

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLNodeLaplacian_sten.cpp
# Opt level: O1

void __thiscall amrex::MLNodeLaplacian::buildStencil(MLNodeLaplacian *this)

{
  Array4<const_int> *pAVar1;
  _func_int *p_Var2;
  _func_int *p_Var3;
  _func_int *p_Var4;
  _func_int *p_Var5;
  _func_int *p_Var6;
  _func_int *p_Var7;
  _func_int *p_Var8;
  _func_int *p_Var9;
  _func_int *p_Var10;
  _func_int *p_Var11;
  _func_int *p_Var12;
  _func_int *p_Var13;
  _func_int *p_Var14;
  _func_int *p_Var15;
  _func_int *p_Var16;
  _func_int *p_Var17;
  _func_int *p_Var18;
  _func_int *p_Var19;
  _func_int *p_Var20;
  _func_int *p_Var21;
  _func_int *p_Var22;
  int iVar23;
  int iVar24;
  FabArray<amrex::FArrayBox> *pFVar25;
  DistributionMapping *pDVar26;
  pointer puVar27;
  tuple<amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_> tVar28;
  Geometry *pGVar29;
  Array4<double> *pAVar30;
  FabArray<amrex::IArrayBox> *pFVar31;
  Array4<const_int> *pAVar32;
  int iVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [12];
  IndexType IVar39;
  int iVar40;
  int iVar41;
  int iVar42;
  int iVar43;
  int i;
  FabType FVar44;
  int iVar45;
  int iVar46;
  int iVar47;
  int iVar48;
  MultiFab *pMVar49;
  __uniq_ptr_data<amrex::MultiFab,_std::default_delete<amrex::MultiFab>,_true,_true> _Var50;
  long lVar51;
  long lVar52;
  long lVar53;
  _func_int *p_Var54;
  Arena *pAVar55;
  element_type *peVar56;
  long lVar57;
  long lVar58;
  long lVar59;
  long lVar60;
  Periodicity *period;
  int iVar61;
  int iVar62;
  int iVar63;
  uint uVar64;
  int iVar65;
  int *piVar66;
  long lVar67;
  long lVar68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var69;
  long lVar70;
  long lVar71;
  ulong uVar72;
  uint uVar73;
  int iVar74;
  long lVar75;
  long lVar76;
  long lVar77;
  FabArray<amrex::FArrayBox> *fabarray_;
  long lVar78;
  long lVar79;
  long lVar80;
  long lVar81;
  long lVar82;
  long lVar83;
  int iVar84;
  int iVar85;
  long lVar86;
  long lVar87;
  long lVar88;
  long lVar89;
  long lVar90;
  long lVar91;
  long lVar92;
  long lVar93;
  Array4<double> *pAVar94;
  int i_2;
  void *pvVar95;
  long lVar96;
  _func_int *p_Var97;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var98;
  long lVar99;
  _func_int *p_Var100;
  IndexType IVar101;
  long lVar102;
  long lVar103;
  long lVar104;
  int i_1;
  int iVar105;
  long lVar106;
  ulong uVar107;
  bool bVar108;
  bool bVar109;
  bool bVar110;
  ulong uVar111;
  ulong uVar112;
  ulong uVar113;
  ulong uVar114;
  ulong uVar115;
  ulong uVar116;
  ulong uVar117;
  ulong uVar118;
  uint uVar119;
  double dVar120;
  double dVar121;
  double dVar122;
  double dVar123;
  double dVar124;
  undefined8 uVar125;
  undefined8 uVar126;
  Real RVar127;
  uint uVar181;
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  uint uVar182;
  Real w1_4;
  double dVar183;
  double dVar184;
  pointer piVar185;
  _Bit_type *p_Var226;
  pointer piVar227;
  undefined1 auVar186 [16];
  uint uVar225;
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  uint uVar228;
  double dVar229;
  undefined1 auVar230 [16];
  uint uVar280;
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  double dVar281;
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  double dVar331;
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  double dVar332;
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  ulong uVar333;
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  double dVar334;
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  undefined1 auVar348 [16];
  undefined1 auVar349 [16];
  double dVar335;
  undefined1 auVar350 [16];
  undefined1 auVar351 [16];
  double dVar336;
  undefined1 auVar352 [16];
  double dVar337;
  double dVar338;
  undefined1 auVar353 [16];
  undefined1 auVar354 [16];
  double dVar339;
  undefined1 auVar355 [16];
  undefined1 auVar356 [16];
  undefined1 auVar357 [16];
  undefined1 auVar358 [16];
  undefined1 auVar359 [16];
  undefined1 auVar360 [16];
  undefined1 auVar361 [16];
  undefined1 auVar362 [16];
  undefined1 auVar363 [16];
  undefined1 auVar364 [16];
  undefined1 auVar365 [16];
  undefined1 auVar366 [16];
  undefined1 auVar367 [16];
  undefined1 auVar368 [16];
  undefined1 auVar369 [16];
  undefined1 auVar370 [16];
  undefined1 auVar371 [16];
  undefined1 auVar372 [16];
  undefined1 auVar373 [16];
  undefined1 auVar374 [16];
  undefined1 auVar375 [16];
  undefined1 auVar376 [16];
  undefined4 uVar383;
  undefined1 auVar377 [16];
  undefined1 auVar378 [16];
  undefined1 auVar379 [16];
  undefined1 auVar380 [16];
  undefined1 auVar381 [16];
  undefined1 auVar382 [16];
  double dVar384;
  double dVar385;
  undefined1 auVar389 [16];
  undefined1 auVar390 [16];
  undefined1 auVar391 [16];
  undefined1 auVar392 [16];
  undefined1 auVar393 [16];
  undefined1 auVar394 [16];
  undefined1 auVar395 [16];
  undefined1 auVar396 [16];
  undefined1 auVar397 [16];
  undefined1 auVar398 [16];
  undefined1 auVar399 [16];
  undefined1 auVar400 [16];
  undefined1 auVar401 [16];
  double dVar386;
  undefined1 auVar402 [16];
  undefined1 auVar403 [16];
  undefined1 auVar404 [16];
  double dVar387;
  undefined1 auVar405 [16];
  double dVar388;
  double dVar427;
  undefined1 auVar406 [16];
  undefined1 auVar407 [16];
  undefined1 auVar408 [16];
  undefined1 auVar409 [16];
  undefined1 auVar410 [16];
  undefined1 auVar411 [16];
  undefined1 auVar412 [16];
  undefined1 auVar413 [16];
  undefined1 auVar414 [16];
  undefined1 auVar415 [16];
  undefined1 auVar416 [16];
  undefined1 auVar417 [16];
  undefined1 auVar418 [16];
  undefined1 auVar419 [16];
  undefined1 auVar420 [16];
  undefined1 auVar421 [16];
  undefined1 auVar422 [16];
  undefined1 auVar423 [16];
  undefined1 auVar424 [16];
  undefined1 auVar425 [16];
  undefined1 auVar426 [16];
  uint uVar428;
  double dVar429;
  uint uVar464;
  uint uVar465;
  uint uVar468;
  undefined1 auVar434 [16];
  undefined1 auVar435 [16];
  undefined1 auVar436 [16];
  double dVar430;
  undefined1 auVar437 [16];
  double dVar431;
  double dVar466;
  undefined1 auVar438 [16];
  undefined1 auVar439 [16];
  undefined1 auVar440 [16];
  undefined1 auVar441 [16];
  double dVar432;
  double dVar467;
  undefined1 auVar442 [16];
  undefined1 auVar443 [16];
  double dVar433;
  undefined1 auVar444 [16];
  undefined1 auVar445 [16];
  undefined1 auVar446 [16];
  undefined1 auVar447 [16];
  undefined1 auVar448 [16];
  undefined1 auVar449 [16];
  undefined1 auVar450 [16];
  undefined1 auVar451 [16];
  undefined1 auVar452 [16];
  undefined1 auVar453 [16];
  undefined1 auVar454 [16];
  undefined1 auVar455 [16];
  undefined1 auVar456 [16];
  undefined1 auVar457 [16];
  undefined1 auVar458 [16];
  undefined1 auVar459 [16];
  undefined1 auVar460 [16];
  undefined1 auVar461 [16];
  undefined1 auVar462 [16];
  undefined1 auVar463 [16];
  double dVar469;
  double dVar472;
  double dVar473;
  int iVar511;
  undefined1 auVar474 [16];
  undefined1 auVar475 [16];
  undefined1 auVar476 [16];
  double dVar470;
  undefined1 auVar477 [16];
  undefined1 auVar478 [16];
  undefined1 auVar479 [16];
  undefined1 auVar480 [16];
  undefined1 auVar481 [16];
  undefined1 auVar482 [16];
  undefined1 auVar483 [16];
  undefined1 auVar484 [16];
  double dVar471;
  double dVar512;
  undefined1 auVar485 [16];
  undefined1 auVar486 [16];
  undefined1 auVar487 [16];
  undefined1 auVar488 [16];
  undefined1 auVar489 [16];
  undefined1 auVar490 [16];
  undefined1 auVar491 [16];
  undefined1 auVar492 [16];
  undefined1 auVar493 [16];
  undefined1 auVar494 [16];
  undefined1 auVar495 [16];
  undefined1 auVar496 [16];
  undefined1 auVar497 [16];
  undefined1 auVar498 [16];
  undefined1 auVar499 [16];
  undefined1 auVar500 [16];
  undefined1 auVar501 [16];
  undefined1 auVar502 [16];
  undefined1 auVar503 [16];
  undefined1 auVar504 [16];
  undefined1 auVar505 [16];
  undefined1 auVar506 [16];
  undefined1 auVar507 [16];
  undefined1 auVar508 [16];
  undefined1 auVar509 [16];
  undefined1 auVar510 [16];
  double dVar513;
  undefined1 auVar516 [16];
  undefined1 auVar517 [16];
  undefined1 auVar518 [16];
  double dVar514;
  undefined1 auVar519 [16];
  double dVar515;
  undefined1 auVar520 [16];
  undefined1 auVar521 [16];
  undefined1 auVar522 [16];
  undefined1 auVar523 [16];
  undefined1 auVar524 [16];
  undefined1 auVar525 [16];
  undefined1 auVar526 [16];
  double dVar548;
  double dVar549;
  undefined1 auVar527 [16];
  undefined1 auVar528 [16];
  undefined1 auVar529 [16];
  undefined1 auVar530 [16];
  undefined1 auVar531 [16];
  undefined1 auVar532 [16];
  undefined1 auVar533 [16];
  undefined1 auVar534 [16];
  undefined1 auVar535 [16];
  undefined1 auVar536 [16];
  undefined1 auVar537 [16];
  undefined1 auVar538 [16];
  undefined1 auVar539 [16];
  undefined1 auVar540 [16];
  undefined1 auVar541 [16];
  undefined1 auVar542 [16];
  undefined1 auVar543 [16];
  undefined1 auVar544 [16];
  undefined1 auVar545 [16];
  undefined1 auVar546 [16];
  undefined1 auVar547 [16];
  double dVar550;
  long *plVar551;
  double dVar552;
  double dVar553;
  double dVar554;
  double dVar555;
  double dVar556;
  double dVar557;
  double dVar558;
  double dVar559;
  double dVar560;
  double dVar561;
  double dVar578;
  double dVar579;
  undefined1 auVar562 [16];
  double dVar580;
  undefined1 auVar563 [16];
  undefined1 auVar564 [16];
  undefined1 auVar565 [16];
  undefined1 auVar566 [16];
  undefined1 auVar567 [16];
  undefined1 auVar568 [16];
  undefined1 auVar569 [16];
  undefined1 auVar570 [16];
  undefined1 auVar571 [16];
  undefined1 auVar572 [16];
  undefined1 auVar573 [16];
  undefined1 auVar574 [16];
  undefined1 auVar575 [16];
  undefined1 auVar576 [16];
  undefined1 auVar577 [16];
  double dVar581;
  undefined1 auVar589 [16];
  undefined1 auVar590 [16];
  double dVar582;
  undefined1 auVar591 [16];
  undefined1 auVar592 [16];
  undefined1 auVar593 [16];
  double dVar583;
  double dVar611;
  undefined1 auVar594 [16];
  double dVar584;
  double dVar585;
  double dVar586;
  double dVar587;
  double dVar612;
  undefined1 auVar595 [16];
  undefined1 auVar596 [16];
  double dVar588;
  double dVar613;
  undefined1 auVar597 [16];
  undefined1 auVar598 [16];
  undefined1 auVar599 [16];
  undefined1 auVar600 [16];
  undefined1 auVar601 [16];
  undefined1 auVar602 [16];
  undefined1 auVar603 [16];
  undefined1 auVar604 [16];
  undefined1 auVar605 [16];
  undefined1 auVar606 [16];
  undefined1 auVar607 [16];
  undefined1 auVar608 [16];
  undefined1 auVar609 [16];
  undefined1 auVar610 [16];
  _Bit_type *p_Var614;
  double dVar618;
  double dVar619;
  double dVar620;
  double dVar621;
  double dVar622;
  undefined1 auVar623 [16];
  double dVar615;
  undefined1 auVar624 [16];
  undefined1 auVar625 [16];
  double dVar616;
  double dVar641;
  undefined1 auVar626 [16];
  double dVar617;
  double dVar642;
  undefined1 auVar627 [16];
  undefined1 auVar628 [16];
  undefined1 auVar629 [16];
  undefined1 auVar630 [16];
  undefined1 auVar631 [16];
  undefined1 auVar632 [16];
  double dVar643;
  double dVar644;
  undefined1 auVar633 [16];
  undefined1 auVar634 [16];
  undefined1 auVar635 [16];
  undefined1 auVar636 [16];
  undefined1 auVar637 [16];
  undefined1 auVar638 [16];
  undefined1 auVar639 [16];
  undefined1 auVar640 [16];
  double dVar645;
  undefined1 auVar648 [16];
  undefined1 auVar649 [16];
  undefined1 auVar650 [16];
  undefined1 auVar651 [16];
  double dVar646;
  double dVar647;
  double dVar660;
  double dVar661;
  undefined1 auVar652 [16];
  undefined1 auVar653 [16];
  undefined1 auVar654 [16];
  undefined1 auVar655 [16];
  undefined1 auVar656 [16];
  undefined1 auVar657 [16];
  undefined1 auVar658 [16];
  undefined1 auVar659 [16];
  double dVar662;
  double dVar663;
  double dVar664;
  double dVar665;
  double dVar666;
  undefined1 auVar667 [16];
  double dVar680;
  undefined1 auVar668 [16];
  undefined1 auVar669 [16];
  double dVar681;
  undefined1 auVar670 [16];
  double dVar682;
  undefined1 auVar671 [16];
  undefined1 auVar672 [16];
  undefined1 auVar673 [16];
  undefined1 auVar674 [16];
  undefined1 auVar675 [16];
  undefined1 auVar676 [16];
  undefined1 auVar677 [16];
  undefined1 auVar678 [16];
  undefined1 auVar679 [16];
  Real w1_3;
  double dVar683;
  double dVar684;
  double dVar685;
  double dVar686;
  undefined1 auVar687 [16];
  undefined1 auVar688 [16];
  undefined1 auVar689 [16];
  double dVar695;
  double dVar696;
  undefined1 auVar690 [16];
  undefined1 auVar691 [16];
  undefined1 auVar692 [16];
  undefined1 auVar693 [16];
  undefined1 auVar694 [16];
  double dVar697;
  double dVar698;
  undefined1 auVar699 [16];
  undefined1 auVar700 [16];
  undefined1 auVar701 [16];
  undefined1 auVar702 [16];
  undefined1 auVar703 [16];
  Periodicity PVar704;
  Real facx;
  Real facz;
  Real wpm_2;
  Real w1_2;
  Real wpm_1;
  Box result;
  Real w1_1;
  FArrayBox sgfab;
  MFIter mfi;
  FArrayBox cnfab;
  Real facy;
  Real w1;
  Array4<double> ns_starr;
  Box tbx;
  Box bx;
  MFItInfo mfi_info;
  Real wpm;
  MFIter mfi_1;
  Elixir cneli;
  Elixir sgeli;
  long local_16d0;
  long local_16c8;
  long local_16b8;
  long local_1698;
  long local_1690;
  long local_1688;
  long local_1680;
  long local_1678;
  long local_1670;
  long local_1668;
  long local_1660;
  double local_1658;
  long local_1650;
  long local_1648;
  long local_1640;
  double local_1620;
  long local_1618;
  long local_1600;
  long local_15f8;
  long local_15f0;
  long local_15e8;
  double local_15d8;
  double local_15d0;
  double local_15c8;
  double dStack_15c0;
  double local_15b8;
  long local_15b0;
  long local_15a8;
  _func_int *local_15a0;
  long local_1598;
  long local_1588;
  long local_1578;
  long local_1568;
  long local_1558;
  _func_int *local_1538;
  long local_1528;
  long local_1518;
  undefined8 local_1508;
  undefined1 local_14f8 [16];
  undefined1 local_14d8 [16];
  undefined8 local_14c8;
  _func_int **local_14b8;
  _func_int *p_Stack_14b0;
  undefined8 local_14a8;
  double dStack_14a0;
  undefined1 local_1478 [12];
  uint uStack_146c;
  double local_1468;
  double local_1458;
  double dStack_1450;
  _func_int *local_1428;
  long local_1418;
  double local_1408;
  long local_13e8;
  long local_13d8;
  undefined8 local_13c8;
  undefined4 uStack_13c0;
  uint local_13b8;
  uint uStack_13b4;
  undefined1 local_1398 [16];
  double local_1388;
  FabArray<amrex::EBCellFlagFab> *local_1378;
  long local_1358;
  double local_1338;
  undefined8 local_1328;
  undefined8 uStack_1320;
  long local_1310;
  long local_1308;
  long local_1300;
  long local_12f8;
  long local_12f0;
  long local_12e8;
  double local_12d8;
  long local_12b8;
  long local_12a8;
  long local_1298;
  long local_1288;
  _func_int *local_1278;
  double local_1268;
  long local_1250;
  FabArray<amrex::FArrayBox> *local_1248;
  long local_1208;
  long local_11e8;
  long local_11c8;
  undefined8 local_11a8;
  long local_1190;
  double local_1188;
  undefined1 local_1168 [16];
  long local_1118;
  long local_1108;
  double dStack_10f0;
  long local_10e0;
  undefined8 uStack_10d0;
  undefined8 local_10c8;
  long local_10b8;
  long local_1088;
  long local_1058;
  uint local_1018;
  uint uStack_1014;
  long local_1008;
  double local_fe8;
  long local_fe0;
  long local_fb8;
  long local_fa8;
  long local_f98;
  long local_f88;
  Box local_f68;
  double local_f48;
  undefined8 uStack_f40;
  double local_f38;
  undefined8 uStack_f30;
  double local_f28;
  double dStack_f20;
  undefined8 local_f18;
  undefined8 uStack_f10;
  double local_f08;
  undefined8 uStack_f00;
  long local_ef8;
  double local_ef0;
  double local_ee8;
  undefined8 uStack_ee0;
  undefined1 local_ed8 [16];
  double local_ec8;
  undefined8 uStack_ec0;
  double local_eb8;
  double dStack_eb0;
  double local_ea8;
  undefined8 uStack_ea0;
  undefined8 local_e98;
  double dStack_e90;
  double local_e88;
  double dStack_e80;
  double local_e78;
  undefined8 uStack_e70;
  double local_e68;
  undefined8 uStack_e60;
  Vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
  *local_e50;
  undefined8 local_e48;
  int iStack_e40;
  int iStack_e3c;
  int iStack_e38;
  int iStack_e34;
  IndexType IStack_e30;
  double local_e28;
  double dStack_e20;
  undefined1 local_e18 [16];
  _func_int *local_e08;
  double dStack_e00;
  double local_df8;
  undefined8 uStack_df0;
  _func_int **local_de8;
  double dStack_de0;
  undefined1 local_dd8 [24];
  int iStack_dc0;
  int iStack_dbc;
  int local_db8;
  int iStack_db4;
  int local_db0;
  int local_dac;
  int local_da4;
  _func_int *local_d88;
  undefined8 uStack_d80;
  _func_int **local_d78;
  undefined8 uStack_d70;
  double local_d68;
  undefined8 uStack_d60;
  _func_int **local_d58;
  _func_int **local_d50;
  double local_d48;
  undefined8 uStack_d40;
  double local_d38;
  undefined8 uStack_d30;
  double local_d28;
  undefined8 uStack_d20;
  _func_int **local_d18;
  undefined8 uStack_d10;
  undefined1 local_d08 [16];
  double local_cf8;
  undefined8 uStack_cf0;
  double local_ce8;
  undefined8 uStack_ce0;
  double local_cd8;
  undefined8 uStack_cd0;
  _func_int **local_cc8;
  double dStack_cc0;
  double local_cb8;
  undefined8 uStack_cb0;
  Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
  *local_ca8;
  _func_int **local_ca0;
  double local_c98;
  undefined8 uStack_c90;
  double local_c88;
  undefined8 uStack_c80;
  double local_c78;
  undefined8 uStack_c70;
  undefined1 local_c68 [16];
  double local_c58;
  double dStack_c50;
  _func_int **local_c48;
  undefined8 uStack_c40;
  double local_c38;
  undefined8 uStack_c30;
  double local_c28;
  double dStack_c20;
  Geometry *local_c18;
  undefined8 uStack_c10;
  _func_int *local_c08;
  undefined8 uStack_c00;
  double local_bf8;
  undefined8 uStack_bf0;
  _func_int *local_be8;
  undefined8 uStack_be0;
  _func_int *local_bd8;
  undefined8 uStack_bd0;
  undefined1 local_bc8;
  bool bStack_bc7;
  bool bStack_bc6;
  undefined1 uStack_bc5;
  undefined1 auStack_bc4 [28];
  int local_ba8 [20];
  double local_b58;
  double dStack_b50;
  double local_b48;
  double dStack_b40;
  _func_int *local_b38;
  _func_int *p_Stack_b30;
  double local_b28;
  undefined8 uStack_b20;
  double local_b18;
  undefined8 uStack_b10;
  double local_b08;
  undefined8 uStack_b00;
  _func_int *local_af8;
  undefined8 uStack_af0;
  double local_ae8;
  double dStack_ae0;
  double local_ad8;
  undefined8 uStack_ad0;
  _func_int **local_ac8;
  undefined8 uStack_ac0;
  _func_int *local_ab8;
  double dStack_ab0;
  double local_aa8;
  undefined8 uStack_aa0;
  double local_a98;
  _func_int *local_a90;
  _func_int *local_a88;
  _func_int **local_a80;
  _func_int **local_a78;
  BaseFab<double> local_a70;
  _func_int *local_a28;
  _func_int *p_Stack_a20;
  double local_a18;
  undefined8 uStack_a10;
  double local_a08;
  double dStack_a00;
  _func_int **local_9f8;
  double dStack_9f0;
  _func_int **local_9e8;
  undefined8 uStack_9e0;
  Array4<const_double> local_9d8;
  double local_998;
  undefined8 uStack_990;
  double local_988;
  undefined8 uStack_980;
  double local_978;
  undefined8 uStack_970;
  double local_968;
  undefined8 uStack_960;
  double local_958;
  undefined8 uStack_950;
  double local_948;
  double dStack_940;
  double local_938;
  undefined8 uStack_930;
  double local_928;
  undefined8 uStack_920;
  undefined1 local_918 [16];
  double local_908;
  undefined8 uStack_900;
  double local_8f8;
  undefined8 uStack_8f0;
  _func_int **local_8e8;
  undefined8 uStack_8e0;
  double local_8d8;
  undefined8 uStack_8d0;
  undefined1 local_8c8 [16];
  double local_8b8;
  undefined8 uStack_8b0;
  _func_int **local_8a8;
  double dStack_8a0;
  undefined1 local_898 [16];
  _func_int **local_888;
  double dStack_880;
  double local_878;
  double dStack_870;
  double local_868;
  double dStack_860;
  _func_int **local_858;
  double dStack_850;
  undefined1 local_848 [8];
  uint uStack_840;
  Orientation OStack_83c;
  uint local_838;
  int iStack_834;
  long lStack_830;
  int local_828;
  int iStack_824;
  int iStack_820;
  int iStack_81c;
  int iStack_818;
  undefined8 uStack_814;
  Array4<const_double> local_808;
  undefined1 local_7c8 [16];
  undefined1 local_7b8 [16];
  double local_7a8;
  double dStack_7a0;
  double local_798;
  double dStack_790;
  _func_int *local_788;
  undefined8 uStack_780;
  double local_778;
  double dStack_770;
  double local_768;
  undefined8 uStack_760;
  _func_int *local_758;
  undefined8 uStack_750;
  double local_748;
  double dStack_740;
  double local_738;
  double dStack_730;
  double local_728;
  undefined8 uStack_720;
  double local_718;
  double dStack_710;
  double local_708;
  double dStack_700;
  double local_6f8;
  double dStack_6f0;
  double local_6e8;
  undefined8 uStack_6e0;
  double local_6d8;
  undefined8 uStack_6d0;
  double local_6c8;
  undefined8 uStack_6c0;
  double local_6b8;
  undefined8 uStack_6b0;
  double local_6a8;
  undefined8 uStack_6a0;
  double local_698;
  undefined8 uStack_690;
  _func_int *local_688;
  _func_int *p_Stack_680;
  FabArray<amrex::FArrayBox> *local_670;
  ulong local_668;
  long local_660;
  double local_658;
  double local_650;
  double local_648;
  double local_640;
  double local_638;
  double local_630;
  double local_628;
  double local_620;
  _func_int **local_618;
  _func_int **local_610;
  int local_604;
  int local_600;
  int local_5fc;
  double *local_5f8;
  int iStack_5f0;
  int aiStack_5ec [7];
  undefined1 local_5d0 [12];
  Orientation OStack_5c4;
  int local_5c0;
  int iStack_5bc;
  long lStack_5b8;
  int local_5b0;
  int iStack_5ac;
  int iStack_5a8;
  int iStack_5a4;
  undefined1 auStack_5a0 [12];
  MFItInfo local_58c;
  double local_578;
  double dStack_570;
  double local_568;
  undefined8 uStack_560;
  double local_558;
  double dStack_550;
  double local_548;
  undefined8 uStack_540;
  double local_538;
  undefined8 uStack_530;
  _func_int **local_528;
  undefined8 uStack_520;
  double local_518;
  double dStack_510;
  double local_508;
  double dStack_500;
  double local_4f8;
  undefined8 uStack_4f0;
  double local_4e8;
  undefined8 uStack_4e0;
  _func_int **local_4d8;
  undefined8 uStack_4d0;
  _func_int **local_4c8;
  undefined8 uStack_4c0;
  _func_int **local_4b8;
  undefined8 uStack_4b0;
  FabArray<amrex::FArrayBox> *local_4a0;
  long local_498;
  long local_490;
  _func_int **local_488;
  _func_int **local_480;
  _func_int **local_478;
  _func_int **local_470;
  _func_int **local_468;
  _func_int **local_460;
  Box local_458;
  _func_int *local_438;
  undefined8 uStack_430;
  _func_int *local_428;
  undefined8 uStack_420;
  _func_int *local_418;
  undefined8 uStack_410;
  _func_int *local_408;
  undefined8 uStack_400;
  _func_int *local_3f8;
  undefined8 uStack_3f0;
  _func_int *local_3e8;
  undefined8 uStack_3e0;
  _func_int *local_3d8;
  undefined8 uStack_3d0;
  _func_int *local_3c8;
  undefined8 uStack_3c0;
  _func_int *local_3b8;
  undefined8 uStack_3b0;
  _func_int *local_3a8;
  undefined8 uStack_3a0;
  _func_int *local_398;
  undefined8 uStack_390;
  double local_388;
  undefined8 uStack_380;
  _func_int *local_378;
  undefined8 uStack_370;
  double local_368;
  undefined8 uStack_360;
  _func_int *local_358;
  undefined8 uStack_350;
  _func_int *local_348;
  undefined8 uStack_340;
  double local_338;
  undefined8 uStack_330;
  long local_328;
  FabArray<amrex::FArrayBox> *local_320;
  long local_318;
  ulong local_310;
  long local_308;
  long local_300;
  _func_int **local_2f0;
  ulong local_2e8;
  long local_2e0;
  long local_2d8;
  long local_2d0;
  long local_2c8;
  long local_2c0;
  long local_2b8;
  long local_2b0;
  long local_2a8;
  ulong local_2a0;
  long local_298;
  _func_int **local_290;
  _func_int **local_288;
  _func_int **local_280;
  _func_int **local_278;
  long local_270;
  long local_268;
  long local_260;
  long local_258;
  long local_250;
  long local_248;
  long local_240;
  _func_int **local_238;
  _func_int **local_230;
  _func_int **local_228;
  double local_220;
  double local_218;
  double local_210;
  double local_208;
  double local_200;
  double local_1f8;
  double local_1f0;
  undefined1 local_1e8 [124];
  int local_16c;
  int local_168;
  pointer local_160;
  pointer piStack_158;
  _Bit_type *local_150;
  double local_148;
  _Bit_type *p_Stack_140;
  double local_138;
  IntVect local_128;
  int local_11c;
  Elixir local_60;
  Elixir local_48;
  undefined1 auVar187 [16];
  
  local_e50 = &this->m_stencil;
  std::
  vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
  ::resize(&local_e50->
            super_vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
           ,(long)(this->super_MLNodeLinOp).super_MLLinOp.m_num_amr_levels);
  local_ca8 = &this->m_nosigma_stencil;
  std::
  vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
  ::resize(&local_ca8->
            super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
           ,(long)(this->super_MLNodeLinOp).super_MLLinOp.m_num_amr_levels);
  std::
  vector<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>
  ::resize(&(this->m_s0_norm0).
            super_vector<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>
           ,(long)(this->super_MLNodeLinOp).super_MLLinOp.m_num_amr_levels);
  if (0 < (this->super_MLNodeLinOp).super_MLLinOp.m_num_amr_levels) {
    lVar75 = 0;
    lVar106 = 0;
    do {
      std::
      vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
      ::resize((vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                *)((long)&(((this->m_stencil).
                            super_vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                            .
                            super__Vector_base<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                          ).
                          super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                  + lVar75),
               (long)(this->super_MLNodeLinOp).super_MLLinOp.m_num_mg_levels.
                     super_vector<int,_std::allocator<int>_>.
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_start[lVar106]);
      local_1e8._0_8_ =
           (__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x0;
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)
                 ((long)&(((this->m_s0_norm0).
                           super_vector<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>
                           .
                           super__Vector_base<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super_vector<double,_std::allocator<double>_>).
                         super__Vector_base<double,_std::allocator<double>_> + lVar75),
                 (long)(this->super_MLNodeLinOp).super_MLLinOp.m_num_mg_levels.
                       super_vector<int,_std::allocator<int>_>.
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_start[lVar106],(value_type_conflict2 *)local_1e8);
      lVar106 = lVar106 + 1;
      lVar75 = lVar75 + 0x18;
    } while (lVar106 < (this->super_MLNodeLinOp).super_MLLinOp.m_num_amr_levels);
  }
  if ((this->super_MLNodeLinOp).m_coarsening_strategy == RAP) {
    if (**(int **)&(((this->super_MLNodeLinOp).super_MLLinOp.m_geom.
                     super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                     .
                     super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->
                   super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>).
                   super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_> == 1) {
      Assert_host("!m_geom[0][0].IsRZ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/LinearSolvers/MLMG/AMReX_MLNodeLaplacian_sten.cpp"
                  ,0x22,"\"MLNodeLaplacian::buildStencil: cylindrical not supported for RAP\"");
    }
    uVar73 = (this->super_MLNodeLinOp).super_MLLinOp.m_num_amr_levels;
    uVar107 = (ulong)uVar73;
    if (0 < (int)uVar73) {
      uVar72 = 0;
      do {
        if ((uVar72 != (int)uVar107 - 1) &&
           ((this->super_MLNodeLinOp).super_MLLinOp.m_amr_ref_ratio.
            super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar72] != 2)) {
          Assert_host("amrlev == m_num_amr_levels-1 || AMRRefRatio(amrlev) == 2",
                      "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/LinearSolvers/MLMG/AMReX_MLNodeLaplacian_sten.cpp"
                      ,0x26,(char *)0x0);
        }
        uVar73 = (this->super_MLNodeLinOp).super_MLLinOp.m_num_mg_levels.
                 super_vector<int,_std::allocator<int>_>.
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start[uVar72];
        uVar107 = (ulong)uVar73;
        local_ef8 = uVar72 * 3;
        if (0 < (int)uVar73) {
          local_16b8 = 0;
          lVar75 = 0;
          uVar333 = 0;
          do {
            local_dd8[0] = true;
            local_dd8._1_7_ = 0x1000000;
            local_dd8._8_4_ = 1;
            convert((BoxArray *)local_1e8,
                    (BoxArray *)
                    (*(long *)&(this->super_MLNodeLinOp).super_MLLinOp.m_grids.
                               super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                               .
                               super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[uVar72].
                               super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                               super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                    + lVar75),(IntVect *)local_dd8);
            lVar106 = *(long *)&(this->super_MLNodeLinOp).super_MLLinOp.m_dmap.
                                super_vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                                .
                                super__Vector_base<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar72].
                                super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                                .
                                super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
            ;
            pMVar49 = (MultiFab *)operator_new(0x180);
            uVar111 = uVar333 + 1;
            bStack_bc7 = false;
            bStack_bc6 = false;
            uStack_bc5 = null >> 0x18;
            auStack_bc4._0_4_ = (IndexType)0x0;
            local_bc8 = true;
            auStack_bc4._20_8_ = (pointer)0x0;
            local_ba8[0] = 0;
            local_ba8[1] = 0;
            auStack_bc4._4_4_ = 0;
            auStack_bc4._8_4_ = 0;
            auStack_bc4._12_4_ = 0;
            auStack_bc4._16_4_ = 0;
            local_a70._vptr_BaseFab = (_func_int **)&PTR__FabFactory_0074e8d0;
            MultiFab::MultiFab(pMVar49,(BoxArray *)local_1e8,
                               (DistributionMapping *)(lVar106 + local_16b8),9,
                               (uint)((uVar107 & 0xffffffff) != uVar111 || uVar72 != 0) * 3 + 1,
                               (MFInfo *)&local_bc8,(FabFactory<amrex::FArrayBox> *)&local_a70);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)(auStack_bc4 + 0xc));
            lVar106 = *(long *)((long)&(((local_e50->
                                         super_vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                                         ).
                                         super__Vector_base<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->
                                       super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                                       ).
                                       super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                               + local_ef8 * 8);
            plVar551 = *(long **)(lVar106 + uVar333 * 8);
            *(MultiFab **)(lVar106 + uVar333 * 8) = pMVar49;
            if (plVar551 != (long *)0x0) {
              (**(code **)(*plVar551 + 8))();
            }
            BoxArray::~BoxArray((BoxArray *)local_1e8);
            pFVar25 = *(FabArray<amrex::FArrayBox> **)
                       (*(long *)((long)&(((this->m_stencil).
                                           super_vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                                           .
                                           super__Vector_base<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->
                                         super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                                         ).
                                         super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                                 + local_ef8 * 8) + uVar333 * 8);
            FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                      (pFVar25,0.0,0,(pFVar25->super_FabArrayBase).n_comp,
                       &(pFVar25->super_FabArrayBase).n_grow);
            uVar107 = (ulong)(this->super_MLNodeLinOp).super_MLLinOp.m_num_mg_levels.
                             super_vector<int,_std::allocator<int>_>.
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[uVar72];
            lVar75 = lVar75 + 0x68;
            local_16b8 = local_16b8 + 0x10;
            uVar333 = uVar111;
          } while ((long)uVar111 < (long)uVar107);
        }
        if (uVar72 != 0) {
          local_dd8[0] = true;
          local_dd8._1_7_ = 0x1000000;
          local_dd8._8_4_ = 1;
          convert((BoxArray *)local_1e8,
                  *(BoxArray **)
                   &(this->super_MLNodeLinOp).super_MLLinOp.m_grids.
                    super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                    .
                    super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar72].
                    super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                    super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,
                  (IntVect *)local_dd8);
          pDVar26 = *(DistributionMapping **)
                     &(this->super_MLNodeLinOp).super_MLLinOp.m_dmap.
                      super_vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                      .
                      super__Vector_base<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar72].
                      super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                      .
                      super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
          ;
          _Var50.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
          super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
          super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
               (__uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>)
               operator_new(0x180);
          bStack_bc7 = false;
          bStack_bc6 = false;
          uStack_bc5 = null >> 0x18;
          auStack_bc4._0_4_ = (IndexType)0x0;
          local_bc8 = true;
          auStack_bc4._20_8_ = (pointer)0x0;
          local_ba8[0] = 0;
          local_ba8[1] = 0;
          auStack_bc4._4_4_ = 0;
          auStack_bc4._8_4_ = 0;
          auStack_bc4._12_4_ = 0;
          auStack_bc4._16_4_ = 0;
          local_a70._vptr_BaseFab = (_func_int **)&PTR__FabFactory_0074e8d0;
          MultiFab::MultiFab((MultiFab *)
                             _Var50.
                             super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                             .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,
                             (BoxArray *)local_1e8,pDVar26,9,4,(MFInfo *)&local_bc8,
                             (FabFactory<amrex::FArrayBox> *)&local_a70);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)(auStack_bc4 + 0xc));
          puVar27 = (local_ca8->
                    super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                    ).
                    super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          tVar28.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
          super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
               *(_Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_> *)
                &puVar27[uVar72]._M_t.
                 super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>;
          puVar27[uVar72]._M_t.
          super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> =
               _Var50.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
               _M_t.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
               .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl;
          if (tVar28.
              super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
              super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl !=
              (_Head_base<0UL,_amrex::MultiFab_*,_false>)0x0) {
            (**(code **)(*(long *)tVar28.
                                  super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                                  .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl + 8)
            )();
          }
          BoxArray::~BoxArray((BoxArray *)local_1e8);
          _Var50.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
          super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
          super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
               (local_ca8->
               super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
               ).
               super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar72]._M_t.
               super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>;
          FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                    ((FabArray<amrex::FArrayBox> *)
                     _Var50.
                     super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                     .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,0.0,0,
                     *(int *)((long)_Var50.
                                    super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                                    .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl +
                             0xcc),
                     (IntVect *)
                     ((long)_Var50.
                            super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                            .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl + 0xc0));
        }
        local_328 = uVar72 * 0x18;
        pGVar29 = *(Geometry **)
                   &(this->super_MLNodeLinOp).super_MLLinOp.m_geom.
                    super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                    .
                    super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar72].
                    super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                    super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>;
        dVar550 = (pGVar29->super_CoordSys).inv_dx[0];
        dVar334 = (pGVar29->super_CoordSys).inv_dx[1];
        dVar469 = (pGVar29->super_CoordSys).inv_dx[2];
        lVar75 = **(long **)&(this->super_MLNodeLinOp).super_MLLinOp.m_factory.
                             super_vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                             .
                             super__Vector_base<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[uVar72].
                             super_vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                             .
                             super__Vector_base<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
        ;
        if (lVar75 == 0) {
          lVar75 = 0;
        }
        else {
          lVar75 = __dynamic_cast(lVar75,&FabFactory<amrex::FArrayBox>::typeinfo,
                                  &EBFArrayBoxFactory::typeinfo,0);
        }
        if (lVar75 == 0) {
          local_1378 = (FabArray<amrex::EBCellFlagFab> *)0x0;
        }
        else {
          local_1378 = EBDataCollection::getMultiEBCellFlagFab
                                 (*(EBDataCollection **)(lVar75 + 0xd8));
        }
        _Var50.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
        super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
        super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
             (this->m_integral).
             super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
             .
             super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar72]._M_t.
             super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>;
        if (lVar75 == 0) {
          local_1248 = (FabArray<amrex::FArrayBox> *)0x0;
        }
        else {
          local_1248 = &EBDataCollection::getVolFrac(*(EBDataCollection **)(lVar75 + 0xd8))->
                        super_FabArray<amrex::FArrayBox>;
        }
        local_58c.device_sync = true;
        local_58c.num_streams = Gpu::Device::max_gpu_streams.itype;
        local_58c.tilesize.vect[2] = DAT_00753ec0;
        local_58c.tilesize.vect[0] = (int)FabArrayBase::mfiter_tile_size;
        local_58c.tilesize.vect[1] = FabArrayBase::mfiter_tile_size._4_4_;
        local_58c.do_tiling = true;
        local_58c.dynamic = true;
        FArrayBox::FArrayBox((FArrayBox *)local_dd8);
        FArrayBox::FArrayBox((FArrayBox *)&local_a70);
        MFIter::MFIter((MFIter *)&local_bc8,
                       (FabArrayBase *)
                       **(undefined8 **)
                         ((long)&(((local_e50->
                                   super_vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                                   ).
                                   super__Vector_base<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                 super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                                 ).
                                 super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                         + local_ef8 * 8),&local_58c);
        local_c18 = pGVar29;
        if (local_ba8[0] < local_ba8[2]) {
          dVar384 = dVar550 * 0.027777777777777776 * dVar550;
          local_9f8 = (_func_int **)(dVar334 * 0.027777777777777776 * dVar334);
          dVar469 = dVar469 * 0.027777777777777776 * dVar469;
          dVar120 = dVar384 * 4.0;
          local_858 = (_func_int **)((double)local_9f8 + (double)local_9f8);
          uVar107 = (ulong)DAT_00697990;
          uStack_9e0 = DAT_00697990._8_8_;
          dVar121 = (double)((ulong)local_858 ^ uVar107);
          local_d68 = dVar469 + dVar469;
          dVar122 = (double)((ulong)local_d68 ^ uVar107);
          dVar123 = dVar384 * -2.0;
          dVar550 = dVar550 * 0.027777777777777776 * dVar550;
          dVar578 = dVar334 * 0.027777777777777776 * dVar334;
          dVar183 = local_d68 + ((dVar550 + dVar550) - dVar578);
          p_Var226 = (_Bit_type *)(local_d68 + ((dVar578 + dVar578) - dVar550));
          dVar184 = dVar578 + dVar578;
          dVar229 = dVar550 + dVar550;
          local_868 = (double)local_9f8 * 4.0;
          piVar185 = (pointer)(dVar469 * -2.0 + (dVar578 * 4.0 - dVar229));
          piVar227 = (pointer)(dVar469 * 4.0 + ((double)((ulong)dVar184 ^ uVar107) - dVar229));
          local_cb8 = dVar469 * 4.0;
          uStack_cb0 = 0;
          dVar124 = dVar384 + dVar384;
          local_9e8 = (_func_int **)((ulong)dVar469 ^ uVar107);
          dVar429 = (double)((ulong)local_9f8 ^ uVar107);
          dVar385 = (double)((ulong)dVar384 ^ uVar107);
          dVar578 = dVar550 + dVar578 + dVar469;
          p_Var614 = (_Bit_type *)((dVar229 + dVar184) - dVar469);
          uStack_d60 = 0;
          plVar551 = (long *)((dVar550 * 4.0 - dVar184) - local_d68);
          dStack_9f0 = dVar334;
          dStack_860 = dVar334;
          dStack_850 = dVar334;
          do {
            BATransformer::operator()
                      (&local_458,
                       (BATransformer *)(CONCAT44(auStack_bc4._8_4_,auStack_bc4._4_4_) + 8),
                       (Box *)((long)*(int *)(*(long *)local_ba8._24_8_ + (long)local_ba8[0] * 4) *
                               0x1c + **(long **)(CONCAT44(auStack_bc4._8_4_,auStack_bc4._4_4_) +
                                                 0x50)));
            local_458.smallend.vect._0_8_ =
                 CONCAT44(local_458.smallend.vect[1] + -1,local_458.smallend.vect[0] + -1);
            local_458.smallend.vect[2] = local_458.smallend.vect[2] + -1;
            MFIter::growntilebox((Box *)&local_e48,(MFIter *)&local_bc8,1);
            uVar107 = CONCAT44(-(uint)(local_458.smallend.vect[1] < (int)((ulong)local_e48 >> 0x20))
                               ,-(uint)(local_458.smallend.vect[0] < (int)local_e48));
            local_e48 = (double *)
                        (~uVar107 & local_458.smallend.vect._0_8_ | (ulong)local_e48 & uVar107);
            iStack_5f0 = local_458.smallend.vect[2];
            if (local_458.smallend.vect[2] < iStack_e40) {
              iStack_5f0 = iStack_e40;
            }
            uVar107 = CONCAT44(-(uint)(iStack_e38 < local_458.bigend.vect[1]),
                               -(uint)(iStack_e3c < local_458.bigend.vect[0]));
            uVar107 = ~uVar107 & local_458.bigend.vect._0_8_ |
                      CONCAT44(iStack_e38,iStack_e3c) & uVar107;
            iStack_e3c = (int)uVar107;
            iStack_e38 = (int)(uVar107 >> 0x20);
            iVar48 = local_458.bigend.vect[2];
            if (iStack_e34 < local_458.bigend.vect[2]) {
              iVar48 = iStack_e34;
            }
            aiStack_5ec[2] = iVar48;
            aiStack_5ec[3] = IStack_e30.itype;
            local_5f8 = local_e48;
            aiStack_5ec[0] = iStack_e3c;
            lVar106 = 0;
            aiStack_5ec[1] = iStack_e38;
            do {
              if ((IStack_e30.itype >> ((uint)lVar106 & 0x1f) & 1) != 0) {
                aiStack_5ec[lVar106] = aiStack_5ec[lVar106] + -1;
              }
              lVar106 = lVar106 + 1;
            } while (lVar106 != 3);
            aiStack_5ec[3] = 0;
            local_f68.btype.itype = 0;
            local_f68.smallend.vect[0] = (int)local_e48;
            local_f68.smallend.vect[1] = (int)((ulong)local_e48 >> 0x20);
            local_f68.smallend.vect[2] = iStack_5f0 + -1;
            local_f68.bigend.vect[0] = aiStack_5ec[0] + 1;
            local_f68.smallend.vect[1] = local_f68.smallend.vect[1] + -1;
            local_f68.smallend.vect[0] = local_f68.smallend.vect[0] + -1;
            local_f68.bigend.vect[1] = aiStack_5ec[1] + 1;
            local_f68.bigend.vect[2] = aiStack_5ec[2] + 1;
            piVar66 = local_ba8;
            if ((Vector<int,_std::allocator<int>_> *)local_ba8._32_8_ !=
                (Vector<int,_std::allocator<int>_> *)0x0) {
              piVar66 = (int *)((long)local_ba8[0] * 4 + *(long *)local_ba8._32_8_);
            }
            lVar106 = *(long *)(*(long *)(**(long **)((long)&(((this->m_sigma).
                                                                                                                              
                                                  super_vector<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>_>_>
                                                  .
                                                  super__Vector_base<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  super_vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>
                                                  ).
                                                  super__Vector_base<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>
                                                  + local_ef8 * 8) + 0x108) + (long)*piVar66 * 8);
            lVar78 = *(long *)(lVar106 + 0x10);
            local_14f8._0_8_ = lVar78;
            iVar63 = *(int *)(lVar106 + 0x18);
            iVar74 = *(int *)(lVar106 + 0x1c);
            iVar65 = *(int *)(lVar106 + 0x20);
            iVar511 = *(int *)(lVar106 + 0x24);
            iVar46 = *(int *)(lVar106 + 0x28);
            iStack_e40 = iStack_5f0;
            iStack_e34 = iVar48;
            FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                      ((Array4<double> *)local_5d0,
                       (FabArray<amrex::FArrayBox> *)
                       **(undefined8 **)
                         ((long)&(((local_e50->
                                   super_vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                                   ).
                                   super__Vector_base<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                 super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                                 ).
                                 super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                         + local_ef8 * 8),(MFIter *)&local_bc8);
            tVar28.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
            super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
                 *(_Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_> *)
                  &(local_ca8->
                   super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                   ).
                   super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar72]._M_t.
                   super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>;
            if (tVar28.
                super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
                super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl ==
                (_Head_base<0UL,_amrex::MultiFab_*,_false>)0x0) {
              local_838 = 0;
              iStack_834 = 0;
              lStack_830 = 0;
              local_848._0_4_ = 0;
              local_848._4_4_ = 0;
              uStack_840 = 0;
              OStack_83c.val = 0;
              local_828 = 1;
              iStack_824 = 1;
              iStack_820 = 1;
              iStack_81c = 0;
              iStack_818 = 0;
              uStack_814._0_4_ = 0;
              uStack_814._4_4_ = 0;
            }
            else {
              FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                        ((Array4<double> *)local_848,
                         (FabArray<amrex::FArrayBox> *)
                         tVar28.
                         super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                         .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,
                         (MFIter *)&local_bc8);
            }
            lVar51 = (long)((iVar511 - iVar63) + 1);
            lVar76 = (long)((iVar46 - iVar74) + 1);
            lVar67 = lVar76 * lVar51;
            FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                      (&local_9d8,
                       (FabArray<amrex::FArrayBox> *)
                       _Var50.
                       super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                       .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,
                       (MFIter *)&local_bc8);
            bVar108 = lVar75 == 0;
            if (lVar75 != 0) {
              FabArray<amrex::EBCellFlagFab>::const_array<amrex::EBCellFlagFab,_0>
                        ((Array4<const_amrex::EBCellFlag> *)local_1e8,local_1378,
                         (MFIter *)&local_bc8);
              FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                        (&local_808,local_1248,(MFIter *)&local_bc8);
              piVar66 = local_ba8;
              if ((Vector<int,_std::allocator<int>_> *)local_ba8._32_8_ !=
                  (Vector<int,_std::allocator<int>_> *)0x0) {
                piVar66 = (int *)((long)local_ba8[0] * 4 + *(long *)local_ba8._32_8_);
              }
              FVar44 = EBCellFlagFab::getType
                                 ((local_1378->m_fabs_v).
                                  super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start[*piVar66],&local_f68);
              iVar84 = iStack_e34;
              iVar23 = iStack_e38;
              iVar46 = iStack_e3c;
              iVar511 = iStack_e40;
              iVar48 = local_f68.smallend.vect[2];
              if (FVar44 == singlevalued) {
                iVar511 = *(int *)(lVar106 + 0x18);
                iVar46 = *(int *)(lVar106 + 0x1c);
                local_ab8 = (_func_int *)CONCAT44(local_ab8._4_4_,iVar511);
                local_aa8 = (double)CONCAT44(local_aa8._4_4_,local_f68.smallend.vect[0]);
                if (iVar511 < local_f68.smallend.vect[0]) {
                  iVar511 = local_f68.smallend.vect[0];
                }
                local_c08 = (_func_int *)CONCAT44(local_c08._4_4_,iVar46);
                local_d28 = (double)CONCAT44(local_d28._4_4_,local_f68.smallend.vect[1]);
                if (iVar46 < local_f68.smallend.vect[1]) {
                  iVar46 = local_f68.smallend.vect[1];
                }
                iVar23 = *(int *)(lVar106 + 0x20);
                local_bf8 = (double)CONCAT44(local_bf8._4_4_,iVar23);
                if (iVar23 < local_f68.smallend.vect[2]) {
                  iVar23 = local_f68.smallend.vect[2];
                }
                iVar84 = *(int *)(lVar106 + 0x24);
                if (local_f68.bigend.vect[0] < *(int *)(lVar106 + 0x24)) {
                  iVar84 = local_f68.bigend.vect[0];
                }
                local_ca0 = (_func_int **)CONCAT44(local_ca0._4_4_,iVar84);
                iVar84 = *(int *)(lVar106 + 0x28);
                if (local_f68.bigend.vect[1] < *(int *)(lVar106 + 0x28)) {
                  iVar84 = local_f68.bigend.vect[1];
                }
                iVar45 = *(int *)(lVar106 + 0x2c);
                if (local_f68.bigend.vect[2] < *(int *)(lVar106 + 0x2c)) {
                  iVar45 = local_f68.bigend.vect[2];
                }
                FArrayBox::resize((FArrayBox *)&local_a70,&local_f68,0x1b,(Arena *)0x0);
                pAVar55 = (Arena *)CONCAT44(local_a70.super_DataAllocator.m_arena._4_4_,
                                            (int)local_a70.super_DataAllocator.m_arena);
                if (pAVar55 == (Arena *)0x0) {
                  pAVar55 = The_Arena();
                }
                local_d50 = (_func_int **)CONCAT44(local_d50._4_4_,iVar23);
                local_ac8 = (_func_int **)CONCAT44(local_ac8._4_4_,iVar48);
                Gpu::Elixir::Elixir(&local_60,(void *)0x0,pAVar55);
                iVar85 = local_a70.domain.bigend.vect[2];
                iVar105 = local_a70.domain.bigend.vect[1];
                iVar24 = local_a70.domain.bigend.vect[0];
                iVar61 = local_a70.domain.smallend.vect[2];
                iVar23 = local_a70.domain.smallend.vect[1];
                iVar48 = local_a70.domain.smallend.vect[0];
                lVar52 = CONCAT44(local_a70.dptr._4_4_,(int)local_a70.dptr);
                lVar53 = (long)local_a70.domain.smallend.vect[0];
                lVar77 = (long)local_a70.domain.smallend.vect[2];
                FArrayBox::resize((FArrayBox *)local_dd8,&local_f68,1,(Arena *)0x0);
                pAVar55 = (Arena *)CONCAT44(local_dd8._12_4_,local_dd8._8_4_);
                if (pAVar55 == (Arena *)0x0) {
                  pAVar55 = The_Arena();
                }
                local_cc8 = (_func_int **)CONCAT44(local_cc8._4_4_,iVar46);
                local_a08 = (double)CONCAT44(local_a08._4_4_,iVar511);
                local_ec8 = (double)(long)((iVar24 - iVar48) + 1);
                lVar88 = (long)((iVar105 - iVar23) + 1);
                lVar103 = lVar88 * (long)local_ec8;
                lVar79 = (long)((iVar85 - iVar61) + 1);
                Gpu::Elixir::Elixir(&local_48,(void *)0x0,pAVar55);
                auVar186 = _DAT_006ba930;
                auVar341 = _DAT_006979c0;
                auVar343 = _DAT_006979b0;
                lVar104 = (long)iStack_dc0;
                lVar92 = (long)iStack_dbc;
                lVar82 = (long)local_db8;
                lVar83 = (long)((iStack_db4 - iStack_dc0) + 1);
                local_14d8._0_8_ = lVar92;
                local_d18 = (_func_int **)(long)((local_db0 - iStack_dbc) + 1);
                lVar102 = (long)local_d18 * lVar83;
                local_16d0 = (long)local_f68.smallend.vect[2];
                uVar107 = (ulong)DAT_00697990;
                if (local_f68.smallend.vect[2] <= local_f68.bigend.vect[2]) {
                  lVar58 = lVar103 * lVar79;
                  lVar57 = (long)local_f68.smallend.vect[1];
                  lVar89 = (long)local_f68.smallend.vect[0];
                  lVar99 = lVar58 * 0x10;
                  local_f18 = (double)(lVar58 * 0x18);
                  local_11c8 = ((lVar79 * 8 + local_16d0 * 8 + lVar77 * -8) * lVar88 + lVar57 * 8 +
                               (long)iVar23 * -8) * (long)local_ec8 + lVar89 * 8 + lVar53 * -8 +
                               lVar52;
                  local_1088 = (lVar57 * 8 + (local_16d0 - lVar77) * lVar88 * 8 + (long)iVar23 * -8)
                               * (long)local_ec8 + lVar89 * 8 + lVar53 * -8 + lVar52;
                  local_ea8 = (double)(lVar58 * 0xa0);
                  local_f28 = (double)(lVar58 * 0xa8);
                  local_eb8 = (double)(lVar58 * 0xb0);
                  local_1168._0_8_ = lVar58 * 0xd0;
                  local_e98._0_4_ = local_f68.bigend.vect[1] + 1;
                  local_de8 = (_func_int **)((long)local_ec8 * 8);
                  do {
                    if (local_f68.smallend.vect[1] <= local_f68.bigend.vect[1]) {
                      local_12a8 = local_1088;
                      local_1268 = (double)local_11c8;
                      lVar59 = lVar57;
                      do {
                        if (local_f68.smallend.vect[0] <= local_f68.bigend.vect[0]) {
                          lVar80 = (lVar59 - local_808.begin.y) *
                                   CONCAT44(local_808.jstride._4_4_,(int)local_808.jstride);
                          lVar81 = (local_16d0 - local_808.begin.z) *
                                   CONCAT44(local_808.kstride._4_4_,(int)local_808.kstride);
                          lVar93 = (lVar59 - local_9d8.begin.y) * local_9d8.jstride;
                          lVar86 = (local_16d0 - local_9d8.begin.z) * local_9d8.kstride;
                          local_15c8 = (double)(local_9d8.nstride * 0x48);
                          local_f08 = (double)(lVar52 + (local_16d0 - lVar77) * lVar103 * 8 +
                                              (lVar59 - iVar23) * (long)local_ec8 * 8);
                          lVar60 = (long)(&((Box *)(local_dd8._16_8_ + 0x18))->smallend + -2) +
                                   (lVar59 - lVar92) * lVar83 * 8 +
                                   (local_16d0 - lVar82) * lVar102 * 8;
                          local_14b8 = (_func_int **)(long)local_808.begin.x;
                          lVar70 = lVar89;
                          lVar71 = local_12a8;
                          dVar550 = local_1268;
                          do {
                            iVar48 = auVar186._0_4_;
                            iVar511 = auVar186._4_4_;
                            if (((((lVar70 < local_a08._0_4_) || (lVar59 < (int)local_cc8)) ||
                                 (local_16d0 < (int)local_d50)) ||
                                (((int)local_ca0 < lVar70 || (iVar84 < lVar59)))) ||
                               (iVar45 < local_16d0)) {
                              lVar68 = 0x1c;
                              lVar87 = 0;
                              auVar230 = auVar343;
                              do {
                                if (SUB164(auVar230 ^ auVar341,4) == iVar511 &&
                                    SUB164(auVar230 ^ auVar341,0) < iVar48) {
                                  *(undefined8 *)(lVar71 + lVar87) = 0;
                                  *(undefined8 *)((long)dVar550 + lVar87) = 0;
                                }
                                lVar90 = auVar230._8_8_;
                                auVar230._0_8_ = auVar230._0_8_ + 2;
                                auVar230._8_8_ = lVar90 + 2;
                                lVar87 = lVar87 + lVar99;
                                lVar68 = lVar68 + -2;
                              } while (lVar68 != 0);
                              uVar125 = 0;
                            }
                            else {
                              uVar73 = *(uint *)(local_1e8._0_8_ +
                                                (lVar70 - (int)local_1e8._32_4_) * 4 +
                                                (local_16d0 - (int)local_1e8._40_4_) *
                                                local_1e8._16_8_ * 4 +
                                                (lVar59 - (int)local_1e8._36_4_) *
                                                CONCAT44(local_1e8._12_4_,local_1e8._8_4_) * 4) & 3;
                              if (uVar73 == 0) {
LAB_005d27df:
                                lVar68 = 0x1c;
                                lVar87 = 0;
                                auVar285 = auVar343;
                                do {
                                  if (SUB164(auVar285 ^ auVar341,4) == iVar511 &&
                                      SUB164(auVar285 ^ auVar341,0) < iVar48) {
                                    *(undefined8 *)(lVar71 + lVar87) = 0x3ff0000000000000;
                                    *(undefined8 *)((long)dVar550 + lVar87) = 0x3ff0000000000000;
                                  }
                                  lVar90 = auVar285._8_8_;
                                  auVar285._0_8_ = auVar285._0_8_ + 2;
                                  auVar285._8_8_ = lVar90 + 2;
                                  lVar87 = lVar87 + lVar99;
                                  lVar68 = lVar68 + -2;
                                } while (lVar68 != 0);
                              }
                              else if (uVar73 == 3) {
                                lVar68 = 0x1c;
                                lVar87 = 0;
                                auVar287 = auVar343;
                                do {
                                  if (SUB164(auVar287 ^ auVar341,4) == iVar511 &&
                                      SUB164(auVar287 ^ auVar341,0) < iVar48) {
                                    *(undefined8 *)(lVar71 + lVar87) = 0;
                                    *(undefined8 *)((long)dVar550 + lVar87) = 0;
                                  }
                                  lVar90 = auVar287._8_8_;
                                  auVar287._0_8_ = auVar287._0_8_ + 2;
                                  auVar287._8_8_ = lVar90 + 2;
                                  lVar87 = lVar87 + lVar99;
                                  lVar68 = lVar68 + -2;
                                } while (lVar68 != 0);
                              }
                              else {
                                lVar68 = lVar70 - local_808.begin.x;
                                if (0.9999999999999778 <= local_808.p[lVar80 + lVar81 + lVar68])
                                goto LAB_005d27df;
                                lVar90 = lVar70 - local_9d8.begin.x;
                                *(double *)((long)local_f08 + (lVar70 - lVar53) * 8) =
                                     (((local_9d8.p
                                        [lVar93 + lVar90 + lVar86 + local_9d8.nstride * 6] -
                                       local_9d8.p[lVar93 + lVar90 + lVar86 + local_9d8.nstride * 9]
                                       ) - local_9d8.p
                                           [lVar93 + lVar90 + lVar86 + local_9d8.nstride * 0xb]) +
                                     local_9d8.p[lVar93 + lVar90 + lVar86 + local_9d8.nstride * 0xf]
                                     ) * 9.0 + local_808.p[lVar80 + lVar81 + lVar68] * 0.5625 +
                                               (((double)((ulong)local_9d8.p
                                                                 [lVar93 + lVar90 + lVar86] ^
                                                         uVar107) -
                                                local_9d8.p
                                                [lVar93 + lVar90 + lVar86 + local_9d8.nstride]) +
                                                local_9d8.p
                                                [lVar93 + lVar90 + lVar86 + local_9d8.nstride * 3] +
                                               local_9d8.p
                                               [lVar93 + lVar90 + lVar86 + local_9d8.nstride * 4]) *
                                               2.25;
                                lVar87 = (long)local_f08 + (lVar70 - lVar53) * 8;
                                local_1478._0_8_ = lVar60;
                                *(double *)(lVar87 + lVar58 * 8) =
                                     (local_9d8.p
                                      [lVar93 + lVar90 + lVar86 + local_9d8.nstride * 0xb] -
                                     local_9d8.p[lVar93 + lVar90 + lVar86 + local_9d8.nstride * 0xf]
                                     ) * 18.0 +
                                     local_808.p[lVar80 + lVar81 + lVar68] * 1.125 +
                                     ((local_9d8.p[lVar93 + lVar90 + lVar86 + local_9d8.nstride * 3]
                                      - local_9d8.p[lVar93 + lVar90 + lVar86]) -
                                     local_9d8.p[lVar93 + lVar90 + lVar86 + local_9d8.nstride * 4])
                                     * 4.5;
                                *(double *)(lVar99 + lVar87) =
                                     (((local_9d8.p
                                        [lVar93 + lVar90 + lVar86 + local_9d8.nstride * 9] -
                                       local_9d8.p[lVar93 + lVar90 + lVar86 + local_9d8.nstride * 6]
                                       ) - local_9d8.p
                                           [lVar93 + lVar90 + lVar86 + local_9d8.nstride * 0xb]) +
                                     local_9d8.p[lVar93 + lVar90 + lVar86 + local_9d8.nstride * 0xf]
                                     ) * 9.0 + local_808.p[lVar80 + lVar81 + lVar68] * 0.5625 +
                                               ((local_9d8.p
                                                 [lVar93 + lVar90 + lVar86 + local_9d8.nstride] -
                                                local_9d8.p[lVar93 + lVar90 + lVar86]) +
                                                local_9d8.p
                                                [lVar93 + lVar90 + lVar86 + local_9d8.nstride * 3] +
                                               local_9d8.p
                                               [lVar93 + lVar90 + lVar86 + local_9d8.nstride * 4]) *
                                               2.25;
                                *(double *)((long)local_f18 + lVar87) =
                                     (local_9d8.p[lVar93 + lVar90 + lVar86 + local_9d8.nstride * 9]
                                     - local_9d8.p
                                       [lVar93 + lVar90 + lVar86 + local_9d8.nstride * 0xf]) * 18.0
                                     + local_808.p[lVar80 + lVar81 + lVar68] * 1.125 +
                                       (((double)((ulong)local_9d8.p
                                                         [lVar93 + lVar90 + lVar86 + local_9d8.
                                                                                     nstride] ^
                                                 uVar107) -
                                        local_9d8.p
                                        [lVar93 + lVar90 + lVar86 + local_9d8.nstride * 3]) +
                                       local_9d8.p[lVar93 + lVar90 + lVar86 + local_9d8.nstride * 4]
                                       ) * 4.5;
                                *(double *)(lVar58 * 0x20 + lVar87) =
                                     local_9d8.p[lVar93 + lVar90 + lVar86 + local_9d8.nstride * 0xf]
                                     * 36.0 + local_808.p[lVar80 + lVar81 + lVar68] * 2.25 +
                                              ((double)((ulong)local_9d8.p
                                                               [lVar93 + lVar90 + lVar86 + local_9d8
                                                  .nstride * 3] ^ uVar107) -
                                              local_9d8.p
                                              [lVar93 + lVar90 + lVar86 + local_9d8.nstride * 4]) *
                                              9.0;
                                *(double *)(lVar58 * 0x28 + lVar87) =
                                     ((double)((ulong)local_9d8.p
                                                      [lVar93 + lVar90 + lVar86 + local_9d8.nstride
                                                                                  * 9] ^ uVar107) -
                                     local_9d8.p[lVar93 + lVar90 + lVar86 + local_9d8.nstride * 0xf]
                                     ) * 18.0 +
                                     local_808.p[lVar80 + lVar81 + lVar68] * 1.125 +
                                     ((local_9d8.p[lVar93 + lVar90 + lVar86 + local_9d8.nstride] -
                                      local_9d8.p[lVar93 + lVar90 + lVar86 + local_9d8.nstride * 3])
                                     + local_9d8.p[lVar93 + lVar90 + lVar86 + local_9d8.nstride * 4]
                                     ) * 4.5;
                                *(double *)(lVar58 * 0x30 + lVar87) =
                                     (((double)((ulong)local_9d8.p
                                                       [lVar93 + lVar90 + lVar86 + local_9d8.nstride
                                                                                   * 6] ^ uVar107) -
                                      local_9d8.p[lVar93 + lVar90 + lVar86 + local_9d8.nstride * 9])
                                      + local_9d8.p
                                        [lVar93 + lVar90 + lVar86 + local_9d8.nstride * 0xb] +
                                     local_9d8.p[lVar93 + lVar86 + local_9d8.nstride * 0xf + lVar90]
                                     ) * 9.0 + local_808.p[lVar80 + lVar81 + lVar68] * 0.5625 +
                                               ((local_9d8.p[lVar93 + lVar90 + lVar86] -
                                                local_9d8.p
                                                [lVar93 + lVar90 + lVar86 + local_9d8.nstride]) +
                                                local_9d8.p
                                                [lVar93 + lVar90 + lVar86 + local_9d8.nstride * 3] +
                                               local_9d8.p
                                               [lVar93 + lVar90 + lVar86 + local_9d8.nstride * 4]) *
                                               2.25;
                                *(double *)(lVar58 * 0x38 + lVar87) =
                                     ((double)((ulong)local_9d8.p
                                                      [lVar93 + lVar86 + lVar90 + local_9d8.nstride
                                                                                  * 0xb] ^ uVar107)
                                     - local_9d8.p
                                       [lVar93 + lVar86 + lVar90 + local_9d8.nstride * 0xf]) * 18.0
                                     + local_808.p[lVar80 + lVar81 + lVar68] * 1.125 +
                                       ((local_9d8.p[lVar93 + lVar86 + lVar90] +
                                        local_9d8.p
                                        [lVar93 + lVar86 + lVar90 + local_9d8.nstride * 3]) -
                                       local_9d8.p[lVar93 + lVar86 + lVar90 + local_9d8.nstride * 4]
                                       ) * 4.5;
                                *(double *)(lVar58 * 0x40 + lVar87) =
                                     (local_9d8.p[lVar93 + lVar86 + lVar90 + local_9d8.nstride * 6]
                                      + local_9d8.p
                                        [lVar93 + lVar86 + lVar90 + local_9d8.nstride * 9] +
                                      local_9d8.p
                                      [lVar93 + lVar86 + lVar90 + local_9d8.nstride * 0xb] +
                                     local_9d8.p[lVar93 + lVar86 + lVar90 + local_9d8.nstride * 0xf]
                                     ) * 9.0 + local_808.p[lVar80 + lVar81 + lVar68] * 0.5625 +
                                               (local_9d8.p[lVar93 + lVar86 + lVar90] +
                                                local_9d8.p
                                                [lVar93 + lVar86 + lVar90 + local_9d8.nstride] +
                                                local_9d8.p
                                                [lVar93 + lVar86 + lVar90 + local_9d8.nstride * 3] +
                                               local_9d8.p
                                               [lVar93 + lVar86 + lVar90 + local_9d8.nstride * 4]) *
                                               2.25;
                                *(double *)(lVar58 * 0x48 + lVar87) =
                                     (((local_9d8.p
                                        [lVar93 + lVar86 + lVar90 + local_9d8.nstride * 7] -
                                       local_9d8.p
                                       [lVar93 + lVar86 + lVar90 + local_9d8.nstride * 10]) -
                                      local_9d8.p
                                      [lVar93 + lVar86 + lVar90 + local_9d8.nstride * 0xd]) +
                                     local_9d8.p
                                     [lVar93 + lVar86 + lVar90 + local_9d8.nstride * 0x10]) * 9.0 +
                                     local_808.p[lVar80 + lVar81 + lVar68] * 0.5625 +
                                     (((double)((ulong)local_9d8.p[lVar93 + lVar86 + lVar90] ^
                                               uVar107) -
                                      local_9d8.p[lVar93 + lVar86 + lVar90 + local_9d8.nstride * 2])
                                      + local_9d8.p
                                        [lVar93 + lVar86 + lVar90 + local_9d8.nstride * 3] +
                                     local_9d8.p[lVar93 + lVar86 + lVar90 + local_9d8.nstride * 5])
                                     * 2.25;
                                *(double *)(lVar58 * 0x50 + lVar87) =
                                     (local_9d8.p
                                      [lVar93 + lVar86 + lVar90 + local_9d8.nstride * 0xd] -
                                     local_9d8.p
                                     [lVar93 + lVar86 + lVar90 + local_9d8.nstride * 0x10]) * 18.0 +
                                     local_808.p[lVar80 + lVar81 + lVar68] * 1.125 +
                                     ((local_9d8.p[lVar93 + lVar86 + lVar90 + local_9d8.nstride * 3]
                                      - local_9d8.p[lVar93 + lVar86 + lVar90]) -
                                     local_9d8.p[lVar93 + lVar86 + lVar90 + local_9d8.nstride * 5])
                                     * 4.5;
                                *(double *)(lVar58 * 0x58 + lVar87) =
                                     (((local_9d8.p
                                        [lVar93 + lVar86 + lVar90 + local_9d8.nstride * 10] -
                                       local_9d8.p[lVar93 + lVar86 + lVar90 + local_9d8.nstride * 7]
                                       ) - local_9d8.p
                                           [lVar93 + lVar86 + lVar90 + local_9d8.nstride * 0xd]) +
                                     local_9d8.p
                                     [lVar93 + lVar86 + lVar90 + local_9d8.nstride * 0x10]) * 9.0 +
                                     local_808.p[lVar80 + lVar81 + lVar68] * 0.5625 +
                                     ((local_9d8.p[lVar93 + lVar86 + lVar90 + local_9d8.nstride * 2]
                                      - local_9d8.p[lVar93 + lVar86 + lVar90]) +
                                      local_9d8.p[lVar93 + lVar86 + lVar90 + local_9d8.nstride * 3]
                                     + local_9d8.p[lVar93 + lVar86 + lVar90 + local_9d8.nstride * 5]
                                     ) * 2.25;
                                *(double *)(lVar58 * 0x60 + lVar87) =
                                     (local_9d8.p[lVar93 + lVar86 + lVar90 + local_9d8.nstride * 10]
                                     - local_9d8.p
                                       [lVar93 + lVar86 + lVar90 + local_9d8.nstride * 0x10]) * 18.0
                                     + local_808.p[lVar80 + lVar81 + lVar68] * 1.125 +
                                       (((double)((ulong)local_9d8.p
                                                         [lVar93 + lVar86 + lVar90 + local_9d8.
                                                                                     nstride * 2] ^
                                                 uVar107) -
                                        local_9d8.p
                                        [lVar93 + lVar86 + lVar90 + local_9d8.nstride * 3]) +
                                       local_9d8.p[lVar93 + lVar86 + lVar90 + local_9d8.nstride * 5]
                                       ) * 4.5;
                                *(double *)(lVar58 * 0x68 + lVar87) =
                                     local_9d8.p
                                     [lVar93 + lVar86 + lVar90 + local_9d8.nstride * 0x10] * 36.0 +
                                     local_808.p[lVar80 + lVar81 + lVar68] * 2.25 +
                                     ((double)((ulong)local_9d8.p
                                                      [lVar93 + lVar86 + lVar90 + local_9d8.nstride
                                                                                  * 3] ^ uVar107) -
                                     local_9d8.p[lVar93 + lVar86 + lVar90 + local_9d8.nstride * 5])
                                     * 9.0;
                                *(double *)(lVar58 * 0x70 + lVar87) =
                                     ((double)((ulong)local_9d8.p
                                                      [lVar93 + lVar86 + lVar90 + local_9d8.nstride
                                                                                  * 10] ^ uVar107) -
                                     local_9d8.p
                                     [lVar93 + lVar86 + lVar90 + local_9d8.nstride * 0x10]) * 18.0 +
                                     local_808.p[lVar80 + lVar81 + lVar68] * 1.125 +
                                     ((local_9d8.p[lVar93 + lVar86 + lVar90 + local_9d8.nstride * 2]
                                      - local_9d8.p
                                        [lVar93 + lVar86 + lVar90 + local_9d8.nstride * 3]) +
                                     local_9d8.p[lVar93 + lVar86 + lVar90 + local_9d8.nstride * 5])
                                     * 4.5;
                                *(double *)(lVar58 * 0x78 + lVar87) =
                                     (((double)((ulong)local_9d8.p
                                                       [lVar93 + lVar86 + lVar90 + local_9d8.nstride
                                                                                   * 7] ^ uVar107) -
                                      local_9d8.p[lVar93 + lVar86 + lVar90 + local_9d8.nstride * 10]
                                      ) + local_9d8.p
                                          [lVar93 + lVar86 + lVar90 + local_9d8.nstride * 0xd] +
                                     local_9d8.p
                                     [lVar93 + lVar86 + lVar90 + local_9d8.nstride * 0x10]) * 9.0 +
                                     local_808.p[lVar80 + lVar81 + lVar68] * 0.5625 +
                                     ((local_9d8.p[lVar93 + lVar86 + lVar90] -
                                      local_9d8.p[lVar93 + lVar86 + lVar90 + local_9d8.nstride * 2])
                                      + local_9d8.p
                                        [lVar93 + lVar86 + lVar90 + local_9d8.nstride * 3] +
                                     local_9d8.p[lVar93 + lVar86 + lVar90 + local_9d8.nstride * 5])
                                     * 2.25;
                                *(double *)(lVar58 * 0x80 + lVar87) =
                                     ((double)((ulong)local_9d8.p
                                                      [lVar93 + lVar86 + lVar90 + local_9d8.nstride
                                                                                  * 0xd] ^ uVar107)
                                     - local_9d8.p
                                       [lVar93 + lVar86 + lVar90 + local_9d8.nstride * 0x10]) * 18.0
                                     + local_808.p[lVar80 + lVar81 + lVar68] * 1.125 +
                                       ((local_9d8.p[lVar93 + lVar86 + lVar90] +
                                        local_9d8.p
                                        [lVar93 + lVar86 + lVar90 + local_9d8.nstride * 3]) -
                                       local_9d8.p[lVar93 + lVar86 + lVar90 + local_9d8.nstride * 5]
                                       ) * 4.5;
                                *(double *)(lVar58 * 0x88 + lVar87) =
                                     (local_9d8.p[lVar93 + lVar86 + lVar90 + local_9d8.nstride * 7]
                                      + local_9d8.p
                                        [lVar93 + lVar86 + lVar90 + local_9d8.nstride * 10] +
                                      local_9d8.p
                                      [lVar93 + lVar86 + lVar90 + local_9d8.nstride * 0xd] +
                                     local_9d8.p
                                     [lVar93 + lVar86 + lVar90 + local_9d8.nstride * 0x10]) * 9.0 +
                                     local_808.p[lVar80 + lVar81 + lVar68] * 0.5625 +
                                     (local_9d8.p[lVar93 + lVar86 + lVar90] +
                                      local_9d8.p[lVar93 + lVar86 + lVar90 + local_9d8.nstride * 2]
                                      + local_9d8.p
                                        [lVar93 + lVar86 + lVar90 + local_9d8.nstride * 3] +
                                     local_9d8.p[lVar93 + lVar86 + lVar90 + local_9d8.nstride * 5])
                                     * 2.25;
                                *(double *)(lVar58 * 0x90 + lVar87) =
                                     (((local_9d8.p
                                        [lVar93 + lVar86 + lVar90 + local_9d8.nstride * 8] -
                                       local_9d8.p
                                       [lVar93 + lVar86 + lVar90 + local_9d8.nstride * 0xc]) -
                                      local_9d8.p
                                      [lVar93 + lVar86 + lVar90 + local_9d8.nstride * 0xe]) +
                                     local_9d8.p
                                     [lVar93 + lVar86 + lVar90 + local_9d8.nstride * 0x11]) * 9.0 +
                                     local_808.p[lVar80 + lVar81 + lVar68] * 0.5625 +
                                     (((double)((ulong)local_9d8.p
                                                       [lVar93 + lVar86 + lVar90 + local_9d8.nstride
                                                       ] ^ uVar107) -
                                      local_9d8.p[lVar93 + lVar86 + lVar90 + local_9d8.nstride * 2])
                                      + local_9d8.p
                                        [lVar93 + lVar86 + lVar90 + local_9d8.nstride * 4] +
                                     local_9d8.p[lVar93 + lVar86 + lVar90 + local_9d8.nstride * 5])
                                     * 2.25;
                                *(double *)(lVar58 * 0x98 + lVar87) =
                                     (local_9d8.p
                                      [lVar93 + lVar86 + lVar90 + local_9d8.nstride * 0xe] -
                                     local_9d8.p
                                     [lVar93 + lVar86 + lVar90 + local_9d8.nstride * 0x11]) * 18.0 +
                                     local_808.p[lVar80 + lVar81 + lVar68] * 1.125 +
                                     ((local_9d8.p[lVar93 + lVar86 + lVar90 + local_9d8.nstride * 4]
                                      - local_9d8.p[lVar93 + lVar86 + lVar90 + local_9d8.nstride]) -
                                     local_9d8.p[lVar93 + lVar86 + lVar90 + local_9d8.nstride * 5])
                                     * 4.5;
                                *(double *)((long)local_ea8 + lVar87) =
                                     (((local_9d8.p
                                        [lVar93 + lVar86 + lVar90 + local_9d8.nstride * 0xc] -
                                       local_9d8.p[lVar93 + lVar86 + lVar90 + local_9d8.nstride * 8]
                                       ) - local_9d8.p
                                           [lVar93 + lVar86 + lVar90 + local_9d8.nstride * 0xe]) +
                                     local_9d8.p
                                     [lVar93 + lVar86 + lVar90 + local_9d8.nstride * 0x11]) * 9.0 +
                                     local_808.p[lVar80 + lVar81 + lVar68] * 0.5625 +
                                     ((local_9d8.p[lVar93 + lVar86 + lVar90 + local_9d8.nstride * 2]
                                      - local_9d8.p[lVar93 + lVar86 + lVar90 + local_9d8.nstride]) +
                                      local_9d8.p[lVar93 + lVar86 + lVar90 + local_9d8.nstride * 4]
                                     + local_9d8.p[lVar93 + lVar86 + lVar90 + local_9d8.nstride * 5]
                                     ) * 2.25;
                                lVar91 = (local_16d0 - local_9d8.begin.z) * local_9d8.kstride;
                                *(double *)((long)local_f28 + lVar87) =
                                     (local_9d8.p
                                      [lVar93 + lVar90 + lVar91 + local_9d8.nstride * 0xc] -
                                     local_9d8.p
                                     [lVar93 + lVar90 + lVar91 + local_9d8.nstride * 0x11]) * 18.0 +
                                     local_808.p[lVar80 + lVar81 + lVar68] * 1.125 +
                                     (((double)((ulong)local_9d8.p
                                                       [lVar93 + lVar90 + lVar91 + local_9d8.nstride
                                                                                   * 2] ^ uVar107) -
                                      local_9d8.p[lVar93 + lVar90 + lVar91 + local_9d8.nstride * 4])
                                     + local_9d8.p[lVar93 + lVar90 + lVar91 + local_9d8.nstride * 5]
                                     ) * 4.5;
                                lVar91 = lVar70 - local_9d8.begin.x;
                                lVar90 = (lVar59 - local_9d8.begin.y) * local_9d8.jstride;
                                lVar68 = (local_16d0 - local_9d8.begin.z) * local_9d8.kstride;
                                *(double *)((long)local_eb8 + lVar87) =
                                     local_9d8.p
                                     [lVar90 + lVar91 + lVar68 + local_9d8.nstride * 0x11] * 36.0 +
                                     local_808.p
                                     [(lVar59 - local_808.begin.y) *
                                      CONCAT44(local_808.jstride._4_4_,(int)local_808.jstride) +
                                      (lVar70 - local_808.begin.x) +
                                      (local_16d0 - local_808.begin.z) *
                                      CONCAT44(local_808.kstride._4_4_,(int)local_808.kstride)] *
                                     2.25 + ((double)((ulong)local_9d8.p
                                                             [lVar90 + lVar91 + lVar68 + local_9d8.
                                                                                         nstride * 4
                                                             ] ^ uVar107) -
                                            local_9d8.p
                                            [lVar90 + lVar91 + lVar68 + local_9d8.nstride * 5]) *
                                            9.0;
                                lVar91 = lVar70 - local_9d8.begin.x;
                                lVar90 = (lVar59 - local_9d8.begin.y) * local_9d8.jstride;
                                lVar68 = (local_16d0 - local_9d8.begin.z) * local_9d8.kstride;
                                *(double *)(lVar58 * 0xb8 + lVar87) =
                                     ((double)((ulong)local_9d8.p
                                                      [lVar90 + lVar91 + lVar68 + local_9d8.nstride
                                                                                  * 0xc] ^ uVar107)
                                     - local_9d8.p
                                       [lVar90 + lVar91 + lVar68 + local_9d8.nstride * 0x11]) * 18.0
                                     + local_808.p
                                       [(lVar59 - local_808.begin.y) *
                                        CONCAT44(local_808.jstride._4_4_,(int)local_808.jstride) +
                                        (lVar70 - local_808.begin.x) +
                                        (local_16d0 - local_808.begin.z) *
                                        CONCAT44(local_808.kstride._4_4_,(int)local_808.kstride)] *
                                       1.125 + ((local_9d8.p
                                                 [lVar90 + lVar91 + lVar68 + local_9d8.nstride * 2]
                                                - local_9d8.p
                                                  [lVar90 + lVar91 + lVar68 + local_9d8.nstride * 4]
                                                ) + local_9d8.p
                                                    [lVar90 + lVar91 + lVar68 + local_9d8.nstride *
                                                                                5]) * 4.5;
                                lVar90 = (lVar59 - local_9d8.begin.y) * local_9d8.jstride;
                                lVar68 = lVar70 - local_9d8.begin.x;
                                lVar91 = (local_16d0 - local_9d8.begin.z) * local_9d8.kstride;
                                *(double *)(lVar58 * 0xc0 + lVar87) =
                                     (((double)((ulong)local_9d8.p
                                                       [lVar90 + lVar68 + lVar91 + local_9d8.nstride
                                                                                   * 8] ^ uVar107) -
                                      local_9d8.p
                                      [lVar90 + lVar68 + lVar91 + local_9d8.nstride * 0xc]) +
                                      local_9d8.p
                                      [lVar90 + lVar68 + lVar91 + local_9d8.nstride * 0xe] +
                                     local_9d8.p
                                     [lVar90 + lVar68 + lVar91 + local_9d8.nstride * 0x11]) * 9.0 +
                                     local_808.p
                                     [(lVar59 - local_808.begin.y) *
                                      CONCAT44(local_808.jstride._4_4_,(int)local_808.jstride) +
                                      (lVar70 - local_808.begin.x) +
                                      (local_16d0 - local_808.begin.z) *
                                      CONCAT44(local_808.kstride._4_4_,(int)local_808.kstride)] *
                                     0.5625 + ((local_9d8.p
                                                [lVar90 + lVar68 + lVar91 + local_9d8.nstride] -
                                               local_9d8.p
                                               [lVar90 + lVar68 + lVar91 + local_9d8.nstride * 2]) +
                                               local_9d8.p
                                               [lVar90 + lVar68 + lVar91 + local_9d8.nstride * 4] +
                                              local_9d8.p
                                              [lVar90 + lVar68 + lVar91 + local_9d8.nstride * 5]) *
                                              2.25;
                                lVar68 = (lVar59 - local_9d8.begin.y) * local_9d8.jstride;
                                lVar90 = lVar70 - local_9d8.begin.x;
                                lVar91 = (local_16d0 - local_9d8.begin.z) * local_9d8.kstride;
                                *(double *)(lVar58 * 200 + lVar87) =
                                     ((double)((ulong)local_9d8.p
                                                      [lVar68 + lVar90 + lVar91 + local_9d8.nstride
                                                                                  * 0xe] ^ uVar107)
                                     - local_9d8.p
                                       [lVar68 + lVar90 + lVar91 + local_9d8.nstride * 0x11]) * 18.0
                                     + local_808.p
                                       [(lVar59 - local_808.begin.y) *
                                        CONCAT44(local_808.jstride._4_4_,(int)local_808.jstride) +
                                        (lVar70 - local_808.begin.x) +
                                        (local_16d0 - local_808.begin.z) *
                                        CONCAT44(local_808.kstride._4_4_,(int)local_808.kstride)] *
                                       1.125 + ((local_9d8.p
                                                 [lVar68 + lVar90 + lVar91 + local_9d8.nstride] +
                                                local_9d8.p
                                                [lVar68 + lVar90 + lVar91 + local_9d8.nstride * 4])
                                               - local_9d8.p
                                                 [lVar68 + lVar90 + lVar91 + local_9d8.nstride * 5])
                                               * 4.5;
                                lVar90 = (lVar59 - local_9d8.begin.y) * local_9d8.jstride;
                                lVar91 = lVar70 - local_9d8.begin.x;
                                lVar68 = (local_16d0 - local_9d8.begin.z) * local_9d8.kstride;
                                *(double *)(lVar58 * 0xd0 + lVar87) =
                                     (local_9d8.p[lVar90 + lVar91 + lVar68 + local_9d8.nstride * 8]
                                      + local_9d8.p
                                        [lVar90 + lVar91 + lVar68 + local_9d8.nstride * 0xc] +
                                      local_9d8.p
                                      [lVar90 + lVar91 + lVar68 + local_9d8.nstride * 0xe] +
                                     local_9d8.p
                                     [lVar90 + lVar91 + lVar68 + local_9d8.nstride * 0x11]) * 9.0 +
                                     local_808.p
                                     [(lVar59 - local_808.begin.y) *
                                      CONCAT44(local_808.jstride._4_4_,(int)local_808.jstride) +
                                      (lVar70 - local_808.begin.x) +
                                      (local_16d0 - local_808.begin.z) *
                                      CONCAT44(local_808.kstride._4_4_,(int)local_808.kstride)] *
                                     0.5625 + (local_9d8.p
                                               [lVar90 + lVar91 + lVar68 + local_9d8.nstride] +
                                               local_9d8.p
                                               [lVar90 + lVar91 + lVar68 + local_9d8.nstride * 2] +
                                               local_9d8.p
                                               [lVar90 + lVar91 + lVar68 + local_9d8.nstride * 4] +
                                              local_9d8.p
                                              [lVar90 + lVar91 + lVar68 + local_9d8.nstride * 5]) *
                                              2.25;
                              }
                              uVar125 = *(undefined8 *)
                                         (lVar78 + (local_16d0 - iVar65) * lVar67 * 8 +
                                          (lVar59 - iVar74) * lVar51 * 8 + (lVar70 - iVar63) * 8);
                            }
                            *(undefined8 *)(lVar60 + (lVar70 - lVar104) * 8) = uVar125;
                            lVar70 = lVar70 + 1;
                            dVar550 = (double)((long)dVar550 + 8);
                            lVar71 = lVar71 + 8;
                          } while (local_f68.bigend.vect[0] + 1 != (int)lVar70);
                        }
                        lVar59 = lVar59 + 1;
                        local_1268 = (double)((long)local_1268 + (long)local_de8);
                        local_12a8 = local_12a8 + (long)local_de8;
                      } while ((int)local_e98 != (int)lVar59);
                    }
                    local_16d0 = local_16d0 + 1;
                    local_11c8 = local_11c8 + lVar103 * 8;
                    local_1088 = local_1088 + lVar103 * 8;
                  } while (local_f68.bigend.vect[2] + 1 != (int)local_16d0);
                }
                lVar89 = (long)(int)local_e48;
                local_14c8 = (long)iStack_e40;
                if (iStack_e40 <= iStack_e34) {
                  lVar57 = (long)local_e48._4_4_ * 8;
                  lVar86 = lVar57 + ((local_14c8 - lVar82) + -1) * (long)local_d18 * 8 + lVar92 * -8
                  ;
                  lVar68 = lVar57 + (local_14c8 - lVar82) * (long)local_d18 * 8 + lVar92 * -8;
                  lVar99 = lVar79 * 0x80 + local_14c8 * 8;
                  lVar71 = lVar79 * 0x38 + local_14c8 * 8 + lVar77 * -8;
                  lVar58 = local_14c8 * 8;
                  lVar96 = lVar79 * 0x20 + local_14c8 * 8 + lVar77 * -8;
                  lVar87 = lVar58 + lVar79 * 0x18 + lVar77 * -8;
                  lVar90 = lVar58 + lVar79 * 0x28 + lVar77 * -8;
                  lVar70 = lVar79 * 0x10 + local_14c8 * 8 + lVar77 * -8;
                  local_14b8 = (_func_int **)lVar70;
                  lVar59 = (long)local_e48._4_4_;
                  lVar60 = (long)iVar23;
                  lVar91 = (lVar99 + lVar77 * -8) * lVar88 + lVar59 * 8 + lVar60 * -8;
                  lVar80 = (lVar79 * 0x70 + local_14c8 * 8 + lVar77 * -8 + -8) * lVar88 + lVar59 * 8
                           + lVar60 * -8;
                  local_15c8 = (double)((lVar79 * 0x68 + local_14c8 * 8 + lVar77 * -8) * lVar88 +
                                        lVar59 * 8 + lVar60 * -8);
                  lVar93 = (lVar79 * 0x50 + local_14c8 * 8 + lVar77 * -8) * lVar88 + lVar59 * 8 +
                           lVar60 * -8;
                  lVar81 = (lVar79 * 0x60 + local_14c8 * 8 + lVar77 * -8) * lVar88 + lVar59 * 8 +
                           lVar60 * -8;
                  local_1428 = (_func_int *)
                               (lVar86 * lVar83 + lVar89 * 8 + lVar104 * -8 + local_dd8._16_8_);
                  local_15a0 = (_func_int *)
                               (lVar68 * lVar83 + lVar89 * 8 + lVar104 * -8 + local_dd8._16_8_);
                  local_1278 = (_func_int *)
                               ((lVar86 + -8) * lVar83 + lVar89 * 8 + lVar104 * -8 +
                               local_dd8._16_8_);
                  local_1538 = (_func_int *)
                               ((lVar68 + -8) * lVar83 + lVar89 * 8 + lVar104 * -8 +
                               local_dd8._16_8_);
                  local_f98 = ((lVar99 + lVar79 * 8 + lVar77 * -8 + -8) * lVar88 + lVar59 * 8 +
                              lVar60 * -8) * (long)local_ec8 + lVar89 * 8 + lVar53 * -8 + lVar52 +
                              -8;
                  local_fa8 = ((lVar71 + -8) * lVar88 + lVar59 * 8 + lVar60 * -8) * (long)local_ec8
                              + lVar89 * 8 + lVar53 * -8 + lVar52 + -8;
                  local_1558 = ((lVar79 * 0xb8 + local_14c8 * 8 + lVar77 * -8 + -8) * lVar88 +
                                lVar59 * 8 + lVar60 * -8) * (long)local_ec8 + lVar89 * 8 +
                               lVar53 * -8 + lVar52;
                  local_1338 = (double)(lVar89 * 8 +
                                        ((lVar79 * 0x30 + local_14c8 * 8 + lVar77 * -8) * lVar88 +
                                         lVar59 * 8 + lVar60 * -8) * (long)local_ec8 + lVar53 * -8 +
                                        lVar52 + -8);
                  local_10c8 = ((lVar79 * 0x78 + local_14c8 * 8 + lVar77 * -8) * lVar88 + lVar59 * 8
                               + lVar60 * -8) * (long)local_ec8 + lVar89 * 8 + lVar53 * -8 + lVar52
                               + -8;
                  local_12e8 = ((lVar79 * 0xb0 + local_14c8 * 8 + lVar77 * -8) * lVar88 + lVar59 * 8
                               + lVar60 * -8) * (long)local_ec8 + lVar89 * 8 + lVar53 * -8 + lVar52;
                  local_1118 = lVar89 * 8 + lVar91 * (long)local_ec8 + lVar53 * -8 + lVar52 + -8;
                  local_12f0 = ((lVar79 * 0x98 + local_14c8 * 8 + lVar77 * -8) * lVar88 + lVar59 * 8
                               + lVar60 * -8) * (long)local_ec8 + lVar89 * 8 + lVar53 * -8 + lVar52;
                  local_fe8 = (double)((lVar71 * lVar88 + lVar59 * 8 + lVar60 * -8) *
                                       (long)local_ec8 + lVar89 * 8 + lVar53 * -8 + lVar52 + -8);
                  local_12f8 = ((lVar79 * 0xa8 + local_14c8 * 8 + lVar77 * -8) * lVar88 + lVar59 * 8
                               + lVar60 * -8) * (long)local_ec8 + lVar89 * 8 + lVar53 * -8 + lVar52;
                  local_1300 = ((lVar79 * 200 + local_14c8 * 8 + lVar77 * -8) * lVar88 + lVar59 * 8
                                + lVar60 * -8 + -8) * (long)local_ec8 + lVar89 * 8 + lVar53 * -8 +
                               lVar52;
                  local_e78 = (double)((lVar91 + -8) * (long)local_ec8 + lVar89 * 8 + lVar53 * -8 +
                                       lVar52 + -8);
                  local_fb8 = ((lVar79 * 0x40 + local_14c8 * 8 + lVar77 * -8) * lVar88 + lVar59 * 8
                               + lVar60 * -8 + -8) * (long)local_ec8 + lVar89 * 8 + lVar53 * -8 +
                              lVar52 + -8;
                  local_1308 = (lVar59 * 8 +
                                (lVar79 * 0x58 + local_14c8 * 8 + lVar77 * -8 + -8) * lVar88 +
                               lVar60 * -8) * (long)local_ec8 + lVar89 * 8 + lVar53 * -8 + lVar52;
                  local_1310 = ((lVar79 * 0xa0 + local_14c8 * 8 + lVar77 * -8 + -8) * lVar88 +
                                lVar59 * 8 + lVar60 * -8) * (long)local_ec8 + lVar89 * 8 +
                               lVar53 * -8 + lVar52;
                  local_1250 = ((lVar96 + -8) * lVar88 + lVar59 * 8 + lVar60 * -8) * (long)local_ec8
                               + lVar89 * 8 + lVar53 * -8 + lVar52;
                  local_ea8 = (double)((((local_14c8 + lVar79) * 8 + lVar77 * -8 + -8) * lVar88 +
                                        lVar59 * 8 + lVar60 * -8) * (long)local_ec8 + lVar89 * 8 +
                                       lVar53 * -8 + lVar52);
                  local_f28 = (double)(((lVar87 + -8) * lVar88 + lVar59 * 8 + lVar60 * -8) *
                                       (long)local_ec8 + lVar89 * 8 + lVar53 * -8 + lVar52);
                  local_eb8 = (double)(lVar80 * (long)local_ec8 + lVar89 * 8 + lVar53 * -8 + lVar52)
                  ;
                  local_f88 = ((lVar58 + lVar79 * 0x48 + lVar77 * -8) * lVar88 + lVar59 * 8 +
                              lVar60 * -8) * (long)local_ec8 + lVar89 * 8 + lVar53 * -8 + lVar52;
                  local_1208 = ((lVar79 * 0x90 + local_14c8 * 8 + lVar77 * -8) * lVar88 + lVar59 * 8
                               + lVar60 * -8) * (long)local_ec8 + lVar89 * 8 + lVar53 * -8 + lVar52;
                  local_1008 = (long)local_15c8 * (long)local_ec8 + lVar89 * 8 + lVar53 * -8 +
                               lVar52;
                  local_1168._0_8_ =
                       (lVar96 * lVar88 + lVar59 * 8 + lVar60 * -8) * (long)local_ec8 + lVar89 * 8 +
                       lVar53 * -8 + lVar52;
                  local_1358 = (lVar57 + (local_14c8 - lVar77) * lVar88 * 8 + lVar60 * -8) *
                               (long)local_ec8 + lVar89 * 8 + lVar53 * -8 + lVar52;
                  local_13d8 = lVar93 * (long)local_ec8 + lVar89 * 8 + lVar53 * -8 + lVar52;
                  local_13e8 = ((lVar79 * 8 + local_14c8 * 8 + lVar77 * -8) * lVar88 + lVar59 * 8 +
                               lVar60 * -8) * (long)local_ec8 + lVar89 * 8 + lVar53 * -8 + lVar52;
                  local_1108 = (lVar87 * lVar88 + lVar59 * 8 + lVar60 * -8) * (long)local_ec8 +
                               lVar89 * 8 + lVar53 * -8 + lVar52;
                  local_11c8 = lVar81 * (long)local_ec8 + lVar89 * 8 + lVar53 * -8 + lVar52;
                  local_1088 = ((lVar79 * 0xd0 + local_14c8 * 8 + lVar77 * -8 + -8) * lVar88 +
                                lVar59 * 8 + lVar60 * -8 + -8) * (long)local_ec8 + lVar89 * 8 +
                               lVar53 * -8 + lVar52;
                  local_1288 = ((lVar90 + -8) * lVar88 + lVar59 * 8 + lVar60 * -8 + -8) *
                               (long)local_ec8 + lVar89 * 8 + lVar53 * -8 + lVar52;
                  local_1190 = (lVar80 + -8) * (long)local_ec8 + lVar89 * 8 + lVar53 * -8 + lVar52;
                  local_10e0 = (lVar70 * lVar88 + lVar59 * 8 + lVar60 * -8 + -8) * (long)local_ec8 +
                               lVar89 * 8 + lVar53 * -8 + lVar52;
                  local_fe0 = ((lVar79 * 0xc0 + local_14c8 * 8 + lVar77 * -8) * lVar88 + lVar59 * 8
                               + lVar60 * -8 + -8) * (long)local_ec8 + lVar89 * 8 + lVar53 * -8 +
                              lVar52;
                  local_f38 = (double)(((long)local_15c8 + -8) * (long)local_ec8 + lVar89 * 8 +
                                       lVar53 * -8 + lVar52);
                  local_f48 = (double)((lVar93 + -8) * (long)local_ec8 + lVar89 * 8 + lVar53 * -8 +
                                      lVar52);
                  local_e68 = (double)((lVar90 * lVar88 + lVar59 * 8 + lVar60 * -8 + -8) *
                                       (long)local_ec8 + lVar89 * 8 + lVar53 * -8 + lVar52);
                  local_1298 = (lVar81 + -8) * (long)local_ec8 + lVar89 * 8 + lVar53 * -8 + lVar52;
                  local_de8 = (_func_int **)CONCAT44(local_de8._4_4_,iStack_e38 + 1);
                  local_bd8 = (_func_int *)CONCAT44(local_bd8._4_4_,iStack_e34 + 1);
                  local_be8 = (_func_int *)(lVar102 * 8);
                  lVar99 = lVar83 * 8;
                  lVar57 = lVar103 * 8;
                  local_f18 = (double)((long)local_ec8 * 8);
                  local_13c8 = local_14c8;
                  do {
                    if (local_e48._4_4_ <= iStack_e38) {
                      lVar59 = (long)local_5b0;
                      local_e98 = (double)(CONCAT44(OStack_5c4.val,local_5d0._8_4_) * 8);
                      local_10b8 = (long)local_e48._4_4_;
                      lVar58 = (local_10b8 - iStack_5ac) * (long)local_e98 +
                               (local_13c8 - iStack_5a8) * CONCAT44(iStack_5bc,local_5c0) * 8;
                      local_1680 = local_5d0._0_8_ +
                                   lVar58 + lStack_5b8 * 8 + lVar59 * -8 + lVar89 * 8;
                      local_1678 = local_5d0._0_8_ +
                                   lStack_5b8 * 0x10 + lVar58 + lVar59 * -8 + lVar89 * 8;
                      local_1598 = local_5d0._0_8_ +
                                   lVar58 + lStack_5b8 * 0x18 + lVar59 * -8 + lVar89 * 8;
                      local_1670 = local_5d0._0_8_ +
                                   lStack_5b8 * 0x20 + lVar58 + lVar59 * -8 + lVar89 * 8;
                      local_1650 = local_5d0._0_8_ +
                                   lVar58 + lStack_5b8 * 0x28 + lVar59 * -8 + lVar89 * 8;
                      local_1660 = local_5d0._0_8_ +
                                   lStack_5b8 * 0x30 + lVar58 + lVar59 * -8 + lVar89 * 8;
                      local_1668 = local_5d0._0_8_ +
                                   lStack_5b8 * 0x38 + lVar58 + lVar59 * -8 + lVar89 * 8;
                      local_1640 = local_1298;
                      local_1658 = local_f48;
                      local_15c8 = local_f38;
                      local_1588 = local_fe0;
                      local_1648 = local_10e0;
                      local_1568 = local_1190;
                      local_1518 = local_1288;
                      local_1578 = local_1088;
                      local_16d0 = local_13e8;
                      local_15f0 = local_1358;
                      local_1698 = local_1208;
                      local_15f8 = local_f88;
                      local_1620 = local_eb8;
                      local_15d0 = local_f28;
                      local_15d8 = local_ea8;
                      local_15b0 = local_1250;
                      local_1528 = local_1310;
                      local_1600 = local_1308;
                      local_15a8 = local_fb8;
                      local_15b8 = local_e78;
                      local_f08 = local_fe8;
                      local_12b8 = local_12f0;
                      local_14b8 = (_func_int **)local_1118;
                      local_11e8 = local_12e8;
                      local_1690 = local_10c8;
                      local_12a8 = (long)local_1338;
                      local_1418 = local_1558;
                      local_1268 = (double)local_fa8;
                      local_1468 = (double)local_f98;
                      local_1478._0_8_ = local_1278;
                      p_Var54 = local_1428;
                      lVar58 = local_12f8;
                      lVar59 = local_13d8;
                      lVar60 = local_1168._0_8_;
                      lVar70 = local_1108;
                      lVar71 = local_11c8;
                      lVar80 = local_1008;
                      dVar550 = local_e68;
                      p_Var97 = local_15a0;
                      p_Var100 = local_1538;
                      lVar93 = local_1300;
                      do {
                        if ((int)local_e48 <= iStack_e3c) {
                          lVar81 = 0;
                          do {
                            *(double *)(local_1680 + lVar81 * 8) =
                                 (*(double *)(local_1518 + lVar81 * 8) * dVar122 +
                                 *(double *)(local_1578 + lVar81 * 8) * dVar120 +
                                 *(double *)(local_1568 + lVar81 * 8) * dVar121) *
                                 *(double *)(local_1478._0_8_ + lVar81 * 8) +
                                 (*(double *)((long)local_15d0 + lVar81 * 8) * dVar122 +
                                 *(double *)(local_1528 + lVar81 * 8) * dVar120 +
                                 *(double *)((long)local_1620 + lVar81 * 8) * dVar121) *
                                 *(double *)(p_Var54 + lVar81 * 8) +
                                 (*(double *)(lVar70 + lVar81 * 8) * dVar122 +
                                 *(double *)(local_1698 + lVar81 * 8) * dVar120 +
                                 *(double *)(lVar71 + lVar81 * 8) * dVar121) *
                                 *(double *)(p_Var97 + lVar81 * 8) +
                                 (*(double *)((long)dVar550 + lVar81 * 8) * dVar122 +
                                 *(double *)(local_1588 + lVar81 * 8) * dVar120 +
                                 *(double *)(local_1640 + lVar81 * 8) * dVar121) *
                                 *(double *)(p_Var100 + lVar81 * 8);
                            *(double *)(local_1678 + lVar81 * 8) =
                                 (*(double *)((long)local_1268 + lVar81 * 8) * dVar122 +
                                 *(double *)(local_1418 + -8 + lVar81 * 8) * dVar123 +
                                 *(double *)((long)local_1468 + lVar81 * 8) * local_868) *
                                 *(double *)(p_Var54 + lVar81 * 8 + -8) +
                                 (*(double *)((long)local_15d8 + lVar81 * 8) * dVar122 +
                                 *(double *)(local_1418 + lVar81 * 8) * dVar123 +
                                 *(double *)(local_1600 + lVar81 * 8) * local_868) *
                                 *(double *)(p_Var54 + lVar81 * 8) +
                                 (*(double *)(local_16d0 + lVar81 * 8) * dVar122 +
                                 *(double *)(lVar58 + lVar81 * 8) * dVar123 +
                                 *(double *)(local_15f8 + lVar81 * 8) * local_868) *
                                 *(double *)(p_Var97 + lVar81 * 8) +
                                 (*(double *)((long)local_f08 + lVar81 * 8) * dVar122 +
                                 *(double *)(lVar58 + -8 + lVar81 * 8) * dVar123 +
                                 *(double *)(local_1690 + lVar81 * 8) * local_868) *
                                 *(double *)(p_Var97 + lVar81 * 8 + -8);
                            *(double *)(local_1598 + lVar81 * 8) =
                                 (*(double *)(local_15a8 + lVar81 * 8) * local_cb8 +
                                 *(double *)(lVar93 + -8 + lVar81 * 8) * dVar123 +
                                 *(double *)((long)local_15b8 + lVar81 * 8) * dVar121) *
                                 *(double *)(p_Var100 + lVar81 * 8 + -8) +
                                 (*(double *)(local_1648 + lVar81 * 8) * local_cb8 +
                                 *(double *)(lVar93 + lVar81 * 8) * dVar123 +
                                 *(double *)((long)local_1658 + lVar81 * 8) * dVar121) *
                                 *(double *)(p_Var100 + lVar81 * 8) +
                                 (*(double *)(local_15f0 + lVar81 * 8) * local_cb8 +
                                 *(double *)(local_12b8 + lVar81 * 8) * dVar123 +
                                 *(double *)(lVar59 + lVar81 * 8) * dVar121) *
                                 *(double *)(p_Var97 + lVar81 * 8) +
                                 (*(double *)(local_12a8 + lVar81 * 8) * local_cb8 +
                                 *(double *)(local_12b8 + -8 + lVar81 * 8) * dVar123 +
                                 *(double *)((long)local_14b8 + lVar81 * 8) * dVar121) *
                                 *(double *)(p_Var97 + lVar81 * 8 + -8);
                            *(double *)(local_1670 + lVar81 * 8) =
                                 (*(double *)(lVar60 + lVar81 * 8) * (double)local_9e8 +
                                 *(double *)(lVar58 + lVar81 * 8) * dVar124 +
                                 *(double *)(lVar71 + lVar81 * 8) * (double)local_858) *
                                 *(double *)(p_Var97 + lVar81 * 8) +
                                 (*(double *)(local_15b0 + lVar81 * 8) * (double)local_9e8 +
                                 *(double *)(local_1418 + lVar81 * 8) * dVar124 +
                                 *(double *)((long)local_1620 + lVar81 * 8) * (double)local_858) *
                                 *(double *)(p_Var54 + lVar81 * 8);
                            *(double *)(local_1650 + lVar81 * 8) =
                                 (*(double *)(lVar70 + lVar81 * 8) * local_d68 +
                                 *(double *)(local_12b8 + lVar81 * 8) * dVar124 +
                                 *(double *)(lVar80 + lVar81 * 8) * dVar429) *
                                 *(double *)(p_Var97 + lVar81 * 8) +
                                 (*(double *)((long)dVar550 + lVar81 * 8) * local_d68 +
                                 *(double *)(lVar93 + lVar81 * 8) * dVar124 +
                                 *(double *)((long)local_15c8 + lVar81 * 8) * dVar429) *
                                 *(double *)(p_Var100 + lVar81 * 8);
                            *(double *)(local_1660 + lVar81 * 8) =
                                 (*(double *)(local_16d0 + lVar81 * 8) * local_d68 +
                                 *(double *)(local_11e8 + lVar81 * 8) * dVar385 +
                                 *(double *)(lVar59 + lVar81 * 8) * (double)local_858) *
                                 *(double *)(p_Var97 + lVar81 * 8) +
                                 (*(double *)((long)local_f08 + lVar81 * 8) * local_d68 +
                                 *(double *)(local_11e8 + -8 + lVar81 * 8) * dVar385 +
                                 *(double *)((long)local_14b8 + lVar81 * 8) * (double)local_858) *
                                 *(double *)(p_Var97 + lVar81 * 8 + -8);
                            *(double *)(local_1668 + lVar81 * 8) =
                                 (*(double *)(lVar60 + lVar81 * 8) * dVar469 +
                                 *(double *)(local_11e8 + lVar81 * 8) * dVar384 +
                                 *(double *)(lVar80 + lVar81 * 8) * (double)local_9f8) *
                                 *(double *)(p_Var97 + lVar81 * 8);
                            lVar81 = lVar81 + 1;
                          } while ((iStack_e3c - (int)local_e48) + 1 != (int)lVar81);
                        }
                        local_10b8 = local_10b8 + 1;
                        p_Var54 = p_Var54 + lVar99;
                        p_Var97 = p_Var97 + lVar99;
                        local_1478._0_8_ = local_1478._0_8_ + lVar99;
                        p_Var100 = p_Var100 + lVar99;
                        local_1680 = local_1680 + (long)local_e98;
                        local_1678 = local_1678 + (long)local_e98;
                        local_1598 = local_1598 + (long)local_e98;
                        local_1670 = local_1670 + (long)local_e98;
                        local_1650 = local_1650 + (long)local_e98;
                        local_1660 = local_1660 + (long)local_e98;
                        local_1668 = local_1668 + (long)local_e98;
                        local_1468 = (double)((long)local_1468 + (long)local_f18);
                        local_1268 = (double)((long)local_1268 + (long)local_f18);
                        local_1418 = local_1418 + (long)local_f18;
                        local_12a8 = local_12a8 + (long)local_f18;
                        local_1690 = local_1690 + (long)local_f18;
                        local_11e8 = local_11e8 + (long)local_f18;
                        local_14b8 = (_func_int **)((long)local_14b8 + (long)local_f18);
                        local_12b8 = local_12b8 + (long)local_f18;
                        local_f08 = (double)((long)local_f08 + (long)local_f18);
                        lVar58 = lVar58 + (long)local_f18;
                        lVar93 = lVar93 + (long)local_f18;
                        local_15b8 = (double)((long)local_15b8 + (long)local_f18);
                        local_15a8 = local_15a8 + (long)local_f18;
                        local_1600 = local_1600 + (long)local_f18;
                        local_1528 = local_1528 + (long)local_f18;
                        local_15b0 = local_15b0 + (long)local_f18;
                        local_15d8 = (double)((long)local_15d8 + (long)local_f18);
                        local_15d0 = (double)((long)local_15d0 + (long)local_f18);
                        local_1620 = (double)((long)local_1620 + (long)local_f18);
                        local_15f8 = local_15f8 + (long)local_f18;
                        local_1698 = local_1698 + (long)local_f18;
                        lVar80 = lVar80 + (long)local_f18;
                        lVar60 = lVar60 + (long)local_f18;
                        local_15f0 = local_15f0 + (long)local_f18;
                        lVar59 = lVar59 + (long)local_f18;
                        local_16d0 = local_16d0 + (long)local_f18;
                        lVar70 = lVar70 + (long)local_f18;
                        lVar71 = lVar71 + (long)local_f18;
                        local_1578 = local_1578 + (long)local_f18;
                        local_1518 = local_1518 + (long)local_f18;
                        local_1568 = local_1568 + (long)local_f18;
                        local_1648 = local_1648 + (long)local_f18;
                        local_1588 = local_1588 + (long)local_f18;
                        local_15c8 = (double)((long)local_15c8 + (long)local_f18);
                        local_1658 = (double)((long)local_1658 + (long)local_f18);
                        dVar550 = (double)((long)dVar550 + (long)local_f18);
                        local_1640 = local_1640 + (long)local_f18;
                      } while (iStack_e38 + 1 != (int)local_10b8);
                    }
                    local_13c8 = local_13c8 + 1;
                    local_1428 = local_1428 + (long)local_be8;
                    local_15a0 = local_15a0 + (long)local_be8;
                    local_1278 = local_1278 + (long)local_be8;
                    local_1538 = local_1538 + (long)local_be8;
                    local_f98 = local_f98 + lVar57;
                    local_fa8 = local_fa8 + lVar57;
                    local_1558 = local_1558 + lVar57;
                    local_1338 = (double)((long)local_1338 + lVar57);
                    local_10c8 = local_10c8 + lVar57;
                    local_12e8 = local_12e8 + lVar57;
                    local_1118 = local_1118 + lVar57;
                    local_12f0 = local_12f0 + lVar57;
                    local_fe8 = (double)((long)local_fe8 + lVar57);
                    local_12f8 = local_12f8 + lVar57;
                    local_1300 = local_1300 + lVar57;
                    local_e78 = (double)((long)local_e78 + lVar57);
                    local_fb8 = local_fb8 + lVar57;
                    local_1308 = local_1308 + lVar57;
                    local_1310 = local_1310 + lVar57;
                    local_1250 = local_1250 + lVar57;
                    local_ea8 = (double)((long)local_ea8 + lVar57);
                    local_f28 = (double)((long)local_f28 + lVar57);
                    local_eb8 = (double)((long)local_eb8 + lVar57);
                    local_f88 = local_f88 + lVar57;
                    local_1208 = local_1208 + lVar57;
                    local_1008 = local_1008 + lVar57;
                    local_1168._0_8_ = local_1168._0_8_ + lVar57;
                    local_1358 = local_1358 + lVar57;
                    local_13d8 = local_13d8 + lVar57;
                    local_13e8 = local_13e8 + lVar57;
                    local_1108 = local_1108 + lVar57;
                    local_11c8 = local_11c8 + lVar57;
                    local_1088 = local_1088 + lVar57;
                    local_1288 = local_1288 + lVar57;
                    local_1190 = local_1190 + lVar57;
                    local_10e0 = local_10e0 + lVar57;
                    local_fe0 = local_fe0 + lVar57;
                    local_f38 = (double)((long)local_f38 + lVar57);
                    local_f48 = (double)((long)local_f48 + lVar57);
                    local_e68 = (double)((long)local_e68 + lVar57);
                    local_1298 = local_1298 + lVar57;
                  } while (iStack_e34 + 1 != (int)local_13c8);
                }
                auVar341 = _DAT_006979c0;
                auVar343 = _DAT_006979b0;
                if (CONCAT44(local_848._4_4_,local_848._0_4_) != 0) {
                  if ((int)local_d50 <= iVar45) {
                    iVar48 = local_aa8._0_4_;
                    if (local_aa8._0_4_ < (int)local_ab8) {
                      iVar48 = (int)local_ab8;
                    }
                    iVar511 = local_d28._0_4_;
                    if (local_d28._0_4_ < (int)local_c08) {
                      iVar511 = (int)local_c08;
                    }
                    iVar46 = (int)local_ac8;
                    if ((int)local_ac8 < local_bf8._0_4_) {
                      iVar46 = local_bf8._0_4_;
                    }
                    lVar99 = (long)iVar46;
                    uVar73 = (int)local_ca0 - iVar48;
                    auVar186._4_4_ = 0;
                    auVar186._0_4_ = uVar73;
                    auVar186._8_4_ = uVar73;
                    auVar186._12_4_ = 0;
                    lVar57 = local_dd8._16_8_ +
                             ((long)iVar511 * 8 + (lVar99 - lVar82) * (long)local_d18 * 8 +
                             lVar92 * -8) * lVar83 + (long)iVar48 * 8 + lVar104 * -8 + 8;
                    do {
                      lVar58 = lVar57;
                      lVar59 = (long)iVar511;
                      if ((int)local_cc8 <= iVar84) {
                        do {
                          if (local_a08._0_4_ <= (int)local_ca0) {
                            uVar107 = 0;
                            do {
                              auVar290._8_4_ = (int)uVar107;
                              auVar290._0_8_ = uVar107;
                              auVar290._12_4_ = (int)(uVar107 >> 0x20);
                              auVar285 = auVar186 ^ auVar341;
                              auVar230 = (auVar290 | auVar343) ^ auVar341;
                              bVar108 = auVar285._0_4_ < auVar230._0_4_;
                              iVar48 = auVar285._4_4_;
                              iVar61 = auVar230._4_4_;
                              if ((bool)(~(iVar48 < iVar61 || iVar61 == iVar48 && bVar108) & 1)) {
                                *(undefined8 *)(lVar58 + -8 + uVar107 * 8) = 0x3ff0000000000000;
                              }
                              if (iVar48 >= iVar61 && (iVar61 != iVar48 || !bVar108)) {
                                *(undefined8 *)(lVar58 + uVar107 * 8) = 0x3ff0000000000000;
                              }
                              uVar107 = uVar107 + 2;
                            } while (((ulong)uVar73 + 2 & 0x1fffffffe) != uVar107);
                          }
                          lVar59 = lVar59 + 1;
                          lVar58 = lVar58 + lVar83 * 8;
                        } while (((iVar84 + iVar511) - (int)local_cc8) + 1 != (int)lVar59);
                      }
                      lVar99 = lVar99 + 1;
                      lVar57 = lVar57 + lVar102 * 8;
                    } while (((iVar45 + iVar46) - (int)local_d50) + 1 != (int)lVar99);
                  }
                  if (iStack_e40 <= iStack_e34) {
                    lVar99 = (long)local_e48._4_4_ * 8;
                    lVar57 = lVar99 + ((local_14c8 - lVar82) + -1) * (long)local_d18 * 8 +
                             lVar92 * -8;
                    lVar82 = lVar99 + (local_14c8 - lVar82) * (long)local_d18 * 8 + lVar92 * -8;
                    local_1168._0_8_ =
                         lVar57 * lVar83 + lVar89 * 8 + lVar104 * -8 + local_dd8._16_8_;
                    local_1358 = lVar82 * lVar83 + lVar89 * 8 + lVar104 * -8 + local_dd8._16_8_;
                    local_13d8 = (lVar57 + -8) * lVar83 + lVar89 * 8 + lVar104 * -8 +
                                 local_dd8._16_8_;
                    local_13e8 = (lVar82 + -8) * lVar83 + lVar89 * 8 + lVar104 * -8 +
                                 local_dd8._16_8_;
                    lVar82 = lVar79 * 0x80 + local_14c8 * 8;
                    lVar86 = lVar79 * 0x38 + local_14c8 * 8 + lVar77 * -8;
                    lVar92 = local_14c8 * 8;
                    lVar58 = lVar79 * 0x20 + local_14c8 * 8 + lVar77 * -8;
                    lVar59 = lVar92 + lVar79 * 0x18 + lVar77 * -8;
                    lVar93 = lVar92 + lVar79 * 0x28 + lVar77 * -8;
                    lVar104 = (long)local_e48._4_4_;
                    lVar57 = (long)iVar23;
                    lVar81 = (lVar82 + lVar77 * -8) * lVar88 + lVar104 * 8 + lVar57 * -8;
                    lVar60 = (lVar79 * 0x58 + local_14c8 * 8 + lVar77 * -8 + -8) * lVar88 +
                             lVar104 * 8 + lVar57 * -8;
                    local_14b8 = (_func_int **)lVar60;
                    lVar70 = (lVar79 * 0x70 + local_14c8 * 8 + lVar77 * -8 + -8) * lVar88 +
                             lVar104 * 8 + lVar57 * -8;
                    lVar71 = (lVar79 * 0x68 + local_14c8 * 8 + lVar77 * -8) * lVar88 + lVar104 * 8 +
                             lVar57 * -8;
                    local_15c8 = (double)((lVar79 * 0x50 + local_14c8 * 8 + lVar77 * -8) * lVar88 +
                                          lVar104 * 8 + lVar57 * -8);
                    lVar80 = (lVar79 * 0x60 + local_14c8 * 8 + lVar77 * -8) * lVar88 + lVar104 * 8 +
                             lVar57 * -8;
                    local_f48 = (double)(((lVar82 + lVar79 * 8 + lVar77 * -8 + -8) * lVar88 +
                                          lVar104 * 8 + lVar57 * -8) * (long)local_ec8 + lVar89 * 8
                                         + lVar53 * -8 + lVar52 + -8);
                    local_e68 = (double)(((lVar86 + -8) * lVar88 + lVar104 * 8 + lVar57 * -8) *
                                         (long)local_ec8 + lVar89 * 8 + lVar53 * -8 + lVar52 + -8);
                    local_13c8 = ((lVar79 * 0xb8 + local_14c8 * 8 + lVar77 * -8 + -8) * lVar88 +
                                  lVar104 * 8 + lVar57 * -8) * (long)local_ec8 + lVar89 * 8 +
                                 lVar53 * -8 + lVar52;
                    local_1298 = ((lVar79 * 0x30 + local_14c8 * 8 + lVar77 * -8) * lVar88 +
                                  lVar104 * 8 + lVar57 * -8) * (long)local_ec8 + lVar89 * 8 +
                                 lVar53 * -8 + lVar52 + -8;
                    local_f98 = ((lVar79 * 0x78 + local_14c8 * 8 + lVar77 * -8) * lVar88 +
                                 lVar104 * 8 + lVar57 * -8) * (long)local_ec8 + lVar89 * 8 +
                                lVar53 * -8 + lVar52 + -8;
                    local_1428 = (_func_int *)
                                 (((lVar79 * 0xb0 + local_14c8 * 8 + lVar77 * -8) * lVar88 +
                                   lVar104 * 8 + lVar57 * -8) * (long)local_ec8 + lVar89 * 8 +
                                  lVar53 * -8 + lVar52);
                    local_fa8 = lVar81 * (long)local_ec8 + lVar89 * 8 + lVar53 * -8 + lVar52 + -8;
                    local_15a0 = (_func_int *)
                                 (lVar89 * 8 +
                                  ((lVar79 * 0x98 + local_14c8 * 8 + lVar77 * -8) * lVar88 +
                                   lVar104 * 8 + lVar57 * -8) * (long)local_ec8 + lVar53 * -8 +
                                 lVar52);
                    local_1338 = (double)((lVar86 * lVar88 + lVar104 * 8 + lVar57 * -8) *
                                          (long)local_ec8 + lVar89 * 8 + lVar53 * -8 + lVar52 + -8);
                    local_1278 = (_func_int *)
                                 (((lVar79 * 0xa8 + local_14c8 * 8 + lVar77 * -8) * lVar88 +
                                   lVar104 * 8 + lVar57 * -8) * (long)local_ec8 + lVar89 * 8 +
                                  lVar53 * -8 + lVar52);
                    local_1538 = (_func_int *)
                                 (((lVar79 * 200 + local_14c8 * 8 + lVar77 * -8) * lVar88 +
                                   lVar104 * 8 + lVar57 * -8 + -8) * (long)local_ec8 + lVar89 * 8 +
                                  lVar53 * -8 + lVar52);
                    local_10c8 = (lVar81 + -8) * (long)local_ec8 + lVar89 * 8 + lVar53 * -8 + lVar52
                                 + -8;
                    local_1118 = ((lVar79 * 0x40 + local_14c8 * 8 + lVar77 * -8) * lVar88 +
                                  lVar104 * 8 + lVar57 * -8 + -8) * (long)local_ec8 + lVar89 * 8 +
                                 lVar53 * -8 + lVar52 + -8;
                    local_1558 = lVar60 * (long)local_ec8 + lVar89 * 8 + lVar53 * -8 + lVar52;
                    local_12e8 = ((lVar79 * 0xa0 + local_14c8 * 8 + lVar77 * -8 + -8) * lVar88 +
                                  lVar104 * 8 + lVar57 * -8) * (long)local_ec8 + lVar89 * 8 +
                                 lVar53 * -8 + lVar52;
                    local_12f0 = ((lVar58 + -8) * lVar88 + lVar104 * 8 + lVar57 * -8) *
                                 (long)local_ec8 + lVar89 * 8 + lVar53 * -8 + lVar52;
                    local_12f8 = (((local_14c8 + lVar79) * 8 + lVar77 * -8 + -8) * lVar88 +
                                  lVar104 * 8 + lVar57 * -8) * (long)local_ec8 + lVar89 * 8 +
                                 lVar53 * -8 + lVar52;
                    local_1300 = ((lVar59 + -8) * lVar88 + lVar104 * 8 + lVar57 * -8) *
                                 (long)local_ec8 + lVar89 * 8 + lVar53 * -8 + lVar52;
                    local_1308 = lVar70 * (long)local_ec8 + lVar89 * 8 + lVar53 * -8 + lVar52;
                    local_1310 = ((lVar92 + lVar79 * 0x48 + lVar77 * -8) * lVar88 + lVar104 * 8 +
                                 lVar57 * -8) * (long)local_ec8 + lVar89 * 8 + lVar53 * -8 + lVar52;
                    local_1250 = ((lVar79 * 0x90 + local_14c8 * 8 + lVar77 * -8) * lVar88 +
                                  lVar104 * 8 + lVar57 * -8) * (long)local_ec8 + lVar89 * 8 +
                                 lVar53 * -8 + lVar52;
                    local_ea8 = (double)(lVar71 * (long)local_ec8 + lVar89 * 8 + lVar53 * -8 +
                                        lVar52);
                    local_f28 = (double)((lVar58 * lVar88 + lVar104 * 8 + lVar57 * -8) *
                                         (long)local_ec8 + lVar89 * 8 + lVar53 * -8 + lVar52);
                    local_eb8 = (double)((lVar99 + (local_14c8 - lVar77) * lVar88 * 8 + lVar57 * -8)
                                         * (long)local_ec8 + lVar89 * 8 + lVar53 * -8 + lVar52);
                    local_f88 = (long)local_15c8 * (long)local_ec8 + lVar89 * 8 + lVar53 * -8 +
                                lVar52;
                    local_1208 = ((lVar79 * 8 + local_14c8 * 8 + lVar77 * -8) * lVar88 + lVar104 * 8
                                 + lVar57 * -8) * (long)local_ec8 + lVar89 * 8 + lVar53 * -8 +
                                 lVar52;
                    local_1008 = (lVar59 * lVar88 + lVar104 * 8 + lVar57 * -8) * (long)local_ec8 +
                                 lVar89 * 8 + lVar53 * -8 + lVar52;
                    lVar82 = lVar80 * (long)local_ec8 + lVar89 * 8 + lVar53 * -8 + lVar52;
                    local_14d8._0_8_ =
                         ((lVar79 * 0xd0 + local_14c8 * 8 + lVar77 * -8 + -8) * lVar88 + lVar104 * 8
                          + lVar57 * -8 + -8) * (long)local_ec8 + lVar89 * 8 + lVar53 * -8 + lVar52;
                    local_1108 = lVar89 * 8 +
                                 ((lVar93 + -8) * lVar88 + lVar104 * 8 + lVar57 * -8 + -8) *
                                 (long)local_ec8 + lVar53 * -8 + lVar52;
                    local_11c8 = (lVar70 + -8) * (long)local_ec8 + lVar89 * 8 + lVar53 * -8 + lVar52
                    ;
                    local_1088 = ((lVar79 * 0x10 + local_14c8 * 8 + lVar77 * -8) * lVar88 +
                                  lVar104 * 8 + lVar57 * -8 + -8) * (long)local_ec8 + lVar89 * 8 +
                                 lVar53 * -8 + lVar52;
                    local_1288 = ((lVar79 * 0xc0 + local_14c8 * 8 + lVar77 * -8) * lVar88 +
                                  lVar104 * 8 + lVar57 * -8 + -8) * (long)local_ec8 + lVar89 * 8 +
                                 lVar53 * -8 + lVar52;
                    local_1190 = (lVar71 + -8) * (long)local_ec8 + lVar89 * 8 + lVar53 * -8 + lVar52
                    ;
                    local_10e0 = ((long)local_15c8 + -8) * (long)local_ec8 + lVar89 * 8 +
                                 lVar53 * -8 + lVar52;
                    local_fe0 = (lVar93 * lVar88 + lVar104 * 8 + lVar57 * -8 + -8) * (long)local_ec8
                                + lVar89 * 8 + lVar53 * -8 + lVar52;
                    local_f38 = (double)((lVar80 + -8) * (long)local_ec8 + lVar89 * 8 + lVar53 * -8
                                        + lVar52);
                    lVar102 = lVar102 * 8;
                    local_f18 = (double)(lVar83 * 8);
                    lVar52 = CONCAT44(local_848._4_4_,local_848._0_4_) + lVar89 * 8;
                    lVar103 = lVar103 * 8;
                    lVar53 = (long)local_ec8 * 8;
                    do {
                      if (local_e48._4_4_ <= iStack_e38) {
                        lVar88 = (long)local_828;
                        lVar92 = CONCAT44(OStack_83c.val,uStack_840) * 8;
                        local_de8 = (_func_int **)(long)local_e48._4_4_;
                        lVar77 = ((long)local_de8 - (long)iStack_824) * lVar92 +
                                 (local_14c8 - iStack_820) * CONCAT44(iStack_834,local_838) * 8;
                        local_1678 = lVar77 + lStack_830 * 8 + lVar88 * -8 + lVar52;
                        local_1598 = lStack_830 * 0x10 + lVar77 + lVar88 * -8 + lVar52;
                        local_1660 = lVar77 + lStack_830 * 0x18 + lVar88 * -8 + lVar52;
                        local_1668 = lStack_830 * 0x20 + lVar77 + lVar88 * -8 + lVar52;
                        local_1640 = lVar77 + lStack_830 * 0x28 + lVar88 * -8 + lVar52;
                        local_1650 = lStack_830 * 0x30 + lVar77 + lVar88 * -8 + lVar52;
                        local_1680 = lStack_830 * 0x38 + lVar77 + lVar88 * -8 + lVar52;
                        local_1658 = (double)local_10e0;
                        local_15c8 = (double)local_1190;
                        local_1588 = local_1288;
                        local_1648 = local_1088;
                        local_1568 = local_11c8;
                        local_1518 = local_1108;
                        local_1578 = local_14d8._0_8_;
                        local_16c8 = local_1208;
                        local_16b8 = local_f88;
                        local_1620 = local_eb8;
                        local_1690 = local_1250;
                        local_15f8 = local_1310;
                        local_15f0 = local_1308;
                        local_15d0 = (double)local_1300;
                        local_15d8 = (double)local_12f8;
                        local_15b0 = local_12f0;
                        local_14b8 = (_func_int **)local_12e8;
                        local_1528 = local_1558;
                        local_1600 = local_1118;
                        local_15a8 = local_10c8;
                        local_1418 = (long)local_1278;
                        local_16d0 = local_fa8;
                        local_1688 = (long)local_1428;
                        local_15b8 = (double)local_f98;
                        local_12a8 = local_1298;
                        local_1058 = local_13c8;
                        local_1268 = local_e68;
                        local_1468 = local_f48;
                        local_10b8 = local_13e8;
                        local_1478._0_8_ = local_13d8;
                        local_f08 = (double)local_1168._0_8_;
                        dVar550 = local_ea8;
                        dVar334 = local_f28;
                        lVar77 = lVar82;
                        dVar184 = local_f38;
                        lVar88 = local_fe0;
                        lVar79 = local_1008;
                        p_Var54 = local_1538;
                        p_Var97 = local_15a0;
                        lVar83 = local_1358;
                        local_e98 = local_1338;
                        do {
                          if ((int)local_e48 <= iStack_e3c) {
                            lVar104 = 0;
                            do {
                              *(double *)(local_1678 + lVar104 * 8) =
                                   (*(double *)(local_1518 + lVar104 * 8) * dVar122 +
                                   *(double *)(local_1578 + lVar104 * 8) * dVar120 +
                                   *(double *)(local_1568 + lVar104 * 8) * dVar121) *
                                   *(double *)(local_1478._0_8_ + lVar104 * 8) +
                                   (*(double *)((long)local_15d0 + lVar104 * 8) * dVar122 +
                                   *(double *)((long)local_14b8 + lVar104 * 8) * dVar120 +
                                   *(double *)(local_15f0 + lVar104 * 8) * dVar121) *
                                   *(double *)((long)local_f08 + lVar104 * 8) +
                                   (*(double *)(lVar79 + lVar104 * 8) * dVar122 +
                                   *(double *)(local_1690 + lVar104 * 8) * dVar120 +
                                   *(double *)(lVar77 + lVar104 * 8) * dVar121) *
                                   *(double *)(lVar83 + lVar104 * 8) +
                                   (*(double *)(lVar88 + lVar104 * 8) * dVar122 +
                                   *(double *)(local_1588 + lVar104 * 8) * dVar120 +
                                   *(double *)((long)dVar184 + lVar104 * 8) * dVar121) *
                                   *(double *)(local_10b8 + lVar104 * 8);
                              *(double *)(local_1598 + lVar104 * 8) =
                                   (*(double *)((long)local_1268 + lVar104 * 8) * dVar122 +
                                   *(double *)(local_1058 + -8 + lVar104 * 8) * dVar123 +
                                   *(double *)((long)local_1468 + lVar104 * 8) * local_868) *
                                   *(double *)((long)local_f08 + -8 + lVar104 * 8) +
                                   (*(double *)((long)local_15d8 + lVar104 * 8) * dVar122 +
                                   *(double *)(local_1058 + lVar104 * 8) * dVar123 +
                                   *(double *)(local_1528 + lVar104 * 8) * local_868) *
                                   *(double *)((long)local_f08 + lVar104 * 8) +
                                   (*(double *)(local_16c8 + lVar104 * 8) * dVar122 +
                                   *(double *)(local_1418 + lVar104 * 8) * dVar123 +
                                   *(double *)(local_15f8 + lVar104 * 8) * local_868) *
                                   *(double *)(lVar83 + lVar104 * 8) +
                                   (*(double *)((long)local_e98 + lVar104 * 8) * dVar122 +
                                   *(double *)(local_1418 + -8 + lVar104 * 8) * dVar123 +
                                   *(double *)((long)local_15b8 + lVar104 * 8) * local_868) *
                                   *(double *)(lVar83 + -8 + lVar104 * 8);
                              *(double *)(local_1660 + lVar104 * 8) =
                                   (*(double *)(local_1600 + lVar104 * 8) * local_cb8 +
                                   *(double *)((long)p_Var54 + -8 + lVar104 * 8) * dVar123 +
                                   *(double *)(local_15a8 + lVar104 * 8) * dVar121) *
                                   *(double *)(local_10b8 + -8 + lVar104 * 8) +
                                   (*(double *)(local_1648 + lVar104 * 8) * local_cb8 +
                                   *(double *)((long)p_Var54 + lVar104 * 8) * dVar123 +
                                   *(double *)((long)local_1658 + lVar104 * 8) * dVar121) *
                                   *(double *)(local_10b8 + lVar104 * 8) +
                                   (*(double *)((long)local_1620 + lVar104 * 8) * local_cb8 +
                                   *(double *)((long)p_Var97 + lVar104 * 8) * dVar123 +
                                   *(double *)(local_16b8 + lVar104 * 8) * dVar121) *
                                   *(double *)(lVar83 + lVar104 * 8) +
                                   (*(double *)(local_12a8 + lVar104 * 8) * local_cb8 +
                                   *(double *)((long)p_Var97 + -8 + lVar104 * 8) * dVar123 +
                                   *(double *)(local_16d0 + lVar104 * 8) * dVar121) *
                                   *(double *)(lVar83 + -8 + lVar104 * 8);
                              *(double *)(local_1668 + lVar104 * 8) =
                                   (*(double *)((long)dVar334 + lVar104 * 8) * (double)local_9e8 +
                                   *(double *)(local_1418 + lVar104 * 8) * dVar124 +
                                   *(double *)(lVar77 + lVar104 * 8) * (double)local_858) *
                                   *(double *)(lVar83 + lVar104 * 8) +
                                   (*(double *)(local_15b0 + lVar104 * 8) * (double)local_9e8 +
                                   *(double *)(local_1058 + lVar104 * 8) * dVar124 +
                                   *(double *)(local_15f0 + lVar104 * 8) * (double)local_858) *
                                   *(double *)((long)local_f08 + lVar104 * 8);
                              *(double *)(local_1640 + lVar104 * 8) =
                                   (*(double *)(lVar79 + lVar104 * 8) * local_d68 +
                                   *(double *)((long)p_Var97 + lVar104 * 8) * dVar124 +
                                   *(double *)((long)dVar550 + lVar104 * 8) * dVar429) *
                                   *(double *)(lVar83 + lVar104 * 8) +
                                   (*(double *)(lVar88 + lVar104 * 8) * local_d68 +
                                   *(double *)((long)p_Var54 + lVar104 * 8) * dVar124 +
                                   *(double *)((long)local_15c8 + lVar104 * 8) * dVar429) *
                                   *(double *)(local_10b8 + lVar104 * 8);
                              *(double *)(local_1650 + lVar104 * 8) =
                                   (*(double *)(local_16c8 + lVar104 * 8) * local_d68 +
                                   *(double *)(local_1688 + lVar104 * 8) * dVar385 +
                                   *(double *)(local_16b8 + lVar104 * 8) * (double)local_858) *
                                   *(double *)(lVar83 + lVar104 * 8) +
                                   (*(double *)((long)local_e98 + lVar104 * 8) * local_d68 +
                                   *(double *)(local_1688 + -8 + lVar104 * 8) * dVar385 +
                                   *(double *)(local_16d0 + lVar104 * 8) * (double)local_858) *
                                   *(double *)(lVar83 + -8 + lVar104 * 8);
                              *(double *)(local_1680 + lVar104 * 8) =
                                   (*(double *)((long)dVar334 + lVar104 * 8) * dVar469 +
                                   *(double *)(local_1688 + lVar104 * 8) * dVar384 +
                                   *(double *)((long)dVar550 + lVar104 * 8) * (double)local_9f8) *
                                   *(double *)(lVar83 + lVar104 * 8);
                              lVar104 = lVar104 + 1;
                            } while ((iStack_e3c - (int)local_e48) + 1 != (int)lVar104);
                          }
                          local_de8 = (_func_int **)((long)local_de8 + 1);
                          local_f08 = (double)((long)local_f08 + (long)local_f18);
                          lVar83 = lVar83 + (long)local_f18;
                          local_1478._0_8_ = local_1478._0_8_ + (long)local_f18;
                          local_10b8 = local_10b8 + (long)local_f18;
                          local_1678 = local_1678 + lVar92;
                          local_1598 = local_1598 + lVar92;
                          local_1660 = local_1660 + lVar92;
                          local_1668 = local_1668 + lVar92;
                          local_1640 = local_1640 + lVar92;
                          local_1650 = local_1650 + lVar92;
                          local_1680 = local_1680 + lVar92;
                          local_1468 = (double)((long)local_1468 + lVar53);
                          local_1268 = (double)((long)local_1268 + lVar53);
                          local_1058 = local_1058 + lVar53;
                          local_12a8 = local_12a8 + lVar53;
                          local_15b8 = (double)((long)local_15b8 + lVar53);
                          local_1688 = local_1688 + lVar53;
                          local_16d0 = local_16d0 + lVar53;
                          p_Var97 = (_func_int *)((long)p_Var97 + lVar53);
                          local_e98 = (double)((long)local_e98 + lVar53);
                          local_1418 = local_1418 + lVar53;
                          p_Var54 = (_func_int *)((long)p_Var54 + lVar53);
                          local_15a8 = local_15a8 + lVar53;
                          local_1600 = local_1600 + lVar53;
                          local_1528 = local_1528 + lVar53;
                          local_14b8 = (_func_int **)((long)local_14b8 + lVar53);
                          local_15b0 = local_15b0 + lVar53;
                          local_15d8 = (double)((long)local_15d8 + lVar53);
                          local_15d0 = (double)((long)local_15d0 + lVar53);
                          local_15f0 = local_15f0 + lVar53;
                          local_15f8 = local_15f8 + lVar53;
                          local_1690 = local_1690 + lVar53;
                          dVar550 = (double)((long)dVar550 + lVar53);
                          dVar334 = (double)((long)dVar334 + lVar53);
                          local_1620 = (double)((long)local_1620 + lVar53);
                          local_16b8 = local_16b8 + lVar53;
                          local_16c8 = local_16c8 + lVar53;
                          lVar79 = lVar79 + lVar53;
                          lVar77 = lVar77 + lVar53;
                          local_1578 = local_1578 + lVar53;
                          local_1518 = local_1518 + lVar53;
                          local_1568 = local_1568 + lVar53;
                          local_1648 = local_1648 + lVar53;
                          local_1588 = local_1588 + lVar53;
                          local_15c8 = (double)((long)local_15c8 + lVar53);
                          local_1658 = (double)((long)local_1658 + lVar53);
                          lVar88 = lVar88 + lVar53;
                          dVar184 = (double)((long)dVar184 + lVar53);
                        } while (iStack_e38 + 1 != (int)local_de8);
                      }
                      local_14c8 = local_14c8 + 1;
                      local_1168._0_8_ = local_1168._0_8_ + lVar102;
                      local_1358 = local_1358 + lVar102;
                      local_13d8 = local_13d8 + lVar102;
                      local_13e8 = local_13e8 + lVar102;
                      local_f48 = (double)((long)local_f48 + lVar103);
                      local_e68 = (double)((long)local_e68 + lVar103);
                      local_13c8 = local_13c8 + lVar103;
                      local_1298 = local_1298 + lVar103;
                      local_f98 = local_f98 + lVar103;
                      local_1428 = (_func_int *)((long)local_1428 + lVar103);
                      local_fa8 = local_fa8 + lVar103;
                      local_15a0 = (_func_int *)((long)local_15a0 + lVar103);
                      local_1338 = (double)((long)local_1338 + lVar103);
                      local_1278 = (_func_int *)((long)local_1278 + lVar103);
                      local_1538 = (_func_int *)((long)local_1538 + lVar103);
                      local_10c8 = local_10c8 + lVar103;
                      local_1118 = local_1118 + lVar103;
                      local_1558 = local_1558 + lVar103;
                      local_12e8 = local_12e8 + lVar103;
                      local_12f0 = local_12f0 + lVar103;
                      local_12f8 = local_12f8 + lVar103;
                      local_1300 = local_1300 + lVar103;
                      local_1308 = local_1308 + lVar103;
                      local_1310 = local_1310 + lVar103;
                      local_1250 = local_1250 + lVar103;
                      local_ea8 = (double)((long)local_ea8 + lVar103);
                      local_f28 = (double)((long)local_f28 + lVar103);
                      local_eb8 = (double)((long)local_eb8 + lVar103);
                      local_f88 = local_f88 + lVar103;
                      local_1208 = local_1208 + lVar103;
                      local_1008 = local_1008 + lVar103;
                      lVar82 = lVar82 + lVar103;
                      local_14d8._0_8_ = local_14d8._0_8_ + lVar103;
                      local_1108 = local_1108 + lVar103;
                      local_11c8 = local_11c8 + lVar103;
                      local_1088 = local_1088 + lVar103;
                      local_1288 = local_1288 + lVar103;
                      local_1190 = local_1190 + lVar103;
                      local_10e0 = local_10e0 + lVar103;
                      local_fe0 = local_fe0 + lVar103;
                      local_f38 = (double)((long)local_f38 + lVar103);
                    } while (iStack_e34 + 1 != (int)local_14c8);
                  }
                }
                Gpu::Elixir::~Elixir(&local_48);
                Gpu::Elixir::~Elixir(&local_60);
              }
              else {
                bVar108 = true;
                if (FVar44 != covered) goto LAB_005d5cbb;
                iVar48 = (int)local_e48;
                lVar77 = (long)(int)local_e48;
                iVar45 = local_e48._4_4_;
                lVar52 = (long)local_e48._4_4_;
                uVar73 = iStack_e3c - (int)local_e48;
                iVar61 = (iStack_e38 - local_e48._4_4_) + 1;
                local_1698 = 0;
                lVar53 = 0;
                do {
                  iVar24 = iVar511;
                  if (iVar511 <= iVar84) {
                    do {
                      if (iVar45 <= iVar23) {
                        lVar102 = CONCAT44(OStack_5c4.val,local_5d0._8_4_) * 8;
                        pvVar95 = (void *)(local_5d0._0_8_ +
                                          lStack_5b8 * local_1698 +
                                          (lVar52 - iStack_5ac) * lVar102 +
                                          (long)(iVar24 - iStack_5a8) *
                                          CONCAT44(iStack_5bc,local_5c0) * 8 + (long)local_5b0 * -8
                                          + lVar77 * 8);
                        iVar105 = iVar61;
                        do {
                          if (iVar48 <= iVar46) {
                            memset(pvVar95,0,(ulong)uVar73 * 8 + 8);
                          }
                          pvVar95 = (void *)((long)pvVar95 + lVar102);
                          iVar105 = iVar105 + -1;
                        } while (iVar105 != 0);
                      }
                      bVar108 = iVar24 != iVar84;
                      iVar24 = iVar24 + 1;
                    } while (bVar108);
                  }
                  lVar53 = lVar53 + 1;
                  local_1698 = local_1698 + 8;
                } while (lVar53 != 9);
                lVar53 = CONCAT44(local_848._4_4_,local_848._0_4_);
                if (lVar53 != 0) {
                  local_1698 = 0;
                  lVar102 = 0;
                  do {
                    iVar24 = iVar511;
                    if (iVar511 <= iVar84) {
                      do {
                        if (iVar45 <= iVar23) {
                          lVar103 = CONCAT44(OStack_83c.val,uStack_840) * 8;
                          pvVar95 = (void *)(lStack_830 * local_1698 +
                                             (lVar52 - iStack_824) * lVar103 +
                                             (long)(iVar24 - iStack_820) *
                                             CONCAT44(iStack_834,local_838) * 8 +
                                             (long)local_828 * -8 + lVar53 + lVar77 * 8);
                          iVar105 = iVar61;
                          do {
                            if (iVar48 <= iVar46) {
                              memset(pvVar95,0,(ulong)uVar73 * 8 + 8);
                            }
                            pvVar95 = (void *)((long)pvVar95 + lVar103);
                            iVar105 = iVar105 + -1;
                          } while (iVar105 != 0);
                        }
                        bVar108 = iVar24 != iVar84;
                        iVar24 = iVar24 + 1;
                      } while (bVar108);
                    }
                    lVar102 = lVar102 + 1;
                    local_1698 = local_1698 + 8;
                  } while (lVar102 != 9);
                }
              }
              bVar108 = false;
            }
LAB_005d5cbb:
            iVar48 = local_f68.smallend.vect[2];
            if (bVar108) {
              iVar84 = local_f68.smallend.vect[0];
              iVar45 = local_f68.smallend.vect[1];
              iVar511 = *(int *)(lVar106 + 0x18);
              iVar46 = *(int *)(lVar106 + 0x1c);
              iVar23 = iVar511;
              if (iVar511 < local_f68.smallend.vect[0]) {
                iVar23 = local_f68.smallend.vect[0];
              }
              iVar61 = iVar46;
              if (iVar46 < local_f68.smallend.vect[1]) {
                iVar61 = local_f68.smallend.vect[1];
              }
              iVar24 = *(int *)(lVar106 + 0x20);
              iVar105 = iVar24;
              if (iVar24 < local_f68.smallend.vect[2]) {
                iVar105 = local_f68.smallend.vect[2];
              }
              iVar85 = *(int *)(lVar106 + 0x24);
              if (local_f68.bigend.vect[0] < *(int *)(lVar106 + 0x24)) {
                iVar85 = local_f68.bigend.vect[0];
              }
              iVar33 = *(int *)(lVar106 + 0x28);
              if (local_f68.bigend.vect[1] < *(int *)(lVar106 + 0x28)) {
                iVar33 = local_f68.bigend.vect[1];
              }
              iVar47 = *(int *)(lVar106 + 0x2c);
              if (local_f68.bigend.vect[2] < *(int *)(lVar106 + 0x2c)) {
                iVar47 = local_f68.bigend.vect[2];
              }
              local_15c8._0_4_ = iVar47;
              FArrayBox::resize((FArrayBox *)local_dd8,&local_f68,1,(Arena *)0x0);
              pAVar55 = (Arena *)CONCAT44(local_dd8._12_4_,local_dd8._8_4_);
              if (pAVar55 == (Arena *)0x0) {
                pAVar55 = The_Arena();
              }
              local_14b8._0_4_ = iVar24;
              Gpu::Elixir::Elixir(&local_60,(void *)0x0,pAVar55);
              iVar43 = local_da4;
              iVar42 = local_db8;
              iVar41 = iStack_dbc;
              iVar40 = iStack_dc0;
              uVar125 = local_dd8._16_8_;
              lVar77 = (long)iStack_dc0;
              lVar102 = (long)iStack_dbc;
              lVar106 = (long)local_db8;
              iVar62 = iStack_db4 + 1;
              p_Var69 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(long)(iVar62 - iStack_dc0);
              lVar52 = (long)((local_db0 + 1) - iStack_dbc);
              peVar56 = (element_type *)(lVar52 * (long)p_Var69);
              lVar53 = (long)local_f68.smallend.vect[2];
              if (local_f68.smallend.vect[2] <= local_f68.bigend.vect[2]) {
                lVar103 = (long)local_f68.smallend.vect[0];
                local_14f8._0_8_ =
                     lVar78 + ((long)local_f68.smallend.vect[1] * 8 + (lVar53 - iVar65) * lVar76 * 8
                              + (long)iVar74 * -8) * lVar51 + lVar103 * 8 + (long)iVar63 * -8;
                do {
                  if (local_f68.smallend.vect[1] <= local_f68.bigend.vect[1]) {
                    lVar78 = (long)local_f68.smallend.vect[1];
                    lVar76 = local_14f8._0_8_;
                    do {
                      if (local_f68.smallend.vect[0] <= local_f68.bigend.vect[0]) {
                        lVar82 = 0;
                        do {
                          uVar126 = 0;
                          if ((((long)iVar23 <= lVar103 + lVar82) && (iVar61 <= lVar78)) &&
                             ((iVar105 <= lVar53 &&
                              (((lVar103 + lVar82 <= (long)iVar85 && (lVar78 <= iVar33)) &&
                               (lVar53 <= iVar47)))))) {
                            uVar126 = *(undefined8 *)(lVar76 + lVar82 * 8);
                          }
                          *(undefined8 *)
                           (local_dd8._16_8_ +
                           lVar82 * 8 +
                           lVar103 * 8 + lVar77 * -8 +
                           (lVar78 - lVar102) * (long)p_Var69 * 8 +
                           (lVar53 - lVar106) * (long)peVar56 * 8) = uVar126;
                          lVar82 = lVar82 + 1;
                        } while ((local_f68.bigend.vect[0] - local_f68.smallend.vect[0]) + 1 !=
                                 (int)lVar82);
                      }
                      lVar78 = lVar78 + 1;
                      lVar76 = lVar76 + lVar51 * 8;
                    } while (local_f68.bigend.vect[1] + 1 != (int)lVar78);
                  }
                  lVar53 = lVar53 + 1;
                  local_14f8._0_8_ = local_14f8._0_8_ + lVar67 * 8;
                } while (local_f68.bigend.vect[2] + 1 != (int)lVar53);
              }
              p_Var98 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                        ((((long)local_dac + 1) - lVar106) * (long)peVar56);
              uVar126._4_4_ = local_db0 + 1;
              uVar126._0_4_ = iVar62;
              local_808.kstride._0_4_ = iStack_e38;
              local_808.kstride._4_4_ = iStack_e34;
              local_808.p = local_e48;
              local_808.jstride._0_4_ = iStack_e40;
              local_808.jstride._4_4_ = iStack_e3c;
              local_1e8._20_4_ = iStack_5bc;
              local_1e8._16_4_ = local_5c0;
              local_1e8._24_8_ = lStack_5b8;
              local_1e8._48_4_ = auStack_5a0._0_4_;
              local_1e8._52_8_ = auStack_5a0._4_8_;
              local_1e8._32_4_ = local_5b0;
              local_1e8._36_4_ = iStack_5ac;
              local_1e8._40_4_ = iStack_5a8;
              local_1e8._44_4_ = iStack_5a4;
              local_1e8._0_8_ = local_5d0._0_8_;
              local_1e8._8_4_ = local_5d0._8_4_;
              local_1e8._12_4_ = OStack_5c4.val;
              local_1e8._72_8_ = local_dd8._16_8_;
              local_1e8._104_4_ = iStack_dc0;
              local_1e8._108_4_ = iStack_dbc;
              local_1e8._112_4_ = local_db8;
              iVar63 = (int)((long)local_dac + 1);
              local_168 = local_da4;
              local_1e8._64_8_ = plVar551;
              local_1e8._80_8_ = p_Var69;
              local_1e8._88_8_ = peVar56;
              local_1e8._96_8_ = p_Var98;
              local_1e8._116_8_ = uVar126;
              local_16c = iVar63;
              local_160 = piVar185;
              piStack_158 = piVar227;
              local_150 = p_Var614;
              local_148 = dVar183;
              p_Stack_140 = p_Var226;
              local_138 = dVar578;
              LoopConcurrent<amrex::mlndlap_set_stencil(amrex::Box_const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,amrex::GpuArray<double,3u>const&)::_lambda(int,int,int)_1_>
                        ((Box *)&local_808,(anon_class_184_9_71aa95b3 *)local_1e8);
              auVar341 = _DAT_006979c0;
              auVar343 = _DAT_006979b0;
              if (CONCAT44(local_848._4_4_,local_848._0_4_) != 0) {
                if (iVar105 <= iVar47) {
                  if (iVar84 < iVar511) {
                    iVar84 = iVar511;
                  }
                  if (iVar45 < iVar46) {
                    iVar45 = iVar46;
                  }
                  if (iVar48 < iVar24) {
                    iVar48 = iVar24;
                  }
                  lVar78 = (long)iVar48;
                  uVar73 = iVar85 - iVar84;
                  auVar354._4_4_ = 0;
                  auVar354._0_4_ = uVar73;
                  auVar354._8_4_ = uVar73;
                  auVar354._12_4_ = 0;
                  lVar106 = uVar125 + ((long)iVar45 * 8 + (lVar78 - lVar106) * lVar52 * 8 +
                                      lVar102 * -8) * (long)p_Var69 + (long)iVar84 * 8 + lVar77 * -8
                                      + 8;
                  do {
                    lVar51 = lVar106;
                    lVar67 = (long)iVar45;
                    if (iVar61 <= iVar33) {
                      do {
                        if (iVar23 <= iVar85) {
                          uVar107 = 0;
                          do {
                            auVar404._8_4_ = (int)uVar107;
                            auVar404._0_8_ = uVar107;
                            auVar404._12_4_ = (int)(uVar107 >> 0x20);
                            auVar230 = auVar354 ^ auVar341;
                            auVar186 = (auVar404 | auVar343) ^ auVar341;
                            bVar108 = auVar230._0_4_ < auVar186._0_4_;
                            iVar74 = auVar230._4_4_;
                            iVar65 = auVar186._4_4_;
                            if ((bool)(~(iVar74 < iVar65 || iVar65 == iVar74 && bVar108) & 1)) {
                              *(undefined8 *)(lVar51 + -8 + uVar107 * 8) = 0x3ff0000000000000;
                            }
                            if (iVar74 >= iVar65 && (iVar65 != iVar74 || !bVar108)) {
                              *(undefined8 *)(lVar51 + uVar107 * 8) = 0x3ff0000000000000;
                            }
                            uVar107 = uVar107 + 2;
                          } while (((ulong)uVar73 + 2 & 0x1fffffffe) != uVar107);
                        }
                        lVar67 = lVar67 + 1;
                        lVar51 = lVar51 + (long)iVar62 * 8 + lVar77 * -8;
                      } while (((iVar33 + iVar45) - iVar61) + 1 != (int)lVar67);
                    }
                    lVar78 = lVar78 + 1;
                    lVar106 = lVar106 + (long)peVar56 * 8;
                  } while (((iVar47 + iVar48) - iVar105) + 1 != (int)lVar78);
                }
                local_808.kstride._0_4_ = iStack_e38;
                local_808.kstride._4_4_ = iStack_e34;
                local_808.p = local_e48;
                local_808.jstride._0_4_ = iStack_e40;
                local_808.jstride._4_4_ = iStack_e3c;
                local_1e8._48_4_ = iStack_818;
                local_1e8._52_4_ = (int)uStack_814;
                local_1e8._56_4_ = uStack_814._4_4_;
                local_1e8._4_4_ = local_848._4_4_;
                local_1e8._0_4_ = local_848._0_4_;
                local_1e8._20_4_ = iStack_834;
                local_1e8._16_4_ = local_838;
                local_1e8._24_8_ = lStack_830;
                local_1e8._32_4_ = local_828;
                local_1e8._36_4_ = iStack_824;
                local_1e8._40_4_ = iStack_820;
                local_1e8._44_4_ = iStack_81c;
                local_1e8._8_4_ = uStack_840;
                local_1e8._12_4_ = OStack_83c.val;
                local_1e8._72_8_ = uVar125;
                local_1e8._104_4_ = iVar40;
                local_1e8._108_4_ = iVar41;
                local_1e8._112_4_ = iVar42;
                local_168 = iVar43;
                local_1e8._64_8_ = plVar551;
                local_1e8._80_8_ = p_Var69;
                local_1e8._88_8_ = peVar56;
                local_1e8._96_8_ = p_Var98;
                local_1e8._116_8_ = uVar126;
                local_16c = iVar63;
                local_160 = piVar185;
                piStack_158 = piVar227;
                local_150 = p_Var614;
                local_148 = dVar183;
                p_Stack_140 = p_Var226;
                local_138 = dVar578;
                LoopConcurrent<amrex::mlndlap_set_stencil(amrex::Box_const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,amrex::GpuArray<double,3u>const&)::_lambda(int,int,int)_1_>
                          ((Box *)&local_808,(anon_class_184_9_71aa95b3 *)local_1e8);
              }
              Gpu::Elixir::~Elixir(&local_60);
            }
            MFIter::operator++((MFIter *)&local_bc8);
          } while (local_ba8[0] < local_ba8[2]);
        }
        MFIter::~MFIter((MFIter *)&local_bc8);
        local_a70._vptr_BaseFab = (_func_int **)&PTR__BaseFab_0074eb90;
        BaseFab<double>::clear(&local_a70);
        local_dd8[0] = true;
        local_dd8._1_7_ = 0x74eb;
        BaseFab<double>::clear((BaseFab<double> *)local_dd8);
        MFIter::MFIter((MFIter *)local_1e8,
                       (FabArrayBase *)
                       **(undefined8 **)
                         ((long)&(((local_e50->
                                   super_vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                                   ).
                                   super__Vector_base<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                 super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                                 ).
                                 super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                         + local_ef8 * 8),true);
        if ((int)local_1e8._32_4_ < (int)local_1e8._40_4_) {
          do {
            MFIter::tilebox((Box *)&local_a70,(MFIter *)local_1e8);
            FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                      ((Array4<double> *)&local_bc8,
                       (FabArray<amrex::FArrayBox> *)
                       **(undefined8 **)
                         ((long)&(((local_e50->
                                   super_vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                                   ).
                                   super__Vector_base<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                 super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                                 ).
                                 super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                         + local_ef8 * 8),(MFIter *)local_1e8);
            uVar107 = (ulong)DAT_00697990;
            uVar333 = (ulong)DAT_00698470;
            if ((int)local_a70.super_DataAllocator.m_arena <= local_a70.dptr._4_4_) {
              lVar75 = (long)local_a70._vptr_BaseFab._4_4_;
              local_14b8._0_4_ = (int)local_a70.dptr + 1;
              iVar48 = (int)local_a70.super_DataAllocator.m_arena + -1;
              local_1478._0_8_ = lVar75 + -1;
              iVar63 = (int)local_a70.super_DataAllocator.m_arena;
              do {
                if (local_a70._vptr_BaseFab._4_4_ <= (int)local_a70.dptr) {
                  lVar53 = CONCAT44(auStack_bc4._8_4_,auStack_bc4._4_4_) * 8;
                  lVar92 = (lVar75 - local_ba8[1]) * lVar53;
                  lVar78 = CONCAT44(auStack_bc4._16_4_,auStack_bc4._12_4_) * 8;
                  lVar67 = ((long)iVar48 - (long)local_ba8[2]) * lVar78;
                  lVar106 = lVar92 + lVar67;
                  lVar77 = auStack_bc4._20_8_ * 0x38;
                  lVar78 = ((long)iVar63 - (long)local_ba8[2]) * lVar78;
                  lVar92 = lVar92 + lVar78;
                  lVar76 = ((lVar75 + -1) - (long)local_ba8[1]) * lVar53;
                  lVar67 = lVar67 + lVar76;
                  lVar76 = lVar76 + lVar78;
                  lVar78 = auStack_bc4._20_8_ * 0x30;
                  lVar51 = (long)local_ba8[0];
                  local_1690 = lVar67 + lVar77 + lVar51 * -8;
                  local_1618 = lVar77 + lVar76 + lVar51 * -8;
                  lVar52 = auStack_bc4._20_8_ * 0x20 + lVar76 + lVar51 * -8;
                  lVar104 = lVar67 + lVar78 + lVar51 * -8;
                  local_1668 = lVar78 + lVar76 + lVar51 * -8;
                  local_15e8 = auStack_bc4._20_8_ * 0x10 + lVar76 + lVar51 * -8;
                  lVar67 = CONCAT44(auStack_bc4._0_4_,
                                    CONCAT13(uStack_bc5,
                                             CONCAT12(bStack_bc6,CONCAT11(bStack_bc7,local_bc8)))) +
                           (long)(int)local_a70._vptr_BaseFab * 8;
                  lVar88 = lVar106 + lVar77 + lVar51 * -8 + lVar67;
                  lVar103 = lVar106 + auStack_bc4._20_8_ * 0x28 + lVar51 * -8 + lVar67;
                  lVar77 = lVar92 + lVar77 + lVar51 * -8 + lVar67;
                  lVar82 = auStack_bc4._20_8_ * 0x28 + lVar92 + lVar51 * -8 + lVar67;
                  lVar102 = lVar92 + auStack_bc4._20_8_ * 0x20 + lVar51 * -8 + lVar67;
                  lVar83 = lVar92 + auStack_bc4._20_8_ * 8 + lVar51 * -8 + lVar67;
                  local_1518 = lVar67 + local_1690;
                  local_1690 = local_1690 + lVar67;
                  local_1620 = (double)(lVar67 + local_1618);
                  local_1618 = local_1618 + lVar67;
                  local_15f8 = lVar67 + lVar52;
                  lVar52 = lVar52 + lVar67;
                  local_1698 = lVar106 + lVar78 + lVar51 * -8 + lVar67;
                  lVar79 = lVar106 + auStack_bc4._20_8_ * 0x18 + lVar51 * -8 + lVar67;
                  local_1598 = lVar92 + lVar51 * -8 + lVar67;
                  local_1688 = lVar92 + lVar78 + lVar51 * -8 + lVar67;
                  local_1678 = auStack_bc4._20_8_ * 0x18 + lVar92 + lVar51 * -8 + lVar67;
                  local_1680 = lVar92 + auStack_bc4._20_8_ * 0x10 + lVar51 * -8 + lVar67;
                  local_1670 = lVar92 + auStack_bc4._20_8_ * 0x40 + lVar51 * -8 + lVar67;
                  local_1660 = lVar67 + lVar104;
                  lVar104 = lVar104 + lVar67;
                  local_1650 = lVar67 + local_1668;
                  local_1668 = local_1668 + lVar67;
                  local_1640 = lVar67 + local_15e8;
                  local_15e8 = local_15e8 + lVar67;
                  local_15c8 = (double)local_1678;
                  lVar106 = lVar77;
                  lVar78 = lVar88;
                  lVar51 = lVar83;
                  lVar67 = lVar103;
                  lVar76 = lVar102;
                  local_1658 = (double)local_1680;
                  local_1648 = lVar79;
                  local_15f0 = lVar75;
                  local_1588 = local_1688;
                  local_1578 = lVar82;
                  local_1568 = local_1698;
                  do {
                    if ((int)local_a70._vptr_BaseFab <= local_a70.super_DataAllocator.m_arena._4_4_)
                    {
                      lVar92 = 0;
                      do {
                        *(ulong *)(local_1598 + lVar92 * 8) =
                             (ulong)(*(double *)(lVar51 + -8 + lVar92 * 8) +
                                     *(double *)(lVar51 + lVar92 * 8) +
                                     *(double *)(local_1640 + lVar92 * 8) +
                                     *(double *)((long)local_1658 + lVar92 * 8) +
                                     *(double *)(local_1648 + lVar92 * 8) +
                                     *(double *)((long)local_15c8 + lVar92 * 8) +
                                     *(double *)(lVar52 + -8 + lVar92 * 8) +
                                     *(double *)(lVar52 + lVar92 * 8) +
                                     *(double *)(lVar76 + -8 + lVar92 * 8) +
                                     *(double *)(lVar76 + lVar92 * 8) +
                                     *(double *)(lVar67 + -8 + lVar92 * 8) +
                                     *(double *)(lVar67 + lVar92 * 8) +
                                     *(double *)(lVar82 + -8 + lVar92 * 8) +
                                     *(double *)(lVar82 + lVar92 * 8) +
                                     *(double *)(local_1660 + lVar92 * 8) +
                                     *(double *)(local_1568 + lVar92 * 8) +
                                     *(double *)(local_1650 + lVar92 * 8) +
                                     *(double *)(local_1588 + lVar92 * 8) +
                                     *(double *)(local_1690 + -8 + lVar92 * 8) +
                                     *(double *)(local_1690 + lVar92 * 8) +
                                     *(double *)(lVar88 + -8 + lVar92 * 8) +
                                     *(double *)(lVar88 + lVar92 * 8) +
                                     *(double *)(local_1618 + -8 + lVar92 * 8) +
                                     *(double *)(local_1618 + lVar92 * 8) +
                                     *(double *)(lVar77 + -8 + lVar92 * 8) +
                                    *(double *)(lVar77 + lVar92 * 8)) ^ uVar107;
                        *(double *)(local_1670 + lVar92 * 8) =
                             1.0 / ((double)(*(ulong *)(lVar106 + lVar92 * 8) & uVar333) +
                                    (double)(*(ulong *)(lVar106 + -8 + lVar92 * 8) & uVar333) +
                                    (double)(*(ulong *)((long)local_1620 + lVar92 * 8) & uVar333) +
                                    (double)(*(ulong *)((long)local_1620 + -8 + lVar92 * 8) &
                                            uVar333) +
                                    (double)(*(ulong *)(lVar78 + lVar92 * 8) & uVar333) +
                                    (double)(*(ulong *)(lVar78 + -8 + lVar92 * 8) & uVar333) +
                                    (double)(*(ulong *)(local_1518 + lVar92 * 8) & uVar333) +
                                    (double)(*(ulong *)(local_1518 + -8 + lVar92 * 8) & uVar333) +
                                    (double)(*(ulong *)(local_1688 + lVar92 * 8) & uVar333) +
                                    (double)(*(ulong *)(local_1668 + lVar92 * 8) & uVar333) +
                                    (double)(*(ulong *)(local_1698 + lVar92 * 8) & uVar333) +
                                    (double)(*(ulong *)(lVar104 + lVar92 * 8) & uVar333) +
                                    (double)(*(ulong *)(local_1578 + lVar92 * 8) & uVar333) +
                                    (double)(*(ulong *)(local_1578 + -8 + lVar92 * 8) & uVar333) +
                                    (double)(*(ulong *)(lVar103 + lVar92 * 8) & uVar333) +
                                    (double)(*(ulong *)(lVar103 + -8 + lVar92 * 8) & uVar333) +
                                    (double)(*(ulong *)(lVar102 + lVar92 * 8) & uVar333) +
                                    (double)(*(ulong *)(lVar102 + -8 + lVar92 * 8) & uVar333) +
                                    (double)(*(ulong *)(local_15f8 + lVar92 * 8) & uVar333) +
                                    (double)(*(ulong *)(local_15f8 + -8 + lVar92 * 8) & uVar333) +
                                    (double)(*(ulong *)(local_1678 + lVar92 * 8) & uVar333) +
                                    (double)(*(ulong *)(lVar79 + lVar92 * 8) & uVar333) +
                                    (double)(*(ulong *)(local_1680 + lVar92 * 8) & uVar333) +
                                    (double)(*(ulong *)(local_15e8 + lVar92 * 8) & uVar333) +
                                    (double)(*(ulong *)(lVar83 + lVar92 * 8) & uVar333) +
                                    (double)(*(ulong *)(lVar83 + -8 + lVar92 * 8) & uVar333) +
                                   1e-100);
                        lVar92 = lVar92 + 1;
                      } while ((local_a70.super_DataAllocator.m_arena._4_4_ -
                               (int)local_a70._vptr_BaseFab) + 1 != (int)lVar92);
                    }
                    local_15f0 = local_15f0 + 1;
                    lVar78 = lVar78 + lVar53;
                    lVar103 = lVar103 + lVar53;
                    lVar106 = lVar106 + lVar53;
                    local_1578 = local_1578 + lVar53;
                    lVar102 = lVar102 + lVar53;
                    lVar83 = lVar83 + lVar53;
                    local_1518 = local_1518 + lVar53;
                    local_1620 = (double)((long)local_1620 + lVar53);
                    local_15f8 = local_15f8 + lVar53;
                    lVar88 = lVar88 + lVar53;
                    lVar67 = lVar67 + lVar53;
                    lVar77 = lVar77 + lVar53;
                    lVar82 = lVar82 + lVar53;
                    lVar76 = lVar76 + lVar53;
                    lVar51 = lVar51 + lVar53;
                    local_1690 = local_1690 + lVar53;
                    local_1618 = local_1618 + lVar53;
                    lVar52 = lVar52 + lVar53;
                    local_1568 = local_1568 + lVar53;
                    local_1648 = local_1648 + lVar53;
                    local_1598 = local_1598 + lVar53;
                    local_1588 = local_1588 + lVar53;
                    local_15c8 = (double)((long)local_15c8 + lVar53);
                    local_1658 = (double)((long)local_1658 + lVar53);
                    local_1660 = local_1660 + lVar53;
                    local_1650 = local_1650 + lVar53;
                    local_1640 = local_1640 + lVar53;
                    local_1698 = local_1698 + lVar53;
                    lVar79 = lVar79 + lVar53;
                    local_1670 = local_1670 + lVar53;
                    local_1688 = local_1688 + lVar53;
                    local_1678 = local_1678 + lVar53;
                    local_1680 = local_1680 + lVar53;
                    lVar104 = lVar104 + lVar53;
                    local_1668 = local_1668 + lVar53;
                    local_15e8 = local_15e8 + lVar53;
                  } while ((int)local_a70.dptr + 1 != (int)local_15f0);
                }
                iVar48 = iVar48 + 1;
                bVar108 = iVar63 != local_a70.dptr._4_4_;
                iVar63 = iVar63 + 1;
              } while (bVar108);
            }
            if ((_Head_base<0UL,_amrex::MultiFab_*,_false>)
                *(_Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_> *)
                 &(local_ca8->
                  super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                  ).
                  super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar72]._M_t.
                  super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> !=
                (MultiFab *)0x0) {
              FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                        ((Array4<double> *)local_dd8,
                         (FabArray<amrex::FArrayBox> *)
                         (local_ca8->
                         super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                         ).
                         super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar72]._M_t.
                         super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
                         ,(MFIter *)local_1e8);
              uVar107 = (ulong)DAT_00697990;
              uVar333 = (ulong)DAT_00698470;
              if ((int)local_a70.super_DataAllocator.m_arena <= local_a70.dptr._4_4_) {
                lVar75 = (long)local_a70._vptr_BaseFab._4_4_;
                local_14b8._0_4_ = (int)local_a70.dptr + 1;
                iVar48 = (int)local_a70.super_DataAllocator.m_arena + -1;
                local_1478._0_8_ = lVar75 + -1;
                iVar63 = (int)local_a70.super_DataAllocator.m_arena;
                do {
                  if (local_a70._vptr_BaseFab._4_4_ <= (int)local_a70.dptr) {
                    lVar51 = CONCAT44(iStack_dbc,iStack_dc0);
                    lVar53 = CONCAT44(local_dd8._12_4_,local_dd8._8_4_) * 8;
                    lVar92 = (lVar75 - iStack_db4) * lVar53;
                    lVar76 = ((long)iVar48 - (long)local_db0) * local_dd8._16_8_ * 8;
                    lVar106 = lVar92 + lVar76;
                    lVar102 = lVar51 * 0x38;
                    lVar78 = ((long)iVar63 - (long)local_db0) * local_dd8._16_8_ * 8;
                    lVar92 = lVar92 + lVar78;
                    lVar77 = ((lVar75 + -1) - (long)iStack_db4) * lVar53;
                    lVar76 = lVar76 + lVar77;
                    lVar77 = lVar77 + lVar78;
                    lVar78 = lVar51 * 0x30;
                    lVar67 = (long)local_db8;
                    local_1690 = lVar76 + lVar102 + lVar67 * -8;
                    local_1618 = lVar102 + lVar77 + lVar67 * -8;
                    lVar52 = lVar51 * 0x20 + lVar77 + lVar67 * -8;
                    lVar104 = lVar76 + lVar78 + lVar67 * -8;
                    local_1668 = lVar78 + lVar77 + lVar67 * -8;
                    local_15e8 = lVar51 * 0x10 + lVar77 + lVar67 * -8;
                    lVar76 = CONCAT71(local_dd8._1_7_,local_dd8[0]) +
                             (long)(int)local_a70._vptr_BaseFab * 8;
                    lVar88 = lVar106 + lVar102 + lVar67 * -8 + lVar76;
                    lVar103 = lVar106 + lVar51 * 0x28 + lVar67 * -8 + lVar76;
                    lVar77 = lVar92 + lVar102 + lVar67 * -8 + lVar76;
                    lVar82 = lVar51 * 0x28 + lVar92 + lVar67 * -8 + lVar76;
                    lVar102 = lVar92 + lVar51 * 0x20 + lVar67 * -8 + lVar76;
                    lVar83 = lVar92 + lVar51 * 8 + lVar67 * -8 + lVar76;
                    local_1518 = lVar76 + local_1690;
                    local_1690 = local_1690 + lVar76;
                    local_1620 = (double)(lVar76 + local_1618);
                    local_1618 = local_1618 + lVar76;
                    local_15f8 = lVar76 + lVar52;
                    lVar52 = lVar52 + lVar76;
                    local_1698 = lVar106 + lVar78 + lVar67 * -8 + lVar76;
                    lVar79 = lVar106 + lVar51 * 0x18 + lVar67 * -8 + lVar76;
                    local_1598 = lVar92 + lVar67 * -8 + lVar76;
                    local_1688 = lVar92 + lVar78 + lVar67 * -8 + lVar76;
                    local_1678 = lVar51 * 0x18 + lVar92 + lVar67 * -8 + lVar76;
                    local_1680 = lVar92 + lVar51 * 0x10 + lVar67 * -8 + lVar76;
                    local_1670 = lVar92 + lVar51 * 0x40 + lVar67 * -8 + lVar76;
                    local_1660 = lVar76 + lVar104;
                    lVar104 = lVar104 + lVar76;
                    local_1650 = lVar76 + local_1668;
                    local_1668 = local_1668 + lVar76;
                    local_1640 = lVar76 + local_15e8;
                    local_15e8 = local_15e8 + lVar76;
                    local_15c8 = (double)local_1678;
                    lVar106 = lVar77;
                    lVar78 = lVar88;
                    lVar51 = lVar83;
                    lVar67 = lVar103;
                    lVar76 = lVar102;
                    local_1658 = (double)local_1680;
                    local_1648 = lVar79;
                    local_15f0 = lVar75;
                    local_1588 = local_1688;
                    local_1578 = lVar82;
                    local_1568 = local_1698;
                    do {
                      if ((int)local_a70._vptr_BaseFab <=
                          local_a70.super_DataAllocator.m_arena._4_4_) {
                        lVar92 = 0;
                        do {
                          *(ulong *)(local_1598 + lVar92 * 8) =
                               (ulong)(*(double *)(lVar51 + -8 + lVar92 * 8) +
                                       *(double *)(lVar51 + lVar92 * 8) +
                                       *(double *)(local_1640 + lVar92 * 8) +
                                       *(double *)((long)local_1658 + lVar92 * 8) +
                                       *(double *)(local_1648 + lVar92 * 8) +
                                       *(double *)((long)local_15c8 + lVar92 * 8) +
                                       *(double *)(lVar52 + -8 + lVar92 * 8) +
                                       *(double *)(lVar52 + lVar92 * 8) +
                                       *(double *)(lVar76 + -8 + lVar92 * 8) +
                                       *(double *)(lVar76 + lVar92 * 8) +
                                       *(double *)(lVar67 + -8 + lVar92 * 8) +
                                       *(double *)(lVar67 + lVar92 * 8) +
                                       *(double *)(lVar82 + -8 + lVar92 * 8) +
                                       *(double *)(lVar82 + lVar92 * 8) +
                                       *(double *)(local_1660 + lVar92 * 8) +
                                       *(double *)(local_1568 + lVar92 * 8) +
                                       *(double *)(local_1650 + lVar92 * 8) +
                                       *(double *)(local_1588 + lVar92 * 8) +
                                       *(double *)(local_1690 + -8 + lVar92 * 8) +
                                       *(double *)(local_1690 + lVar92 * 8) +
                                       *(double *)(lVar88 + -8 + lVar92 * 8) +
                                       *(double *)(lVar88 + lVar92 * 8) +
                                       *(double *)(local_1618 + -8 + lVar92 * 8) +
                                       *(double *)(local_1618 + lVar92 * 8) +
                                       *(double *)(lVar77 + -8 + lVar92 * 8) +
                                      *(double *)(lVar77 + lVar92 * 8)) ^ uVar107;
                          *(double *)(local_1670 + lVar92 * 8) =
                               1.0 / ((double)(*(ulong *)(lVar106 + lVar92 * 8) & uVar333) +
                                      (double)(*(ulong *)(lVar106 + -8 + lVar92 * 8) & uVar333) +
                                      (double)(*(ulong *)((long)local_1620 + lVar92 * 8) & uVar333)
                                      + (double)(*(ulong *)((long)local_1620 + -8 + lVar92 * 8) &
                                                uVar333) +
                                        (double)(*(ulong *)(lVar78 + lVar92 * 8) & uVar333) +
                                        (double)(*(ulong *)(lVar78 + -8 + lVar92 * 8) & uVar333) +
                                        (double)(*(ulong *)(local_1518 + lVar92 * 8) & uVar333) +
                                        (double)(*(ulong *)(local_1518 + -8 + lVar92 * 8) & uVar333)
                                        + (double)(*(ulong *)(local_1688 + lVar92 * 8) & uVar333) +
                                          (double)(*(ulong *)(local_1668 + lVar92 * 8) & uVar333) +
                                          (double)(*(ulong *)(local_1698 + lVar92 * 8) & uVar333) +
                                          (double)(*(ulong *)(lVar104 + lVar92 * 8) & uVar333) +
                                          (double)(*(ulong *)(local_1578 + lVar92 * 8) & uVar333) +
                                          (double)(*(ulong *)(local_1578 + -8 + lVar92 * 8) &
                                                  uVar333) +
                                          (double)(*(ulong *)(lVar103 + lVar92 * 8) & uVar333) +
                                          (double)(*(ulong *)(lVar103 + -8 + lVar92 * 8) & uVar333)
                                          + (double)(*(ulong *)(lVar102 + lVar92 * 8) & uVar333) +
                                            (double)(*(ulong *)(lVar102 + -8 + lVar92 * 8) & uVar333
                                                    ) +
                                            (double)(*(ulong *)(local_15f8 + lVar92 * 8) & uVar333)
                                            + (double)(*(ulong *)(local_15f8 + -8 + lVar92 * 8) &
                                                      uVar333) +
                                              (double)(*(ulong *)(local_1678 + lVar92 * 8) & uVar333
                                                      ) +
                                              (double)(*(ulong *)(lVar79 + lVar92 * 8) & uVar333) +
                                              (double)(*(ulong *)(local_1680 + lVar92 * 8) & uVar333
                                                      ) +
                                              (double)(*(ulong *)(local_15e8 + lVar92 * 8) & uVar333
                                                      ) +
                                              (double)(*(ulong *)(lVar83 + lVar92 * 8) & uVar333) +
                                              (double)(*(ulong *)(lVar83 + -8 + lVar92 * 8) &
                                                      uVar333) + 1e-100);
                          lVar92 = lVar92 + 1;
                        } while ((local_a70.super_DataAllocator.m_arena._4_4_ -
                                 (int)local_a70._vptr_BaseFab) + 1 != (int)lVar92);
                      }
                      local_15f0 = local_15f0 + 1;
                      lVar78 = lVar78 + lVar53;
                      lVar103 = lVar103 + lVar53;
                      lVar106 = lVar106 + lVar53;
                      local_1578 = local_1578 + lVar53;
                      lVar102 = lVar102 + lVar53;
                      lVar83 = lVar83 + lVar53;
                      local_1518 = local_1518 + lVar53;
                      local_1620 = (double)((long)local_1620 + lVar53);
                      local_15f8 = local_15f8 + lVar53;
                      lVar88 = lVar88 + lVar53;
                      lVar67 = lVar67 + lVar53;
                      lVar77 = lVar77 + lVar53;
                      lVar82 = lVar82 + lVar53;
                      lVar76 = lVar76 + lVar53;
                      lVar51 = lVar51 + lVar53;
                      local_1690 = local_1690 + lVar53;
                      local_1618 = local_1618 + lVar53;
                      lVar52 = lVar52 + lVar53;
                      local_1568 = local_1568 + lVar53;
                      local_1648 = local_1648 + lVar53;
                      local_1598 = local_1598 + lVar53;
                      local_1588 = local_1588 + lVar53;
                      local_15c8 = (double)((long)local_15c8 + lVar53);
                      local_1658 = (double)((long)local_1658 + lVar53);
                      local_1660 = local_1660 + lVar53;
                      local_1650 = local_1650 + lVar53;
                      local_1640 = local_1640 + lVar53;
                      local_1698 = local_1698 + lVar53;
                      lVar79 = lVar79 + lVar53;
                      local_1670 = local_1670 + lVar53;
                      local_1688 = local_1688 + lVar53;
                      local_1678 = local_1678 + lVar53;
                      local_1680 = local_1680 + lVar53;
                      lVar104 = lVar104 + lVar53;
                      local_1668 = local_1668 + lVar53;
                      local_15e8 = local_15e8 + lVar53;
                    } while ((int)local_a70.dptr + 1 != (int)local_15f0);
                  }
                  iVar48 = iVar48 + 1;
                  bVar108 = iVar63 != local_a70.dptr._4_4_;
                  iVar63 = iVar63 + 1;
                } while (bVar108);
              }
            }
            MFIter::operator++((MFIter *)local_1e8);
          } while ((int)local_1e8._32_4_ < (int)local_1e8._40_4_);
        }
        MFIter::~MFIter((MFIter *)local_1e8);
        pGVar29 = local_c18;
        pFVar25 = (FabArray<amrex::FArrayBox> *)
                  **(undefined8 **)
                    ((long)&(((local_e50->
                              super_vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                              ).
                              super__Vector_base<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                            super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                            ).
                            super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                    + local_ef8 * 8);
        PVar704 = Geometry::periodicity(local_c18);
        local_1e8._0_8_ = PVar704.period.vect._0_8_;
        local_1e8._8_4_ = PVar704.period.vect[2];
        FabArray<amrex::FArrayBox>::FillBoundary<double>(pFVar25,(Periodicity *)local_1e8,false);
        tVar28.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
        super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
             *(_Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_> *)
              &(local_ca8->
               super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
               ).
               super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar72]._M_t.
               super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>;
        if (tVar28.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
            super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl !=
            (_Head_base<0UL,_amrex::MultiFab_*,_false>)0x0) {
          PVar704 = Geometry::periodicity(pGVar29);
          local_1e8._0_8_ = PVar704.period.vect._0_8_;
          local_1e8._8_4_ = PVar704.period.vect[2];
          FabArray<amrex::FArrayBox>::FillBoundary<double>
                    ((FabArray<amrex::FArrayBox> *)
                     tVar28.
                     super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                     .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,
                     (Periodicity *)local_1e8,false);
        }
        if (1 < (this->super_MLNodeLinOp).super_MLLinOp.m_num_mg_levels.
                super_vector<int,_std::allocator<int>_>.
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start[uVar72]) {
          lVar75 = 1;
          do {
            lVar106 = *(long *)((long)&(((local_e50->
                                         super_vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                                         ).
                                         super__Vector_base<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->
                                       super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                                       ).
                                       super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                               + local_ef8 * 8);
            pFVar25 = *(FabArray<amrex::FArrayBox> **)(lVar106 + -8 + lVar75 * 8);
            fabarray_ = *(FabArray<amrex::FArrayBox> **)(lVar106 + lVar75 * 8);
            pDVar26 = &(pFVar25->super_FabArrayBase).distributionMap;
            local_318 = lVar75;
            bVar108 = DistributionMapping::operator==
                                (&(fabarray_->super_FabArrayBase).distributionMap,pDVar26);
            bVar109 = (fabarray_->super_FabArrayBase).boxarray.m_ref.
                      super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                      (pFVar25->super_FabArrayBase).boxarray.m_ref.
                      super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            local_4a0 = pFVar25;
            MultiFab::MultiFab((MultiFab *)local_1e8);
            pFVar25 = local_4a0;
            local_320 = fabarray_;
            if (bVar109 || !bVar108) {
              amrex::coarsen((BoxArray *)&local_bc8,&(local_4a0->super_FabArrayBase).boxarray,2);
              local_dd8._1_7_ = 0;
              local_dd8[0] = true;
              iStack_dc0 = 0;
              iStack_dbc = 0;
              local_db8 = 0;
              iStack_db4 = 0;
              local_dd8._8_4_ = 0;
              local_dd8._12_4_ = 0;
              local_dd8._16_8_ = (element_type *)0x0;
              local_a70._vptr_BaseFab = (_func_int **)&PTR__FabFactory_0074e8d0;
              MultiFab::define((MultiFab *)local_1e8,(BoxArray *)&local_bc8,pDVar26,
                               (pFVar25->super_FabArrayBase).n_comp,1,(MFInfo *)local_dd8,
                               (FabFactory<amrex::FArrayBox> *)&local_a70);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)(local_dd8 + 0x10));
              FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                        ((FabArray<amrex::FArrayBox> *)local_1e8,0.0,0,local_11c,&local_128);
              BoxArray::~BoxArray((BoxArray *)&local_bc8);
              fabarray_ = (FabArray<amrex::FArrayBox> *)local_1e8;
            }
            local_670 = fabarray_;
            MFIter::MFIter((MFIter *)&local_bc8,&fabarray_->super_FabArrayBase,true);
            while (local_ba8[0] < local_ba8[2]) {
              BATransformer::operator()
                        ((Box *)local_5d0,
                         (BATransformer *)(CONCAT44(auStack_bc4._8_4_,auStack_bc4._4_4_) + 8),
                         (Box *)((long)*(int *)(*(long *)local_ba8._24_8_ + (long)local_ba8[0] * 4)
                                 * 0x1c + **(long **)(CONCAT44(auStack_bc4._8_4_,auStack_bc4._4_4_)
                                                     + 0x50)));
              local_5d0._0_8_ = CONCAT44(SUB84(local_5d0._0_8_,4) + -1,(int)local_5d0._0_8_ + -1);
              local_5d0._8_4_ = local_5d0._8_4_ - 1;
              MFIter::growntilebox((Box *)local_848,(MFIter *)&local_bc8,1);
              uVar107 = CONCAT44(-(uint)(SUB84(local_5d0._0_8_,4) < (int)local_848._4_4_),
                                 -(uint)((int)local_5d0._0_8_ < (int)local_848._0_4_));
              uVar107 = ~uVar107 & local_5d0._0_8_ |
                        CONCAT44(local_848._4_4_,local_848._0_4_) & uVar107;
              local_848._0_4_ = (undefined4)uVar107;
              local_848._4_4_ = (undefined4)(uVar107 >> 0x20);
              uVar73 = local_5d0._8_4_;
              if ((int)local_5d0._8_4_ < (int)uStack_840) {
                uVar73 = uStack_840;
              }
              uVar107 = CONCAT44(-(uint)((int)local_838 < local_5c0),
                                 -(uint)(OStack_83c.val < OStack_5c4.val));
              uVar107 = ~uVar107 & CONCAT44(local_5c0,OStack_5c4.val) |
                        CONCAT44(local_838,OStack_83c.val) & uVar107;
              OStack_83c.val = (int)uVar107;
              local_838 = (uint)(uVar107 >> 0x20);
              iVar48 = iStack_5bc;
              if (iStack_834 < iStack_5bc) {
                iVar48 = iStack_834;
              }
              uStack_840 = uVar73;
              iStack_834 = iVar48;
              FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                        ((Array4<double> *)local_dd8,local_670,(MFIter *)&local_bc8);
              FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                        ((Array4<const_double> *)&local_a70,local_4a0,(MFIter *)&local_bc8);
              local_668 = (ulong)uStack_840;
              local_604 = iStack_834;
              if ((int)uStack_840 <= iStack_834) {
                local_2a0 = (ulong)(uint)OStack_83c.val;
                local_310 = (ulong)local_838;
                local_498 = (long)(int)local_848._4_4_;
                local_490 = (long)(int)local_848._0_4_;
                local_5fc = OStack_83c.val + 1;
                local_600 = local_838 + 1;
                auVar343 = _DAT_00698470;
                do {
                  iVar48 = (int)local_668;
                  if ((int)local_848._4_4_ <= (int)local_838) {
                    lVar106 = CONCAT44(local_a70.dptr._4_4_,(int)local_a70.dptr);
                    lVar76 = ((iVar48 * 2 + -1) - local_a70.domain.bigend.vect[1]) * lVar106;
                    iVar63 = iVar48 * 2 - local_a70.domain.bigend.vect[1];
                    uVar73 = ~local_a70.domain.bigend.vect[1];
                    lVar53 = (int)(uVar73 + iVar48 * 2 + -1) * lVar106;
                    lVar102 = lVar106 * iVar63;
                    lVar77 = ((iVar48 * 2 + 1) - local_a70.domain.bigend.vect[1]) * lVar106;
                    lVar52 = (int)(uVar73 + iVar48 * 2 + 1) * lVar106;
                    local_868 = (double)((int)(uVar73 + iVar48 * 2) * lVar106);
                    lVar67 = (iVar63 + -2) * lVar106;
                    lVar75 = CONCAT44(iStack_dbc,iStack_dc0);
                    local_2c0 = ((long)iVar48 - (long)local_db0) * local_dd8._16_8_ * 8 +
                                CONCAT71(local_dd8._1_7_,local_dd8[0]);
                    local_2a8 = local_2c0 + lVar75 * 8;
                    lVar106 = (iVar63 + 2) * lVar106;
                    local_2c8 = lVar75 * 0x10 + local_2c0;
                    local_2b8 = lVar75 * 0x20 + local_2c0;
                    local_2d0 = local_2c0 + lVar75 * 0x28;
                    local_2d8 = local_2c0 + lVar75 * 0x18;
                    local_2b0 = lVar75 * 0x30 + local_2c0;
                    local_2c0 = lVar75 * 0x38 + local_2c0;
                    local_2e0 = (long)local_a70.domain.bigend.vect[0];
                    uVar73 = ~local_a70.domain.bigend.vect[0];
                    local_2e8 = (ulong)uVar73;
                    lVar78 = CONCAT44(local_a70.domain.smallend.vect[1],
                                      local_a70.domain.smallend.vect[0]);
                    lVar51 = (long)local_a70.domain.smallend.vect[2];
                    uVar64 = ~local_a70.domain.smallend.vect[2];
                    local_2f0 = local_a70._vptr_BaseFab;
                    lVar75 = CONCAT44(local_a70.super_DataAllocator.m_arena._4_4_,
                                      (int)local_a70.super_DataAllocator.m_arena);
                    local_298 = (long)local_db8;
                    local_300 = (long)iStack_db4;
                    local_308 = CONCAT44(local_dd8._12_4_,local_dd8._8_4_);
                    local_660 = local_498;
                    dVar469 = local_e98;
                    do {
                      if ((int)local_848._0_4_ <= OStack_83c.val) {
                        lVar103 = local_660 * 2 + -1;
                        lVar79 = (lVar103 - local_2e0) * lVar75;
                        local_460 = local_a70._vptr_BaseFab + (int)((int)lVar103 + uVar73) * lVar75;
                        lVar82 = (local_660 * 2 - local_2e0) * lVar75;
                        lVar103 = local_660 * 2 + 1;
                        lVar83 = (lVar103 - local_2e0) * lVar75;
                        iVar63 = (int)lVar103;
                        lVar92 = (int)(iVar63 + uVar73) * lVar75;
                        iVar74 = (int)(local_660 * 2);
                        local_9f8 = local_a70._vptr_BaseFab + (int)(iVar74 + uVar73) * lVar75;
                        iVar74 = iVar74 + -2;
                        local_230 = local_a70._vptr_BaseFab +
                                    (iVar74 - local_a70.domain.bigend.vect[0]) * lVar75;
                        local_468 = local_a70._vptr_BaseFab +
                                    (iVar63 - local_a70.domain.bigend.vect[0]) * lVar75;
                        lVar104 = (local_660 - local_300) * local_308;
                        lVar103 = local_660 * 2 + 2;
                        lVar89 = (lVar103 - local_2e0) * lVar75;
                        local_238 = local_a70._vptr_BaseFab +
                                    (iVar63 - local_a70.domain.bigend.vect[0]) * lVar75;
                        local_480 = local_a70._vptr_BaseFab +
                                    (iVar74 - local_a70.domain.bigend.vect[0]) * lVar75;
                        local_488 = local_a70._vptr_BaseFab +
                                    (iVar63 - local_a70.domain.bigend.vect[0]) * lVar75;
                        local_470 = local_a70._vptr_BaseFab +
                                    (iVar63 - local_a70.domain.bigend.vect[0]) * lVar75;
                        local_610 = local_a70._vptr_BaseFab +
                                    (iVar74 - local_a70.domain.bigend.vect[0]) * lVar75;
                        local_478 = local_a70._vptr_BaseFab +
                                    (iVar63 - local_a70.domain.bigend.vect[0]) * lVar75;
                        local_618 = local_a70._vptr_BaseFab +
                                    (iVar63 - local_a70.domain.bigend.vect[0]) * lVar75;
                        lVar88 = (int)((int)lVar103 + uVar73) * lVar75;
                        local_ca0 = local_a70._vptr_BaseFab +
                                    (iVar63 - local_a70.domain.bigend.vect[0]) * lVar75;
                        local_240 = local_2a8 + lVar104 * 8;
                        local_248 = local_2c8 + lVar104 * 8;
                        local_250 = local_2d8 + lVar104 * 8;
                        local_258 = local_2b8 + lVar104 * 8;
                        local_260 = local_2d0 + lVar104 * 8;
                        local_268 = local_2b0 + lVar104 * 8;
                        local_270 = local_2c0 + lVar104 * 8;
                        local_278 = local_480 + lVar102;
                        local_280 = local_488 + lVar102;
                        local_288 = local_610 + lVar102;
                        local_290 = local_618 + lVar102;
                        lVar103 = local_490;
                        do {
                          lVar104 = lVar103 * 2 + 1;
                          lVar70 = lVar104 - lVar51;
                          p_Var54 = local_a70._vptr_BaseFab[lVar79 + lVar70 + lVar76 + lVar78];
                          uVar428 = auVar343._0_4_;
                          uVar228 = (uint)local_a70._vptr_BaseFab
                                          [lVar79 + lVar70 + lVar53 + lVar78 * 7] & uVar428;
                          uVar464 = auVar343._4_4_;
                          uVar280 = (uint)((ulong)local_a70._vptr_BaseFab
                                                  [lVar79 + lVar70 + lVar53 + lVar78 * 7] >> 0x20) &
                                    uVar464;
                          uVar465 = auVar343._8_4_;
                          uVar468 = auVar343._12_4_;
                          p_Var97 = local_a70._vptr_BaseFab[lVar79 + lVar70 + lVar76 + lVar78 * 2];
                          iVar63 = (int)lVar104;
                          lVar93 = (long)(int)(iVar63 + uVar64);
                          uVar119 = (uint)local_a70._vptr_BaseFab
                                          [lVar79 + lVar93 + lVar76 + lVar78 * 7] & uVar428;
                          uVar181 = (uint)((ulong)local_a70._vptr_BaseFab
                                                  [lVar79 + lVar93 + lVar76 + lVar78 * 7] >> 0x20) &
                                    uVar464;
                          dVar469 = (double)CONCAT44(uVar181,uVar119);
                          p_Var100 = local_a70._vptr_BaseFab[lVar79 + lVar70 + lVar76 + lVar78 * 3];
                          p_Var2 = local_a70._vptr_BaseFab[lVar79 + lVar70 + lVar76 + lVar78 * 4];
                          p_Var3 = local_a70._vptr_BaseFab[lVar79 + lVar70 + lVar76 + lVar78 * 5];
                          p_Var4 = local_a70._vptr_BaseFab[lVar79 + lVar70 + lVar76 + lVar78 * 6];
                          uVar182 = (uint)local_a70._vptr_BaseFab
                                          [lVar79 + lVar70 + lVar76 + lVar78 * 7] & uVar428;
                          uVar225 = (uint)((ulong)local_a70._vptr_BaseFab
                                                  [lVar79 + lVar70 + lVar76 + lVar78 * 7] >> 0x20) &
                                    uVar464;
                          auVar187._0_8_ = (double)CONCAT44(uVar225,uVar182);
                          auVar187._8_4_ = (uint)local_460[lVar70 + lVar76 + lVar78 * 7] & uVar465;
                          auVar187._12_4_ =
                               (uint)((ulong)local_460[lVar70 + lVar76 + lVar78 * 7] >> 0x20) &
                               uVar468;
                          uVar114 = auVar343._0_8_;
                          uVar107 = auVar343._8_8_;
                          dVar550 = (double)CONCAT44(auVar187._12_4_,auVar187._8_4_);
                          auVar340._0_4_ = (uint)p_Var54 & uVar428;
                          auVar340._4_4_ = (uint)((ulong)p_Var54 >> 0x20) & uVar464;
                          auVar340._8_4_ = (uint)p_Var97 & uVar465;
                          auVar340._12_4_ = (uint)((ulong)p_Var97 >> 0x20) & uVar468;
                          auVar474._0_8_ =
                               (double)CONCAT44((uint)((ulong)local_460[lVar70 + lVar53 + lVar78 * 7
                                                                       ] >> 0x20) & uVar464,
                                                (uint)local_460[lVar70 + lVar53 + lVar78 * 7] &
                                                uVar428);
                          auVar474._8_4_ =
                               (uint)local_a70._vptr_BaseFab[lVar79 + lVar93 + lVar53 + lVar78 * 7]
                               & uVar465;
                          auVar474._12_4_ =
                               (uint)((ulong)local_a70._vptr_BaseFab
                                             [lVar79 + lVar93 + lVar53 + lVar78 * 7] >> 0x20) &
                               uVar468;
                          auVar516._0_8_ = (double)CONCAT44(uVar280,uVar228);
                          auVar516._8_4_ = uVar228;
                          auVar516._12_4_ = uVar280;
                          auVar475._0_8_ = (double)CONCAT44(auVar187._12_4_,auVar187._8_4_);
                          auVar475._8_4_ = uVar119;
                          auVar475._12_4_ = uVar181;
                          auVar517._0_8_ = (double)CONCAT44(uVar225,uVar182);
                          auVar517._8_4_ = uVar182;
                          auVar517._12_4_ = uVar225;
                          auVar476._0_8_ =
                               auVar475._0_8_ + auVar516._0_8_ + auVar474._0_8_ + auVar517._0_8_ +
                               1e-100;
                          auVar476._8_8_ =
                               auVar475._8_8_ + auVar516._8_8_ + auVar474._8_8_ + auVar517._8_8_ +
                               1e-100;
                          auVar341 = divpd(auVar340,auVar476);
                          auVar623._0_4_ = (uint)p_Var2 & uVar428;
                          auVar623._4_4_ = (uint)((ulong)p_Var2 >> 0x20) & uVar464;
                          auVar623._8_4_ = (uint)p_Var100 & uVar465;
                          auVar623._12_4_ = (uint)((ulong)p_Var100 >> 0x20) & uVar468;
                          auVar231._0_8_ =
                               (double)CONCAT44(uVar280,uVar228) + auVar517._0_8_ + 1e-100;
                          auVar231._8_8_ =
                               dVar550 + (double)CONCAT44((uint)((ulong)local_460[lVar93 + lVar76 + 
                                                  lVar78 * 7] >> 0x20) & uVar464,
                                                  (uint)local_460[lVar93 + lVar76 + lVar78 * 7] &
                                                  uVar428) + dVar469 + auVar517._8_8_ + 1e-100;
                          auVar186 = divpd(auVar623,auVar231);
                          auVar342._0_4_ = (uint)p_Var4 & uVar428;
                          auVar342._4_4_ = (uint)((ulong)p_Var4 >> 0x20) & uVar464;
                          auVar342._8_4_ = (uint)p_Var3 & uVar465;
                          auVar342._12_4_ = (uint)((ulong)p_Var3 >> 0x20) & uVar468;
                          auVar343._0_8_ = dVar469 + auVar187._0_8_ + 1e-100;
                          auVar343._8_8_ = auVar187._0_8_ + auVar187._8_8_ + 1e-100;
                          auVar343 = divpd(auVar342,auVar343);
                          dVar513 = (double)local_a70._vptr_BaseFab
                                            [lVar79 + lVar70 + lVar76 + lVar78 * 8] * auVar187._0_8_
                                    * (auVar343._8_8_ +
                                       auVar186._8_8_ + auVar341._8_8_ + auVar341._0_8_ + 1.0 +
                                       auVar186._0_8_ + auVar343._0_8_);
                          lVar104 = lVar103 * 2 + 2;
                          lVar57 = lVar104 - lVar51;
                          dVar121 = (double)CONCAT44((uint)((ulong)local_460[lVar57 + lVar53 + 
                                                  lVar78 * 6] >> 0x20) & uVar464,
                                                  (uint)local_460[lVar57 + lVar53 + lVar78 * 6] &
                                                  uVar428);
                          dVar550 = (double)CONCAT44((uint)((ulong)local_460[lVar57 + lVar76 + 
                                                  lVar78 * 6] >> 0x20) & uVar464,
                                                  (uint)local_460[lVar57 + lVar76 + lVar78 * 6] &
                                                  uVar428);
                          dVar122 = (double)CONCAT44((uint)((ulong)local_a70._vptr_BaseFab
                                                                   [lVar79 + lVar57 + lVar53 + 
                                                  lVar78 * 6] >> 0x20) & uVar464,
                                                  (uint)local_a70._vptr_BaseFab
                                                        [lVar79 + lVar57 + lVar53 + lVar78 * 6] &
                                                  uVar428);
                          dVar229 = (double)CONCAT44((uint)((ulong)local_a70._vptr_BaseFab
                                                                   [lVar79 + lVar57 + lVar76 + 
                                                  lVar78 * 6] >> 0x20) & uVar464,
                                                  (uint)local_a70._vptr_BaseFab
                                                        [lVar79 + lVar57 + lVar76 + lVar78 * 6] &
                                                  uVar428);
                          dVar334 = (double)CONCAT44((uint)((ulong)local_a70._vptr_BaseFab
                                                                   [lVar79 + lVar57 + lVar53 + 
                                                  lVar78 * 3] >> 0x20) & uVar464,
                                                  (uint)local_a70._vptr_BaseFab
                                                        [lVar79 + lVar57 + lVar53 + lVar78 * 3] &
                                                  uVar428) / (dVar121 + dVar122 + 1e-100);
                          dVar120 = (double)CONCAT44((uint)((ulong)local_a70._vptr_BaseFab
                                                                   [lVar79 + lVar57 + lVar76 + 
                                                  lVar78 * 3] >> 0x20) & uVar464,
                                                  (uint)local_a70._vptr_BaseFab
                                                        [lVar79 + lVar57 + lVar76 + lVar78 * 3] &
                                                  uVar428) / (dVar550 + dVar229 + 1e-100);
                          dVar469 = (double)CONCAT44((uint)((ulong)local_460[lVar57 + lVar76 + 
                                                  lVar78 * 2] >> 0x20) & uVar464,
                                                  (uint)local_460[lVar57 + lVar76 + lVar78 * 2] &
                                                  uVar428) / (dVar121 + dVar550 + 1e-100) + 1.0;
                          dVar123 = (double)CONCAT44((uint)((ulong)local_a70._vptr_BaseFab
                                                                   [lVar79 + lVar57 + lVar76 + 
                                                  lVar78 * 2] >> 0x20) & uVar464,
                                                  (uint)local_a70._vptr_BaseFab
                                                        [lVar79 + lVar57 + lVar76 + lVar78 * 2] &
                                                  uVar428) / (dVar122 + dVar229 + 1e-100) + 1.0;
                          p_Var5 = local_a70._vptr_BaseFab[lVar82 + lVar57 + lVar53 + lVar78 * 3];
                          dVar229 = (dVar123 + dVar120) * dVar229;
                          dVar229 = dVar229 / ((dVar469 + dVar120) * dVar550 +
                                               (dVar334 + dVar123) * dVar122 +
                                               (dVar469 + dVar334) * dVar121 + dVar229 + 1e-100);
                          p_Var6 = local_a70._vptr_BaseFab[lVar82 + lVar70 + lVar76 + lVar78];
                          auVar188._0_4_ = (uint)p_Var6 & uVar428;
                          auVar188._4_4_ = (uint)((ulong)p_Var6 >> 0x20) & uVar464;
                          auVar188._8_4_ =
                               (uint)local_a70._vptr_BaseFab[lVar82 + lVar93 + lVar76 + lVar78] &
                               uVar465;
                          auVar188._12_4_ =
                               (uint)((ulong)local_a70._vptr_BaseFab
                                             [lVar82 + lVar93 + lVar76 + lVar78] >> 0x20) & uVar468;
                          auVar434._0_8_ =
                               (double)CONCAT44((uint)((ulong)local_a70._vptr_BaseFab
                                                              [lVar82 + lVar70 + lVar53 + lVar78 * 5
                                                              ] >> 0x20) & uVar464,
                                                (uint)local_a70._vptr_BaseFab
                                                      [lVar82 + lVar70 + lVar53 + lVar78 * 5] &
                                                uVar428);
                          auVar434._8_4_ =
                               (uint)local_a70._vptr_BaseFab[lVar82 + lVar93 + lVar53 + lVar78 * 5]
                               & uVar465;
                          auVar434._12_4_ =
                               (uint)((ulong)local_a70._vptr_BaseFab
                                             [lVar82 + lVar93 + lVar53 + lVar78 * 5] >> 0x20) &
                               uVar468;
                          auVar232._0_8_ =
                               (double)CONCAT44((uint)((ulong)local_a70._vptr_BaseFab
                                                              [lVar82 + lVar70 + lVar76 + lVar78 * 5
                                                              ] >> 0x20) & uVar464,
                                                (uint)local_a70._vptr_BaseFab
                                                      [lVar82 + lVar70 + lVar76 + lVar78 * 5] &
                                                uVar428);
                          auVar232._8_4_ =
                               (uint)local_a70._vptr_BaseFab[lVar82 + lVar93 + lVar76 + lVar78 * 5]
                               & uVar465;
                          auVar232._12_4_ =
                               (uint)((ulong)local_a70._vptr_BaseFab
                                             [lVar82 + lVar93 + lVar76 + lVar78 * 5] >> 0x20) &
                               uVar468;
                          auVar341._8_4_ = auVar434._8_4_;
                          auVar341._0_8_ = auVar434._0_8_;
                          auVar341._12_4_ = auVar434._12_4_;
                          auVar487._0_8_ = auVar434._0_8_ + auVar232._0_8_ + 1e-100;
                          auVar487._8_8_ = auVar341._8_8_ + auVar232._8_8_ + 1e-100;
                          auVar343 = divpd(auVar188,auVar487);
                          dVar469 = (double)CONCAT44(auVar434._12_4_,auVar434._8_4_);
                          dVar334 = (double)CONCAT44((uint)((ulong)local_a70._vptr_BaseFab
                                                                   [lVar82 + lVar70 + lVar53 + 
                                                  lVar78 * 3] >> 0x20) & uVar464,
                                                  (uint)local_a70._vptr_BaseFab
                                                        [lVar82 + lVar70 + lVar53 + lVar78 * 3] &
                                                  uVar428) / (dVar469 + auVar434._0_8_ + 1e-100);
                          dVar469 = (double)CONCAT44(auVar232._12_4_,auVar232._8_4_);
                          dVar120 = (double)CONCAT44((uint)((ulong)local_a70._vptr_BaseFab
                                                                   [lVar82 + lVar70 + lVar76 + 
                                                  lVar78 * 3] >> 0x20) & uVar464,
                                                  (uint)local_a70._vptr_BaseFab
                                                        [lVar82 + lVar70 + lVar76 + lVar78 * 3] &
                                                  uVar428) / (dVar469 + auVar232._0_8_ + 1e-100);
                          p_Var7 = local_a70._vptr_BaseFab[lVar82 + lVar57 + lVar76 + lVar78 * 3];
                          dVar469 = auVar343._0_8_ + 1.0;
                          dVar550 = auVar343._8_8_ + 1.0;
                          dVar645 = (dVar120 + dVar469) * auVar232._0_8_;
                          dStack_de0 = (dVar120 + dVar550) * auVar232._8_8_;
                          dVar645 = dVar645 / (dStack_de0 +
                                               (dVar334 + dVar550) * auVar434._8_8_ +
                                               (dVar334 + dVar469) * auVar434._0_8_ + dVar645 +
                                              1e-100);
                          dVar469 = (double)CONCAT44((uint)((ulong)p_Var7 >> 0x20) & uVar464,
                                                     (uint)p_Var7 & uVar428);
                          dVar469 = dVar469 / ((double)CONCAT44((uint)((ulong)p_Var5 >> 0x20) &
                                                                uVar464,(uint)p_Var5 & uVar428) +
                                              dVar469);
                          dVar121 = (double)((-(ulong)((double)p_Var7 == 0.0) & 0x3fe0000000000000 |
                                             ~-(ulong)((double)p_Var7 == 0.0) & (ulong)dVar469) &
                                             -(ulong)((double)p_Var5 == 0.0) |
                                            ~-(ulong)((double)p_Var5 == 0.0) & (ulong)dVar469);
                          auVar233._0_4_ =
                               (uint)local_a70._vptr_BaseFab[lVar83 + lVar57 + lVar76 + lVar78 * 2]
                               & uVar428;
                          auVar233._4_4_ =
                               (uint)((ulong)local_a70._vptr_BaseFab
                                             [lVar83 + lVar57 + lVar76 + lVar78 * 2] >> 0x20) &
                               uVar464;
                          auVar233._8_4_ =
                               (uint)local_a70._vptr_BaseFab[lVar92 + lVar57 + lVar76 + lVar78 * 2]
                               & uVar465;
                          auVar233._12_4_ =
                               (uint)((ulong)local_a70._vptr_BaseFab
                                             [lVar92 + lVar57 + lVar76 + lVar78 * 2] >> 0x20) &
                               uVar468;
                          auVar435._0_8_ =
                               (double)CONCAT44((uint)((ulong)local_a70._vptr_BaseFab
                                                              [lVar83 + lVar57 + lVar53 + lVar78 * 6
                                                              ] >> 0x20) & uVar464,
                                                (uint)local_a70._vptr_BaseFab
                                                      [lVar83 + lVar57 + lVar53 + lVar78 * 6] &
                                                uVar428);
                          auVar435._8_4_ =
                               (uint)local_a70._vptr_BaseFab[lVar92 + lVar57 + lVar53 + lVar78 * 6]
                               & uVar465;
                          auVar435._12_4_ =
                               (uint)((ulong)local_a70._vptr_BaseFab
                                             [lVar92 + lVar57 + lVar53 + lVar78 * 6] >> 0x20) &
                               uVar468;
                          auVar344._0_8_ =
                               (double)CONCAT44((uint)((ulong)local_a70._vptr_BaseFab
                                                              [lVar83 + lVar57 + lVar76 + lVar78 * 6
                                                              ] >> 0x20) & uVar464,
                                                (uint)local_a70._vptr_BaseFab
                                                      [lVar83 + lVar57 + lVar76 + lVar78 * 6] &
                                                uVar428);
                          auVar344._8_4_ =
                               (uint)local_a70._vptr_BaseFab[lVar92 + lVar57 + lVar76 + lVar78 * 6]
                               & uVar465;
                          auVar344._12_4_ =
                               (uint)((ulong)local_a70._vptr_BaseFab
                                             [lVar92 + lVar57 + lVar76 + lVar78 * 6] >> 0x20) &
                               uVar468;
                          auVar389._8_4_ = auVar435._8_4_;
                          auVar389._0_8_ = auVar435._0_8_;
                          auVar389._12_4_ = auVar435._12_4_;
                          auVar390._0_8_ = auVar435._0_8_ + auVar344._0_8_ + 1e-100;
                          auVar390._8_8_ = auVar389._8_8_ + auVar344._8_8_ + 1e-100;
                          auVar343 = divpd(auVar233,auVar390);
                          dVar469 = (double)CONCAT44(auVar435._12_4_,auVar435._8_4_);
                          dVar469 = (double)CONCAT44((uint)((ulong)local_a70._vptr_BaseFab
                                                                   [lVar83 + lVar57 + lVar53 + 
                                                  lVar78 * 3] >> 0x20) & uVar464,
                                                  (uint)local_a70._vptr_BaseFab
                                                        [lVar83 + lVar57 + lVar53 + lVar78 * 3] &
                                                  uVar428) / (dVar469 + auVar435._0_8_ + 1e-100);
                          dVar550 = (double)CONCAT44(auVar344._12_4_,auVar344._8_4_);
                          dVar120 = (double)CONCAT44((uint)((ulong)local_a70._vptr_BaseFab
                                                                   [lVar83 + lVar57 + lVar76 + 
                                                  lVar78 * 3] >> 0x20) & uVar464,
                                                  (uint)local_a70._vptr_BaseFab
                                                        [lVar83 + lVar57 + lVar76 + lVar78 * 3] &
                                                  uVar428) / (dVar550 + auVar344._0_8_ + 1e-100);
                          dVar550 = auVar343._0_8_ + 1.0;
                          dVar334 = auVar343._8_8_ + 1.0;
                          dVar184 = (dVar120 + dVar334) * auVar344._8_8_;
                          dVar184 = dVar184 / ((dVar469 + dVar334) * auVar435._8_8_ +
                                               (dVar469 + dVar550) * auVar435._0_8_ + dVar184 +
                                               (dVar120 + dVar550) * auVar344._0_8_ + 1e-100);
                          p_Var5 = local_a70._vptr_BaseFab[lVar79 + lVar70 + lVar102 + lVar78];
                          auVar189._0_4_ = (uint)p_Var5 & uVar428;
                          auVar189._4_4_ = (uint)((ulong)p_Var5 >> 0x20) & uVar464;
                          auVar189._8_4_ =
                               (uint)local_a70._vptr_BaseFab[lVar79 + lVar93 + lVar102 + lVar78] &
                               uVar465;
                          auVar189._12_4_ =
                               (uint)((ulong)local_a70._vptr_BaseFab
                                             [lVar79 + lVar93 + lVar102 + lVar78] >> 0x20) & uVar468
                          ;
                          auVar436._0_8_ =
                               (double)CONCAT44((uint)((ulong)local_460[lVar70 + lVar102 + lVar78 * 
                                                  4] >> 0x20) & uVar464,
                                                (uint)local_460[lVar70 + lVar102 + lVar78 * 4] &
                                                uVar428);
                          auVar436._8_4_ = (uint)local_460[lVar93 + lVar102 + lVar78 * 4] & uVar465;
                          auVar436._12_4_ =
                               (uint)((ulong)local_460[lVar93 + lVar102 + lVar78 * 4] >> 0x20) &
                               uVar468;
                          auVar345._0_8_ =
                               (double)CONCAT44((uint)((ulong)local_a70._vptr_BaseFab
                                                              [lVar79 + lVar70 + lVar102 + lVar78 * 
                                                  4] >> 0x20) & uVar464,
                                                (uint)local_a70._vptr_BaseFab
                                                      [lVar79 + lVar70 + lVar102 + lVar78 * 4] &
                                                uVar428);
                          auVar345._8_4_ =
                               (uint)local_a70._vptr_BaseFab[lVar79 + lVar93 + lVar102 + lVar78 * 4]
                               & uVar465;
                          auVar345._12_4_ =
                               (uint)((ulong)local_a70._vptr_BaseFab
                                             [lVar79 + lVar93 + lVar102 + lVar78 * 4] >> 0x20) &
                               uVar468;
                          auVar391._8_4_ = auVar436._8_4_;
                          auVar391._0_8_ = auVar436._0_8_;
                          auVar391._12_4_ = auVar436._12_4_;
                          auVar392._0_8_ = auVar436._0_8_ + auVar345._0_8_ + 1e-100;
                          auVar392._8_8_ = auVar391._8_8_ + auVar345._8_8_ + 1e-100;
                          auVar343 = divpd(auVar189,auVar392);
                          dVar469 = (double)CONCAT44(auVar436._12_4_,auVar436._8_4_);
                          dVar334 = (double)CONCAT44((uint)((ulong)local_460[lVar70 + lVar102 + 
                                                  lVar78 * 2] >> 0x20) & uVar464,
                                                  (uint)local_460[lVar70 + lVar102 + lVar78 * 2] &
                                                  uVar428) / (dVar469 + auVar436._0_8_ + 1e-100);
                          dVar469 = (double)CONCAT44(auVar345._12_4_,auVar345._8_4_);
                          dVar120 = (double)CONCAT44((uint)((ulong)local_a70._vptr_BaseFab
                                                                   [lVar79 + lVar70 + lVar102 + 
                                                  lVar78 * 2] >> 0x20) & uVar464,
                                                  (uint)local_a70._vptr_BaseFab
                                                        [lVar79 + lVar70 + lVar102 + lVar78 * 2] &
                                                  uVar428) / (dVar469 + auVar345._0_8_ + 1e-100);
                          dVar469 = auVar343._0_8_ + 1.0;
                          dVar550 = auVar343._8_8_ + 1.0;
                          dVar430 = (dVar120 + dVar469) * auVar345._0_8_;
                          p_Var7 = local_460[lVar57 + lVar102 + lVar78 * 2];
                          dVar430 = dVar430 / ((dVar120 + dVar550) * auVar345._8_8_ +
                                               (dVar334 + dVar550) * auVar436._8_8_ +
                                               (dVar334 + dVar469) * auVar436._0_8_ + dVar430 +
                                              1e-100);
                          p_Var8 = local_a70._vptr_BaseFab[lVar79 + lVar57 + lVar102 + lVar78 * 2];
                          dVar469 = (double)CONCAT44((uint)((ulong)p_Var8 >> 0x20) & uVar464,
                                                     (uint)p_Var8 & uVar428);
                          dVar469 = dVar469 / ((double)CONCAT44((uint)((ulong)p_Var7 >> 0x20) &
                                                                uVar464,(uint)p_Var7 & uVar428) +
                                              dVar469);
                          dVar469 = (double)((-(ulong)((double)p_Var8 == 0.0) & 0x3fe0000000000000 |
                                             ~-(ulong)((double)p_Var8 == 0.0) & (ulong)dVar469) &
                                             -(ulong)((double)p_Var7 == 0.0) |
                                            ~-(ulong)((double)p_Var7 == 0.0) & (ulong)dVar469);
                          local_9e8 = local_a70._vptr_BaseFab + lVar82 + lVar93 + lVar102;
                          p_Var7 = local_9e8[lVar78];
                          p_Var8 = local_a70._vptr_BaseFab[lVar82 + lVar70 + lVar102 + lVar78];
                          dVar550 = (double)CONCAT44((uint)((ulong)p_Var8 >> 0x20) & uVar464,
                                                     (uint)p_Var8 & uVar428);
                          dVar550 = dVar550 / ((double)CONCAT44((uint)((ulong)p_Var7 >> 0x20) &
                                                                uVar464,(uint)p_Var7 & uVar428) +
                                              dVar550);
                          p_Var9 = local_a70._vptr_BaseFab[lVar83 + lVar70 + lVar102 + lVar78];
                          dVar550 = (double)((-(ulong)((double)p_Var8 == 0.0) & 0x3fe0000000000000 |
                                             ~-(ulong)((double)p_Var8 == 0.0) & (ulong)dVar550) &
                                             -(ulong)((double)p_Var7 == 0.0) |
                                            ~-(ulong)((double)p_Var7 == 0.0) & (ulong)dVar550);
                          local_858 = local_a70._vptr_BaseFab + lVar92 + lVar93 + lVar102;
                          auVar437._0_4_ = (uint)p_Var9 & uVar428;
                          auVar437._4_4_ = (uint)((ulong)p_Var9 >> 0x20) & uVar464;
                          auVar437._8_4_ =
                               (uint)local_a70._vptr_BaseFab[lVar83 + lVar93 + lVar102 + lVar78] &
                               uVar465;
                          auVar437._12_4_ =
                               (uint)((ulong)local_a70._vptr_BaseFab
                                             [lVar83 + lVar93 + lVar102 + lVar78] >> 0x20) & uVar468
                          ;
                          auVar393._0_8_ =
                               (double)CONCAT44((uint)((ulong)local_a70._vptr_BaseFab
                                                              [lVar92 + lVar70 + lVar102 + lVar78 * 
                                                  4] >> 0x20) & uVar464,
                                                (uint)local_a70._vptr_BaseFab
                                                      [lVar92 + lVar70 + lVar102 + lVar78 * 4] &
                                                uVar428);
                          auVar393._8_4_ = (uint)local_858[lVar78 * 4] & uVar465;
                          auVar393._12_4_ = (uint)((ulong)local_858[lVar78 * 4] >> 0x20) & uVar468;
                          auVar346._0_8_ =
                               (double)CONCAT44((uint)((ulong)local_a70._vptr_BaseFab
                                                              [lVar83 + lVar70 + lVar102 + lVar78 * 
                                                  4] >> 0x20) & uVar464,
                                                (uint)local_a70._vptr_BaseFab
                                                      [lVar83 + lVar70 + lVar102 + lVar78 * 4] &
                                                uVar428);
                          auVar346._8_4_ =
                               (uint)local_a70._vptr_BaseFab[lVar83 + lVar93 + lVar102 + lVar78 * 4]
                               & uVar465;
                          auVar346._12_4_ =
                               (uint)((ulong)local_a70._vptr_BaseFab
                                             [lVar83 + lVar93 + lVar102 + lVar78 * 4] >> 0x20) &
                               uVar468;
                          dVar472 = auVar393._8_8_;
                          auVar394._0_8_ = auVar393._0_8_ + auVar346._0_8_ + 1e-100;
                          auVar394._8_8_ = dVar472 + auVar346._8_8_ + 1e-100;
                          auVar343 = divpd(auVar437,auVar394);
                          dVar334 = (double)CONCAT44(auVar346._12_4_,auVar346._8_4_);
                          dVar470 = (double)CONCAT44((uint)((ulong)local_a70._vptr_BaseFab
                                                                   [lVar83 + lVar70 + lVar102 + 
                                                  lVar78 * 2] >> 0x20) & uVar464,
                                                  (uint)local_a70._vptr_BaseFab
                                                        [lVar83 + lVar70 + lVar102 + lVar78 * 2] &
                                                  uVar428) / (dVar334 + auVar346._0_8_ + 1e-100);
                          dVar431 = auVar343._0_8_ + 1.0;
                          dVar466 = auVar343._8_8_ + 1.0;
                          p_Var7 = local_a70._vptr_BaseFab[lVar92 + lVar57 + lVar102 + lVar78 * 2];
                          dVar334 = (double)CONCAT44((uint)((ulong)p_Var7 >> 0x20) & uVar464,
                                                     (uint)p_Var7 & uVar428);
                          p_Var10 = local_a70._vptr_BaseFab[lVar83 + lVar57 + lVar102 + lVar78 * 2];
                          dVar334 = dVar334 / ((double)CONCAT44((uint)((ulong)p_Var10 >> 0x20) &
                                                                uVar464,(uint)p_Var10 & uVar428) +
                                              dVar334);
                          dVar334 = (double)((-(ulong)((double)p_Var10 == 0.0) & 0x3fe0000000000000
                                             | ~-(ulong)((double)p_Var10 == 0.0) & (ulong)dVar334) &
                                             -(ulong)((double)p_Var7 == 0.0) |
                                            ~-(ulong)((double)p_Var7 == 0.0) & (ulong)dVar334);
                          auVar347._0_4_ =
                               (uint)local_a70._vptr_BaseFab[lVar79 + lVar57 + lVar77 + lVar78 * 2]
                               & uVar428;
                          auVar347._4_4_ =
                               (uint)((ulong)local_a70._vptr_BaseFab
                                             [lVar79 + lVar57 + lVar77 + lVar78 * 2] >> 0x20) &
                               uVar464;
                          auVar347._8_4_ = (uint)local_460[lVar57 + lVar77 + lVar78 * 2] & uVar465;
                          auVar347._12_4_ =
                               (uint)((ulong)local_460[lVar57 + lVar77 + lVar78 * 2] >> 0x20) &
                               uVar468;
                          auVar438._0_8_ =
                               (double)CONCAT44((uint)((ulong)local_a70._vptr_BaseFab
                                                              [lVar79 + lVar57 + lVar52 + lVar78 * 6
                                                              ] >> 0x20) & uVar464,
                                                (uint)local_a70._vptr_BaseFab
                                                      [lVar79 + lVar57 + lVar52 + lVar78 * 6] &
                                                uVar428);
                          auVar438._8_4_ = (uint)local_460[lVar57 + lVar52 + lVar78 * 6] & uVar465;
                          auVar438._12_4_ =
                               (uint)((ulong)local_460[lVar57 + lVar52 + lVar78 * 6] >> 0x20) &
                               uVar468;
                          auVar395._0_8_ =
                               (double)CONCAT44((uint)((ulong)local_a70._vptr_BaseFab
                                                              [lVar79 + lVar57 + lVar77 + lVar78 * 6
                                                              ] >> 0x20) & uVar464,
                                                (uint)local_a70._vptr_BaseFab
                                                      [lVar79 + lVar57 + lVar77 + lVar78 * 6] &
                                                uVar428);
                          auVar395._8_4_ = (uint)local_460[lVar57 + lVar77 + lVar78 * 6] & uVar465;
                          auVar395._12_4_ =
                               (uint)((ulong)local_460[lVar57 + lVar77 + lVar78 * 6] >> 0x20) &
                               uVar468;
                          auVar477._8_4_ = auVar438._8_4_;
                          auVar477._0_8_ = auVar438._0_8_;
                          auVar477._12_4_ = auVar438._12_4_;
                          auVar478._0_8_ = auVar438._0_8_ + auVar395._0_8_ + 1e-100;
                          auVar478._8_8_ = auVar477._8_8_ + auVar395._8_8_ + 1e-100;
                          auVar343 = divpd(auVar347,auVar478);
                          dVar120 = (double)CONCAT44(auVar438._12_4_,auVar438._8_4_);
                          dVar124 = (double)CONCAT44((uint)((ulong)local_a70._vptr_BaseFab
                                                                   [lVar79 + lVar57 + lVar52 + 
                                                  lVar78 * 3] >> 0x20) & uVar464,
                                                  (uint)local_a70._vptr_BaseFab
                                                        [lVar79 + lVar57 + lVar52 + lVar78 * 3] &
                                                  uVar428) / (dVar120 + auVar438._0_8_ + 1e-100);
                          dVar120 = (double)CONCAT44(auVar395._12_4_,auVar395._8_4_);
                          dVar123 = (double)CONCAT44((uint)((ulong)local_a70._vptr_BaseFab
                                                                   [lVar79 + lVar57 + lVar77 + 
                                                  lVar78 * 3] >> 0x20) & uVar464,
                                                  (uint)local_a70._vptr_BaseFab
                                                        [lVar79 + lVar57 + lVar77 + lVar78 * 3] &
                                                  uVar428) / (dVar120 + auVar395._0_8_ + 1e-100);
                          dVar120 = auVar343._0_8_ + 1.0;
                          dVar122 = auVar343._8_8_ + 1.0;
                          dVar552 = (dVar124 + dVar120) * auVar438._0_8_;
                          dVar552 = dVar552 / ((dVar123 + dVar122) * auVar395._8_8_ +
                                               (dVar124 + dVar122) * auVar438._8_8_ + dVar552 +
                                               (dVar123 + dVar120) * auVar395._0_8_ + 1e-100);
                          p_Var7 = local_a70._vptr_BaseFab[lVar82 + lVar70 + lVar77 + lVar78];
                          auVar348._0_4_ = (uint)p_Var7 & uVar428;
                          auVar348._4_4_ = (uint)((ulong)p_Var7 >> 0x20) & uVar464;
                          auVar348._8_4_ =
                               (uint)local_a70._vptr_BaseFab[lVar82 + lVar93 + lVar77 + lVar78] &
                               uVar465;
                          auVar348._12_4_ =
                               (uint)((ulong)local_a70._vptr_BaseFab
                                             [lVar82 + lVar93 + lVar77 + lVar78] >> 0x20) & uVar468;
                          auVar439._0_8_ =
                               (double)CONCAT44((uint)((ulong)local_a70._vptr_BaseFab
                                                              [lVar82 + lVar70 + lVar52 + lVar78 * 5
                                                              ] >> 0x20) & uVar464,
                                                (uint)local_a70._vptr_BaseFab
                                                      [lVar82 + lVar70 + lVar52 + lVar78 * 5] &
                                                uVar428);
                          auVar439._8_4_ =
                               (uint)local_a70._vptr_BaseFab[lVar82 + lVar93 + lVar52 + lVar78 * 5]
                               & uVar465;
                          auVar439._12_4_ =
                               (uint)((ulong)local_a70._vptr_BaseFab
                                             [lVar82 + lVar93 + lVar52 + lVar78 * 5] >> 0x20) &
                               uVar468;
                          auVar396._0_8_ =
                               (double)CONCAT44((uint)((ulong)local_a70._vptr_BaseFab
                                                              [lVar82 + lVar70 + lVar77 + lVar78 * 5
                                                              ] >> 0x20) & uVar464,
                                                (uint)local_a70._vptr_BaseFab
                                                      [lVar82 + lVar70 + lVar77 + lVar78 * 5] &
                                                uVar428);
                          auVar396._8_4_ =
                               (uint)local_a70._vptr_BaseFab[lVar82 + lVar93 + lVar77 + lVar78 * 5]
                               & uVar465;
                          auVar396._12_4_ =
                               (uint)((ulong)local_a70._vptr_BaseFab
                                             [lVar82 + lVar93 + lVar77 + lVar78 * 5] >> 0x20) &
                               uVar468;
                          auVar479._8_4_ = auVar439._8_4_;
                          auVar479._0_8_ = auVar439._0_8_;
                          auVar479._12_4_ = auVar439._12_4_;
                          auVar480._0_8_ = auVar439._0_8_ + auVar396._0_8_ + 1e-100;
                          auVar480._8_8_ = auVar479._8_8_ + auVar396._8_8_ + 1e-100;
                          auVar343 = divpd(auVar348,auVar480);
                          dVar120 = (double)CONCAT44(auVar439._12_4_,auVar439._8_4_);
                          dVar124 = (double)CONCAT44((uint)((ulong)local_a70._vptr_BaseFab
                                                                   [lVar82 + lVar70 + lVar52 + 
                                                  lVar78 * 3] >> 0x20) & uVar464,
                                                  (uint)local_a70._vptr_BaseFab
                                                        [lVar82 + lVar70 + lVar52 + lVar78 * 3] &
                                                  uVar428) / (dVar120 + auVar439._0_8_ + 1e-100);
                          dVar120 = (double)CONCAT44(auVar396._12_4_,auVar396._8_4_);
                          dVar123 = (double)CONCAT44((uint)((ulong)local_a70._vptr_BaseFab
                                                                   [lVar82 + lVar70 + lVar77 + 
                                                  lVar78 * 3] >> 0x20) & uVar464,
                                                  (uint)local_a70._vptr_BaseFab
                                                        [lVar82 + lVar70 + lVar77 + lVar78 * 3] &
                                                  uVar428) / (dVar120 + auVar396._0_8_ + 1e-100);
                          dVar120 = auVar343._0_8_ + 1.0;
                          dVar122 = auVar343._8_8_ + 1.0;
                          dVar581 = (dVar124 + dVar120) * auVar439._0_8_;
                          dVar581 = dVar581 / ((dVar123 + dVar122) * auVar396._8_8_ +
                                               (dVar124 + dVar122) * auVar439._8_8_ + dVar581 +
                                               (dVar123 + dVar120) * auVar396._0_8_ + 1e-100);
                          p_Var10 = local_a70._vptr_BaseFab[lVar82 + lVar57 + lVar52 + lVar78 * 3];
                          dVar120 = (double)CONCAT44((uint)((ulong)p_Var10 >> 0x20) & uVar464,
                                                     (uint)p_Var10 & uVar428);
                          p_Var11 = local_a70._vptr_BaseFab[lVar82 + lVar57 + lVar77 + lVar78 * 3];
                          dVar120 = dVar120 / ((double)CONCAT44((uint)((ulong)p_Var11 >> 0x20) &
                                                                uVar464,(uint)p_Var11 & uVar428) +
                                              dVar120);
                          dVar120 = (double)((-(ulong)((double)p_Var11 == 0.0) & 0x3fe0000000000000
                                             | ~-(ulong)((double)p_Var11 == 0.0) & (ulong)dVar120) &
                                             -(ulong)((double)p_Var10 == 0.0) |
                                            ~-(ulong)((double)p_Var10 == 0.0) & (ulong)dVar120);
                          uVar119 = (uint)local_a70._vptr_BaseFab
                                          [lVar92 + lVar70 + lVar77 + lVar78 * 7] & uVar465;
                          uVar181 = (uint)((ulong)local_a70._vptr_BaseFab
                                                  [lVar92 + lVar70 + lVar77 + lVar78 * 7] >> 0x20) &
                                    uVar468;
                          local_1328 = (double)CONCAT44((uint)((ulong)local_a70._vptr_BaseFab
                                                                      [lVar92 + lVar93 + lVar77 + 
                                                  lVar78 * 7] >> 0x20) & uVar464,
                                                  (uint)local_a70._vptr_BaseFab
                                                        [lVar92 + lVar93 + lVar77 + lVar78 * 7] &
                                                  uVar428);
                          uStack_1320 = (double)CONCAT44(uVar181,uVar119);
                          local_f18 = (double)CONCAT44(uVar181,uVar119);
                          uStack_f10 = (double)CONCAT44((uint)((ulong)local_a70._vptr_BaseFab
                                                                      [lVar83 + lVar70 + lVar77 + 
                                                  lVar78 * 7] >> 0x20) & uVar464,
                                                  (uint)local_a70._vptr_BaseFab
                                                        [lVar83 + lVar70 + lVar77 + lVar78 * 7] &
                                                  uVar428);
                          auVar349._0_4_ =
                               (uint)local_a70._vptr_BaseFab[lVar83 + lVar57 + lVar77 + lVar78 * 2]
                               & uVar428;
                          auVar349._4_4_ =
                               (uint)((ulong)local_a70._vptr_BaseFab
                                             [lVar83 + lVar57 + lVar77 + lVar78 * 2] >> 0x20) &
                               uVar464;
                          auVar349._8_4_ =
                               (uint)local_a70._vptr_BaseFab[lVar92 + lVar57 + lVar77 + lVar78 * 2]
                               & uVar465;
                          auVar349._12_4_ =
                               (uint)((ulong)local_a70._vptr_BaseFab
                                             [lVar92 + lVar57 + lVar77 + lVar78 * 2] >> 0x20) &
                               uVar468;
                          auVar440._0_8_ =
                               (double)CONCAT44((uint)((ulong)local_a70._vptr_BaseFab
                                                              [lVar83 + lVar57 + lVar52 + lVar78 * 6
                                                              ] >> 0x20) & uVar464,
                                                (uint)local_a70._vptr_BaseFab
                                                      [lVar83 + lVar57 + lVar52 + lVar78 * 6] &
                                                uVar428);
                          auVar440._8_4_ =
                               (uint)local_a70._vptr_BaseFab[lVar92 + lVar57 + lVar52 + lVar78 * 6]
                               & uVar465;
                          auVar440._12_4_ =
                               (uint)((ulong)local_a70._vptr_BaseFab
                                             [lVar92 + lVar57 + lVar52 + lVar78 * 6] >> 0x20) &
                               uVar468;
                          auVar397._0_8_ =
                               (double)CONCAT44((uint)((ulong)local_a70._vptr_BaseFab
                                                              [lVar83 + lVar57 + lVar77 + lVar78 * 6
                                                              ] >> 0x20) & uVar464,
                                                (uint)local_a70._vptr_BaseFab
                                                      [lVar83 + lVar57 + lVar77 + lVar78 * 6] &
                                                uVar428);
                          auVar397._8_4_ =
                               (uint)local_a70._vptr_BaseFab[lVar92 + lVar57 + lVar77 + lVar78 * 6]
                               & uVar465;
                          auVar397._12_4_ =
                               (uint)((ulong)local_a70._vptr_BaseFab
                                             [lVar92 + lVar57 + lVar77 + lVar78 * 6] >> 0x20) &
                               uVar468;
                          auVar481._8_4_ = auVar440._8_4_;
                          auVar481._0_8_ = auVar440._0_8_;
                          auVar481._12_4_ = auVar440._12_4_;
                          auVar482._0_8_ = auVar440._0_8_ + auVar397._0_8_ + 1e-100;
                          auVar482._8_8_ = auVar481._8_8_ + auVar397._8_8_ + 1e-100;
                          auVar343 = divpd(auVar349,auVar482);
                          dVar122 = (double)CONCAT44(auVar440._12_4_,auVar440._8_4_);
                          dVar124 = (double)CONCAT44((uint)((ulong)local_a70._vptr_BaseFab
                                                                   [lVar83 + lVar57 + lVar52 + 
                                                  lVar78 * 3] >> 0x20) & uVar464,
                                                  (uint)local_a70._vptr_BaseFab
                                                        [lVar83 + lVar57 + lVar52 + lVar78 * 3] &
                                                  uVar428) / (dVar122 + auVar440._0_8_ + 1e-100);
                          dVar122 = (double)CONCAT44(auVar397._12_4_,auVar397._8_4_);
                          dVar183 = (double)CONCAT44((uint)((ulong)local_a70._vptr_BaseFab
                                                                   [lVar83 + lVar57 + lVar77 + 
                                                  lVar78 * 3] >> 0x20) & uVar464,
                                                  (uint)local_a70._vptr_BaseFab
                                                        [lVar83 + lVar57 + lVar77 + lVar78 * 3] &
                                                  uVar428) / (dVar122 + auVar397._0_8_ + 1e-100);
                          dVar122 = auVar343._0_8_ + 1.0;
                          dVar123 = auVar343._8_8_ + 1.0;
                          dVar578 = (dVar124 + dVar123) * auVar440._8_8_;
                          dVar578 = dVar578 / ((dVar183 + dVar123) * auVar397._8_8_ +
                                               (dVar124 + dVar122) * auVar440._0_8_ + dVar578 +
                                               (dVar183 + dVar122) * auVar397._0_8_ + 1e-100);
                          lVar58 = lVar103 * 2 - lVar51;
                          p_Var10 = local_a70._vptr_BaseFab[lVar92 + lVar70 + lVar76 + lVar78 * 4];
                          p_Var11 = local_a70._vptr_BaseFab[lVar92 + lVar70 + lVar76 + lVar78 * 2];
                          p_Var12 = local_a70._vptr_BaseFab[lVar79 + lVar70 + lVar52 + lVar78 * 5];
                          p_Var13 = local_a70._vptr_BaseFab[lVar79 + lVar70 + lVar52 + lVar78 * 6];
                          dVar122 = (double)CONCAT44((uint)((ulong)local_a70._vptr_BaseFab
                                                                   [lVar92 + lVar70 + lVar53 + 
                                                  lVar78 * 7] >> 0x20) & uVar464,
                                                  (uint)local_a70._vptr_BaseFab
                                                        [lVar92 + lVar70 + lVar53 + lVar78 * 7] &
                                                  uVar428);
                          dVar384 = (double)CONCAT44((uint)((ulong)local_230[lVar58 + lVar67 + 
                                                  lVar78 * 6] >> 0x20) & uVar464,
                                                  (uint)local_230[lVar58 + lVar67 + lVar78 * 6] &
                                                  uVar428);
                          dVar332 = (double)CONCAT44((uint)((ulong)local_230[lVar58 + (long)
                                                  local_868 + lVar78 * 6] >> 0x20) & uVar464,
                                                  (uint)local_230[lVar58 + (long)local_868 +
                                                                           lVar78 * 6] & uVar428);
                          auVar190._0_8_ =
                               (double)CONCAT44((uint)((ulong)local_a70._vptr_BaseFab
                                                              [lVar92 + lVar70 + lVar76 + lVar78 * 7
                                                              ] >> 0x20) & uVar464,
                                                (uint)local_a70._vptr_BaseFab
                                                      [lVar92 + lVar70 + lVar76 + lVar78 * 7] &
                                                uVar428);
                          auVar190._8_4_ =
                               (uint)local_9f8[lVar58 + (long)local_868 + lVar78 * 6] & uVar465;
                          auVar190._12_4_ =
                               (uint)((ulong)local_9f8[lVar58 + (long)local_868 + lVar78 * 6] >>
                                     0x20) & uVar468;
                          lVar99 = (long)(iVar63 - local_a70.domain.smallend.vect[2]);
                          auVar234._0_8_ =
                               (double)CONCAT44((uint)((ulong)local_9f8[lVar58 + (long)local_868 +
                                                                                 lVar78 * 7] >> 0x20
                                                      ) & uVar464,
                                                (uint)local_9f8[lVar58 + (long)local_868 +
                                                                         lVar78 * 7] & uVar428);
                          auVar234._8_4_ =
                               (uint)local_230[lVar58 + (long)local_868 + lVar78 * 7] & uVar465;
                          auVar234._12_4_ =
                               (uint)((ulong)local_230[lVar58 + (long)local_868 + lVar78 * 7] >>
                                     0x20) & uVar468;
                          dVar123 = (double)CONCAT44(auVar234._12_4_,auVar234._8_4_);
                          uVar119 = (uint)local_9f8[lVar58 + lVar67 + lVar78 * 7] & uVar428;
                          uVar181 = (uint)((ulong)local_9f8[lVar58 + lVar67 + lVar78 * 7] >> 0x20) &
                                    uVar464;
                          auVar398._0_8_ = (double)CONCAT44(uVar181,uVar119);
                          auVar398._8_4_ =
                               (uint)local_9f8[lVar99 + (long)local_868 + lVar78 * 7] & uVar465;
                          auVar398._12_4_ =
                               (uint)((ulong)local_9f8[lVar99 + (long)local_868 + lVar78 * 7] >>
                                     0x20) & uVar468;
                          auVar282._0_8_ =
                               (double)CONCAT44((uint)((ulong)local_9f8[lVar99 + lVar67 + lVar78 * 7
                                                                       ] >> 0x20) & uVar464,
                                                (uint)local_9f8[lVar99 + lVar67 + lVar78 * 7] &
                                                uVar428);
                          auVar282._8_4_ = (uint)local_230[lVar58 + lVar67 + lVar78 * 7] & uVar465;
                          auVar282._12_4_ =
                               (uint)((ulong)local_230[lVar58 + lVar67 + lVar78 * 7] >> 0x20) &
                               uVar468;
                          auVar483._0_8_ = (double)CONCAT44(uVar181,uVar119);
                          auVar483._8_4_ = uVar119;
                          auVar483._12_4_ = uVar181;
                          auVar283._0_4_ =
                               (uint)local_9f8[lVar99 + (long)local_868 + lVar78 * 2] & uVar428;
                          auVar283._4_4_ =
                               (uint)((ulong)local_9f8[lVar99 + (long)local_868 + lVar78 * 2] >>
                                     0x20) & uVar464;
                          auVar283._8_4_ =
                               (uint)local_9f8[lVar58 + (long)local_868 + lVar78] & uVar465;
                          auVar283._12_4_ =
                               (uint)((ulong)local_9f8[lVar58 + (long)local_868 + lVar78] >> 0x20) &
                               uVar468;
                          dVar124 = auVar398._8_8_;
                          auVar484._0_8_ =
                               auVar483._0_8_ + auVar282._0_8_ + auVar234._0_8_ + dVar124 + 1e-100;
                          auVar484._8_8_ =
                               auVar483._8_8_ + auVar282._8_8_ + auVar234._8_8_ + auVar234._0_8_ +
                               1e-100;
                          auVar230 = divpd(auVar283,auVar484);
                          auVar284._0_4_ =
                               (uint)local_9f8[lVar58 + (long)local_868 + lVar78 * 4] & uVar428;
                          auVar284._4_4_ =
                               (uint)((ulong)local_9f8[lVar58 + (long)local_868 + lVar78 * 4] >>
                                     0x20) & uVar464;
                          auVar284._8_4_ =
                               (uint)local_9f8[lVar99 + (long)local_868 + lVar78 * 3] & uVar465;
                          auVar284._12_4_ =
                               (uint)((ulong)local_9f8[lVar99 + (long)local_868 + lVar78 * 3] >>
                                     0x20) & uVar468;
                          auVar518._0_8_ = auVar234._0_8_ + auVar398._0_8_ + 1e-100;
                          auVar518._8_8_ =
                               dVar123 + (double)CONCAT44((uint)((ulong)local_230[lVar99 + (long)
                                                  local_868 + lVar78 * 7] >> 0x20) & uVar464,
                                                  (uint)local_230[lVar99 + (long)local_868 +
                                                                           lVar78 * 7] & uVar428) +
                               auVar234._0_8_ + dVar124 + 1e-100;
                          auVar285 = divpd(auVar284,auVar518);
                          auVar286._0_4_ =
                               (uint)local_9f8[lVar99 + (long)local_868 + lVar78 * 6] & uVar428;
                          auVar286._4_4_ =
                               (uint)((ulong)local_9f8[lVar99 + (long)local_868 + lVar78 * 6] >>
                                     0x20) & uVar464;
                          auVar286._8_4_ =
                               (uint)local_9f8[lVar58 + (long)local_868 + lVar78 * 5] & uVar465;
                          auVar286._12_4_ =
                               (uint)((ulong)local_9f8[lVar58 + (long)local_868 + lVar78 * 5] >>
                                     0x20) & uVar468;
                          auVar399._0_8_ = dVar124 + auVar234._0_8_ + 1e-100;
                          auVar399._8_8_ = auVar234._0_8_ + auVar234._8_8_ + 1e-100;
                          auVar287 = divpd(auVar286,auVar399);
                          p_Var14 = local_a70._vptr_BaseFab[lVar82 + lVar58 + lVar67 + lVar78 * 3];
                          p_Var15 = local_a70._vptr_BaseFab
                                    [lVar82 + lVar58 + (long)local_868 + lVar78 * 3];
                          dVar335 = (double)CONCAT44((uint)((ulong)p_Var15 >> 0x20) & uVar464,
                                                     (uint)p_Var15 & uVar428);
                          dVar335 = dVar335 / ((double)CONCAT44((uint)((ulong)p_Var14 >> 0x20) &
                                                                uVar464,(uint)p_Var14 & uVar428) +
                                              dVar335);
                          auVar288._0_4_ =
                               (uint)local_a70._vptr_BaseFab
                                     [lVar82 + lVar99 + (long)local_868 + lVar78] & uVar428;
                          auVar288._4_4_ =
                               (uint)((ulong)local_a70._vptr_BaseFab
                                             [lVar82 + lVar99 + (long)local_868 + lVar78] >> 0x20) &
                               uVar464;
                          auVar288._8_4_ =
                               (uint)local_a70._vptr_BaseFab
                                     [lVar82 + lVar58 + (long)local_868 + lVar78] & uVar465;
                          auVar288._12_4_ =
                               (uint)((ulong)local_a70._vptr_BaseFab
                                             [lVar82 + lVar58 + (long)local_868 + lVar78] >> 0x20) &
                               uVar468;
                          auVar235._0_8_ =
                               (double)CONCAT44((uint)((ulong)local_a70._vptr_BaseFab
                                                              [lVar82 + lVar99 + lVar67 + lVar78 * 5
                                                              ] >> 0x20) & uVar464,
                                                (uint)local_a70._vptr_BaseFab
                                                      [lVar82 + lVar99 + lVar67 + lVar78 * 5] &
                                                uVar428);
                          auVar235._8_4_ =
                               (uint)local_a70._vptr_BaseFab[lVar82 + lVar58 + lVar67 + lVar78 * 5]
                               & uVar465;
                          auVar235._12_4_ =
                               (uint)((ulong)local_a70._vptr_BaseFab
                                             [lVar82 + lVar58 + lVar67 + lVar78 * 5] >> 0x20) &
                               uVar468;
                          auVar350._0_8_ =
                               (double)CONCAT44((uint)((ulong)local_a70._vptr_BaseFab
                                                              [lVar82 + lVar99 + (long)local_868 +
                                                                                 lVar78 * 5] >> 0x20
                                                      ) & uVar464,
                                                (uint)local_a70._vptr_BaseFab
                                                      [lVar82 + lVar99 + (long)local_868 +
                                                                         lVar78 * 5] & uVar428);
                          auVar350._8_4_ =
                               (uint)local_a70._vptr_BaseFab
                                     [lVar82 + lVar58 + (long)local_868 + lVar78 * 5] & uVar465;
                          auVar350._12_4_ =
                               (uint)((ulong)local_a70._vptr_BaseFab
                                             [lVar82 + lVar58 + (long)local_868 + lVar78 * 5] >>
                                     0x20) & uVar468;
                          auVar400._8_4_ = auVar235._8_4_;
                          auVar400._0_8_ = auVar235._0_8_;
                          auVar400._12_4_ = auVar235._12_4_;
                          auVar401._0_8_ = auVar235._0_8_ + auVar350._0_8_ + 1e-100;
                          auVar401._8_8_ = auVar400._8_8_ + auVar350._8_8_ + 1e-100;
                          auVar343 = divpd(auVar288,auVar401);
                          dVar123 = (double)CONCAT44(auVar235._12_4_,auVar235._8_4_);
                          dVar386 = (double)CONCAT44((uint)((ulong)local_a70._vptr_BaseFab
                                                                   [lVar82 + lVar99 + lVar67 + 
                                                  lVar78 * 3] >> 0x20) & uVar464,
                                                  (uint)local_a70._vptr_BaseFab
                                                        [lVar82 + lVar99 + lVar67 + lVar78 * 3] &
                                                  uVar428) / (dVar123 + auVar235._0_8_ + 1e-100);
                          dVar123 = (double)CONCAT44(auVar350._12_4_,auVar350._8_4_);
                          dVar471 = (double)CONCAT44((uint)((ulong)local_a70._vptr_BaseFab
                                                                   [lVar82 + lVar99 + (long)
                                                  local_868 + lVar78 * 3] >> 0x20) & uVar464,
                                                  (uint)local_a70._vptr_BaseFab
                                                        [lVar82 + lVar99 + (long)local_868 +
                                                                           lVar78 * 3] & uVar428) /
                                    (dVar123 + auVar350._0_8_ + 1e-100);
                          dVar281 = auVar343._0_8_ + 1.0;
                          dVar331 = auVar343._8_8_ + 1.0;
                          dVar512 = (dVar471 + dVar331) * auVar350._8_8_;
                          uVar119 = (uint)local_a70._vptr_BaseFab
                                          [lVar82 + lVar58 + lVar67 + lVar78 * 6] & uVar428;
                          uVar181 = (uint)((ulong)local_a70._vptr_BaseFab
                                                  [lVar82 + lVar58 + lVar67 + lVar78 * 6] >> 0x20) &
                                    uVar464;
                          dVar385 = (double)CONCAT44(uVar181,uVar119);
                          uVar182 = (uint)local_a70._vptr_BaseFab
                                          [lVar82 + lVar58 + (long)local_868 + lVar78 * 6] & uVar428
                          ;
                          uVar225 = (uint)((ulong)local_a70._vptr_BaseFab
                                                  [lVar82 + lVar58 + (long)local_868 + lVar78 * 6]
                                          >> 0x20) & uVar464;
                          dVar387 = (double)CONCAT44(uVar225,uVar182);
                          dVar339 = (double)CONCAT44((uint)((ulong)local_468[lVar58 + lVar67 + 
                                                  lVar78 * 6] >> 0x20) & uVar464,
                                                  (uint)local_468[lVar58 + lVar67 + lVar78 * 6] &
                                                  uVar428);
                          dVar123 = (double)CONCAT44((uint)((ulong)local_468[lVar58 + (long)
                                                  local_868 + lVar78 * 6] >> 0x20) & uVar464,
                                                  (uint)local_468[lVar58 + (long)local_868 +
                                                                           lVar78 * 6] & uVar428);
                          auVar351._8_4_ = uVar119;
                          auVar351._0_8_ = dVar472;
                          auVar351._12_4_ = uVar181;
                          dVar336 = (double)CONCAT44((uint)((ulong)local_468[lVar58 + lVar67 + 
                                                  lVar78 * 3] >> 0x20) & uVar464,
                                                  (uint)local_468[lVar58 + lVar67 + lVar78 * 3] &
                                                  uVar428) / (dVar385 + dVar339 + 1e-100);
                          auVar236._8_4_ = uVar182;
                          auVar236._0_8_ = dVar472;
                          auVar236._12_4_ = uVar225;
                          auVar699._0_4_ =
                               (uint)local_a70._vptr_BaseFab[lVar92 + lVar70 + lVar102 + lVar78 * 2]
                               & uVar428;
                          auVar699._4_4_ =
                               (uint)((ulong)local_a70._vptr_BaseFab
                                             [lVar92 + lVar70 + lVar102 + lVar78 * 2] >> 0x20) &
                               uVar464;
                          auVar699._8_4_ =
                               (uint)local_468[lVar58 + (long)local_868 + lVar78 * 3] & uVar465;
                          auVar699._12_4_ =
                               (uint)((ulong)local_468[lVar58 + (long)local_868 + lVar78 * 3] >>
                                     0x20) & uVar468;
                          auVar402._0_8_ = auVar393._0_8_ + dVar472 + 1e-100;
                          auVar402._8_8_ = dVar123 + auVar236._8_8_ + 1e-100;
                          auVar341 = divpd(auVar699,auVar402);
                          dVar615 = (double)CONCAT44((uint)((ulong)local_468[lVar58 + (long)
                                                  local_868 + lVar78 * 2] >> 0x20) & uVar464,
                                                  (uint)local_468[lVar58 + (long)local_868 +
                                                                           lVar78 * 2] & uVar428) /
                                    (dVar339 + dVar123 + 1e-100) + 1.0;
                          dVar473 = (double)CONCAT44((uint)((ulong)local_a70._vptr_BaseFab
                                                                   [lVar82 + lVar58 + lVar67 + 
                                                  lVar78 * 7] >> 0x20) & uVar464,
                                                  (uint)local_a70._vptr_BaseFab
                                                        [lVar82 + lVar58 + lVar67 + lVar78 * 7] &
                                                  uVar428);
                          uStack_ac0 = 0;
                          auVar352._0_8_ =
                               (double)CONCAT44((uint)((ulong)local_a70._vptr_BaseFab
                                                              [lVar79 + lVar70 + lVar52 + lVar78 * 7
                                                              ] >> 0x20) & uVar464,
                                                (uint)local_a70._vptr_BaseFab
                                                      [lVar79 + lVar70 + lVar52 + lVar78 * 7] &
                                                uVar428);
                          auVar352._8_4_ = (uint)local_460[lVar70 + lVar52 + lVar78 * 7] & uVar465;
                          auVar352._12_4_ =
                               (uint)((ulong)local_460[lVar70 + lVar52 + lVar78 * 7] >> 0x20) &
                               uVar468;
                          local_1478._0_4_ = SUB84(p_Var13,0);
                          local_1478._4_4_ = (undefined4)((ulong)p_Var13 >> 0x20);
                          local_1478._8_4_ = SUB84(p_Var12,0);
                          uStack_146c = (uint)((ulong)p_Var12 >> 0x20);
                          auVar289._0_4_ = local_1478._0_4_ & uVar428;
                          auVar289._4_4_ = local_1478._4_4_ & uVar464;
                          auVar289._8_4_ = local_1478._8_4_ & uVar465;
                          auVar289._12_4_ = uStack_146c & uVar468;
                          auVar237._0_8_ =
                               (double)CONCAT44((uint)((ulong)local_a70._vptr_BaseFab
                                                              [lVar79 + lVar93 + lVar52 + lVar78 * 7
                                                              ] >> 0x20) & uVar464,
                                                (uint)local_a70._vptr_BaseFab
                                                      [lVar79 + lVar93 + lVar52 + lVar78 * 7] &
                                                uVar428);
                          auVar237._8_4_ =
                               (uint)local_468[lVar58 + (long)local_868 + lVar78 * 7] & uVar465;
                          auVar237._12_4_ =
                               (uint)((ulong)local_468[lVar58 + (long)local_868 + lVar78 * 7] >>
                                     0x20) & uVar468;
                          dStack_870 = auVar352._8_8_;
                          auVar238._0_8_ = auVar237._0_8_ + auVar352._0_8_ + 1e-100;
                          auVar238._8_8_ = auVar352._0_8_ + dStack_870 + 1e-100;
                          auVar290 = divpd(auVar289,auVar238);
                          dStack_ae0 = (double)CONCAT44((uint)((ulong)local_a70._vptr_BaseFab
                                                                      [lVar82 + lVar99 + lVar67 + 
                                                  lVar78 * 7] >> 0x20) & uVar464,
                                                  (uint)local_a70._vptr_BaseFab
                                                        [lVar82 + lVar99 + lVar67 + lVar78 * 7] &
                                                  uVar428) + dVar473;
                          p_Var16 = local_230[lVar58 + lVar102 + lVar78 * 2];
                          p_Var17 = local_9f8[lVar58 + lVar102 + lVar78 * 2];
                          dVar337 = (double)CONCAT44((uint)((ulong)p_Var17 >> 0x20) & uVar464,
                                                     (uint)p_Var17 & uVar428);
                          dVar337 = dVar337 / ((double)CONCAT44((uint)((ulong)p_Var16 >> 0x20) &
                                                                uVar464,(uint)p_Var16 & uVar428) +
                                              dVar337);
                          dVar429 = (double)CONCAT44((uint)((ulong)local_230[lVar99 + lVar102 + 
                                                  lVar78 * 4] >> 0x20) & uVar464,
                                                  (uint)local_230[lVar99 + lVar102 + lVar78 * 4] &
                                                  uVar428);
                          dVar388 = (double)CONCAT44((uint)((ulong)local_9f8[lVar99 + lVar102 + 
                                                  lVar78 * 4] >> 0x20) & uVar464,
                                                  (uint)local_9f8[lVar99 + lVar102 + lVar78 * 4] &
                                                  uVar428);
                          uVar182 = (uint)local_230[lVar58 + lVar102 + lVar78 * 4] & uVar428;
                          uVar225 = (uint)((ulong)local_230[lVar58 + lVar102 + lVar78 * 4] >> 0x20)
                                    & uVar464;
                          dVar427 = (double)CONCAT44(uVar225,uVar182);
                          dStack_ab0 = (double)CONCAT44((uint)((ulong)local_230[lVar99 + lVar102 + 
                                                  lVar78 * 2] >> 0x20) & uVar464,
                                                  (uint)local_230[lVar99 + lVar102 + lVar78 * 2] &
                                                  uVar428) / (dVar427 + dVar429 + 1e-100);
                          dVar514 = (double)CONCAT44((uint)((ulong)local_9f8[lVar99 + lVar102 + 
                                                  lVar78] >> 0x20) & uVar464,
                                                  (uint)local_9f8[lVar99 + lVar102 + lVar78] &
                                                  uVar428) / (dVar429 + dVar388 + 1e-100) + 1.0;
                          local_1018 = (uint)p_Var11;
                          uStack_1014 = (uint)((ulong)p_Var11 >> 0x20);
                          dVar433 = (double)CONCAT44((uint)((ulong)local_a70._vptr_BaseFab
                                                                   [lVar92 + lVar93 + lVar76 + 
                                                  lVar78 * 7] >> 0x20) & uVar464,
                                                  (uint)local_a70._vptr_BaseFab
                                                        [lVar92 + lVar93 + lVar76 + lVar78 * 7] &
                                                  uVar428);
                          p_Var18 = local_a70._vptr_BaseFab[lVar83 + lVar70 + lVar76 + lVar78];
                          auVar291._0_8_ =
                               (double)CONCAT44((uint)((ulong)local_a70._vptr_BaseFab
                                                              [lVar83 + lVar70 + lVar76 + lVar78 * 7
                                                              ] >> 0x20) & uVar464,
                                                (uint)local_a70._vptr_BaseFab
                                                      [lVar83 + lVar70 + lVar76 + lVar78 * 7] &
                                                uVar428);
                          auVar291._8_4_ = (uint)local_9f8[lVar58 + lVar67 + lVar78 * 6] & uVar465;
                          auVar291._12_4_ =
                               (uint)((ulong)local_9f8[lVar58 + lVar67 + lVar78 * 6] >> 0x20) &
                               uVar468;
                          auVar485._0_4_ = (uint)p_Var18 & uVar428;
                          auVar485._4_4_ = (uint)((ulong)p_Var18 >> 0x20) & uVar464;
                          auVar485._8_4_ = (uint)local_9f8[lVar58 + lVar67 + lVar78 * 3] & uVar465;
                          auVar485._12_4_ =
                               (uint)((ulong)local_9f8[lVar58 + lVar67 + lVar78 * 3] >> 0x20) &
                               uVar468;
                          auVar239._0_8_ =
                               (double)CONCAT44((uint)((ulong)local_a70._vptr_BaseFab
                                                              [lVar83 + lVar70 + lVar53 + lVar78 * 7
                                                              ] >> 0x20) & uVar464,
                                                (uint)local_a70._vptr_BaseFab
                                                      [lVar83 + lVar70 + lVar53 + lVar78 * 7] &
                                                uVar428) + dVar122 + auVar190._0_8_ + auVar291._0_8_
                               + 1e-100;
                          auVar239._8_8_ = dVar384 + auVar291._8_8_ + 1e-100;
                          auVar343 = divpd(auVar485,auVar239);
                          dVar124 = (double)CONCAT44((uint)((ulong)local_230[lVar58 + (long)
                                                  local_868 + lVar78 * 2] >> 0x20) & uVar464,
                                                  (uint)local_230[lVar58 + (long)local_868 +
                                                                           lVar78 * 2] & uVar428) /
                                    (dVar384 + dVar332 + 1e-100) + 1.0;
                          p_Var19 = local_a70._vptr_BaseFab[lVar83 + lVar70 + lVar76 + lVar78 * 3];
                          dVar338 = dVar433 + auVar190._0_8_;
                          uStack_690 = 0;
                          local_1398._0_4_ = SUB84(p_Var10,0);
                          local_1398._4_4_ = (undefined4)((ulong)p_Var10 >> 0x20);
                          uVar228 = local_1398._0_4_ & uVar428;
                          uVar280 = local_1398._4_4_ & uVar464;
                          dVar183 = (double)CONCAT44(auVar190._12_4_,auVar190._8_4_);
                          auVar519._0_8_ = (double)CONCAT44(auVar291._12_4_,auVar291._8_4_);
                          auVar519._8_4_ = auVar291._8_4_;
                          auVar519._12_4_ = auVar291._12_4_;
                          dVar515 = (double)CONCAT44((uint)((ulong)local_9f8[lVar58 + (long)
                                                  local_868 + lVar78 * 3] >> 0x20) & uVar464,
                                                  (uint)local_9f8[lVar58 + (long)local_868 +
                                                                           lVar78 * 3] & uVar428) /
                                    (dVar183 + dVar332 + 1e-100);
                          uStack_6b0 = 0;
                          dVar183 = (double)CONCAT44((uint)((ulong)local_9f8[lVar58 + (long)
                                                  local_868 + lVar78 * 2] >> 0x20) & uVar464,
                                                  (uint)local_9f8[lVar58 + (long)local_868 +
                                                                           lVar78 * 2] & uVar428) /
                                    (auVar519._0_8_ + dVar183 + 1e-100) + 1.0;
                          local_1398._8_8_ = (dVar183 + dVar515) * auVar190._8_8_;
                          local_1398._0_8_ =
                               (double)local_a70._vptr_BaseFab
                                       [lVar83 + lVar70 + lVar76 + lVar78 * 8] * auVar190._0_8_;
                          p_Var20 = local_a70._vptr_BaseFab[lVar83 + lVar70 + lVar76 + lVar78 * 5];
                          local_13b8 = (uint)p_Var20;
                          uStack_13b4 = (uint)((ulong)p_Var20 >> 0x20);
                          uVar119 = (uint)local_a70._vptr_BaseFab
                                          [lVar92 + lVar70 + lVar52 + lVar78 * 7] & uVar428;
                          uVar181 = (uint)((ulong)local_a70._vptr_BaseFab
                                                  [lVar92 + lVar70 + lVar52 + lVar78 * 7] >> 0x20) &
                                    uVar464;
                          auVar191._0_8_ = (double)CONCAT44(uVar181,uVar119);
                          auVar191._8_4_ = (uint)local_9f8[lVar58 + lVar102 + lVar78 * 4] & uVar465;
                          auVar191._12_4_ =
                               (uint)((ulong)local_9f8[lVar58 + lVar102 + lVar78 * 4] >> 0x20) &
                               uVar468;
                          auVar441._0_8_ = (double)CONCAT44(uVar181,uVar119);
                          auVar441._8_4_ = uVar119;
                          auVar441._12_4_ = uVar181;
                          dVar432 = auVar441._0_8_ +
                                    (double)((ulong)local_a70._vptr_BaseFab
                                                    [lVar92 + lVar93 + lVar52 + lVar78 * 7] &
                                            uVar114);
                          dVar467 = auVar441._8_8_ +
                                    (double)((ulong)local_a70._vptr_BaseFab
                                                    [lVar83 + lVar70 + lVar52 + lVar78 * 7] &
                                            uVar107);
                          auVar589._0_8_ =
                               (ulong)local_a70._vptr_BaseFab[lVar92 + lVar70 + lVar77 + lVar78 * 2]
                               & uVar114;
                          auVar589._8_8_ =
                               (ulong)local_a70._vptr_BaseFab[lVar83 + lVar70 + lVar77 + lVar78] &
                               uVar107;
                          auVar192._0_8_ = dVar432 + local_1328 + local_f18 + 1e-100;
                          auVar192._8_8_ = dVar467 + uStack_1320 + uStack_f10 + 1e-100;
                          auVar590 = divpd(auVar589,auVar192);
                          uStack_cb0 = 0;
                          auVar353._0_8_ =
                               (ulong)local_a70._vptr_BaseFab[lVar92 + lVar70 + lVar77 + lVar78 * 4]
                               & uVar114;
                          auVar353._8_8_ =
                               (ulong)local_a70._vptr_BaseFab[lVar83 + lVar70 + lVar52 + lVar78 * 3]
                               & uVar107;
                          auVar240._0_8_ = uStack_1320 + auVar191._0_8_ + 1e-100;
                          auVar240._8_8_ =
                               (double)((ulong)local_a70._vptr_BaseFab
                                               [lVar83 + lVar93 + lVar52 + lVar78 * 7] & uVar114) +
                               dVar432 + (double)((ulong)local_a70._vptr_BaseFab
                                                         [lVar83 + lVar70 + lVar52 + lVar78 * 7] &
                                                 uVar107) + 1e-100;
                          auVar354 = divpd(auVar353,auVar240);
                          uStack_4b0 = 0;
                          auVar687._0_8_ =
                               (ulong)local_a70._vptr_BaseFab[lVar92 + lVar70 + lVar52 + lVar78 * 6]
                               & uVar114;
                          auVar687._8_8_ =
                               (ulong)local_a70._vptr_BaseFab[lVar83 + lVar70 + lVar52 + lVar78 * 5]
                               & uVar107;
                          auVar442._0_8_ = dVar432 + 1e-100;
                          auVar442._8_8_ = dVar467 + 1e-100;
                          auVar688 = divpd(auVar687,auVar442);
                          auVar292._0_8_ =
                               (double)CONCAT44(uStack_13b4 & uVar464,local_13b8 & uVar428) /
                               (auVar190._0_8_ + auVar291._0_8_ + 1e-100) +
                               (double)CONCAT44(uVar280,uVar228) /
                               (dVar122 + auVar190._0_8_ + 1e-100) +
                               (double)CONCAT44((uint)((ulong)p_Var19 >> 0x20) & uVar464,
                                                (uint)p_Var19 & uVar428) /
                               ((double)CONCAT44((uint)((ulong)local_a70._vptr_BaseFab
                                                               [lVar83 + lVar93 + lVar76 + lVar78 * 
                                                  7] >> 0x20) & uVar464,
                                                 (uint)local_a70._vptr_BaseFab
                                                       [lVar83 + lVar93 + lVar76 + lVar78 * 7] &
                                                 uVar428) + dVar338 + auVar291._0_8_ + 1e-100) +
                               (double)CONCAT44(uStack_1014 & uVar464,local_1018 & uVar428) /
                               ((double)CONCAT44((uint)((ulong)local_a70._vptr_BaseFab
                                                               [lVar92 + lVar93 + lVar53 + lVar78 * 
                                                  7] >> 0x20) & uVar464,
                                                 (uint)local_a70._vptr_BaseFab
                                                       [lVar92 + lVar93 + lVar53 + lVar78 * 7] &
                                                 uVar428) + dVar122 + dVar433 + auVar190._0_8_ +
                               1e-100) + auVar343._0_8_ + 1.0 +
                               (double)((ulong)local_a70._vptr_BaseFab
                                               [lVar92 + lVar70 + lVar76 + lVar78 * 6] & uVar114) /
                               (dVar338 + 1e-100);
                          auVar292._8_8_ =
                               (double)local_1398._8_8_ +
                               (dVar124 + dVar515) * dVar332 +
                               (auVar343._8_8_ + dVar183) * auVar519._0_8_ +
                               (dVar124 + auVar343._8_8_) * dVar384 + 1e-100;
                          dVar662 = (double)local_a70._vptr_BaseFab
                                            [lVar83 + lVar70 + lVar76 + lVar78 * 8] * auVar190._0_8_
                                    * auVar292._0_8_;
                          auVar343 = divpd(local_1398,auVar292);
                          dVar122 = (double)CONCAT44((uint)((ulong)local_a70._vptr_BaseFab
                                                                   [lVar82 + lVar58 + (long)
                                                  local_868 + lVar78 * 2] >> 0x20) & uVar464,
                                                  (uint)local_a70._vptr_BaseFab
                                                        [lVar82 + lVar58 + (long)local_868 +
                                                                           lVar78 * 2] & uVar428) /
                                    (dVar385 + dVar387 + 1e-100) + 1.0;
                          local_898._8_8_ = auVar351._8_8_;
                          auVar522._0_8_ = auVar393._0_8_ * (dVar431 + auVar341._0_8_);
                          auVar522._8_8_ = dVar387 * (dVar122 + auVar341._8_8_);
                          auVar520._0_8_ =
                               (dVar470 + dVar431) * auVar346._0_8_ +
                               (dVar470 + dVar466) * auVar346._8_8_ +
                               auVar522._0_8_ + dVar472 * (auVar341._0_8_ + dVar466) + 1e-100;
                          auVar520._8_8_ =
                               (auVar341._8_8_ + dVar615) * dVar123 +
                               auVar522._8_8_ +
                               (dVar336 + dVar615) * dVar339 +
                               (double)local_898._8_8_ * (dVar336 + dVar122) + 1e-100;
                          auVar341 = divpd(auVar522,auVar520);
                          dVar122 = auVar341._0_8_;
                          dVar123 = (double)((ulong)local_a70._vptr_BaseFab
                                                    [lVar79 + lVar70 + lVar77 + lVar78 * 7] &
                                            uVar114);
                          dVar332 = (double)((ulong)local_a70._vptr_BaseFab
                                                    [lVar82 + lVar58 + (long)local_868 + lVar78 * 7]
                                            & uVar107);
                          dStack_880 = auVar237._8_8_;
                          uStack_ad0 = 0;
                          auVar521._0_8_ =
                               (ulong)local_a70._vptr_BaseFab[lVar79 + lVar70 + lVar77 + lVar78] &
                               uVar114;
                          auVar521._8_8_ =
                               (ulong)local_468[lVar58 + (long)local_868 + lVar78] & uVar107;
                          auVar443._0_8_ =
                               dVar123 + auVar352._0_8_ + dStack_870 +
                                         (double)CONCAT44((uint)((ulong)local_460[lVar70 + lVar77 + 
                                                  lVar78 * 7] >> 0x20) & uVar464,
                                                  (uint)local_460[lVar70 + lVar77 + lVar78 * 7] &
                                                  uVar428) + 1e-100;
                          auVar443._8_8_ =
                               dStack_880 +
                               dVar332 + (double)CONCAT44((uint)((ulong)local_468[lVar58 + lVar67 + 
                                                  lVar78 * 7] >> 0x20) & uVar464,
                                                  (uint)local_468[lVar58 + lVar67 + lVar78 * 7] &
                                                  uVar428) + dVar473 + 1e-100;
                          auVar522 = divpd(auVar521,auVar443);
                          dVar338 = dVar332 + (double)((ulong)local_a70._vptr_BaseFab
                                                              [lVar82 + lVar99 + (long)local_868 +
                                                                                 lVar78 * 7] &
                                                      uVar107);
                          auVar486._0_8_ =
                               (ulong)local_a70._vptr_BaseFab[lVar79 + lVar70 + lVar77 + lVar78 * 2]
                               & uVar114;
                          auVar486._8_8_ =
                               (ulong)local_a70._vptr_BaseFab
                                      [lVar82 + lVar99 + (long)local_868 + lVar78 * 2] & uVar107;
                          auVar700._0_8_ =
                               dVar123 + auVar237._0_8_ + auVar352._0_8_ +
                                         (double)CONCAT44((uint)((ulong)local_a70._vptr_BaseFab
                                                                        [lVar79 + lVar93 + lVar77 + 
                                                  lVar78 * 7] >> 0x20) & uVar464,
                                                  (uint)local_a70._vptr_BaseFab
                                                        [lVar79 + lVar93 + lVar77 + lVar78 * 7] &
                                                  uVar428) + 1e-100;
                          auVar700._8_8_ =
                               (double)((ulong)local_a70._vptr_BaseFab
                                               [lVar82 + lVar99 + (long)local_868 + lVar78 * 7] &
                                       uVar107) + dVar332 + dStack_ae0 + 1e-100;
                          auVar487 = divpd(auVar486,auVar700);
                          auVar403._0_8_ =
                               (ulong)local_a70._vptr_BaseFab[lVar79 + lVar70 + lVar52 + lVar78 * 3]
                               & uVar114;
                          auVar403._8_8_ =
                               (ulong)local_468[lVar99 + (long)local_868 + lVar78 * 3] & uVar107;
                          auVar625._0_8_ =
                               auVar352._0_8_ +
                               auVar237._0_8_ +
                               dStack_870 +
                               (double)((ulong)local_460[lVar93 + lVar52 + lVar78 * 7] & uVar114) +
                               1e-100;
                          auVar625._8_8_ =
                               (double)((ulong)local_468[lVar99 + (long)local_868 + lVar78 * 7] &
                                       uVar114) + dStack_880 + dVar338 + 1e-100;
                          auVar404 = divpd(auVar403,auVar625);
                          auVar628._0_8_ =
                               (ulong)local_a70._vptr_BaseFab[lVar79 + lVar70 + lVar77 + lVar78 * 4]
                               & uVar114;
                          auVar628._8_8_ =
                               (ulong)local_a70._vptr_BaseFab
                                      [lVar82 + lVar58 + (long)local_868 + lVar78 * 4] & uVar107;
                          auVar523._0_8_ = auVar352._0_8_ + dVar123 + 1e-100;
                          auVar523._8_8_ = dVar473 + dVar332 + 1e-100;
                          auVar186 = divpd(auVar628,auVar523);
                          local_1478._0_8_ = auVar290._0_8_;
                          stack0xffffffffffffeb90 = auVar290._8_8_;
                          dVar433 = (double)local_a70._vptr_BaseFab
                                            [lVar79 + lVar70 + lVar77 + lVar78 * 8] * auVar352._0_8_
                                    * ((double)local_1478._0_8_ +
                                      stack0xffffffffffffeb90 +
                                      auVar186._0_8_ +
                                      auVar404._0_8_ + auVar487._0_8_ + auVar522._0_8_ + 1.0);
                          local_c68._8_8_ = auVar191._8_8_;
                          auVar701._8_4_ = uVar182;
                          auVar701._0_8_ = dVar427;
                          auVar701._12_4_ = uVar225;
                          dVar124 = (double)((ulong)local_9f8[lVar99 + lVar102 + lVar78 * 2] &
                                            uVar114) / ((double)local_c68._8_8_ + dVar388 + 1e-100);
                          dVar123 = (double)((ulong)local_9f8[lVar58 + lVar102 + lVar78] & uVar114)
                                    / (dVar427 + (double)local_c68._8_8_ + 1e-100) + 1.0;
                          local_e18._0_8_ = auVar590._0_8_;
                          local_e18._8_8_ = auVar590._8_8_;
                          auVar624._0_8_ =
                               (double)local_a70._vptr_BaseFab
                                       [lVar83 + lVar70 + lVar77 + lVar78 * 8] * auVar191._0_8_;
                          auVar624._8_8_ = (dVar123 + dVar124) * (double)local_c68._8_8_;
                          auVar689._0_8_ =
                               auVar688._0_8_ +
                               auVar688._8_8_ +
                               auVar354._8_8_ +
                               (double)local_e18._0_8_ + (double)local_e18._8_8_ + 1.0 +
                               auVar354._0_8_;
                          auVar689._8_8_ =
                               (dVar124 + dVar514) * dVar388 +
                               (dStack_ab0 + dVar514) * dVar429 +
                               (dStack_ab0 + dVar123) * auVar701._8_8_ + auVar624._8_8_ + 1e-100;
                          dVar697 = auVar624._0_8_ * auVar689._0_8_;
                          auVar625 = divpd(auVar624,auVar689);
                          local_de8 = local_a70._vptr_BaseFab + lVar92 + lVar58 + lVar102;
                          p_Stack_14b0 = auVar341._8_8_;
                          local_1398._8_8_ = auVar343._8_8_;
                          p_Var21 = local_a70._vptr_BaseFab[lVar82 + lVar58 + lVar102 + lVar78];
                          dVar582 = ABS((double)p_Var21) /
                                    (ABS((double)local_a70._vptr_BaseFab
                                                 [lVar82 + lVar99 + lVar102 + lVar78]) +
                                    ABS((double)p_Var21));
                          uVar107 = -(ulong)((double)local_a70._vptr_BaseFab
                                                     [lVar82 + lVar99 + lVar102 + lVar78] == 0.0);
                          dVar553 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar58 + lVar102 + lVar78 * 2]);
                          dVar553 = dVar553 / (ABS((double)local_468[lVar58 + lVar102 + lVar78 * 2])
                                              + dVar553);
                          uVar333 = -(ulong)((double)local_a70._vptr_BaseFab
                                                     [lVar82 + lVar58 + lVar102 + lVar78 * 2] == 0.0
                                            );
                          uVar111 = -(ulong)((double)local_468[lVar58 + lVar102 + lVar78 * 2] == 0.0
                                            );
                          auVar524._0_8_ =
                               (ulong)local_468[lVar99 + lVar102 + lVar78] & 0x7fffffffffffffff;
                          auVar524._8_8_ =
                               (ulong)local_468[lVar58 + lVar102 + lVar78] & 0x7fffffffffffffff;
                          dVar616 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar99 + lVar102 + lVar78 * 4]);
                          dVar641 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar58 + lVar102 + lVar78 * 4]);
                          dVar554 = ABS((double)local_468[lVar99 + lVar102 + lVar78 * 4]);
                          dVar579 = ABS((double)local_468[lVar58 + lVar102 + lVar78 * 4]);
                          auVar591._0_8_ = dVar616 + dVar554 + 1e-100;
                          auVar591._8_8_ = dVar641 + dVar579 + 1e-100;
                          auVar343 = divpd(auVar524,auVar591);
                          dVar387 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar99 + lVar102 + lVar78 * 2]) /
                                    (dVar641 + dVar616 + 1e-100);
                          dVar472 = ABS((double)local_468[lVar99 + lVar102 + lVar78 * 2]) /
                                    (dVar579 + dVar554 + 1e-100);
                          dVar432 = auVar343._0_8_ + 1.0;
                          dVar515 = auVar343._8_8_ + 1.0;
                          dVar641 = (dVar515 + dVar387) * dVar641;
                          auVar667._0_8_ =
                               (ulong)local_9f8[lVar58 + lVar77 + lVar78 * 2] & 0x7fffffffffffffff;
                          auVar667._8_8_ =
                               (ulong)local_230[lVar58 + lVar77 + lVar78 * 2] & 0x7fffffffffffffff;
                          dVar473 = ABS((double)local_9f8[lVar58 + lVar102 + lVar78 * 6]);
                          dVar431 = ABS((double)local_230[lVar58 + lVar102 + lVar78 * 6]);
                          dVar683 = ABS((double)local_9f8[lVar58 + lVar77 + lVar78 * 6]);
                          dVar695 = ABS((double)local_230[lVar58 + lVar77 + lVar78 * 6]);
                          auVar444._0_8_ = dVar473 + dVar683 + 1e-100;
                          auVar444._8_8_ = dVar431 + dVar695 + 1e-100;
                          auVar343 = divpd(auVar667,auVar444);
                          dVar339 = ABS((double)local_9f8[lVar58 + lVar102 + lVar78 * 3]) /
                                    (dVar431 + dVar473 + 1e-100);
                          dVar466 = ABS((double)local_9f8[lVar58 + lVar77 + lVar78 * 3]) /
                                    (dVar695 + dVar683 + 1e-100);
                          dVar663 = auVar343._0_8_ + 1.0;
                          dVar680 = auVar343._8_8_ + 1.0;
                          dVar473 = (dVar339 + dVar663) * dVar473;
                          dVar336 = ABS((double)local_9f8[lVar58 + lVar102 + lVar78 * 7]);
                          dVar183 = ABS((double)local_9f8[lVar58 + lVar77 + lVar78 * 7]);
                          dVar123 = ABS((double)local_9f8[lVar99 + lVar102 + lVar78 * 7]) + dVar336;
                          dVar124 = dVar336 + ABS((double)local_230[lVar58 + lVar102 + lVar78 * 7]);
                          p_Var22 = local_468[lVar99 + lVar102 + lVar78 * 7];
                          auVar445._0_8_ =
                               (ulong)local_9f8[lVar58 + lVar77 + lVar78 * 4] & 0x7fffffffffffffff;
                          auVar445._8_8_ =
                               (ulong)local_9f8[lVar99 + lVar102 + lVar78 * 3] & 0x7fffffffffffffff;
                          auVar525._0_8_ =
                               (ulong)local_9f8[lVar99 + lVar77 + lVar78 * 2] & 0x7fffffffffffffff;
                          auVar525._8_8_ =
                               (ulong)local_9f8[lVar58 + lVar77 + lVar78] & 0x7fffffffffffffff;
                          auVar562._0_8_ =
                               ABS((double)local_9f8[lVar99 + lVar77 + lVar78 * 7]) +
                               dVar183 + dVar123 + 1e-100;
                          auVar562._8_8_ =
                               dVar183 + ABS((double)local_230[lVar58 + lVar77 + lVar78 * 7]) +
                                         dVar124 + 1e-100;
                          auVar354 = divpd(auVar525,auVar562);
                          auVar626._0_8_ = dVar336 + dVar183 + 1e-100;
                          auVar626._8_8_ =
                               ABS((double)local_230[lVar58 + lVar102 + lVar78 * 7]) +
                               ABS((double)local_230[lVar99 + lVar102 + lVar78 * 7]) + dVar336 +
                               ABS((double)local_9f8[lVar99 + lVar102 + lVar78 * 7]) + 1e-100;
                          auVar341 = divpd(auVar445,auVar626);
                          auVar488._0_8_ =
                               (ulong)local_9f8[lVar99 + lVar102 + lVar78 * 6] & 0x7fffffffffffffff;
                          auVar488._8_8_ =
                               (ulong)local_9f8[lVar58 + lVar102 + lVar78 * 5] & 0x7fffffffffffffff;
                          auVar592._0_8_ = dVar123 + 1e-100;
                          auVar592._8_8_ = dVar124 + 1e-100;
                          auVar290 = divpd(auVar488,auVar592);
                          dVar555 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar58 + lVar102 + lVar78 * 3]);
                          dVar555 = dVar555 / (ABS((double)local_a70._vptr_BaseFab
                                                           [lVar82 + lVar58 + lVar77 + lVar78 * 3])
                                              + dVar555);
                          uVar112 = -(ulong)((double)local_a70._vptr_BaseFab
                                                     [lVar82 + lVar58 + lVar102 + lVar78 * 3] == 0.0
                                            );
                          uVar113 = -(ulong)((double)local_a70._vptr_BaseFab
                                                     [lVar82 + lVar58 + lVar77 + lVar78 * 3] == 0.0)
                          ;
                          auVar593._0_8_ =
                               (ulong)local_a70._vptr_BaseFab[lVar82 + lVar99 + lVar77 + lVar78] &
                               0x7fffffffffffffff;
                          auVar593._8_8_ =
                               (ulong)local_a70._vptr_BaseFab[lVar82 + lVar58 + lVar77 + lVar78] &
                               0x7fffffffffffffff;
                          dVar385 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar99 + lVar102 + lVar78 * 5]);
                          dVar429 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar58 + lVar102 + lVar78 * 5]);
                          dVar617 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar99 + lVar77 + lVar78 * 5]);
                          dVar642 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar58 + lVar77 + lVar78 * 5]);
                          auVar241._0_8_ = dVar385 + dVar617 + 1e-100;
                          auVar241._8_8_ = dVar429 + dVar642 + 1e-100;
                          auVar343 = divpd(auVar593,auVar241);
                          dVar684 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar99 + lVar102 + lVar78 * 3]) /
                                    (dVar429 + dVar385 + 1e-100);
                          dVar467 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar99 + lVar77 + lVar78 * 3]) /
                                    (dVar642 + dVar617 + 1e-100);
                          dVar583 = auVar343._0_8_ + 1.0;
                          dVar611 = auVar343._8_8_ + 1.0;
                          dVar429 = (dVar684 + dVar611) * dVar429;
                          auVar405._0_8_ =
                               (ulong)local_468[lVar58 + lVar77 + lVar78 * 2] & 0x7fffffffffffffff;
                          auVar405._8_8_ =
                               (ulong)local_a70._vptr_BaseFab[lVar82 + lVar58 + lVar77 + lVar78 * 2]
                               & 0x7fffffffffffffff;
                          dVar685 = ABS((double)local_468[lVar58 + lVar102 + lVar78 * 6]);
                          dVar615 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar58 + lVar102 + lVar78 * 6]);
                          dVar556 = ABS((double)local_468[lVar58 + lVar77 + lVar78 * 6]);
                          dVar580 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar58 + lVar77 + lVar78 * 6]);
                          auVar355._0_8_ = dVar685 + dVar556 + 1e-100;
                          auVar355._8_8_ = dVar615 + dVar580 + 1e-100;
                          auVar343 = divpd(auVar405,auVar355);
                          dVar470 = ABS((double)local_468[lVar58 + lVar102 + lVar78 * 3]) /
                                    (dVar615 + dVar685 + 1e-100);
                          dVar124 = ABS((double)local_468[lVar58 + lVar77 + lVar78 * 3]) /
                                    (dVar580 + dVar556 + 1e-100);
                          dVar388 = auVar343._0_8_ + 1.0;
                          dVar427 = auVar343._8_8_ + 1.0;
                          dVar615 = (dVar470 + dVar427) * dVar615;
                          dVar123 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar58 + lVar102 + lVar78 * 7]);
                          auVar242._8_4_ = SUB84(dVar123,0);
                          auVar242._0_8_ = dVar123;
                          auVar242._12_4_ = (int)((ulong)dVar123 >> 0x20);
                          dVar183 = dVar123 + ABS((double)local_a70._vptr_BaseFab
                                                          [lVar82 + lVar99 + lVar102 + lVar78 * 7]);
                          dVar384 = auVar242._8_8_ +
                                    ABS((double)local_468[lVar58 + lVar102 + lVar78 * 7]);
                          dVar514 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar58 + lVar77 + lVar78 * 7]);
                          auVar668._0_8_ =
                               (ulong)local_a70._vptr_BaseFab[lVar82 + lVar58 + lVar77 + lVar78 * 4]
                               & 0x7fffffffffffffff;
                          auVar668._8_8_ =
                               (ulong)local_468[lVar99 + lVar102 + lVar78 * 3] & 0x7fffffffffffffff;
                          auVar446._0_8_ =
                               (ulong)local_a70._vptr_BaseFab[lVar82 + lVar99 + lVar77 + lVar78 * 2]
                               & 0x7fffffffffffffff;
                          auVar446._8_8_ =
                               (ulong)local_468[lVar58 + lVar77 + lVar78] & 0x7fffffffffffffff;
                          auVar406._8_4_ = SUB84(dVar514,0);
                          auVar406._0_8_ = dVar514;
                          auVar406._12_4_ = (int)((ulong)dVar514 >> 0x20);
                          auVar407._0_8_ =
                               dVar514 + dVar183 +
                               ABS((double)local_a70._vptr_BaseFab
                                           [lVar82 + lVar99 + lVar77 + lVar78 * 7]) + 1e-100;
                          auVar407._8_8_ =
                               auVar406._8_8_ + dVar384 +
                               ABS((double)local_468[lVar58 + lVar77 + lVar78 * 7]) + 1e-100;
                          auVar343 = divpd(auVar446,auVar407);
                          auVar590._0_8_ = dVar123 + dVar514 + 1e-100;
                          auVar590._8_8_ =
                               ABS((double)local_468[lVar58 + lVar102 + lVar78 * 7]) + dVar183 +
                               ABS((double)p_Var22) + 1e-100;
                          auVar590 = divpd(auVar668,auVar590);
                          auVar627._0_8_ =
                               (ulong)local_a70._vptr_BaseFab
                                      [lVar82 + lVar99 + lVar102 + lVar78 * 6] & 0x7fffffffffffffff;
                          auVar627._8_8_ =
                               (ulong)local_468[lVar58 + lVar102 + lVar78 * 5] & 0x7fffffffffffffff;
                          auVar243._0_8_ = dVar183 + 1e-100;
                          auVar243._8_8_ = dVar384 + 1e-100;
                          auVar628 = divpd(auVar627,auVar243);
                          local_cb8 = (double)(lVar103 - local_298);
                          *(double *)(local_240 + (long)local_cb8 * 8) =
                               ((double)local_468[lVar99 + lVar77 + lVar78 * 8] * dVar123 *
                                (auVar628._8_8_ +
                                 auVar590._8_8_ + auVar343._8_8_ + 1.0 + auVar343._0_8_ +
                                 auVar590._0_8_ + auVar628._0_8_) *
                                (dVar578 * (double)local_a70._vptr_BaseFab
                                                   [lVar83 + lVar70 + lVar77 + lVar78] +
                                dVar697 * (double)local_a70._vptr_BaseFab[lVar83 + lVar70 + lVar77]
                                + dVar120 * (double)local_a70._vptr_BaseFab
                                                    [lVar92 + lVar70 + lVar77 + lVar78 * 4] +
                                  (double)local_a70._vptr_BaseFab
                                          [lVar92 + lVar70 + lVar77 + lVar78 * 2] * dVar581 +
                                  dVar334 * (double)local_a70._vptr_BaseFab
                                                    [lVar83 + lVar70 + lVar52 + lVar78 * 5] +
                                  (double)local_a70._vptr_BaseFab
                                          [lVar83 + lVar70 + lVar52 + lVar78 * 3] * dVar122 +
                                  (double)local_a70._vptr_BaseFab
                                          [lVar92 + lVar70 + lVar52 + lVar78 * 6] * dVar550 +
                                  (double)local_a70._vptr_BaseFab
                                          [lVar92 + lVar70 + lVar52 + lVar78 * 7]) +
                               (dVar615 /
                               ((dVar124 + dVar427) * dVar580 +
                                (dVar470 + dVar388) * dVar685 + dVar615 +
                                (dVar124 + dVar388) * dVar556 + 1e-100)) *
                               ((double)local_a70._vptr_BaseFab[lVar83 + lVar58 + lVar77 + lVar78] *
                                dVar697 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar92 + lVar58 + lVar77 + lVar78 * 4] * dVar581 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar92 + lVar58 + lVar52 + lVar78 * 7] * dVar550 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar83 + lVar58 + lVar52 + lVar78 * 5] * dVar122) +
                               (dVar429 /
                               ((dVar467 + dVar611) * dVar642 +
                                (dVar684 + dVar583) * dVar385 + dVar429 +
                                (dVar467 + dVar583) * dVar617 + 1e-100)) *
                               ((double)local_a70._vptr_BaseFab
                                        [lVar82 + lVar70 + lVar77 + lVar78 * 4] * dVar578 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar82 + lVar70 + lVar77 + lVar78 * 2] * dVar697 +
                               (double)p_Var7 * dVar120 +
                               (double)local_a70._vptr_BaseFab[lVar82 + lVar70 + lVar77] * dVar581 +
                               dVar552 * (double)local_9f8[lVar70 + lVar77 + lVar78 * 4] +
                               (double)local_9f8[lVar70 + lVar77 + lVar78 * 2] * dVar433 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar82 + lVar70 + lVar52 + lVar78 * 7] * dVar334 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar82 + lVar70 + lVar52 + lVar78 * 6] * dVar122 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar82 + lVar70 + lVar52 + lVar78 * 3] * dVar550 +
                               (double)local_9f8[lVar70 + lVar52 + lVar78 * 6] * dVar430 +
                               (double)local_9f8[lVar70 + lVar52 + lVar78 * 7] * dVar469 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar82 + lVar70 + lVar52 + lVar78 * 5]) +
                               (double)((uVar113 & 0x3fe0000000000000 | ~uVar113 & (ulong)dVar555) &
                                        uVar112 | ~uVar112 & (ulong)dVar555) *
                               ((double)local_a70._vptr_BaseFab
                                        [lVar82 + lVar58 + lVar77 + lVar78 * 4] * dVar697 +
                               (double)local_a70._vptr_BaseFab[lVar82 + lVar58 + lVar77 + lVar78] *
                               dVar581 + (double)local_9f8[lVar58 + lVar77 + lVar78 * 4] * dVar433 +
                                         (double)local_a70._vptr_BaseFab
                                                 [lVar82 + lVar58 + lVar52 + lVar78 * 7] * dVar122 +
                                         (double)local_9f8[lVar58 + lVar52 + lVar78 * 7] * dVar430 +
                                         (double)local_a70._vptr_BaseFab
                                                 [lVar82 + lVar58 + lVar52 + lVar78 * 5] * dVar550)
                               + (double)local_9f8[lVar99 + lVar77 + lVar78 * 8] * dVar336 *
                                 (auVar290._8_8_ +
                                  auVar341._8_8_ + auVar354._8_8_ + 1.0 + auVar354._0_8_ +
                                  auVar341._0_8_ + auVar290._0_8_) *
                                 ((double)local_a70._vptr_BaseFab
                                          [lVar79 + lVar70 + lVar77 + lVar78 * 4] * dVar120 +
                                 (double)local_a70._vptr_BaseFab
                                         [lVar79 + lVar70 + lVar77 + lVar78 * 2] * dVar581 +
                                 (double)local_a70._vptr_BaseFab[lVar79 + lVar70 + lVar77 + lVar78]
                                 * dVar552 +
                                 (double)local_a70._vptr_BaseFab[lVar79 + lVar70 + lVar77] * dVar433
                                 + (double)p_Var13 * dVar550 +
                                   (double)local_a70._vptr_BaseFab
                                           [lVar79 + lVar70 + lVar52 + lVar78 * 3] * dVar430 +
                                   dVar469 * (double)p_Var12 +
                                   (double)local_a70._vptr_BaseFab
                                           [lVar79 + lVar70 + lVar52 + lVar78 * 7]) +
                                 (dVar473 /
                                 ((dVar466 + dVar680) * dVar695 +
                                  (dVar339 + dVar680) * dVar431 + dVar473 +
                                  (dVar466 + dVar663) * dVar683 + 1e-100)) *
                                 ((double)local_a70._vptr_BaseFab
                                          [lVar79 + lVar58 + lVar77 + lVar78 * 4] * dVar581 +
                                 (double)local_a70._vptr_BaseFab[lVar79 + lVar58 + lVar77 + lVar78]
                                 * dVar433 +
                                 (double)local_a70._vptr_BaseFab
                                         [lVar79 + lVar58 + lVar52 + lVar78 * 5] * dVar430 +
                                 (double)local_a70._vptr_BaseFab
                                         [lVar79 + lVar58 + lVar52 + lVar78 * 7] * dVar550) +
                                 (dVar641 /
                                 ((dVar472 + dVar515) * dVar579 +
                                  (dVar387 + dVar432) * dVar616 + dVar641 +
                                  (dVar472 + dVar432) * dVar554 + 1e-100)) *
                                 ((double)local_a70._vptr_BaseFab
                                          [lVar83 + lVar70 + lVar102 + lVar78 * 5] * dVar578 +
                                 (double)local_a70._vptr_BaseFab
                                         [lVar83 + lVar70 + lVar102 + lVar78 * 3] * dVar697 +
                                 (double)local_a70._vptr_BaseFab
                                         [lVar92 + lVar70 + lVar102 + lVar78 * 7] * dVar120 +
                                 (double)local_a70._vptr_BaseFab
                                         [lVar92 + lVar70 + lVar102 + lVar78 * 6] * dVar581 +
                                 (double)p_Var9 * dVar334 +
                                 (double)local_a70._vptr_BaseFab[lVar83 + lVar70 + lVar102] *
                                 dVar122 + (double)local_a70._vptr_BaseFab
                                                   [lVar92 + lVar70 + lVar102 + lVar78 * 2] *
                                           dVar550 + dVar184 * (double)local_a70._vptr_BaseFab
                                                                       [lVar83 + lVar70 + (long)
                                                  local_868 + lVar78 * 5] +
                                                  dVar662 * (double)local_a70._vptr_BaseFab
                                                                    [lVar83 + lVar70 + (long)
                                                  local_868 + lVar78 * 3] +
                                                  (double)local_a70._vptr_BaseFab
                                                          [lVar92 + lVar70 + (long)local_868 +
                                                                             lVar78 * 6] * dVar645 +
                                                  (double)local_a70._vptr_BaseFab
                                                          [lVar92 + lVar70 + (long)local_868 +
                                                                             lVar78 * 7] * dVar121 +
                                           (double)local_a70._vptr_BaseFab
                                                   [lVar92 + lVar70 + lVar102 + lVar78 * 4]) +
                                 (double)((uVar111 & 0x3fe0000000000000 | ~uVar111 & (ulong)dVar553)
                                          & uVar333 | ~uVar333 & (ulong)dVar553) *
                                 ((double)local_a70._vptr_BaseFab
                                          [lVar83 + lVar58 + lVar102 + lVar78 * 5] * dVar697 +
                                 (double)local_de8[lVar78 * 7] * dVar581 +
                                 (double)local_a70._vptr_BaseFab[lVar83 + lVar58 + lVar102 + lVar78]
                                 * dVar122 +
                                 (double)local_de8[lVar78 * 4] * dVar550 +
                                 dVar645 * (double)local_a70._vptr_BaseFab
                                                   [lVar92 + lVar58 + (long)local_868 + lVar78 * 7]
                                 + (double)local_a70._vptr_BaseFab
                                           [lVar83 + lVar58 + (long)local_868 + lVar78 * 5] *
                                   dVar662) +
                                 (double)((uVar107 & 0x3fe0000000000000 | ~uVar107 & (ulong)dVar582)
                                          & -(ulong)((double)p_Var21 == 0.0) |
                                         ~-(ulong)((double)p_Var21 == 0.0) & (ulong)dVar582) *
                                 ((double)local_a70._vptr_BaseFab
                                          [lVar82 + lVar70 + lVar102 + lVar78 * 7] * dVar578 +
                                 (double)local_a70._vptr_BaseFab
                                         [lVar82 + lVar70 + lVar102 + lVar78 * 6] * dVar697 +
                                 (double)local_a70._vptr_BaseFab
                                         [lVar82 + lVar70 + lVar102 + lVar78 * 5] * dVar120 +
                                 (double)local_a70._vptr_BaseFab
                                         [lVar82 + lVar70 + lVar102 + lVar78 * 3] * dVar581 +
                                 (double)local_9f8[lVar70 + lVar102 + lVar78 * 7] * dVar552 +
                                 (double)local_9f8[lVar70 + lVar102 + lVar78 * 6] * dVar433 +
                                 (double)local_a70._vptr_BaseFab
                                         [lVar82 + lVar70 + lVar102 + lVar78 * 4] * dVar334 +
                                 (double)local_a70._vptr_BaseFab
                                         [lVar82 + lVar70 + lVar102 + lVar78 * 2] * dVar122 +
                                 (double)local_a70._vptr_BaseFab[lVar82 + lVar70 + lVar102] *
                                 dVar550 + (double)local_9f8[lVar70 + lVar102 + lVar78 * 4] *
                                           dVar469 + (double)local_9f8[lVar70 + lVar102 + lVar78 * 2
                                                                      ] * dVar430 +
                                                     (double)local_a70._vptr_BaseFab
                                                             [lVar82 + lVar70 + (long)local_868 +
                                                                                lVar78 * 7] *
                                                     dVar184 + (double)local_a70._vptr_BaseFab
                                                                       [lVar82 + lVar70 + (long)
                                                  local_868 + lVar78 * 6] * dVar662 +
                                                  (double)local_a70._vptr_BaseFab
                                                          [lVar82 + lVar70 + (long)local_868 +
                                                                             lVar78 * 5] * dVar121 +
                                                  (double)local_a70._vptr_BaseFab
                                                          [lVar82 + lVar70 + (long)local_868 +
                                                                             lVar78 * 3] * dVar645 +
                                                  dVar513 * (double)local_9f8[lVar70 + (long)
                                                  local_868 + lVar78 * 6] +
                                                  dVar229 * (double)local_9f8[lVar70 + (long)
                                                  local_868 + lVar78 * 7] + (double)p_Var8) +
                                 ((double)local_a70._vptr_BaseFab
                                          [lVar79 + lVar70 + lVar102 + lVar78 * 7] * dVar120 +
                                 (double)local_a70._vptr_BaseFab
                                         [lVar79 + lVar70 + lVar102 + lVar78 * 6] * dVar581 +
                                 (double)local_a70._vptr_BaseFab
                                         [lVar79 + lVar70 + lVar102 + lVar78 * 5] * dVar552 +
                                 (double)local_a70._vptr_BaseFab
                                         [lVar79 + lVar70 + lVar102 + lVar78 * 3] * dVar433 +
                                 (double)local_a70._vptr_BaseFab
                                         [lVar79 + lVar70 + lVar102 + lVar78 * 2] * dVar550 +
                                 (double)p_Var5 * dVar469 +
                                 (double)local_a70._vptr_BaseFab[lVar79 + lVar70 + lVar102] *
                                 dVar430 + (double)local_a70._vptr_BaseFab
                                                   [lVar79 + lVar70 + (long)local_868 + lVar78 * 7]
                                           * dVar121 +
                                           (double)local_a70._vptr_BaseFab
                                                   [lVar79 + lVar70 + (long)local_868 + lVar78 * 6]
                                           * dVar645 +
                                           (double)local_a70._vptr_BaseFab
                                                   [lVar79 + lVar70 + (long)local_868 + lVar78 * 3]
                                           * dVar513 +
                                           (double)local_a70._vptr_BaseFab
                                                   [lVar79 + lVar70 + (long)local_868 + lVar78 * 5]
                                           * dVar229 +
                                 (double)local_a70._vptr_BaseFab
                                         [lVar79 + lVar70 + lVar102 + lVar78 * 4]) * auVar625._8_8_
                                 + ((double)local_a70._vptr_BaseFab
                                            [lVar79 + lVar58 + lVar102 + lVar78 * 7] * dVar581 +
                                   (double)local_a70._vptr_BaseFab
                                           [lVar79 + lVar58 + lVar102 + lVar78 * 5] * dVar433 +
                                   (double)local_a70._vptr_BaseFab
                                           [lVar79 + lVar58 + lVar102 + lVar78 * 4] * dVar550 +
                                   (double)local_a70._vptr_BaseFab
                                           [lVar79 + lVar58 + lVar102 + lVar78] * dVar430 +
                                   (double)local_a70._vptr_BaseFab
                                           [lVar79 + lVar58 + (long)local_868 + lVar78 * 5] *
                                   dVar513 + (double)local_a70._vptr_BaseFab
                                                     [lVar79 + lVar58 + (long)local_868 + lVar78 * 7
                                                     ] * dVar645) *
                                   (double)((-(ulong)((double)p_Var17 == 0.0) & 0x3fe0000000000000 |
                                            ~-(ulong)((double)p_Var17 == 0.0) & (ulong)dVar337) &
                                            -(ulong)((double)p_Var16 == 0.0) |
                                           ~-(ulong)((double)p_Var16 == 0.0) & (ulong)dVar337) +
                                   ((double)p_Var20 * dVar334 +
                                   (double)p_Var19 * dVar122 +
                                   dVar550 * (double)local_a70._vptr_BaseFab
                                                     [lVar92 + lVar70 + lVar76 + lVar78 * 6] +
                                   (double)p_Var18 * dVar184 +
                                   (double)local_a70._vptr_BaseFab[lVar83 + lVar70 + lVar76] *
                                   dVar662 + (double)p_Var11 * dVar645 + dVar121 * (double)p_Var10 +
                                   (double)local_a70._vptr_BaseFab
                                           [lVar92 + lVar70 + lVar76 + lVar78 * 7]) *
                                   (double)local_468[lVar99 + (long)local_868 + lVar78 * 8] *
                                   dVar332 * ((double)((ulong)local_a70._vptr_BaseFab
                                                              [lVar82 + lVar99 + (long)local_868 +
                                                                                 lVar78 * 6] &
                                                      uVar114) / (dVar338 + 1e-100) +
                                             (double)((ulong)local_468[lVar58 + (long)local_868 +
                                                                                lVar78 * 5] &
                                                     uVar114) / (dStack_880 + dVar332 + 1e-100) +
                                             auVar186._8_8_ +
                                             auVar404._8_8_ + auVar487._8_8_ + auVar522._8_8_ + 1.0)
                                   + ((double)local_a70._vptr_BaseFab
                                              [lVar83 + lVar58 + lVar76 + lVar78 * 5] * dVar122 +
                                     (double)local_a70._vptr_BaseFab
                                             [lVar92 + lVar58 + lVar76 + lVar78 * 7] * dVar550 +
                                     (double)local_a70._vptr_BaseFab
                                             [lVar92 + lVar58 + lVar76 + lVar78 * 4] * dVar645 +
                                     (double)local_a70._vptr_BaseFab
                                             [lVar83 + lVar58 + lVar76 + lVar78] * dVar662) *
                                     (double)p_Stack_14b0 +
                                     ((double)local_a70._vptr_BaseFab
                                              [lVar82 + lVar70 + lVar76 + lVar78 * 7] * dVar334 +
                                     (double)local_a70._vptr_BaseFab
                                             [lVar82 + lVar70 + lVar76 + lVar78 * 6] * dVar122 +
                                     (double)local_a70._vptr_BaseFab
                                             [lVar82 + lVar70 + lVar76 + lVar78 * 3] * dVar550 +
                                     (double)local_9f8[lVar70 + lVar76 + lVar78 * 7] * dVar469 +
                                     (double)local_9f8[lVar70 + lVar76 + lVar78 * 6] * dVar430 +
                                     (double)local_a70._vptr_BaseFab
                                             [lVar82 + lVar70 + lVar76 + lVar78 * 4] * dVar184 +
                                     (double)local_a70._vptr_BaseFab
                                             [lVar82 + lVar70 + lVar76 + lVar78 * 2] * dVar662 +
                                     (double)p_Var6 * dVar121 +
                                     (double)local_a70._vptr_BaseFab[lVar82 + lVar70 + lVar76] *
                                     dVar645 + (double)local_9f8[lVar70 + lVar76 + lVar78 * 2] *
                                               dVar513 + (double)local_9f8[lVar70 + lVar76 + lVar78 
                                                  * 4] * dVar229 +
                                     (double)local_a70._vptr_BaseFab
                                             [lVar82 + lVar70 + lVar76 + lVar78 * 5]) *
                                     (dVar512 /
                                     ((dVar386 + dVar331) * auVar235._8_8_ +
                                      (dVar386 + dVar281) * auVar235._0_8_ + dVar512 +
                                      (dVar471 + dVar281) * auVar350._0_8_ + 1e-100)) +
                                     ((double)local_a70._vptr_BaseFab
                                              [lVar82 + lVar58 + lVar76 + lVar78 * 7] * dVar122 +
                                     (double)local_a70._vptr_BaseFab
                                             [lVar82 + lVar58 + lVar76 + lVar78 * 5] * dVar550 +
                                     (double)local_9f8[lVar58 + lVar76 + lVar78 * 7] * dVar430 +
                                     (double)local_a70._vptr_BaseFab
                                             [lVar82 + lVar58 + lVar76 + lVar78 * 4] * dVar662 +
                                     (double)local_9f8[lVar58 + lVar76 + lVar78 * 4] * dVar513 +
                                     (double)local_a70._vptr_BaseFab
                                             [lVar82 + lVar58 + lVar76 + lVar78] * dVar645) *
                                     (double)((-(ulong)((double)p_Var15 == 0.0) & 0x3fe0000000000000
                                              | ~-(ulong)((double)p_Var15 == 0.0) & (ulong)dVar335)
                                              & -(ulong)((double)p_Var14 == 0.0) |
                                             ~-(ulong)((double)p_Var14 == 0.0) & (ulong)dVar335) +
                                     ((double)local_a70._vptr_BaseFab
                                              [lVar79 + lVar58 + lVar76 + lVar78 * 7] * dVar550 +
                                     (double)local_a70._vptr_BaseFab
                                             [lVar79 + lVar58 + lVar76 + lVar78 * 5] * dVar430 +
                                     (double)local_a70._vptr_BaseFab
                                             [lVar79 + lVar58 + lVar76 + lVar78] * dVar513 +
                                     (double)local_a70._vptr_BaseFab
                                             [lVar79 + lVar58 + lVar76 + lVar78 * 4] * dVar645) *
                                     (double)local_1398._8_8_ +
                                     (double)local_9f8[lVar99 + (long)local_868 + lVar78 * 8] *
                                     auVar234._0_8_ *
                                     (auVar287._8_8_ +
                                      auVar285._8_8_ + auVar230._8_8_ + 1.0 + auVar230._0_8_ +
                                      auVar285._0_8_ + auVar287._0_8_) *
                                     ((double)p_Var4 * dVar550 +
                                      (double)p_Var3 * dVar469 +
                                      (double)p_Var100 * dVar430 +
                                      (double)p_Var2 * dVar121 +
                                      (double)p_Var97 * dVar645 +
                                      (double)local_a70._vptr_BaseFab[lVar79 + lVar70 + lVar76] *
                                      dVar513 + (double)p_Var54 * dVar229 +
                                     (double)local_a70._vptr_BaseFab
                                             [lVar79 + lVar70 + lVar76 + lVar78 * 7]) +
                                 (double)local_a70._vptr_BaseFab
                                         [lVar82 + lVar58 + lVar102 + lVar78 * 7] * dVar697 +
                                 dVar581 * (double)local_a70._vptr_BaseFab
                                                   [lVar82 + lVar58 + lVar102 + lVar78 * 5] +
                                 (double)local_9f8[lVar58 + lVar102 + lVar78 * 7] * dVar433 +
                                 (double)local_a70._vptr_BaseFab
                                         [lVar82 + lVar58 + lVar102 + lVar78 * 4] * dVar122 +
                                 dVar550 * (double)p_Var21 +
                                 dVar430 * (double)local_9f8[lVar58 + lVar102 + lVar78 * 4] +
                                 (double)local_a70._vptr_BaseFab
                                         [lVar82 + lVar58 + (long)local_868 + lVar78 * 7] * dVar662
                                 + (double)local_9f8[lVar58 + (long)local_868 + lVar78 * 7] *
                                   dVar513 + (double)local_a70._vptr_BaseFab
                                                     [lVar82 + lVar58 + (long)local_868 + lVar78 * 5
                                                     ] * dVar645) * 0.125;
                          lVar99 = lVar103 * 2 + -1;
                          lVar71 = lVar99 - lVar51;
                          lVar99 = (long)(int)((int)lVar99 + uVar64);
                          dVar120 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar83 + lVar71 + lVar53 + lVar78 * 7]);
                          dVar469 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar83 + lVar99 + lVar76 + lVar78 * 7]);
                          dVar550 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar83 + lVar71 + lVar76 + lVar78 * 7]);
                          dVar334 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar92 + lVar71 + lVar76 + lVar78 * 7]);
                          auVar356._0_8_ =
                               ABS((double)local_a70._vptr_BaseFab
                                           [lVar83 + lVar71 + lVar76 + lVar78]);
                          auVar356._8_8_ =
                               ABS((double)local_a70._vptr_BaseFab
                                           [lVar83 + lVar71 + lVar76 + lVar78 * 2]);
                          auVar489._8_4_ = SUB84(dVar120,0);
                          auVar489._0_8_ = dVar120;
                          auVar489._12_4_ = (int)((ulong)dVar120 >> 0x20);
                          auVar490._8_4_ = SUB84(dVar550,0);
                          auVar490._0_8_ = dVar550;
                          auVar490._12_4_ = (int)((ulong)dVar550 >> 0x20);
                          auVar447._0_8_ =
                               dVar334 + dVar120 + ABS((double)local_a70._vptr_BaseFab
                                                               [lVar92 + lVar71 + lVar53 + lVar78 * 
                                                  7]) + dVar550 + 1e-100;
                          auVar447._8_8_ =
                               dVar469 + auVar489._8_8_ +
                                         ABS((double)local_a70._vptr_BaseFab
                                                     [lVar83 + lVar99 + lVar53 + lVar78 * 7]) +
                               auVar490._8_8_ + 1e-100;
                          auVar186 = divpd(auVar356,auVar447);
                          auVar293._0_8_ =
                               ABS((double)local_a70._vptr_BaseFab
                                           [lVar83 + lVar71 + lVar76 + lVar78 * 4]);
                          auVar293._8_8_ =
                               ABS((double)local_a70._vptr_BaseFab
                                           [lVar83 + lVar71 + lVar76 + lVar78 * 3]);
                          auVar244._0_8_ = dVar120 + dVar550 + 1e-100;
                          auVar244._8_8_ =
                               dVar334 + ABS((double)local_a70._vptr_BaseFab
                                                     [lVar92 + lVar99 + lVar76 + lVar78 * 7]) +
                               dVar469 + auVar490._8_8_ + 1e-100;
                          auVar343 = divpd(auVar293,auVar244);
                          auVar294._0_8_ =
                               ABS((double)local_a70._vptr_BaseFab
                                           [lVar83 + lVar71 + lVar76 + lVar78 * 6]);
                          auVar294._8_8_ =
                               ABS((double)local_a70._vptr_BaseFab
                                           [lVar83 + lVar71 + lVar76 + lVar78 * 5]);
                          auVar688._0_8_ = dVar469 + dVar550 + 1e-100;
                          auVar688._8_8_ = dVar550 + dVar334 + 1e-100;
                          auVar341 = divpd(auVar294,auVar688);
                          dVar388 = (double)local_a70._vptr_BaseFab
                                            [lVar83 + lVar71 + lVar76 + lVar78 * 8] * dVar550 *
                                    (auVar341._8_8_ +
                                     auVar343._8_8_ + auVar186._8_8_ + auVar186._0_8_ + 1.0 +
                                     auVar343._0_8_ + auVar341._0_8_);
                          auVar193._0_8_ =
                               (ulong)local_a70._vptr_BaseFab[lVar83 + lVar58 + lVar76 + lVar78 * 2]
                               & 0x7fffffffffffffff;
                          auVar193._8_8_ =
                               (ulong)local_a70._vptr_BaseFab[lVar92 + lVar58 + lVar76 + lVar78 * 2]
                               & 0x7fffffffffffffff;
                          dVar120 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar83 + lVar58 + lVar53 + lVar78 * 6]);
                          dVar121 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar92 + lVar58 + lVar53 + lVar78 * 6]);
                          dVar432 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar83 + lVar58 + lVar76 + lVar78 * 6]);
                          dVar122 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar92 + lVar58 + lVar76 + lVar78 * 6]);
                          auVar357._0_8_ = dVar120 + dVar432 + 1e-100;
                          auVar357._8_8_ = dVar121 + dVar122 + 1e-100;
                          auVar343 = divpd(auVar193,auVar357);
                          dVar469 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar83 + lVar58 + lVar53 + lVar78 * 3]) /
                                    (dVar121 + dVar120 + 1e-100);
                          dVar123 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar83 + lVar58 + lVar76 + lVar78 * 3]) /
                                    (dVar122 + dVar432 + 1e-100);
                          dVar550 = auVar343._0_8_ + 1.0;
                          dVar334 = auVar343._8_8_ + 1.0;
                          dVar432 = (dVar123 + dVar550) * dVar432;
                          dVar432 = dVar432 / ((dVar123 + dVar334) * dVar122 +
                                               (dVar469 + dVar334) * dVar121 +
                                               (dVar469 + dVar550) * dVar120 + dVar432 + 1e-100);
                          dVar550 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar83 + lVar93 + lVar76 + lVar78 * 7]);
                          dVar334 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar92 + lVar93 + lVar76 + lVar78 * 7]);
                          dVar120 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar83 + lVar93 + lVar53 + lVar78 * 7]);
                          dVar121 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar83 + lVar70 + lVar76 + lVar78 * 7]);
                          auVar358._0_8_ =
                               ABS((double)local_a70._vptr_BaseFab
                                           [lVar83 + lVar70 + lVar76 + lVar78 * 2]);
                          auVar358._8_8_ =
                               ABS((double)local_a70._vptr_BaseFab
                                           [lVar83 + lVar93 + lVar76 + lVar78]);
                          auVar408._8_4_ = SUB84(dVar120,0);
                          auVar408._0_8_ = dVar120;
                          auVar408._12_4_ = (int)((ulong)dVar120 >> 0x20);
                          auVar409._0_8_ =
                               dVar120 + ABS((double)local_a70._vptr_BaseFab
                                                     [lVar83 + lVar70 + lVar53 + lVar78 * 7]) +
                               dVar550 + dVar121 + 1e-100;
                          auVar409._8_8_ =
                               auVar408._8_8_ +
                               ABS((double)local_a70._vptr_BaseFab
                                           [lVar92 + lVar93 + lVar53 + lVar78 * 7]) + dVar334 +
                               dVar550 + 1e-100;
                          auVar341 = divpd(auVar358,auVar409);
                          dVar469 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar89 + lVar58 + lVar76 + lVar78 * 3]);
                          dVar469 = dVar469 / (ABS((double)local_a70._vptr_BaseFab
                                                           [lVar89 + lVar58 + lVar53 + lVar78 * 3])
                                              + dVar469);
                          uVar107 = -(ulong)((double)local_a70._vptr_BaseFab
                                                     [lVar89 + lVar58 + lVar76 + lVar78 * 3] == 0.0)
                          ;
                          uVar333 = -(ulong)((double)local_a70._vptr_BaseFab
                                                     [lVar89 + lVar58 + lVar53 + lVar78 * 3] == 0.0)
                          ;
                          dVar469 = (double)((uVar107 & 0x3fe0000000000000 |
                                             ~uVar107 & (ulong)dVar469) & uVar333 |
                                            ~uVar333 & (ulong)dVar469);
                          auVar359._0_8_ =
                               ABS((double)local_a70._vptr_BaseFab
                                           [lVar83 + lVar93 + lVar76 + lVar78 * 4]);
                          auVar359._8_8_ =
                               ABS((double)local_a70._vptr_BaseFab
                                           [lVar83 + lVar70 + lVar76 + lVar78 * 3]);
                          auVar245._0_8_ = dVar550 + dVar120 + 1e-100;
                          auVar245._8_8_ =
                               dVar334 + ABS((double)local_a70._vptr_BaseFab
                                                     [lVar92 + lVar70 + lVar76 + lVar78 * 7]) +
                               dVar550 + dVar121 + 1e-100;
                          auVar186 = divpd(auVar359,auVar245);
                          auVar295._0_8_ =
                               ABS((double)local_a70._vptr_BaseFab
                                           [lVar83 + lVar70 + lVar76 + lVar78 * 6]);
                          auVar295._8_8_ =
                               ABS((double)local_a70._vptr_BaseFab
                                           [lVar83 + lVar93 + lVar76 + lVar78 * 5]);
                          auVar194._0_8_ = dVar121 + dVar550 + 1e-100;
                          auVar194._8_8_ = dVar550 + dVar334 + 1e-100;
                          auVar343 = divpd(auVar295,auVar194);
                          dVar466 = (double)local_a70._vptr_BaseFab
                                            [lVar83 + lVar70 + lVar76 + lVar78 * 8] * dVar550 *
                                    (auVar343._8_8_ +
                                     auVar186._8_8_ + auVar341._8_8_ + 1.0 + auVar341._0_8_ +
                                     auVar186._0_8_ + auVar343._0_8_);
                          auVar246._0_8_ =
                               (ulong)local_a70._vptr_BaseFab[lVar89 + lVar71 + lVar76 + lVar78] &
                               0x7fffffffffffffff;
                          auVar246._8_8_ =
                               (ulong)local_a70._vptr_BaseFab[lVar89 + lVar99 + lVar76 + lVar78] &
                               0x7fffffffffffffff;
                          dVar550 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar89 + lVar71 + lVar53 + lVar78 * 5]);
                          dVar334 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar89 + lVar99 + lVar53 + lVar78 * 5]);
                          dVar332 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar89 + lVar71 + lVar76 + lVar78 * 5]);
                          dVar120 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar89 + lVar99 + lVar76 + lVar78 * 5]);
                          auVar296._0_8_ = dVar550 + dVar332 + 1e-100;
                          auVar296._8_8_ = dVar334 + dVar120 + 1e-100;
                          auVar343 = divpd(auVar246,auVar296);
                          dVar123 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar89 + lVar71 + lVar53 + lVar78 * 3]) /
                                    (dVar334 + dVar550 + 1e-100);
                          dVar124 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar89 + lVar71 + lVar76 + lVar78 * 3]) /
                                    (dVar120 + dVar332 + 1e-100);
                          dVar121 = auVar343._0_8_ + 1.0;
                          dVar122 = auVar343._8_8_ + 1.0;
                          dVar332 = (dVar124 + dVar121) * dVar332;
                          dVar332 = dVar332 / ((dVar124 + dVar122) * dVar120 +
                                               (dVar123 + dVar122) * dVar334 +
                                               (dVar123 + dVar121) * dVar550 + dVar332 + 1e-100);
                          auVar128._0_8_ =
                               (ulong)local_a70._vptr_BaseFab[lVar89 + lVar70 + lVar76 + lVar78] &
                               0x7fffffffffffffff;
                          auVar128._8_8_ =
                               (ulong)local_a70._vptr_BaseFab[lVar89 + lVar93 + lVar76 + lVar78] &
                               0x7fffffffffffffff;
                          dVar120 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar89 + lVar70 + lVar53 + lVar78 * 5]);
                          dVar121 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar89 + lVar93 + lVar53 + lVar78 * 5]);
                          dVar122 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar89 + lVar70 + lVar76 + lVar78 * 5]);
                          dVar281 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar89 + lVar93 + lVar76 + lVar78 * 5]);
                          auVar297._0_8_ = dVar120 + dVar122 + 1e-100;
                          auVar297._8_8_ = dVar121 + dVar281 + 1e-100;
                          auVar343 = divpd(auVar128,auVar297);
                          dVar123 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar89 + lVar70 + lVar53 + lVar78 * 3]) /
                                    (dVar121 + dVar120 + 1e-100);
                          dVar124 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar89 + lVar70 + lVar76 + lVar78 * 3]) /
                                    (dVar281 + dVar122 + 1e-100);
                          dVar550 = auVar343._0_8_ + 1.0;
                          dVar334 = auVar343._8_8_ + 1.0;
                          dVar281 = (dVar124 + dVar334) * dVar281;
                          dVar281 = dVar281 / ((dVar123 + dVar334) * dVar121 +
                                               (dVar123 + dVar550) * dVar120 + dVar281 +
                                               (dVar124 + dVar550) * dVar122 + 1e-100);
                          dVar550 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar83 + lVar58 + lVar102 + lVar78 * 2]);
                          dVar550 = dVar550 / (ABS((double)local_de8[lVar78 * 2]) + dVar550);
                          uVar107 = -(ulong)((double)local_a70._vptr_BaseFab
                                                     [lVar83 + lVar58 + lVar102 + lVar78 * 2] == 0.0
                                            );
                          uVar333 = -(ulong)((double)local_de8[lVar78 * 2] == 0.0);
                          dVar550 = (double)((uVar107 & 0x3fe0000000000000 |
                                             ~uVar107 & (ulong)dVar550) & uVar333 |
                                            ~uVar333 & (ulong)dVar550);
                          uStack_8e0 = 0;
                          auVar129._0_8_ =
                               (ulong)local_a70._vptr_BaseFab[lVar83 + lVar70 + lVar102 + lVar78] &
                               0x7fffffffffffffff;
                          auVar129._8_8_ =
                               ABS((double)local_a70._vptr_BaseFab
                                           [lVar83 + lVar93 + lVar102 + lVar78]);
                          dVar121 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar92 + lVar70 + lVar102 + lVar78 * 4]);
                          dVar122 = ABS((double)local_858[lVar78 * 4]);
                          dVar123 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar83 + lVar70 + lVar102 + lVar78 * 4]);
                          dVar339 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar83 + lVar93 + lVar102 + lVar78 * 4]);
                          auVar298._0_8_ = dVar121 + dVar123 + 1e-100;
                          auVar298._8_8_ = dVar122 + dVar339 + 1e-100;
                          auVar343 = divpd(auVar129,auVar298);
                          dVar124 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar92 + lVar70 + lVar102 + lVar78 * 2]) /
                                    (dVar122 + dVar121 + 1e-100);
                          dVar183 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar83 + lVar70 + lVar102 + lVar78 * 2]) /
                                    (dVar339 + dVar123 + 1e-100);
                          dVar334 = auVar343._0_8_ + 1.0;
                          dVar120 = auVar343._8_8_ + 1.0;
                          dVar339 = (dVar183 + dVar120) * dVar339;
                          dVar339 = dVar339 / ((dVar124 + dVar120) * dVar122 +
                                               (dVar124 + dVar334) * dVar121 + dVar339 +
                                               (dVar183 + dVar334) * dVar123 + 1e-100);
                          dVar334 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar89 + lVar71 + lVar102 + lVar78]);
                          dVar334 = dVar334 / (ABS((double)local_a70._vptr_BaseFab
                                                           [lVar89 + lVar99 + lVar102 + lVar78]) +
                                              dVar334);
                          uVar107 = -(ulong)((double)local_a70._vptr_BaseFab
                                                     [lVar89 + lVar71 + lVar102 + lVar78] == 0.0);
                          uVar333 = -(ulong)((double)local_a70._vptr_BaseFab
                                                     [lVar89 + lVar99 + lVar102 + lVar78] == 0.0);
                          dVar334 = (double)((uVar107 & 0x3fe0000000000000 |
                                             ~uVar107 & (ulong)dVar334) & uVar333 |
                                            ~uVar333 & (ulong)dVar334);
                          dVar120 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar89 + lVar93 + lVar102 + lVar78]);
                          dVar120 = dVar120 / (ABS((double)local_a70._vptr_BaseFab
                                                           [lVar89 + lVar70 + lVar102 + lVar78]) +
                                              dVar120);
                          uVar107 = -(ulong)((double)local_a70._vptr_BaseFab
                                                     [lVar89 + lVar70 + lVar102 + lVar78] == 0.0);
                          uVar333 = -(ulong)((double)local_a70._vptr_BaseFab
                                                     [lVar89 + lVar93 + lVar102 + lVar78] == 0.0);
                          dVar120 = (double)((uVar107 & 0x3fe0000000000000 |
                                             ~uVar107 & (ulong)dVar120) & uVar333 |
                                            ~uVar333 & (ulong)dVar120);
                          dVar427 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar83 + lVar71 + lVar52 + lVar78 * 7]);
                          dVar122 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar83 + lVar71 + lVar77 + lVar78 * 7]);
                          dVar123 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar83 + lVar99 + lVar52 + lVar78 * 7]) + dVar427;
                          dVar124 = dVar427 + ABS((double)local_a70._vptr_BaseFab
                                                          [lVar92 + lVar71 + lVar52 + lVar78 * 7]);
                          auVar448._8_4_ = SUB84(dVar122,0);
                          auVar448._0_8_ = dVar122;
                          auVar448._12_4_ = (int)((ulong)dVar122 >> 0x20);
                          uStack_4c0 = 0;
                          auVar130._0_8_ =
                               ABS((double)local_a70._vptr_BaseFab
                                           [lVar83 + lVar71 + lVar77 + lVar78 * 2]);
                          auVar130._8_8_ =
                               ABS((double)local_a70._vptr_BaseFab
                                           [lVar83 + lVar71 + lVar77 + lVar78]);
                          auVar449._0_8_ =
                               dVar122 + ABS((double)local_a70._vptr_BaseFab
                                                     [lVar83 + lVar99 + lVar77 + lVar78 * 7]) +
                                         dVar123 + 1e-100;
                          auVar449._8_8_ =
                               auVar448._8_8_ +
                               ABS((double)local_a70._vptr_BaseFab
                                           [lVar92 + lVar71 + lVar77 + lVar78 * 7]) + dVar124 +
                               1e-100;
                          auVar343 = divpd(auVar130,auVar449);
                          auVar131._8_4_ = SUB84(dVar427,0);
                          auVar131._0_8_ = dVar427;
                          auVar131._12_4_ = (int)((ulong)dVar427 >> 0x20);
                          dVar121 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar89 + lVar58 + lVar52 + lVar78 * 3]);
                          dVar121 = dVar121 / (ABS((double)local_a70._vptr_BaseFab
                                                           [lVar89 + lVar58 + lVar77 + lVar78 * 3])
                                              + dVar121);
                          uVar107 = -(ulong)((double)local_a70._vptr_BaseFab
                                                     [lVar89 + lVar58 + lVar77 + lVar78 * 3] == 0.0)
                          ;
                          uVar333 = -(ulong)((double)local_a70._vptr_BaseFab
                                                     [lVar89 + lVar58 + lVar52 + lVar78 * 3] == 0.0)
                          ;
                          dVar121 = (double)((uVar107 & 0x3fe0000000000000 |
                                             ~uVar107 & (ulong)dVar121) & uVar333 |
                                            ~uVar333 & (ulong)dVar121);
                          local_14b8 = local_a70._vptr_BaseFab + lVar83 + lVar93 + lVar77;
                          p_Stack_14b0 = p_Var22;
                          auVar132._0_8_ =
                               ABS((double)local_a70._vptr_BaseFab
                                           [lVar83 + lVar71 + lVar77 + lVar78 * 4]);
                          auVar132._8_8_ =
                               ABS((double)local_a70._vptr_BaseFab
                                           [lVar83 + lVar71 + lVar52 + lVar78 * 3]);
                          auVar299._0_8_ = dVar122 + dVar427 + 1e-100;
                          auVar299._8_8_ =
                               ABS((double)local_a70._vptr_BaseFab
                                           [lVar92 + lVar71 + lVar52 + lVar78 * 7]) +
                               ABS((double)local_a70._vptr_BaseFab
                                           [lVar92 + lVar99 + lVar52 + lVar78 * 7]) +
                               ABS((double)local_a70._vptr_BaseFab
                                           [lVar83 + lVar99 + lVar52 + lVar78 * 7]) + auVar131._8_8_
                               + 1e-100;
                          auVar341 = divpd(auVar132,auVar299);
                          iVar74 = (int)(lVar103 * 2);
                          lVar59 = (long)(int)(iVar74 + uVar64);
                          auVar629._0_8_ =
                               ABS((double)local_a70._vptr_BaseFab
                                           [lVar83 + lVar71 + lVar52 + lVar78 * 6]);
                          auVar629._8_8_ =
                               ABS((double)local_a70._vptr_BaseFab
                                           [lVar83 + lVar71 + lVar52 + lVar78 * 5]);
                          auVar526._0_8_ = dVar123 + 1e-100;
                          auVar526._8_8_ = dVar124 + 1e-100;
                          auVar285 = divpd(auVar629,auVar526);
                          auVar133._0_8_ =
                               (ulong)local_a70._vptr_BaseFab[lVar83 + lVar58 + lVar77 + lVar78 * 2]
                               & 0x7fffffffffffffff;
                          auVar133._8_8_ =
                               (ulong)local_a70._vptr_BaseFab[lVar92 + lVar58 + lVar77 + lVar78 * 2]
                               & 0x7fffffffffffffff;
                          dVar473 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar83 + lVar58 + lVar52 + lVar78 * 6]);
                          dVar124 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar92 + lVar58 + lVar52 + lVar78 * 6]);
                          dVar183 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar83 + lVar58 + lVar77 + lVar78 * 6]);
                          dVar184 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar92 + lVar58 + lVar77 + lVar78 * 6]);
                          auVar410._0_8_ = dVar473 + dVar183 + 1e-100;
                          auVar410._8_8_ = dVar124 + dVar184 + 1e-100;
                          auVar186 = divpd(auVar133,auVar410);
                          dVar384 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar83 + lVar58 + lVar52 + lVar78 * 3]) /
                                    (dVar124 + dVar473 + 1e-100);
                          dVar229 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar83 + lVar58 + lVar77 + lVar78 * 3]) /
                                    (dVar184 + dVar183 + 1e-100);
                          dVar122 = auVar186._0_8_ + 1.0;
                          dVar123 = auVar186._8_8_ + 1.0;
                          dVar473 = (dVar384 + dVar122) * dVar473;
                          dVar473 = dVar473 / ((dVar229 + dVar123) * dVar184 +
                                               (dVar384 + dVar123) * dVar124 + dVar473 +
                                               (dVar229 + dVar122) * dVar183 + 1e-100);
                          dVar183 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar83 + lVar93 + lVar52 + lVar78 * 7]);
                          dVar122 = ABS((double)local_14b8[lVar78 * 7]);
                          dVar123 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar83 + lVar70 + lVar52 + lVar78 * 7]) + dVar183;
                          dVar124 = dVar183 + ABS((double)local_a70._vptr_BaseFab
                                                          [lVar92 + lVar93 + lVar52 + lVar78 * 7]);
                          auVar300._0_8_ =
                               ABS((double)local_a70._vptr_BaseFab
                                           [lVar83 + lVar70 + lVar77 + lVar78 * 2]);
                          auVar300._8_8_ = ABS((double)local_14b8[lVar78]);
                          auVar491._0_8_ =
                               ABS((double)local_a70._vptr_BaseFab
                                           [lVar83 + lVar70 + lVar77 + lVar78 * 7]) +
                               dVar122 + dVar123 + 1e-100;
                          auVar491._8_8_ =
                               dVar122 + ABS((double)local_a70._vptr_BaseFab
                                                     [lVar92 + lVar93 + lVar77 + lVar78 * 7]) +
                                         dVar124 + 1e-100;
                          auVar186 = divpd(auVar300,auVar491);
                          auVar669._0_8_ = ABS((double)local_14b8[lVar78 * 4]);
                          auVar669._8_8_ =
                               ABS((double)local_a70._vptr_BaseFab
                                           [lVar83 + lVar70 + lVar52 + lVar78 * 3]);
                          auVar134._0_8_ = dVar183 + dVar122 + 1e-100;
                          auVar134._8_8_ =
                               ABS((double)local_a70._vptr_BaseFab
                                           [lVar92 + lVar93 + lVar52 + lVar78 * 7]) +
                               ABS((double)local_a70._vptr_BaseFab
                                           [lVar92 + lVar70 + lVar52 + lVar78 * 7]) + dVar183 +
                               ABS((double)local_a70._vptr_BaseFab
                                           [lVar83 + lVar70 + lVar52 + lVar78 * 7]) + 1e-100;
                          auVar287 = divpd(auVar669,auVar134);
                          auVar594._0_8_ =
                               ABS((double)local_a70._vptr_BaseFab
                                           [lVar83 + lVar70 + lVar52 + lVar78 * 6]);
                          auVar594._8_8_ =
                               ABS((double)local_a70._vptr_BaseFab
                                           [lVar83 + lVar93 + lVar52 + lVar78 * 5]);
                          auVar411._0_8_ = dVar123 + 1e-100;
                          auVar411._8_8_ = dVar124 + 1e-100;
                          auVar230 = divpd(auVar594,auVar411);
                          dVar122 = (double)local_a70._vptr_BaseFab
                                            [lVar83 + lVar70 + lVar77 + lVar78 * 8] * dVar183 *
                                    (auVar230._8_8_ +
                                     auVar287._8_8_ + auVar186._8_8_ + 1.0 + auVar186._0_8_ +
                                     auVar287._0_8_ + auVar230._0_8_);
                          auVar412._0_8_ =
                               (ulong)local_a70._vptr_BaseFab[lVar89 + lVar71 + lVar77 + lVar78] &
                               0x7fffffffffffffff;
                          auVar412._8_8_ =
                               (ulong)local_a70._vptr_BaseFab[lVar89 + lVar99 + lVar77 + lVar78] &
                               0x7fffffffffffffff;
                          uStack_6a0 = auVar519._8_8_;
                          dVar124 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar89 + lVar71 + lVar52 + lVar78 * 5]);
                          dVar229 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar89 + lVar99 + lVar52 + lVar78 * 5]);
                          dVar384 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar89 + lVar71 + lVar77 + lVar78 * 5]);
                          dVar385 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar89 + lVar99 + lVar77 + lVar78 * 5]);
                          auVar648._0_8_ = dVar124 + dVar384 + 1e-100;
                          auVar648._8_8_ = dVar229 + dVar385 + 1e-100;
                          auVar186 = divpd(auVar412,auVar648);
                          dVar123 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar89 + lVar71 + lVar52 + lVar78 * 3]) /
                                    (dVar229 + dVar124 + 1e-100);
                          dVar429 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar89 + lVar71 + lVar77 + lVar78 * 3]) /
                                    (dVar385 + dVar384 + 1e-100);
                          dVar183 = auVar186._0_8_ + 1.0;
                          dVar184 = auVar186._8_8_ + 1.0;
                          dVar124 = (dVar123 + dVar183) * dVar124;
                          dVar124 = dVar124 / ((dVar429 + dVar184) * dVar385 +
                                               (dVar123 + dVar184) * dVar229 + dVar124 +
                                               (dVar429 + dVar183) * dVar384 + 1e-100);
                          auVar413._0_8_ =
                               (ulong)local_a70._vptr_BaseFab[lVar89 + lVar70 + lVar77 + lVar78] &
                               0x7fffffffffffffff;
                          auVar413._8_8_ =
                               (ulong)local_a70._vptr_BaseFab[lVar89 + lVar93 + lVar77 + lVar78] &
                               0x7fffffffffffffff;
                          dVar229 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar89 + lVar70 + lVar52 + lVar78 * 5]);
                          dVar123 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar89 + lVar93 + lVar52 + lVar78 * 5]);
                          dVar384 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar89 + lVar70 + lVar77 + lVar78 * 5]);
                          dVar385 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar89 + lVar93 + lVar77 + lVar78 * 5]);
                          auVar649._0_8_ = dVar229 + dVar384 + 1e-100;
                          auVar649._8_8_ = dVar123 + dVar385 + 1e-100;
                          auVar186 = divpd(auVar413,auVar649);
                          dVar429 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar89 + lVar70 + lVar52 + lVar78 * 3]) /
                                    (dVar123 + dVar229 + 1e-100);
                          dVar578 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar89 + lVar70 + lVar77 + lVar78 * 3]) /
                                    (dVar385 + dVar384 + 1e-100);
                          dVar183 = auVar186._0_8_ + 1.0;
                          dVar184 = auVar186._8_8_ + 1.0;
                          dVar123 = (dVar429 + dVar184) * dVar123;
                          dVar123 = dVar123 / ((dVar578 + dVar184) * dVar385 +
                                               (dVar429 + dVar183) * dVar229 + dVar123 +
                                               (dVar578 + dVar183) * dVar384 + 1e-100);
                          dVar433 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar58 + (long)local_868 + lVar78 * 3]);
                          dVar433 = dVar433 / (ABS((double)local_a70._vptr_BaseFab
                                                           [lVar82 + lVar58 + lVar67 + lVar78 * 3])
                                              + dVar433);
                          uVar107 = -(ulong)((double)local_a70._vptr_BaseFab
                                                     [lVar82 + lVar58 + (long)local_868 + lVar78 * 3
                                                     ] == 0.0);
                          uVar333 = -(ulong)((double)local_a70._vptr_BaseFab
                                                     [lVar82 + lVar58 + lVar67 + lVar78 * 3] == 0.0)
                          ;
                          lVar60 = (long)(iVar63 - local_a70.domain.smallend.vect[2]);
                          auVar135._0_8_ =
                               (ulong)local_a70._vptr_BaseFab
                                      [lVar82 + lVar60 + (long)local_868 + lVar78] &
                               0x7fffffffffffffff;
                          auVar135._8_8_ =
                               (ulong)local_a70._vptr_BaseFab
                                      [lVar82 + lVar58 + (long)local_868 + lVar78] &
                               0x7fffffffffffffff;
                          dVar331 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar60 + lVar67 + lVar78 * 5]);
                          dVar336 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar58 + lVar67 + lVar78 * 5]);
                          dVar338 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar60 + (long)local_868 + lVar78 * 5]);
                          dVar430 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar58 + (long)local_868 + lVar78 * 5]);
                          auVar301._0_8_ = dVar331 + dVar338 + 1e-100;
                          auVar301._8_8_ = dVar336 + dVar430 + 1e-100;
                          auVar186 = divpd(auVar135,auVar301);
                          dVar467 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar60 + lVar67 + lVar78 * 3]) /
                                    (dVar336 + dVar331 + 1e-100);
                          dVar471 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar60 + (long)local_868 + lVar78 * 3]) /
                                    (dVar430 + dVar338 + 1e-100);
                          dVar183 = auVar186._0_8_ + 1.0;
                          dVar385 = auVar186._8_8_ + 1.0;
                          dVar430 = (dVar471 + dVar385) * dVar430;
                          iVar74 = iVar74 + -2;
                          lVar80 = (long)(iVar74 - local_a70.domain.smallend.vect[2]);
                          dVar184 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar59 + lVar67 + lVar78 * 7]);
                          auVar247._8_4_ = SUB84(dVar184,0);
                          auVar247._0_8_ = dVar184;
                          auVar247._12_4_ = (int)((ulong)dVar184 >> 0x20);
                          dVar335 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar59 + (long)local_868 + lVar78 * 7]);
                          dVar384 = ABS((double)local_238[lVar59 + (long)local_868 + lVar78 * 7]);
                          auVar360._0_8_ =
                               (ulong)local_238[lVar59 + (long)local_868 + lVar78] &
                               0x7fffffffffffffff;
                          auVar360._8_8_ =
                               (ulong)local_a70._vptr_BaseFab
                                      [lVar82 + lVar59 + (long)local_868 + lVar78 * 2] &
                               0x7fffffffffffffff;
                          auVar248._0_8_ =
                               dVar384 + dVar335 + dVar184 + ABS((double)local_238[lVar59 + lVar67 +
                                                                                            lVar78 *
                                                                                            7]) +
                               1e-100;
                          auVar248._8_8_ =
                               dVar335 + ABS((double)local_a70._vptr_BaseFab
                                                     [lVar82 + lVar80 + (long)local_868 + lVar78 * 7
                                                     ]) +
                                         auVar247._8_8_ +
                                         ABS((double)local_a70._vptr_BaseFab
                                                     [lVar82 + lVar80 + lVar67 + lVar78 * 7]) +
                               1e-100;
                          auVar354 = divpd(auVar360,auVar248);
                          auVar249._8_4_ = SUB84(dVar335,0);
                          auVar249._0_8_ = dVar335;
                          auVar249._12_4_ = (int)((ulong)dVar335 >> 0x20);
                          dVar229 = dVar335 + ABS((double)local_a70._vptr_BaseFab
                                                          [lVar82 + lVar80 + (long)local_868 +
                                                                             lVar78 * 7]);
                          auVar136._0_8_ =
                               (ulong)local_a70._vptr_BaseFab
                                      [lVar82 + lVar59 + (long)local_868 + lVar78 * 4] &
                               0x7fffffffffffffff;
                          auVar136._8_8_ =
                               (ulong)local_238[lVar59 + (long)local_868 + lVar78 * 3] &
                               0x7fffffffffffffff;
                          auVar195._0_8_ = dVar335 + dVar184 + 1e-100;
                          auVar195._8_8_ =
                               ABS((double)local_238[lVar80 + (long)local_868 + lVar78 * 7]) +
                               dVar229 + dVar384 + 1e-100;
                          auVar186 = divpd(auVar136,auVar195);
                          auVar137._0_8_ =
                               (ulong)local_a70._vptr_BaseFab
                                      [lVar82 + lVar59 + (long)local_868 + lVar78 * 6] &
                               0x7fffffffffffffff;
                          auVar137._8_8_ =
                               (ulong)local_238[lVar59 + (long)local_868 + lVar78 * 5] &
                               0x7fffffffffffffff;
                          auVar250._0_8_ = dVar229 + 1e-100;
                          auVar250._8_8_ = auVar249._8_8_ + dVar384 + 1e-100;
                          auVar230 = divpd(auVar137,auVar250);
                          auVar650._0_8_ =
                               (ulong)local_a70._vptr_BaseFab
                                      [lVar82 + lVar58 + (long)local_868 + lVar78 * 2] &
                               0x7fffffffffffffff;
                          auVar650._8_8_ =
                               (ulong)local_238[lVar58 + (long)local_868 + lVar78 * 2] &
                               0x7fffffffffffffff;
                          dVar184 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar58 + lVar67 + lVar78 * 6]);
                          dVar429 = ABS((double)local_238[lVar58 + lVar67 + lVar78 * 6]);
                          dVar387 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar58 + (long)local_868 + lVar78 * 6]);
                          dVar337 = ABS((double)local_238[lVar58 + (long)local_868 + lVar78 * 6]);
                          auVar251._0_8_ = dVar184 + dVar387 + 1e-100;
                          auVar251._8_8_ = dVar429 + dVar337 + 1e-100;
                          auVar287 = divpd(auVar650,auVar251);
                          dVar555 = ABS((double)local_238[lVar58 + lVar67 + lVar78 * 3]) /
                                    (dVar429 + dVar184 + 1e-100);
                          local_1458 = auVar285._0_8_;
                          dStack_1450 = auVar285._8_8_;
                          dVar470 = ABS((double)local_238[lVar58 + (long)local_868 + lVar78 * 3]) /
                                    (dVar387 + dVar337 + 1e-100);
                          dVar556 = auVar287._0_8_ + 1.0;
                          dVar579 = auVar287._8_8_ + 1.0;
                          dVar384 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar58 + lVar67 + lVar78 * 7]);
                          auVar252._8_4_ = SUB84(dVar384,0);
                          auVar252._0_8_ = dVar384;
                          auVar252._12_4_ = (int)((ulong)dVar384 >> 0x20);
                          dVar578 = ABS((double)local_238[lVar58 + (long)local_868 + lVar78 * 7]);
                          dVar229 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar58 + (long)local_868 + lVar78 * 7]);
                          auVar492._0_8_ =
                               (ulong)local_a70._vptr_BaseFab
                                      [lVar82 + lVar60 + (long)local_868 + lVar78 * 2] &
                               0x7fffffffffffffff;
                          auVar492._8_8_ =
                               (ulong)local_238[lVar58 + (long)local_868 + lVar78] &
                               0x7fffffffffffffff;
                          auVar563._8_4_ = SUB84(dVar229,0);
                          auVar563._0_8_ = dVar229;
                          auVar563._12_4_ = (int)((ulong)dVar229 >> 0x20);
                          auVar253._0_8_ =
                               dVar384 + ABS((double)local_a70._vptr_BaseFab
                                                     [lVar82 + lVar60 + lVar67 + lVar78 * 7]) +
                               dVar229 + ABS((double)local_a70._vptr_BaseFab
                                                     [lVar82 + lVar60 + (long)local_868 + lVar78 * 7
                                                     ]) + 1e-100;
                          auVar253._8_8_ =
                               auVar252._8_8_ + ABS((double)local_238[lVar58 + lVar67 + lVar78 * 7])
                               + auVar563._8_8_ + dVar578 + 1e-100;
                          auVar522 = divpd(auVar492,auVar253);
                          dVar386 = dVar229 + ABS((double)local_a70._vptr_BaseFab
                                                          [lVar82 + lVar60 + (long)local_868 +
                                                                             lVar78 * 7]);
                          auVar414._0_8_ =
                               (ulong)local_a70._vptr_BaseFab
                                      [lVar82 + lVar58 + (long)local_868 + lVar78 * 4] &
                               0x7fffffffffffffff;
                          auVar414._8_8_ =
                               (ulong)local_238[lVar60 + (long)local_868 + lVar78 * 3] &
                               0x7fffffffffffffff;
                          auVar196._0_8_ = dVar384 + dVar229 + 1e-100;
                          auVar196._8_8_ =
                               dVar578 + dVar386 +
                               ABS((double)local_238[lVar60 + (long)local_868 + lVar78 * 7]) +
                               1e-100;
                          auVar404 = divpd(auVar414,auVar196);
                          auVar254._0_8_ =
                               (ulong)local_a70._vptr_BaseFab
                                      [lVar82 + lVar60 + (long)local_868 + lVar78 * 6] &
                               0x7fffffffffffffff;
                          auVar254._8_8_ =
                               (ulong)local_238[lVar58 + (long)local_868 + lVar78 * 5] &
                               0x7fffffffffffffff;
                          auVar564._0_8_ = dVar386 + 1e-100;
                          auVar564._8_8_ = auVar563._8_8_ + dVar578 + 1e-100;
                          auVar290 = divpd(auVar254,auVar564);
                          dVar386 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar59 + lVar102 + lVar78]);
                          dVar386 = dVar386 / (ABS((double)local_a70._vptr_BaseFab
                                                           [lVar82 + lVar80 + lVar102 + lVar78]) +
                                              dVar386);
                          uVar111 = -(ulong)((double)local_a70._vptr_BaseFab
                                                     [lVar82 + lVar59 + lVar102 + lVar78] == 0.0);
                          uVar112 = -(ulong)((double)local_a70._vptr_BaseFab
                                                     [lVar82 + lVar80 + lVar102 + lVar78] == 0.0);
                          dVar514 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar83 + lVar99 + lVar102 + lVar78 * 4]);
                          dVar515 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar80 + (long)local_868 + lVar78 * 5]);
                          dVar553 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar83 + lVar71 + lVar102 + lVar78 * 4]);
                          dVar554 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar59 + (long)local_868 + lVar78 * 5]);
                          auVar415._0_8_ =
                               (ulong)local_a70._vptr_BaseFab
                                      [lVar83 + lVar71 + lVar102 + lVar78 * 2] & 0x7fffffffffffffff;
                          auVar415._8_8_ =
                               (ulong)local_a70._vptr_BaseFab
                                      [lVar82 + lVar59 + (long)local_868 + lVar78 * 3] &
                               0x7fffffffffffffff;
                          auVar138._0_8_ = dVar514 + dVar553 + 1e-100;
                          auVar138._8_8_ = dVar515 + dVar554 + 1e-100;
                          auVar487 = divpd(auVar415,auVar138);
                          dVar512 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar92 + lVar99 + lVar102 + lVar78 * 4]);
                          dVar513 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar80 + lVar67 + lVar78 * 5]);
                          auVar139._0_8_ =
                               (ulong)local_a70._vptr_BaseFab[lVar83 + lVar99 + lVar102 + lVar78] &
                               0x7fffffffffffffff;
                          auVar139._8_8_ =
                               (ulong)local_a70._vptr_BaseFab
                                      [lVar82 + lVar80 + (long)local_868 + lVar78] &
                               0x7fffffffffffffff;
                          auVar493._0_8_ = dVar512 + dVar514 + 1e-100;
                          auVar493._8_8_ = dVar513 + dVar515 + 1e-100;
                          auVar285 = divpd(auVar139,auVar493);
                          auVar494._0_8_ =
                               ABS((double)local_a70._vptr_BaseFab
                                           [lVar83 + lVar71 + lVar102 + lVar78]);
                          auVar494._8_8_ =
                               (ulong)local_a70._vptr_BaseFab
                                      [lVar82 + lVar59 + (long)local_868 + lVar78] &
                               0x7fffffffffffffff;
                          dVar472 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar92 + lVar71 + lVar102 + lVar78 * 4]);
                          dVar431 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar59 + lVar67 + lVar78 * 5]);
                          auVar197._0_8_ = dVar472 + dVar553 + 1e-100;
                          auVar197._8_8_ = dVar431 + dVar554 + 1e-100;
                          auVar625 = divpd(auVar494,auVar197);
                          auVar198._0_8_ =
                               (ulong)local_a70._vptr_BaseFab
                                      [lVar92 + lVar71 + lVar102 + lVar78 * 2] & 0x7fffffffffffffff;
                          auVar198._8_8_ =
                               (ulong)local_a70._vptr_BaseFab[lVar82 + lVar59 + lVar67 + lVar78 * 3]
                               & 0x7fffffffffffffff;
                          auVar302._0_8_ = dVar512 + dVar472 + 1e-100;
                          auVar302._8_8_ = dVar513 + dVar431 + 1e-100;
                          auVar287 = divpd(auVar198,auVar302);
                          dVar384 = auVar285._0_8_ + 1.0;
                          dVar578 = auVar285._8_8_ + 1.0;
                          dVar615 = auVar625._0_8_ + 1.0;
                          dVar552 = auVar625._8_8_ + 1.0;
                          auVar495._0_8_ = (dVar615 + auVar487._0_8_) * dVar553;
                          auVar495._8_8_ = (dVar552 + auVar487._8_8_) * dVar554;
                          auVar140._0_8_ =
                               (dVar384 + auVar487._0_8_) * dVar514 +
                               (auVar287._0_8_ + dVar615) * dVar472 +
                               (dVar384 + auVar287._0_8_) * dVar512 + auVar495._0_8_ + 1e-100;
                          auVar140._8_8_ =
                               (dVar578 + auVar487._8_8_) * dVar515 +
                               (auVar287._8_8_ + dVar552) * dVar431 +
                               (dVar578 + auVar287._8_8_) * dVar513 + auVar495._8_8_ + 1e-100;
                          auVar487 = divpd(auVar495,auVar140);
                          dVar641 = auVar487._0_8_;
                          uStack_750 = 0;
                          dStack_1450 = auVar341._8_8_ + auVar343._8_8_ + 1.0 + auVar343._0_8_ +
                                        auVar341._0_8_ + dStack_1450;
                          auVar361._0_8_ = local_1458 * dStack_1450;
                          auVar361._8_8_ = dVar387 * (dVar470 + dVar556);
                          auVar141._0_8_ =
                               dVar427 * (double)local_a70._vptr_BaseFab
                                                 [lVar83 + lVar71 + lVar77 + lVar78 * 8];
                          auVar141._8_8_ =
                               auVar361._8_8_ +
                               (dVar555 + dVar579) * dVar429 + (dVar555 + dVar556) * dVar184 +
                               (dVar579 + dVar470) * dVar337 + 1e-100;
                          dVar578 = (local_1458 + dStack_1450) * auVar141._0_8_;
                          auVar343 = divpd(auVar361,auVar141);
                          uStack_4d0 = 0;
                          dStack_14a0 = auVar343._8_8_;
                          dVar337 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar58 + lVar102 + lVar78]);
                          dVar337 = dVar337 / (ABS((double)local_a70._vptr_BaseFab
                                                           [lVar82 + lVar60 + lVar102 + lVar78]) +
                                              dVar337);
                          uVar113 = -(ulong)((double)local_a70._vptr_BaseFab
                                                     [lVar82 + lVar58 + lVar102 + lVar78] == 0.0);
                          uVar114 = -(ulong)((double)local_a70._vptr_BaseFab
                                                     [lVar82 + lVar60 + lVar102 + lVar78] == 0.0);
                          dVar387 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar80 + lVar102 + lVar78 * 4]);
                          dVar429 = ABS((double)local_238[lVar80 + lVar102 + lVar78 * 4]);
                          dVar513 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar59 + lVar102 + lVar78 * 4]);
                          dVar680 = ABS((double)local_238[lVar59 + lVar102 + lVar78 * 4]);
                          dVar512 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar59 + lVar102 + lVar78 * 2]) /
                                    (dVar387 + dVar513 + 1e-100);
                          dVar583 = ABS((double)local_238[lVar59 + lVar102 + lVar78 * 2]) /
                                    (dVar429 + dVar680 + 1e-100);
                          dVar427 = ABS((double)local_238[lVar80 + lVar102 + lVar78]) /
                                    (dVar387 + dVar429 + 1e-100) + 1.0;
                          dVar556 = ABS((double)local_238[lVar59 + lVar102 + lVar78]) /
                                    (dVar513 + dVar680 + 1e-100) + 1.0;
                          dVar513 = (dVar512 + dVar556) * dVar513;
                          dVar472 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar58 + lVar102 + lVar78 * 2]);
                          dVar472 = dVar472 / (ABS((double)local_238[lVar58 + lVar102 + lVar78 * 2])
                                              + dVar472);
                          uVar115 = -(ulong)((double)local_a70._vptr_BaseFab
                                                     [lVar82 + lVar58 + lVar102 + lVar78 * 2] == 0.0
                                            );
                          uVar116 = -(ulong)((double)local_238[lVar58 + lVar102 + lVar78 * 2] == 0.0
                                            );
                          auVar496._0_8_ =
                               (ulong)local_238[lVar60 + lVar102 + lVar78] & 0x7fffffffffffffff;
                          auVar496._8_8_ =
                               (ulong)local_238[lVar58 + lVar102 + lVar78] & 0x7fffffffffffffff;
                          dVar184 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar60 + lVar102 + lVar78 * 4]);
                          dVar384 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar58 + lVar102 + lVar78 * 4]);
                          dVar683 = ABS((double)local_238[lVar60 + lVar102 + lVar78 * 4]);
                          dVar548 = ABS((double)local_238[lVar58 + lVar102 + lVar78 * 4]);
                          auVar362._0_8_ = dVar184 + dVar683 + 1e-100;
                          auVar362._8_8_ = dVar384 + dVar548 + 1e-100;
                          auVar343 = divpd(auVar496,auVar362);
                          dVar579 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar60 + lVar102 + lVar78 * 2]) /
                                    (dVar384 + dVar184 + 1e-100);
                          dVar431 = ABS((double)local_238[lVar60 + lVar102 + lVar78 * 2]) /
                                    (dVar548 + dVar683 + 1e-100);
                          dVar611 = auVar343._0_8_ + 1.0;
                          dVar645 = auVar343._8_8_ + 1.0;
                          dVar384 = (dVar645 + dVar579) * dVar384;
                          auVar497._0_8_ =
                               (ulong)local_a70._vptr_BaseFab[lVar82 + lVar59 + lVar77 + lVar78] &
                               0x7fffffffffffffff;
                          auVar497._8_8_ =
                               (ulong)local_a70._vptr_BaseFab[lVar82 + lVar80 + lVar77 + lVar78] &
                               0x7fffffffffffffff;
                          dVar514 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar59 + lVar102 + lVar78 * 5]);
                          dVar615 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar80 + lVar102 + lVar78 * 5]);
                          dVar684 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar59 + lVar77 + lVar78 * 5]);
                          dVar549 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar80 + lVar77 + lVar78 * 5]);
                          auVar255._0_8_ = dVar514 + dVar684 + 1e-100;
                          auVar255._8_8_ = dVar615 + dVar549 + 1e-100;
                          auVar343 = divpd(auVar497,auVar255);
                          dVar580 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar59 + lVar102 + lVar78 * 3]) /
                                    (dVar615 + dVar514 + 1e-100);
                          dVar557 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar59 + lVar77 + lVar78 * 3]) /
                                    (dVar549 + dVar684 + 1e-100);
                          dVar616 = auVar343._0_8_ + 1.0;
                          dVar662 = auVar343._8_8_ + 1.0;
                          dVar514 = (dVar580 + dVar616) * dVar514;
                          dVar685 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar58 + lVar102 + lVar78 * 3]);
                          dVar685 = dVar685 / (ABS((double)local_a70._vptr_BaseFab
                                                           [lVar82 + lVar58 + lVar77 + lVar78 * 3])
                                              + dVar685);
                          uVar117 = -(ulong)((double)local_a70._vptr_BaseFab
                                                     [lVar82 + lVar58 + lVar102 + lVar78 * 3] == 0.0
                                            );
                          uVar118 = -(ulong)((double)local_a70._vptr_BaseFab
                                                     [lVar82 + lVar58 + lVar77 + lVar78 * 3] == 0.0)
                          ;
                          auVar450._0_8_ =
                               (ulong)local_a70._vptr_BaseFab[lVar82 + lVar60 + lVar77 + lVar78] &
                               0x7fffffffffffffff;
                          auVar450._8_8_ =
                               (ulong)local_a70._vptr_BaseFab[lVar82 + lVar58 + lVar77 + lVar78] &
                               0x7fffffffffffffff;
                          dVar558 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar60 + lVar102 + lVar78 * 5]);
                          dVar554 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar58 + lVar102 + lVar78 * 5]);
                          dVar584 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar60 + lVar77 + lVar78 * 5]);
                          dVar612 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar58 + lVar77 + lVar78 * 5]);
                          auVar630._0_8_ = dVar558 + dVar584 + 1e-100;
                          auVar630._8_8_ = dVar554 + dVar612 + 1e-100;
                          auVar343 = divpd(auVar450,auVar630);
                          dVar552 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar60 + lVar102 + lVar78 * 3]) /
                                    (dVar554 + dVar558 + 1e-100);
                          dVar695 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar60 + lVar77 + lVar78 * 3]) /
                                    (dVar612 + dVar584 + 1e-100);
                          dVar581 = auVar343._0_8_ + 1.0;
                          dVar582 = auVar343._8_8_ + 1.0;
                          dVar554 = (dVar552 + dVar582) * dVar554;
                          dVar617 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar59 + lVar102 + lVar78 * 7]);
                          auVar527._8_4_ = SUB84(dVar617,0);
                          auVar527._0_8_ = dVar617;
                          auVar527._12_4_ = (int)((ulong)dVar617 >> 0x20);
                          dVar515 = dVar617 + ABS((double)local_a70._vptr_BaseFab
                                                          [lVar82 + lVar80 + lVar102 + lVar78 * 7]);
                          dVar553 = auVar527._8_8_ +
                                    ABS((double)local_238[lVar59 + lVar102 + lVar78 * 7]);
                          dVar470 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar59 + lVar77 + lVar78 * 7]);
                          auVar631._0_8_ =
                               (ulong)local_a70._vptr_BaseFab[lVar82 + lVar59 + lVar77 + lVar78 * 2]
                               & 0x7fffffffffffffff;
                          auVar631._8_8_ =
                               (ulong)local_238[lVar59 + lVar77 + lVar78] & 0x7fffffffffffffff;
                          auVar651._0_8_ =
                               dVar470 + dVar515 + ABS((double)local_a70._vptr_BaseFab
                                                               [lVar82 + lVar80 + lVar77 + lVar78 * 
                                                  7]) + 1e-100;
                          auVar651._8_8_ =
                               ABS((double)local_238[lVar59 + lVar77 + lVar78 * 7]) +
                               dVar553 + dVar470 + 1e-100;
                          auVar628 = divpd(auVar631,auVar651);
                          auVar256._0_8_ =
                               (ulong)local_a70._vptr_BaseFab[lVar82 + lVar59 + lVar77 + lVar78 * 4]
                               & 0x7fffffffffffffff;
                          auVar256._8_8_ =
                               (ulong)local_238[lVar59 + lVar102 + lVar78 * 3] & 0x7fffffffffffffff;
                          auVar303._0_8_ = dVar470 + dVar617 + 1e-100;
                          auVar303._8_8_ =
                               ABS((double)local_238[lVar80 + lVar102 + lVar78 * 7]) + dVar515 +
                               ABS((double)local_238[lVar59 + lVar102 + lVar78 * 7]) + 1e-100;
                          auVar341 = divpd(auVar256,auVar303);
                          auVar363._0_8_ =
                               (ulong)local_a70._vptr_BaseFab
                                      [lVar82 + lVar59 + lVar102 + lVar78 * 6] & 0x7fffffffffffffff;
                          auVar363._8_8_ =
                               (ulong)local_238[lVar59 + lVar102 + lVar78 * 5] & 0x7fffffffffffffff;
                          auVar528._0_8_ = dVar515 + 1e-100;
                          auVar528._8_8_ = dVar553 + 1e-100;
                          auVar287 = divpd(auVar363,auVar528);
                          auVar498._0_8_ =
                               (ulong)local_238[lVar58 + lVar77 + lVar78 * 2] & 0x7fffffffffffffff;
                          auVar498._8_8_ =
                               (ulong)local_a70._vptr_BaseFab[lVar82 + lVar58 + lVar77 + lVar78 * 2]
                               & 0x7fffffffffffffff;
                          dVar646 = ABS((double)local_238[lVar58 + lVar102 + lVar78 * 6]);
                          dVar660 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar58 + lVar102 + lVar78 * 6]);
                          dVar664 = ABS((double)local_238[lVar58 + lVar77 + lVar78 * 6]);
                          dVar681 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar58 + lVar77 + lVar78 * 6]);
                          auVar451._0_8_ = dVar646 + dVar664 + 1e-100;
                          auVar451._8_8_ = dVar660 + dVar681 + 1e-100;
                          auVar343 = divpd(auVar498,auVar451);
                          dVar697 = ABS((double)local_238[lVar58 + lVar102 + lVar78 * 3]) /
                                    (dVar660 + dVar646 + 1e-100);
                          dVar470 = ABS((double)local_238[lVar58 + lVar77 + lVar78 * 3]) /
                                    (dVar681 + dVar664 + 1e-100);
                          dVar642 = auVar343._0_8_ + 1.0;
                          dVar663 = auVar343._8_8_ + 1.0;
                          dVar660 = (dVar697 + dVar663) * dVar660;
                          dVar515 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar58 + lVar102 + lVar78 * 7]);
                          auVar416._8_4_ = SUB84(dVar515,0);
                          auVar416._0_8_ = dVar515;
                          auVar416._12_4_ = (int)((ulong)dVar515 >> 0x20);
                          dVar553 = dVar515 + ABS((double)local_a70._vptr_BaseFab
                                                          [lVar82 + lVar60 + lVar102 + lVar78 * 7]);
                          dVar555 = auVar416._8_8_ +
                                    ABS((double)local_238[lVar58 + lVar102 + lVar78 * 7]);
                          dVar585 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar58 + lVar77 + lVar78 * 7]);
                          auVar565._0_8_ =
                               (ulong)local_a70._vptr_BaseFab[lVar82 + lVar58 + lVar77 + lVar78 * 4]
                               & 0x7fffffffffffffff;
                          auVar565._8_8_ =
                               (ulong)local_238[lVar60 + lVar102 + lVar78 * 3] & 0x7fffffffffffffff;
                          auVar199._0_8_ =
                               (ulong)local_a70._vptr_BaseFab[lVar82 + lVar60 + lVar77 + lVar78 * 2]
                               & 0x7fffffffffffffff;
                          auVar199._8_8_ =
                               (ulong)local_238[lVar58 + lVar77 + lVar78] & 0x7fffffffffffffff;
                          auVar499._8_4_ = SUB84(dVar585,0);
                          auVar499._0_8_ = dVar585;
                          auVar499._12_4_ = (int)((ulong)dVar585 >> 0x20);
                          auVar500._0_8_ =
                               dVar585 + dVar553 +
                               ABS((double)local_a70._vptr_BaseFab
                                           [lVar82 + lVar60 + lVar77 + lVar78 * 7]) + 1e-100;
                          auVar500._8_8_ =
                               auVar499._8_8_ + dVar555 +
                               ABS((double)local_238[lVar58 + lVar77 + lVar78 * 7]) + 1e-100;
                          auVar343 = divpd(auVar199,auVar500);
                          auVar364._0_8_ = dVar515 + dVar585 + 1e-100;
                          auVar364._8_8_ =
                               ABS((double)local_238[lVar58 + lVar102 + lVar78 * 7]) + dVar553 +
                               ABS((double)local_238[lVar60 + lVar102 + lVar78 * 7]) + 1e-100;
                          auVar625 = divpd(auVar565,auVar364);
                          auVar304._0_8_ =
                               (ulong)local_a70._vptr_BaseFab
                                      [lVar82 + lVar60 + lVar102 + lVar78 * 6] & 0x7fffffffffffffff;
                          auVar304._8_8_ =
                               (ulong)local_238[lVar58 + lVar102 + lVar78 * 5] & 0x7fffffffffffffff;
                          auVar417._0_8_ = dVar553 + 1e-100;
                          auVar417._8_8_ = dVar555 + 1e-100;
                          auVar285 = divpd(auVar304,auVar417);
                          *(double *)(local_248 + (long)local_cb8 * 8) =
                               ((double)local_238[lVar60 + lVar77 + lVar78 * 8] * dVar515 *
                                (auVar285._8_8_ +
                                 auVar625._8_8_ + auVar343._8_8_ + 1.0 + auVar343._0_8_ +
                                 auVar625._0_8_ + auVar285._0_8_) *
                                ((double)local_a70._vptr_BaseFab
                                         [lVar83 + lVar70 + lVar77 + lVar78 * 2] * dVar123 +
                                (double)local_14b8[lVar78 * 4] * dVar121 +
                                (double)local_a70._vptr_BaseFab[lVar83 + lVar70 + lVar77] * dVar122
                                + (double)local_14b8[lVar78] * dVar473 +
                                  dVar120 * (double)local_a70._vptr_BaseFab
                                                    [lVar83 + lVar70 + lVar52 + lVar78 * 6] +
                                  (double)local_a70._vptr_BaseFab
                                          [lVar83 + lVar93 + lVar52 + lVar78 * 5] * dVar550 +
                                  (double)local_a70._vptr_BaseFab
                                          [lVar83 + lVar70 + lVar52 + lVar78 * 3] * dVar339 +
                                  (double)local_a70._vptr_BaseFab
                                          [lVar83 + lVar93 + lVar52 + lVar78 * 7]) +
                               (dVar660 /
                               ((dVar470 + dVar663) * dVar681 +
                                (dVar697 + dVar642) * dVar646 + dVar660 +
                                (dVar470 + dVar642) * dVar664 + 1e-100)) *
                               (dVar123 * (double)local_a70._vptr_BaseFab
                                                  [lVar83 + lVar58 + lVar77 + lVar78 * 4] +
                               (double)local_a70._vptr_BaseFab
                                       [lVar83 + lVar58 + lVar77 + lVar78 * 2] * dVar121 +
                               dVar124 * (double)local_a70._vptr_BaseFab
                                                 [lVar83 + lVar59 + lVar77 + lVar78 * 4] +
                               (double)local_a70._vptr_BaseFab[lVar83 + lVar58 + lVar77 + lVar78] *
                               dVar122 + (double)local_a70._vptr_BaseFab[lVar83 + lVar58 + lVar77] *
                                         dVar473 + dVar578 * (double)local_a70._vptr_BaseFab
                                                                     [lVar83 + lVar59 + lVar77 + 
                                                  lVar78] + (double)local_a70._vptr_BaseFab
                                                                    [lVar83 + lVar58 + lVar52 + 
                                                  lVar78 * 7] * dVar120 +
                                                  (double)local_a70._vptr_BaseFab
                                                          [lVar83 + lVar59 + lVar52 + lVar78 * 7] *
                                                  dVar334 + (double)local_a70._vptr_BaseFab
                                                                    [lVar83 + lVar58 + lVar52 + 
                                                  lVar78 * 5] * dVar339 +
                                                  (double)local_a70._vptr_BaseFab
                                                          [lVar83 + lVar59 + lVar52 + lVar78 * 5] *
                                                  dVar641 + (double)local_a70._vptr_BaseFab
                                                                    [lVar83 + lVar58 + lVar52 + 
                                                  lVar78 * 3] * dVar550 +
                                                  (double)local_a70._vptr_BaseFab
                                                          [lVar83 + lVar58 + lVar52 + lVar78 * 6]) +
                               (double)local_238[lVar59 + lVar77 + lVar78 * 8] * dVar617 *
                               (auVar287._8_8_ +
                                auVar341._8_8_ + auVar628._8_8_ + 1.0 + auVar628._0_8_ +
                                auVar341._0_8_ + auVar287._0_8_) *
                               (dVar121 * (double)local_a70._vptr_BaseFab
                                                  [lVar83 + lVar71 + lVar77 + lVar78 * 4] +
                               (double)local_a70._vptr_BaseFab
                                       [lVar83 + lVar71 + lVar77 + lVar78 * 2] * dVar124 +
                               (double)local_a70._vptr_BaseFab[lVar83 + lVar71 + lVar77 + lVar78] *
                               dVar473 + (double)local_a70._vptr_BaseFab[lVar83 + lVar71 + lVar77] *
                                         dVar578 + dVar334 * (double)local_a70._vptr_BaseFab
                                                                     [lVar83 + lVar71 + lVar52 + 
                                                  lVar78 * 6] +
                                                  (double)local_a70._vptr_BaseFab
                                                          [lVar83 + lVar71 + lVar52 + lVar78 * 3] *
                                                  dVar641 + (double)local_a70._vptr_BaseFab
                                                                    [lVar83 + lVar71 + lVar52 + 
                                                  lVar78 * 5] * dVar550 +
                                                  (double)local_a70._vptr_BaseFab
                                                          [lVar83 + lVar71 + lVar52 + lVar78 * 7]) +
                               (dVar554 /
                               ((dVar695 + dVar582) * dVar612 +
                                (dVar552 + dVar581) * dVar558 + dVar554 +
                                (dVar695 + dVar581) * dVar584 + 1e-100)) *
                               ((double)local_a70._vptr_BaseFab
                                        [lVar82 + lVar70 + lVar77 + lVar78 * 2] * dVar122 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar82 + lVar93 + lVar77 + lVar78 * 4] * dVar473 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar82 + lVar93 + lVar52 + lVar78 * 7] * dVar550 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar82 + lVar70 + lVar52 + lVar78 * 6] * dVar339) +
                               (double)((uVar118 & 0x3fe0000000000000 | ~uVar118 & (ulong)dVar685) &
                                        uVar117 | ~uVar117 & (ulong)dVar685) *
                               ((double)local_a70._vptr_BaseFab
                                        [lVar82 + lVar58 + lVar77 + lVar78 * 4] * dVar122 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar82 + lVar58 + lVar77 + lVar78 * 2] * dVar473 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar82 + lVar59 + lVar77 + lVar78 * 4] * dVar578 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar82 + lVar58 + lVar52 + lVar78 * 7] * dVar339 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar82 + lVar59 + lVar52 + lVar78 * 7] * dVar641 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar82 + lVar58 + lVar52 + lVar78 * 6] * dVar550) +
                               (dVar514 /
                               ((dVar557 + dVar662) * dVar549 +
                                (dVar580 + dVar662) * dVar615 + dVar514 +
                                (dVar557 + dVar616) * dVar684 + 1e-100)) *
                               ((double)local_a70._vptr_BaseFab
                                        [lVar82 + lVar71 + lVar77 + lVar78 * 4] * dVar473 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar82 + lVar71 + lVar77 + lVar78 * 2] * dVar578 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar82 + lVar71 + lVar52 + lVar78 * 6] * dVar641 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar82 + lVar71 + lVar52 + lVar78 * 7] * dVar550) +
                               (dVar384 /
                               ((dVar431 + dVar645) * dVar548 +
                                (dVar579 + dVar611) * dVar184 + dVar384 +
                                (dVar431 + dVar611) * dVar683 + 1e-100)) *
                               ((double)local_a70._vptr_BaseFab
                                        [lVar83 + lVar70 + lVar102 + lVar78 * 6] * dVar123 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar83 + lVar93 + lVar102 + lVar78 * 7] * dVar121 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar83 + lVar70 + lVar102 + lVar78 * 3] * dVar122 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar83 + lVar93 + lVar102 + lVar78 * 5] * dVar473 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar83 + lVar70 + lVar102 + lVar78 * 2] * dVar120 +
                               (double)local_a70._vptr_BaseFab[lVar83 + lVar70 + lVar102] * dVar339
                               + (double)local_a70._vptr_BaseFab[lVar83 + lVar93 + lVar102 + lVar78]
                                 * dVar550 +
                                 dVar281 * (double)local_a70._vptr_BaseFab
                                                   [lVar83 + lVar70 + (long)local_868 + lVar78 * 6]
                                 + (double)local_a70._vptr_BaseFab
                                           [lVar83 + lVar93 + (long)local_868 + lVar78 * 7] *
                                   dVar469 + dVar432 * (double)local_a70._vptr_BaseFab
                                                               [lVar83 + lVar93 + (long)local_868 +
                                                                                  lVar78 * 5] +
                                             dVar466 * (double)local_a70._vptr_BaseFab
                                                               [lVar83 + lVar70 + (long)local_868 +
                                                                                  lVar78 * 3] +
                               (double)local_a70._vptr_BaseFab
                                       [lVar83 + lVar93 + lVar102 + lVar78 * 4]) +
                               (double)((uVar116 & 0x3fe0000000000000 | ~uVar116 & (ulong)dVar472) &
                                        uVar115 | ~uVar115 & (ulong)dVar472) *
                               ((double)local_a70._vptr_BaseFab
                                        [lVar83 + lVar58 + lVar102 + lVar78 * 7] * dVar123 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar83 + lVar58 + lVar102 + lVar78 * 6] * dVar121 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar83 + lVar59 + lVar102 + lVar78 * 7] * dVar124 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar83 + lVar58 + lVar102 + lVar78 * 5] * dVar122 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar83 + lVar58 + lVar102 + lVar78 * 3] * dVar473 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar83 + lVar59 + lVar102 + lVar78 * 5] * dVar578 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar83 + lVar58 + lVar102 + lVar78 * 4] * dVar120 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar83 + lVar59 + lVar102 + lVar78 * 4] * dVar334 +
                               (double)local_a70._vptr_BaseFab[lVar83 + lVar58 + lVar102 + lVar78] *
                               dVar339 + (double)local_a70._vptr_BaseFab[lVar83 + lVar58 + lVar102]
                                         * dVar550 +
                                         (double)local_a70._vptr_BaseFab
                                                 [lVar83 + lVar59 + lVar102 + lVar78] * dVar641 +
                                         (double)local_a70._vptr_BaseFab
                                                 [lVar83 + lVar58 + (long)local_868 + lVar78 * 7] *
                                         dVar281 + (double)local_a70._vptr_BaseFab
                                                           [lVar83 + lVar58 + (long)local_868 +
                                                                              lVar78 * 6] * dVar469
                                                   + dVar332 * (double)local_a70._vptr_BaseFab
                                                                       [lVar83 + lVar59 + (long)
                                                  local_868 + lVar78 * 7] +
                                                  (double)local_a70._vptr_BaseFab
                                                          [lVar83 + lVar58 + (long)local_868 +
                                                                             lVar78 * 5] * dVar466 +
                                                  dVar388 * (double)local_a70._vptr_BaseFab
                                                                    [lVar83 + lVar59 + (long)
                                                  local_868 + lVar78 * 5] +
                                                  (double)local_a70._vptr_BaseFab
                                                          [lVar83 + lVar58 + (long)local_868 +
                                                                             lVar78 * 3] * dVar432 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar83 + lVar58 + lVar102 + lVar78 * 2]) +
                               (dVar513 /
                               ((dVar427 + dVar512) * dVar387 + dVar513 +
                                (dVar427 + dVar583) * dVar429 + (dVar556 + dVar583) * dVar680 +
                               1e-100)) *
                               ((double)local_a70._vptr_BaseFab
                                        [lVar83 + lVar71 + lVar102 + lVar78 * 7] * dVar121 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar83 + lVar71 + lVar102 + lVar78 * 6] * dVar124 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar83 + lVar71 + lVar102 + lVar78 * 5] * dVar473 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar83 + lVar71 + lVar102 + lVar78 * 3] * dVar578 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar83 + lVar71 + lVar102 + lVar78 * 2] * dVar334 +
                               dVar550 * (double)local_a70._vptr_BaseFab
                                                 [lVar83 + lVar71 + lVar102 + lVar78] +
                               (double)local_a70._vptr_BaseFab[lVar83 + lVar71 + lVar102] * dVar641
                               + (double)local_a70._vptr_BaseFab
                                         [lVar83 + lVar71 + (long)local_868 + lVar78 * 7] * dVar469
                                 + (double)local_a70._vptr_BaseFab
                                           [lVar83 + lVar71 + (long)local_868 + lVar78 * 6] *
                                   dVar332 + (double)local_a70._vptr_BaseFab
                                                     [lVar83 + lVar71 + (long)local_868 + lVar78 * 3
                                                     ] * dVar388 +
                                             (double)local_a70._vptr_BaseFab
                                                     [lVar83 + lVar71 + (long)local_868 + lVar78 * 5
                                                     ] * dVar432 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar83 + lVar71 + lVar102 + lVar78 * 4]) +
                               (double)((uVar114 & 0x3fe0000000000000 | ~uVar114 & (ulong)dVar337) &
                                        uVar113 | ~uVar113 & (ulong)dVar337) *
                               ((double)local_a70._vptr_BaseFab
                                        [lVar82 + lVar70 + lVar102 + lVar78 * 6] * dVar122 +
                               (double)local_9e8[lVar78 * 7] * dVar473 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar82 + lVar70 + lVar102 + lVar78 * 2] * dVar339 +
                               (double)local_9e8[lVar78 * 4] * dVar550 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar82 + lVar93 + (long)local_868 + lVar78 * 7] * dVar432 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar82 + lVar70 + (long)local_868 + lVar78 * 6] * dVar466) +
                               ((double)local_a70._vptr_BaseFab
                                        [lVar82 + lVar71 + lVar102 + lVar78 * 7] * dVar473 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar82 + lVar71 + lVar102 + lVar78 * 6] * dVar578 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar82 + lVar71 + lVar102 + lVar78 * 4] * dVar550 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar82 + lVar71 + lVar102 + lVar78 * 2] * dVar641 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar82 + lVar71 + (long)local_868 + lVar78 * 6] * dVar388 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar82 + lVar71 + (long)local_868 + lVar78 * 7] * dVar432) *
                               (double)((uVar111 & 0x3fe0000000000000 | ~uVar111 & (ulong)dVar386) &
                                        uVar112 | ~uVar112 & (ulong)dVar386) +
                               (double)local_238[lVar60 + (long)local_868 + lVar78 * 8] * dVar229 *
                               (auVar290._8_8_ +
                                auVar404._8_8_ + auVar522._8_8_ + 1.0 + auVar522._0_8_ +
                                auVar404._0_8_ + auVar290._0_8_) *
                               ((double)local_a70._vptr_BaseFab
                                        [lVar83 + lVar70 + lVar76 + lVar78 * 6] * dVar120 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar83 + lVar70 + lVar76 + lVar78 * 3] * dVar339 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar83 + lVar93 + lVar76 + lVar78 * 5] * dVar550 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar83 + lVar70 + lVar76 + lVar78 * 2] * dVar281 +
                               dVar469 * (double)local_a70._vptr_BaseFab
                                                 [lVar83 + lVar93 + lVar76 + lVar78 * 4] +
                               (double)local_a70._vptr_BaseFab[lVar83 + lVar93 + lVar76 + lVar78] *
                               dVar432 + (double)local_a70._vptr_BaseFab[lVar83 + lVar70 + lVar76] *
                                         dVar466 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar83 + lVar93 + lVar76 + lVar78 * 7]) +
                               ((double)local_a70._vptr_BaseFab
                                        [lVar83 + lVar58 + lVar76 + lVar78 * 7] * dVar120 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar83 + lVar59 + lVar76 + lVar78 * 7] * dVar334 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar83 + lVar58 + lVar76 + lVar78 * 5] * dVar339 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar83 + lVar58 + lVar76 + lVar78 * 3] * dVar550 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar83 + lVar59 + lVar76 + lVar78 * 5] * dVar641 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar83 + lVar58 + lVar76 + lVar78 * 4] * dVar281 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar83 + lVar58 + lVar76 + lVar78 * 2] * dVar469 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar83 + lVar59 + lVar76 + lVar78 * 4] * dVar332 +
                               (double)local_a70._vptr_BaseFab[lVar83 + lVar58 + lVar76 + lVar78] *
                               dVar466 + (double)local_a70._vptr_BaseFab
                                                 [lVar83 + lVar59 + lVar76 + lVar78] * dVar388 +
                                         (double)local_a70._vptr_BaseFab[lVar83 + lVar58 + lVar76] *
                                         dVar432 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar83 + lVar58 + lVar76 + lVar78 * 6]) * dStack_14a0 +
                               (double)local_238[lVar59 + (long)local_868 + lVar78 * 8] * dVar335 *
                               (auVar230._8_8_ +
                                auVar186._8_8_ + auVar354._8_8_ + auVar354._0_8_ + 1.0 +
                                auVar186._0_8_ + auVar230._0_8_) *
                               ((double)local_a70._vptr_BaseFab
                                        [lVar83 + lVar71 + lVar76 + lVar78 * 6] * dVar334 +
                                (double)local_a70._vptr_BaseFab
                                        [lVar83 + lVar71 + lVar76 + lVar78 * 5] * dVar550 +
                                (double)local_a70._vptr_BaseFab
                                        [lVar83 + lVar71 + lVar76 + lVar78 * 3] * dVar641 +
                                (double)local_a70._vptr_BaseFab
                                        [lVar83 + lVar71 + lVar76 + lVar78 * 4] * dVar469 +
                                (double)local_a70._vptr_BaseFab
                                        [lVar83 + lVar71 + lVar76 + lVar78 * 2] * dVar332 +
                                (double)local_a70._vptr_BaseFab[lVar83 + lVar71 + lVar76] * dVar388
                                + (double)local_a70._vptr_BaseFab[lVar83 + lVar71 + lVar76 + lVar78]
                                  * dVar432 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar83 + lVar71 + lVar76 + lVar78 * 7]) +
                               ((double)local_a70._vptr_BaseFab
                                        [lVar82 + lVar70 + lVar76 + lVar78 * 6] * dVar339 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar82 + lVar93 + lVar76 + lVar78 * 7] * dVar550 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar82 + lVar93 + lVar76 + lVar78 * 4] * dVar432 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar82 + lVar70 + lVar76 + lVar78 * 2] * dVar466) *
                               (dVar430 /
                               ((dVar467 + dVar385) * dVar336 + (dVar467 + dVar183) * dVar331 +
                                dVar430 + (dVar471 + dVar183) * dVar338 + 1e-100)) +
                               ((double)local_a70._vptr_BaseFab
                                        [lVar82 + lVar71 + lVar76 + lVar78 * 7] * dVar550 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar82 + lVar71 + lVar76 + lVar78 * 6] * dVar641 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar82 + lVar71 + lVar76 + lVar78 * 2] * dVar388 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar82 + lVar71 + lVar76 + lVar78 * 4] * dVar432) *
                               auVar487._8_8_ +
                               ((double)local_a70._vptr_BaseFab
                                        [lVar82 + lVar58 + lVar76 + lVar78 * 7] * dVar339 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar82 + lVar58 + lVar76 + lVar78 * 6] * dVar550 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar82 + lVar59 + lVar76 + lVar78 * 7] * dVar641 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar82 + lVar58 + lVar76 + lVar78 * 4] * dVar466 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar82 + lVar59 + lVar76 + lVar78 * 4] * dVar388 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar82 + lVar58 + lVar76 + lVar78 * 2] * dVar432) *
                               (double)((uVar107 & 0x3fe0000000000000 | ~uVar107 & (ulong)dVar433) &
                                        uVar333 | ~uVar333 & (ulong)dVar433) +
                               dVar122 * (double)local_a70._vptr_BaseFab
                                                 [lVar82 + lVar58 + lVar102 + lVar78 * 7] +
                               dVar473 * (double)local_a70._vptr_BaseFab
                                                 [lVar82 + lVar58 + lVar102 + lVar78 * 6] +
                               (double)local_a70._vptr_BaseFab
                                       [lVar82 + lVar59 + lVar102 + lVar78 * 7] * dVar578 +
                               dVar339 * (double)local_a70._vptr_BaseFab
                                                 [lVar82 + lVar58 + lVar102 + lVar78 * 4] +
                               dVar550 * (double)local_a70._vptr_BaseFab
                                                 [lVar82 + lVar58 + lVar102 + lVar78 * 2] +
                               (double)local_a70._vptr_BaseFab
                                       [lVar82 + lVar59 + lVar102 + lVar78 * 4] * dVar641 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar82 + lVar58 + (long)local_868 + lVar78 * 7] * dVar466 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar82 + lVar59 + (long)local_868 + lVar78 * 7] * dVar388 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar82 + lVar58 + (long)local_868 + lVar78 * 6] * dVar432) *
                               0.125;
                          dVar550 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar79 + lVar71 + lVar52 + lVar78 * 7]);
                          dVar469 = ABS((double)local_460[lVar71 + lVar77 + lVar78 * 7]);
                          dVar120 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar79 + lVar71 + lVar77 + lVar78 * 7]);
                          dVar334 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar79 + lVar99 + lVar77 + lVar78 * 7]);
                          dVar578 = (double)local_a70._vptr_BaseFab
                                            [lVar79 + lVar71 + lVar77 + lVar78 * 8] * dVar120 *
                                    (ABS((double)local_a70._vptr_BaseFab
                                                 [lVar79 + lVar71 + lVar77 + lVar78 * 6]) /
                                     (dVar334 + dVar120 + 1e-100) +
                                    ABS((double)local_a70._vptr_BaseFab
                                                [lVar79 + lVar71 + lVar77 + lVar78 * 5]) /
                                    (dVar469 + dVar120 + 1e-100) +
                                    ABS((double)local_a70._vptr_BaseFab
                                                [lVar79 + lVar71 + lVar77 + lVar78 * 4]) /
                                    (dVar550 + dVar120 + 1e-100) +
                                    ABS((double)local_a70._vptr_BaseFab
                                                [lVar79 + lVar71 + lVar77 + lVar78 * 3]) /
                                    (ABS((double)local_460[lVar99 + lVar77 + lVar78 * 7]) + dVar469
                                     + dVar334 + dVar120 + 1e-100) +
                                    ABS((double)local_a70._vptr_BaseFab
                                                [lVar79 + lVar71 + lVar77 + lVar78 * 2]) /
                                    (ABS((double)local_a70._vptr_BaseFab
                                                 [lVar79 + lVar99 + lVar52 + lVar78 * 7]) + dVar550
                                     + dVar334 + dVar120 + 1e-100) +
                                    ABS((double)local_a70._vptr_BaseFab
                                                [lVar79 + lVar71 + lVar77 + lVar78]) /
                                    (ABS((double)local_460[lVar71 + lVar52 + lVar78 * 7]) + dVar550
                                     + dVar469 + dVar120 + 1e-100) + 1.0);
                          dVar334 = ABS((double)local_460[lVar58 + lVar52 + lVar78 * 6]);
                          dVar550 = ABS((double)local_460[lVar58 + lVar77 + lVar78 * 6]);
                          dVar120 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar79 + lVar58 + lVar52 + lVar78 * 6]);
                          dVar430 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar79 + lVar58 + lVar77 + lVar78 * 6]);
                          dVar121 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar79 + lVar58 + lVar52 + lVar78 * 3]) /
                                    (dVar334 + dVar120 + 1e-100);
                          dVar122 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar79 + lVar58 + lVar77 + lVar78 * 3]) /
                                    (dVar550 + dVar430 + 1e-100);
                          dVar469 = ABS((double)local_460[lVar58 + lVar77 + lVar78 * 2]) /
                                    (dVar334 + dVar550 + 1e-100) + 1.0;
                          dVar123 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar79 + lVar58 + lVar77 + lVar78 * 2]) /
                                    (dVar120 + dVar430 + 1e-100) + 1.0;
                          dVar430 = (dVar123 + dVar122) * dVar430;
                          dVar430 = dVar430 / ((dVar469 + dVar122) * dVar550 +
                                               (dVar121 + dVar123) * dVar120 +
                                               (dVar469 + dVar121) * dVar334 + dVar430 + 1e-100);
                          dVar121 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar79 + lVar93 + lVar52 + lVar78 * 7]);
                          dVar334 = ABS((double)local_460[lVar93 + lVar77 + lVar78 * 7]);
                          dVar550 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar79 + lVar93 + lVar77 + lVar78 * 7]);
                          dVar120 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar79 + lVar70 + lVar77 + lVar78 * 7]);
                          dVar469 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar79 + lVar58 + lVar106 + lVar78 * 2]);
                          dVar469 = dVar469 / (ABS((double)local_460[lVar58 + lVar106 + lVar78 * 2])
                                              + dVar469);
                          uVar107 = -(ulong)((double)local_a70._vptr_BaseFab
                                                     [lVar79 + lVar58 + lVar106 + lVar78 * 2] == 0.0
                                            );
                          uVar333 = -(ulong)((double)local_460[lVar58 + lVar106 + lVar78 * 2] == 0.0
                                            );
                          dVar469 = (double)((uVar107 & 0x3fe0000000000000 |
                                             ~uVar107 & (ulong)dVar469) & uVar333 |
                                            ~uVar333 & (ulong)dVar469);
                          dVar473 = (double)local_a70._vptr_BaseFab
                                            [lVar79 + lVar70 + lVar77 + lVar78 * 8] * dVar550 *
                                    (ABS((double)local_a70._vptr_BaseFab
                                                 [lVar79 + lVar70 + lVar77 + lVar78 * 6]) /
                                     (dVar120 + dVar550 + 1e-100) +
                                    ABS((double)local_a70._vptr_BaseFab
                                                [lVar79 + lVar93 + lVar77 + lVar78 * 5]) /
                                    (dVar334 + dVar550 + 1e-100) +
                                    ABS((double)local_a70._vptr_BaseFab
                                                [lVar79 + lVar93 + lVar77 + lVar78 * 4]) /
                                    (dVar121 + dVar550 + 1e-100) +
                                    ABS((double)local_a70._vptr_BaseFab
                                                [lVar79 + lVar70 + lVar77 + lVar78 * 3]) /
                                    (ABS((double)local_460[lVar70 + lVar77 + lVar78 * 7]) + dVar334
                                     + dVar550 + dVar120 + 1e-100) +
                                    ABS((double)local_a70._vptr_BaseFab
                                                [lVar79 + lVar70 + lVar77 + lVar78 * 2]) /
                                    (ABS((double)local_a70._vptr_BaseFab
                                                 [lVar79 + lVar70 + lVar52 + lVar78 * 7]) + dVar121
                                     + dVar550 + dVar120 + 1e-100) +
                                    ABS((double)local_a70._vptr_BaseFab
                                                [lVar79 + lVar93 + lVar77 + lVar78]) /
                                    (ABS((double)local_460[lVar93 + lVar52 + lVar78 * 7]) + dVar121
                                     + dVar334 + dVar550 + 1e-100) + 1.0);
                          dVar120 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar99 + lVar52 + lVar78 * 5]);
                          dVar334 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar99 + lVar77 + lVar78 * 5]);
                          dVar121 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar71 + lVar52 + lVar78 * 5]);
                          dVar513 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar71 + lVar77 + lVar78 * 5]);
                          dVar122 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar71 + lVar52 + lVar78 * 3]) /
                                    (dVar120 + dVar121 + 1e-100);
                          dVar123 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar71 + lVar77 + lVar78 * 3]) /
                                    (dVar334 + dVar513 + 1e-100);
                          dVar550 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar99 + lVar77 + lVar78]) /
                                    (dVar120 + dVar334 + 1e-100) + 1.0;
                          dVar124 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar71 + lVar77 + lVar78]) /
                                    (dVar121 + dVar513 + 1e-100) + 1.0;
                          dVar513 = (dVar124 + dVar123) * dVar513;
                          dVar513 = dVar513 / ((dVar550 + dVar123) * dVar334 +
                                               (dVar122 + dVar124) * dVar121 +
                                               (dVar550 + dVar122) * dVar120 + dVar513 + 1e-100);
                          dVar550 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar58 + lVar77 + lVar78 * 3]);
                          dVar550 = dVar550 / (ABS((double)local_a70._vptr_BaseFab
                                                           [lVar82 + lVar58 + lVar52 + lVar78 * 3])
                                              + dVar550);
                          uVar107 = -(ulong)((double)local_a70._vptr_BaseFab
                                                     [lVar82 + lVar58 + lVar77 + lVar78 * 3] == 0.0)
                          ;
                          uVar333 = -(ulong)((double)local_a70._vptr_BaseFab
                                                     [lVar82 + lVar58 + lVar52 + lVar78 * 3] == 0.0)
                          ;
                          dVar550 = (double)((uVar107 & 0x3fe0000000000000 |
                                             ~uVar107 & (ulong)dVar550) & uVar333 |
                                            ~uVar333 & (ulong)dVar550);
                          dVar120 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar93 + lVar52 + lVar78 * 5]);
                          dVar122 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar93 + lVar77 + lVar78 * 5]);
                          dVar121 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar70 + lVar52 + lVar78 * 5]);
                          dVar123 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar70 + lVar77 + lVar78 * 5]);
                          dVar124 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar70 + lVar52 + lVar78 * 3]) /
                                    (dVar120 + dVar121 + 1e-100);
                          dVar183 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar70 + lVar77 + lVar78 * 3]) /
                                    (dVar122 + dVar123 + 1e-100);
                          dVar184 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar93 + lVar77 + lVar78]) /
                                    (dVar120 + dVar122 + 1e-100) + 1.0;
                          dVar334 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar70 + lVar77 + lVar78]) /
                                    (dVar121 + dVar123 + 1e-100) + 1.0;
                          dVar122 = (dVar184 + dVar183) * dVar122;
                          dVar122 = dVar122 / ((dVar124 + dVar334) * dVar121 +
                                               (dVar184 + dVar124) * dVar120 + dVar122 +
                                               (dVar334 + dVar183) * dVar123 + 1e-100);
                          dVar121 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar92 + lVar71 + lVar52 + lVar78 * 7]);
                          dVar120 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar92 + lVar71 + lVar77 + lVar78 * 7]);
                          local_a80 = local_a70._vptr_BaseFab + lVar92 + lVar99 + lVar77;
                          dVar124 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar83 + lVar71 + lVar77 + lVar78 * 7]);
                          auVar200._8_4_ = SUB84(dVar120,0);
                          auVar200._0_8_ = dVar120;
                          auVar200._12_4_ = (int)((ulong)dVar120 >> 0x20);
                          dVar123 = dVar120 + ABS((double)local_a80[lVar78 * 7]);
                          uStack_760 = 0;
                          local_4c8 = local_a70._vptr_BaseFab + lVar82 + lVar99 + lVar106;
                          local_4d8 = local_a70._vptr_BaseFab + lVar82 + lVar71 + lVar106;
                          dVar334 = ABS((double)local_4d8[lVar78]);
                          dVar334 = dVar334 / (ABS((double)local_4c8[lVar78]) + dVar334);
                          uVar107 = -(ulong)((double)local_4d8[lVar78] == 0.0);
                          uVar333 = -(ulong)((double)local_4c8[lVar78] == 0.0);
                          dVar334 = (double)((uVar107 & 0x3fe0000000000000 |
                                             ~uVar107 & (ulong)dVar334) & uVar333 |
                                            ~uVar333 & (ulong)dVar334);
                          auVar305._0_8_ =
                               ABS((double)local_a70._vptr_BaseFab
                                           [lVar92 + lVar71 + lVar77 + lVar78 * 6]);
                          auVar305._8_8_ =
                               ABS((double)local_a70._vptr_BaseFab
                                           [lVar83 + lVar71 + lVar77 + lVar78 * 5]);
                          auVar201._0_8_ = dVar123 + 1e-100;
                          auVar201._8_8_ = auVar200._8_8_ + dVar124 + 1e-100;
                          auVar343 = divpd(auVar305,auVar201);
                          dVar331 = (double)local_a70._vptr_BaseFab
                                            [lVar83 + lVar71 + lVar77 + lVar78 * 8] * dVar120 *
                                    (auVar343._8_8_ +
                                     ABS((double)local_a70._vptr_BaseFab
                                                 [lVar83 + lVar71 + lVar77 + lVar78 * 3]) /
                                     (ABS((double)local_a70._vptr_BaseFab
                                                  [lVar83 + lVar99 + lVar77 + lVar78 * 7]) + dVar123
                                      + dVar124 + 1e-100) +
                                     ABS((double)local_a70._vptr_BaseFab
                                                 [lVar92 + lVar71 + lVar77 + lVar78 * 2]) /
                                     (ABS((double)local_a70._vptr_BaseFab
                                                  [lVar92 + lVar99 + lVar52 + lVar78 * 7]) + dVar121
                                      + ABS((double)local_a80[lVar78 * 7]) + dVar120 + 1e-100) +
                                     ABS((double)local_a70._vptr_BaseFab
                                                 [lVar83 + lVar71 + lVar77 + lVar78]) /
                                     (ABS((double)local_a70._vptr_BaseFab
                                                  [lVar83 + lVar71 + lVar52 + lVar78 * 7]) + dVar121
                                      + dVar120 + dVar124 + 1e-100) + 1.0 +
                                     ABS((double)local_a70._vptr_BaseFab
                                                 [lVar92 + lVar71 + lVar77 + lVar78 * 4]) /
                                     (dVar121 + dVar120 + 1e-100) + auVar343._0_8_);
                          auVar142._0_8_ =
                               (ulong)local_a70._vptr_BaseFab[lVar83 + lVar58 + lVar77 + lVar78 * 2]
                               & 0x7fffffffffffffff;
                          auVar142._8_8_ =
                               (ulong)local_a70._vptr_BaseFab[lVar92 + lVar58 + lVar77 + lVar78 * 2]
                               & 0x7fffffffffffffff;
                          dVar123 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar83 + lVar58 + lVar52 + lVar78 * 6]);
                          dVar124 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar92 + lVar58 + lVar52 + lVar78 * 6]);
                          dVar183 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar83 + lVar58 + lVar77 + lVar78 * 6]);
                          dVar332 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar92 + lVar58 + lVar77 + lVar78 * 6]);
                          auVar306._0_8_ = dVar123 + dVar183 + 1e-100;
                          auVar306._8_8_ = dVar124 + dVar332 + 1e-100;
                          auVar343 = divpd(auVar142,auVar306);
                          dVar184 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar83 + lVar58 + lVar52 + lVar78 * 3]) /
                                    (dVar124 + dVar123 + 1e-100);
                          dVar229 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar83 + lVar58 + lVar77 + lVar78 * 3]) /
                                    (dVar332 + dVar183 + 1e-100);
                          dVar120 = auVar343._0_8_ + 1.0;
                          dVar121 = auVar343._8_8_ + 1.0;
                          dVar332 = (dVar229 + dVar121) * dVar332;
                          dVar332 = dVar332 / ((dVar184 + dVar120) * dVar123 +
                                               (dVar121 + dVar184) * dVar124 + dVar332 +
                                               (dVar229 + dVar120) * dVar183 + 1e-100);
                          dVar123 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar92 + lVar93 + lVar52 + lVar78 * 7]);
                          dVar183 = ABS((double)local_14b8[lVar78 * 7]);
                          dVar121 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar92 + lVar93 + lVar77 + lVar78 * 7]);
                          auVar257._8_4_ = SUB84(dVar121,0);
                          auVar257._0_8_ = dVar121;
                          auVar257._12_4_ = (int)((ulong)dVar121 >> 0x20);
                          dVar124 = dVar121 + ABS((double)local_a70._vptr_BaseFab
                                                          [lVar92 + lVar70 + lVar77 + lVar78 * 7]);
                          local_228 = local_a70._vptr_BaseFab + lVar79 + lVar71 + lVar102;
                          local_220 = (double)local_a70._vptr_BaseFab
                                              [lVar79 + lVar58 + lVar102 + lVar78 * 6] * dVar550;
                          local_218 = (double)local_a70._vptr_BaseFab
                                              [lVar79 + lVar93 + lVar102 + lVar78 * 7] * dVar550;
                          local_210 = (double)local_a70._vptr_BaseFab
                                              [lVar82 + lVar71 + lVar102 + lVar78 * 5] * dVar550;
                          local_208 = (double)local_a70._vptr_BaseFab
                                              [lVar82 + lVar58 + lVar102 + lVar78 * 3] * dVar550;
                          local_200 = (double)local_9e8[lVar78 * 5] * dVar550;
                          local_1f8 = (double)local_a70._vptr_BaseFab
                                              [lVar92 + lVar71 + lVar102 + lVar78 * 7] * dVar550;
                          local_1f0 = (double)local_de8[lVar78 * 6] * dVar550;
                          uStack_380 = 0;
                          uStack_360 = 0;
                          auVar365._0_8_ =
                               ABS((double)local_a70._vptr_BaseFab
                                           [lVar92 + lVar93 + lVar77 + lVar78 * 4]);
                          auVar365._8_8_ =
                               ABS((double)local_a70._vptr_BaseFab
                                           [lVar83 + lVar70 + lVar77 + lVar78 * 3]);
                          auVar202._0_8_ = dVar123 + dVar121 + 1e-100;
                          auVar202._8_8_ =
                               dVar183 + dVar124 +
                               ABS((double)local_a70._vptr_BaseFab
                                           [lVar83 + lVar70 + lVar77 + lVar78 * 7]) + 1e-100;
                          auVar341 = divpd(auVar365,auVar202);
                          dVar120 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar93 + lVar106 + lVar78]);
                          dVar120 = dVar120 / (ABS((double)local_a70._vptr_BaseFab
                                                           [lVar82 + lVar70 + lVar106 + lVar78]) +
                                              dVar120);
                          uVar107 = -(ulong)((double)local_a70._vptr_BaseFab
                                                     [lVar82 + lVar70 + lVar106 + lVar78] == 0.0);
                          uVar333 = -(ulong)((double)local_a70._vptr_BaseFab
                                                     [lVar82 + lVar93 + lVar106 + lVar78] == 0.0);
                          dVar120 = (double)((uVar107 & 0x3fe0000000000000 |
                                             ~uVar107 & (ulong)dVar120) & uVar333 |
                                            ~uVar333 & (ulong)dVar120);
                          auVar307._0_8_ =
                               ABS((double)local_a70._vptr_BaseFab
                                           [lVar92 + lVar70 + lVar77 + lVar78 * 6]);
                          auVar307._8_8_ = ABS((double)local_14b8[lVar78 * 5]);
                          auVar258._0_8_ = dVar124 + 1e-100;
                          auVar258._8_8_ = auVar257._8_8_ + dVar183 + 1e-100;
                          auVar343 = divpd(auVar307,auVar258);
                          dVar698 = (double)local_a70._vptr_BaseFab
                                            [lVar83 + lVar70 + lVar77 + lVar78 * 8] * dVar121 *
                                    (auVar343._8_8_ +
                                     auVar341._8_8_ +
                                     ABS((double)local_a70._vptr_BaseFab
                                                 [lVar92 + lVar70 + lVar77 + lVar78 * 2]) /
                                     (ABS((double)local_a70._vptr_BaseFab
                                                  [lVar92 + lVar70 + lVar52 + lVar78 * 7]) + dVar123
                                      + dVar121 +
                                      ABS((double)local_a70._vptr_BaseFab
                                                  [lVar92 + lVar70 + lVar77 + lVar78 * 7]) + 1e-100)
                                     + ABS((double)local_14b8[lVar78]) /
                                       (ABS((double)local_a70._vptr_BaseFab
                                                    [lVar83 + lVar93 + lVar52 + lVar78 * 7]) +
                                        dVar123 + dVar121 + dVar183 + 1e-100) + 1.0 + auVar341._0_8_
                                    + auVar343._0_8_);
                          dVar184 = ABS((double)local_460[lVar99 + lVar106 + lVar78 * 4]);
                          dVar229 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar79 + lVar99 + lVar106 + lVar78 * 4]);
                          dVar123 = ABS((double)local_460[lVar71 + lVar106 + lVar78 * 4]);
                          dVar335 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar79 + lVar71 + lVar106 + lVar78 * 4]);
                          dVar124 = ABS((double)local_460[lVar71 + lVar106 + lVar78 * 2]) /
                                    (dVar184 + dVar123 + 1e-100);
                          dVar183 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar79 + lVar71 + lVar106 + lVar78 * 2]) /
                                    (dVar229 + dVar335 + 1e-100);
                          dVar121 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar79 + lVar99 + lVar106 + lVar78]) /
                                    (dVar184 + dVar229 + 1e-100) + 1.0;
                          dVar384 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar79 + lVar71 + lVar106 + lVar78]) /
                                    (dVar123 + dVar335 + 1e-100) + 1.0;
                          dVar335 = (dVar384 + dVar183) * dVar335;
                          dVar335 = dVar335 / ((dVar121 + dVar183) * dVar229 +
                                               (dVar124 + dVar384) * dVar123 +
                                               (dVar121 + dVar124) * dVar184 + dVar335 + 1e-100);
                          dVar121 = ABS((double)local_460[lVar93 + lVar106 + lVar78 * 4]);
                          dVar431 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar79 + lVar93 + lVar106 + lVar78 * 4]);
                          dVar124 = ABS((double)local_460[lVar70 + lVar106 + lVar78 * 4]);
                          dVar183 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar79 + lVar70 + lVar106 + lVar78 * 4]);
                          dVar184 = ABS((double)local_460[lVar70 + lVar106 + lVar78 * 2]) /
                                    (dVar121 + dVar124 + 1e-100);
                          dVar229 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar79 + lVar70 + lVar106 + lVar78 * 2]) /
                                    (dVar431 + dVar183 + 1e-100);
                          dVar384 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar79 + lVar93 + lVar106 + lVar78]) /
                                    (dVar121 + dVar431 + 1e-100) + 1.0;
                          dVar123 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar79 + lVar70 + lVar106 + lVar78]) /
                                    (dVar124 + dVar183 + 1e-100) + 1.0;
                          dVar431 = (dVar384 + dVar229) * dVar431;
                          dVar431 = dVar431 / ((dVar184 + dVar123) * dVar124 +
                                               (dVar384 + dVar184) * dVar121 + dVar431 +
                                               (dVar123 + dVar229) * dVar183 + 1e-100);
                          auVar143._0_8_ =
                               (ulong)local_a70._vptr_BaseFab[lVar83 + lVar71 + lVar106 + lVar78] &
                               0x7fffffffffffffff;
                          auVar143._8_8_ =
                               (ulong)local_a70._vptr_BaseFab[lVar83 + lVar99 + lVar106 + lVar78] &
                               0x7fffffffffffffff;
                          dVar281 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar92 + lVar71 + lVar106 + lVar78 * 4]);
                          dVar183 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar92 + lVar99 + lVar106 + lVar78 * 4]);
                          dVar184 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar83 + lVar71 + lVar106 + lVar78 * 4]);
                          dVar229 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar83 + lVar99 + lVar106 + lVar78 * 4]);
                          auVar203._0_8_ = dVar281 + dVar184 + 1e-100;
                          auVar203._8_8_ = dVar183 + dVar229 + 1e-100;
                          auVar343 = divpd(auVar143,auVar203);
                          dVar124 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar92 + lVar71 + lVar106 + lVar78 * 2]) /
                                    (dVar183 + dVar281 + 1e-100);
                          dVar384 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar83 + lVar71 + lVar106 + lVar78 * 2]) /
                                    (dVar229 + dVar184 + 1e-100);
                          dVar121 = auVar343._0_8_ + 1.0;
                          dVar123 = auVar343._8_8_ + 1.0;
                          dVar281 = (dVar124 + dVar121) * dVar281;
                          dVar281 = dVar281 / ((dVar384 + dVar123) * dVar229 +
                                               (dVar124 + dVar123) * dVar183 + dVar281 +
                                               (dVar384 + dVar121) * dVar184 + 1e-100);
                          dVar121 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar92 + lVar58 + lVar106 + lVar78 * 2]);
                          dVar121 = dVar121 / (ABS((double)local_a70._vptr_BaseFab
                                                           [lVar83 + lVar58 + lVar106 + lVar78 * 2])
                                              + dVar121);
                          uVar107 = -(ulong)((double)local_a70._vptr_BaseFab
                                                     [lVar83 + lVar58 + lVar106 + lVar78 * 2] == 0.0
                                            );
                          uVar333 = -(ulong)((double)local_a70._vptr_BaseFab
                                                     [lVar92 + lVar58 + lVar106 + lVar78 * 2] == 0.0
                                            );
                          dVar121 = (double)((uVar107 & 0x3fe0000000000000 |
                                             ~uVar107 & (ulong)dVar121) & uVar333 |
                                            ~uVar333 & (ulong)dVar121);
                          auVar259._0_8_ =
                               (ulong)local_a70._vptr_BaseFab[lVar83 + lVar70 + lVar106 + lVar78] &
                               0x7fffffffffffffff;
                          auVar259._8_8_ =
                               (ulong)local_a70._vptr_BaseFab[lVar83 + lVar93 + lVar106 + lVar78] &
                               0x7fffffffffffffff;
                          dVar184 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar92 + lVar70 + lVar106 + lVar78 * 4]);
                          dVar123 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar92 + lVar93 + lVar106 + lVar78 * 4]);
                          dVar229 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar83 + lVar70 + lVar106 + lVar78 * 4]);
                          dVar384 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar83 + lVar93 + lVar106 + lVar78 * 4]);
                          auVar418._0_8_ = dVar184 + dVar229 + 1e-100;
                          auVar418._8_8_ = dVar123 + dVar384 + 1e-100;
                          auVar343 = divpd(auVar259,auVar418);
                          dVar385 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar92 + lVar70 + lVar106 + lVar78 * 2]) /
                                    (dVar123 + dVar184 + 1e-100);
                          dVar429 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar83 + lVar70 + lVar106 + lVar78 * 2]) /
                                    (dVar384 + dVar229 + 1e-100);
                          dVar124 = auVar343._0_8_ + 1.0;
                          dVar183 = auVar343._8_8_ + 1.0;
                          dVar123 = (dVar385 + dVar183) * dVar123;
                          dVar123 = dVar123 / ((dVar429 + dVar183) * dVar384 +
                                               (dVar385 + dVar124) * dVar184 + dVar123 +
                                               (dVar429 + dVar124) * dVar229 + 1e-100);
                          local_d58 = local_a70._vptr_BaseFab + lVar92 + lVar59 + lVar102;
                          lVar60 = (long)(iVar74 - local_a70.domain.smallend.vect[2]);
                          dVar580 = ABS((double)local_278[lVar60 + lVar78 * 4]);
                          dVar552 = ABS((double)local_9f8[lVar60 + lVar102 + lVar78 * 4]);
                          dVar695 = ABS((double)local_480[lVar59 + lVar102 + lVar78 * 4]);
                          dVar183 = ABS((double)local_9f8[lVar59 + lVar102 + lVar78 * 4]);
                          dVar612 = ABS((double)local_480[lVar59 + lVar102 + lVar78 * 2]) /
                                    (dVar580 + dVar695 + 1e-100);
                          dVar432 = ABS((double)local_9f8[lVar59 + lVar102 + lVar78 * 2]) /
                                    (dVar552 + dVar183 + 1e-100);
                          dVar514 = ABS((double)local_9f8[lVar60 + lVar102 + lVar78]) /
                                    (dVar580 + dVar552 + 1e-100) + 1.0;
                          dVar124 = ABS((double)local_9f8[lVar59 + lVar102 + lVar78]) /
                                    (dVar695 + dVar183 + 1e-100) + 1.0;
                          dVar183 = (dVar124 + dVar432) * dVar183;
                          dVar581 = ABS((double)local_9f8[lVar58 + lVar102 + lVar78 * 2]);
                          dVar581 = dVar581 / (ABS((double)local_480[lVar58 + lVar102 + lVar78 * 2])
                                              + dVar581);
                          uVar107 = -(ulong)((double)local_9f8[lVar58 + lVar102 + lVar78 * 2] == 0.0
                                            );
                          uVar333 = -(ulong)((double)local_480[lVar58 + lVar102 + lVar78 * 2] == 0.0
                                            );
                          dVar662 = ABS((double)local_480[lVar58 + lVar102 + lVar78 * 4]);
                          dVar229 = ABS((double)local_9f8[lVar58 + lVar102 + lVar78 * 4]);
                          lVar80 = (long)(iVar63 - local_a70.domain.smallend.vect[2]);
                          dVar586 = ABS((double)local_278[lVar80 + lVar78 * 4]);
                          dVar697 = ABS((double)local_9f8[lVar80 + lVar102 + lVar78 * 4]);
                          dVar646 = ABS((double)local_278[lVar80 + lVar78 * 2]) /
                                    (dVar662 + dVar586 + 1e-100);
                          dVar466 = ABS((double)local_9f8[lVar80 + lVar102 + lVar78 * 2]) /
                                    (dVar229 + dVar697 + 1e-100);
                          dVar184 = ABS((double)local_9f8[lVar58 + lVar102 + lVar78]) /
                                    (dVar662 + dVar229 + 1e-100) + 1.0;
                          dVar582 = ABS((double)local_9f8[lVar80 + lVar102 + lVar78]) /
                                    (dVar586 + dVar697 + 1e-100) + 1.0;
                          dVar229 = (dVar184 + dVar466) * dVar229;
                          dVar641 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar59 + lVar102 + lVar78]);
                          dVar641 = dVar641 / (ABS((double)local_a70._vptr_BaseFab
                                                           [lVar82 + lVar60 + lVar102 + lVar78]) +
                                              dVar641);
                          uVar111 = -(ulong)((double)local_a70._vptr_BaseFab
                                                     [lVar82 + lVar59 + lVar102 + lVar78] == 0.0);
                          uVar112 = -(ulong)((double)local_a70._vptr_BaseFab
                                                     [lVar82 + lVar60 + lVar102 + lVar78] == 0.0);
                          dVar467 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar58 + lVar102 + lVar78]);
                          dVar467 = dVar467 / (ABS((double)local_a70._vptr_BaseFab
                                                           [lVar82 + lVar80 + lVar102 + lVar78]) +
                                              dVar467);
                          uVar113 = -(ulong)((double)local_a70._vptr_BaseFab
                                                     [lVar82 + lVar80 + lVar102 + lVar78] == 0.0);
                          uVar114 = -(ulong)((double)local_a70._vptr_BaseFab
                                                     [lVar82 + lVar58 + lVar102 + lVar78] == 0.0);
                          dVar548 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar60 + lVar102 + lVar78 * 4]);
                          dVar583 = ABS((double)local_280[lVar60 + lVar78 * 4]);
                          dVar554 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar59 + lVar102 + lVar78 * 4]);
                          dVar664 = ABS((double)local_488[lVar59 + lVar102 + lVar78 * 4]);
                          dVar553 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar59 + lVar102 + lVar78 * 2]) /
                                    (dVar548 + dVar554 + 1e-100);
                          dVar387 = ABS((double)local_488[lVar59 + lVar102 + lVar78 * 2]) /
                                    (dVar583 + dVar664 + 1e-100);
                          dVar515 = ABS((double)local_280[lVar60 + lVar78]) /
                                    (dVar548 + dVar583 + 1e-100) + 1.0;
                          dVar663 = ABS((double)local_488[lVar59 + lVar102 + lVar78]) /
                                    (dVar554 + dVar664 + 1e-100) + 1.0;
                          dVar554 = (dVar553 + dVar663) * dVar554;
                          dVar336 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar58 + lVar102 + lVar78 * 2]);
                          dVar336 = dVar336 / (ABS((double)local_488[lVar58 + lVar102 + lVar78 * 2])
                                              + dVar336);
                          uVar115 = -(ulong)((double)local_a70._vptr_BaseFab
                                                     [lVar82 + lVar58 + lVar102 + lVar78 * 2] == 0.0
                                            );
                          uVar116 = -(ulong)((double)local_488[lVar58 + lVar102 + lVar78 * 2] == 0.0
                                            );
                          dVar384 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar58 + lVar102 + lVar78 * 4]);
                          dVar549 = ABS((double)local_488[lVar58 + lVar102 + lVar78 * 4]);
                          dVar618 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar80 + lVar102 + lVar78 * 4]);
                          dVar587 = ABS((double)local_488[lVar80 + lVar102 + lVar78 * 4]);
                          dVar680 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar80 + lVar102 + lVar78 * 2]) /
                                    (dVar384 + dVar618 + 1e-100);
                          dVar337 = ABS((double)local_488[lVar80 + lVar102 + lVar78 * 2]) /
                                    (dVar549 + dVar587 + 1e-100);
                          dVar555 = ABS((double)local_488[lVar58 + lVar102 + lVar78]) /
                                    (dVar384 + dVar549 + 1e-100) + 1.0;
                          dVar384 = (dVar555 + dVar680) * dVar384;
                          dVar611 = ABS((double)local_488[lVar80 + lVar102 + lVar78]) /
                                    (dVar618 + dVar587 + 1e-100) + 1.0;
                          dVar556 = ABS((double)local_9f8[lVar59 + lVar102 + lVar78 * 7]);
                          dVar616 = ABS((double)local_9f8[lVar60 + lVar102 + lVar78 * 7]) + dVar556;
                          dVar642 = dVar556 + ABS((double)local_480[lVar59 + lVar102 + lVar78 * 7]);
                          dVar683 = ABS((double)local_9f8[lVar59 + lVar77 + lVar78 * 7]);
                          auVar260._0_8_ =
                               (ulong)local_9f8[lVar59 + lVar102 + lVar78 * 6] & 0x7fffffffffffffff;
                          auVar260._8_8_ =
                               (ulong)local_9f8[lVar59 + lVar102 + lVar78 * 5] & 0x7fffffffffffffff;
                          auVar452._0_8_ = dVar616 + 1e-100;
                          auVar452._8_8_ = dVar642 + 1e-100;
                          auVar343 = divpd(auVar260,auVar452);
                          auVar453._0_8_ =
                               (ulong)local_9f8[lVar58 + lVar77 + lVar78 * 2] & 0x7fffffffffffffff;
                          auVar453._8_8_ =
                               (ulong)local_480[lVar58 + lVar77 + lVar78 * 2] & 0x7fffffffffffffff;
                          dVar429 = ABS((double)local_9f8[lVar58 + lVar102 + lVar78 * 6]);
                          dVar558 = ABS((double)local_480[lVar58 + lVar102 + lVar78 * 6]);
                          dVar684 = ABS((double)local_9f8[lVar58 + lVar77 + lVar78 * 6]);
                          dVar685 = ABS((double)local_480[lVar58 + lVar77 + lVar78 * 6]);
                          auVar261._0_8_ = dVar429 + dVar684 + 1e-100;
                          auVar261._8_8_ = dVar558 + dVar685 + 1e-100;
                          auVar341 = divpd(auVar453,auVar261);
                          dVar385 = ABS((double)local_9f8[lVar58 + lVar102 + lVar78 * 3]) /
                                    (dVar558 + dVar429 + 1e-100);
                          dVar579 = ABS((double)local_9f8[lVar58 + lVar77 + lVar78 * 3]) /
                                    (dVar685 + dVar684 + 1e-100);
                          dVar617 = auVar341._0_8_ + 1.0;
                          dVar645 = auVar341._8_8_ + 1.0;
                          dVar429 = (dVar385 + dVar617) * dVar429;
                          dVar619 = ABS((double)local_9f8[lVar58 + lVar102 + lVar78 * 7]);
                          dVar681 = ABS((double)local_9f8[lVar58 + lVar77 + lVar78 * 7]);
                          dVar660 = ABS((double)local_9f8[lVar80 + lVar102 + lVar78 * 7]) + dVar619;
                          dVar584 = dVar619 + ABS((double)local_480[lVar58 + lVar102 + lVar78 * 7]);
                          auVar595._0_8_ =
                               (ulong)local_9f8[lVar58 + lVar77 + lVar78 * 4] & 0x7fffffffffffffff;
                          auVar595._8_8_ =
                               (ulong)local_9f8[lVar80 + lVar102 + lVar78 * 3] & 0x7fffffffffffffff;
                          auVar632._0_8_ = dVar619 + dVar681 + 1e-100;
                          auVar632._8_8_ =
                               ABS((double)local_480[lVar58 + lVar102 + lVar78 * 7]) +
                               ABS((double)local_278[lVar80 + lVar78 * 7]) + dVar619 +
                               ABS((double)local_9f8[lVar80 + lVar102 + lVar78 * 7]) + 1e-100;
                          auVar290 = divpd(auVar595,auVar632);
                          auVar566._0_8_ =
                               (ulong)local_9f8[lVar80 + lVar102 + lVar78 * 6] & 0x7fffffffffffffff;
                          auVar566._8_8_ =
                               (ulong)local_9f8[lVar58 + lVar102 + lVar78 * 5] & 0x7fffffffffffffff;
                          auVar529._0_8_ = dVar660 + 1e-100;
                          auVar529._8_8_ = dVar584 + 1e-100;
                          auVar287 = divpd(auVar566,auVar529);
                          auVar596._0_8_ =
                               (ulong)local_a70._vptr_BaseFab[lVar82 + lVar59 + lVar77 + lVar78] &
                               0x7fffffffffffffff;
                          auVar596._8_8_ =
                               (ulong)local_a70._vptr_BaseFab[lVar82 + lVar60 + lVar77 + lVar78] &
                               0x7fffffffffffffff;
                          dVar647 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar59 + lVar102 + lVar78 * 5]);
                          dVar661 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar60 + lVar102 + lVar78 * 5]);
                          dVar620 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar59 + lVar77 + lVar78 * 5]);
                          dVar643 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar60 + lVar77 + lVar78 * 5]);
                          auVar144._0_8_ = dVar647 + dVar620 + 1e-100;
                          auVar144._8_8_ = dVar661 + dVar643 + 1e-100;
                          auVar341 = divpd(auVar596,auVar144);
                          dVar559 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar59 + lVar102 + lVar78 * 3]) /
                                    (dVar661 + dVar647 + 1e-100);
                          dVar665 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar59 + lVar77 + lVar78 * 3]) /
                                    (dVar643 + dVar620 + 1e-100);
                          dVar588 = auVar341._0_8_ + 1.0;
                          dVar613 = auVar341._8_8_ + 1.0;
                          dVar647 = (dVar559 + dVar588) * dVar647;
                          dVar470 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar58 + lVar102 + lVar78 * 3]);
                          dVar470 = dVar470 / (ABS((double)local_a70._vptr_BaseFab
                                                           [lVar82 + lVar58 + lVar77 + lVar78 * 3])
                                              + dVar470);
                          uVar117 = -(ulong)((double)local_a70._vptr_BaseFab
                                                     [lVar82 + lVar58 + lVar102 + lVar78 * 3] == 0.0
                                            );
                          uVar118 = -(ulong)((double)local_a70._vptr_BaseFab
                                                     [lVar82 + lVar58 + lVar77 + lVar78 * 3] == 0.0)
                          ;
                          auVar262._0_8_ =
                               (ulong)local_a70._vptr_BaseFab[lVar82 + lVar80 + lVar77 + lVar78] &
                               0x7fffffffffffffff;
                          auVar262._8_8_ =
                               (ulong)local_a70._vptr_BaseFab[lVar82 + lVar58 + lVar77 + lVar78] &
                               0x7fffffffffffffff;
                          dVar615 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar80 + lVar102 + lVar78 * 5]);
                          dVar512 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar58 + lVar102 + lVar78 * 5]);
                          dVar621 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar80 + lVar77 + lVar78 * 5]);
                          dVar644 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar58 + lVar77 + lVar78 * 5]);
                          auVar652._0_8_ = dVar615 + dVar621 + 1e-100;
                          auVar652._8_8_ = dVar512 + dVar644 + 1e-100;
                          auVar341 = divpd(auVar262,auVar652);
                          dVar471 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar80 + lVar102 + lVar78 * 3]) /
                                    (dVar512 + dVar615 + 1e-100);
                          dVar560 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar80 + lVar77 + lVar78 * 3]) /
                                    (dVar644 + dVar621 + 1e-100);
                          dVar388 = auVar341._0_8_ + 1.0;
                          dVar386 = auVar341._8_8_ + 1.0;
                          dVar512 = (dVar471 + dVar386) * dVar512;
                          dVar427 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar59 + lVar102 + lVar78 * 7]);
                          auVar567._8_4_ = SUB84(dVar427,0);
                          auVar567._0_8_ = dVar427;
                          auVar567._12_4_ = (int)((ulong)dVar427 >> 0x20);
                          dVar433 = dVar427 + ABS((double)local_a70._vptr_BaseFab
                                                          [lVar82 + lVar60 + lVar102 + lVar78 * 7]);
                          dVar338 = auVar567._8_8_ +
                                    ABS((double)local_488[lVar59 + lVar102 + lVar78 * 7]);
                          dVar339 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar59 + lVar77 + lVar78 * 7]);
                          auVar653._0_8_ =
                               (ulong)local_a70._vptr_BaseFab[lVar82 + lVar59 + lVar77 + lVar78 * 2]
                               & 0x7fffffffffffffff;
                          auVar653._8_8_ =
                               (ulong)local_488[lVar59 + lVar77 + lVar78] & 0x7fffffffffffffff;
                          auVar670._0_8_ =
                               dVar339 + dVar433 + ABS((double)local_a70._vptr_BaseFab
                                                               [lVar82 + lVar60 + lVar77 + lVar78 * 
                                                  7]) + 1e-100;
                          auVar670._8_8_ =
                               ABS((double)local_488[lVar59 + lVar77 + lVar78 * 7]) +
                               dVar338 + dVar339 + 1e-100;
                          auVar404 = divpd(auVar653,auVar670);
                          auVar308._0_8_ =
                               (ulong)local_a70._vptr_BaseFab[lVar82 + lVar59 + lVar77 + lVar78 * 4]
                               & 0x7fffffffffffffff;
                          auVar308._8_8_ =
                               (ulong)local_488[lVar59 + lVar102 + lVar78 * 3] & 0x7fffffffffffffff;
                          auVar501._0_8_ = dVar339 + dVar427 + 1e-100;
                          auVar501._8_8_ =
                               ABS((double)local_280[lVar60 + lVar78 * 7]) + dVar433 +
                               ABS((double)local_488[lVar59 + lVar102 + lVar78 * 7]) + 1e-100;
                          auVar341 = divpd(auVar308,auVar501);
                          auVar530._0_8_ =
                               (ulong)local_a70._vptr_BaseFab
                                      [lVar82 + lVar59 + lVar102 + lVar78 * 6] & 0x7fffffffffffffff;
                          auVar530._8_8_ =
                               (ulong)local_488[lVar59 + lVar102 + lVar78 * 5] & 0x7fffffffffffffff;
                          auVar568._0_8_ = dVar433 + 1e-100;
                          auVar568._8_8_ = dVar338 + 1e-100;
                          auVar285 = divpd(auVar530,auVar568);
                          auVar531._0_8_ =
                               (ulong)local_488[lVar58 + lVar77 + lVar78 * 2] & 0x7fffffffffffffff;
                          auVar531._8_8_ =
                               (ulong)local_a70._vptr_BaseFab[lVar82 + lVar58 + lVar77 + lVar78 * 2]
                               & 0x7fffffffffffffff;
                          dVar666 = ABS((double)local_488[lVar58 + lVar102 + lVar78 * 6]);
                          dVar682 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar58 + lVar102 + lVar78 * 6]);
                          dVar686 = ABS((double)local_488[lVar58 + lVar77 + lVar78 * 6]);
                          dVar696 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar58 + lVar77 + lVar78 * 6]);
                          auVar366._0_8_ = dVar666 + dVar686 + 1e-100;
                          auVar366._8_8_ = dVar682 + dVar696 + 1e-100;
                          auVar186 = divpd(auVar531,auVar366);
                          dVar561 = ABS((double)local_488[lVar58 + lVar102 + lVar78 * 3]) /
                                    (dVar682 + dVar666 + 1e-100);
                          dVar433 = ABS((double)local_488[lVar58 + lVar77 + lVar78 * 3]) /
                                    (dVar696 + dVar686 + 1e-100);
                          dVar557 = auVar186._0_8_ + 1.0;
                          dVar585 = auVar186._8_8_ + 1.0;
                          dVar682 = (dVar561 + dVar585) * dVar682;
                          dVar339 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar58 + lVar102 + lVar78 * 7]);
                          auVar263._8_4_ = SUB84(dVar339,0);
                          auVar263._0_8_ = dVar339;
                          auVar263._12_4_ = (int)((ulong)dVar339 >> 0x20);
                          dVar338 = dVar339 + ABS((double)local_a70._vptr_BaseFab
                                                          [lVar82 + lVar80 + lVar102 + lVar78 * 7]);
                          dVar472 = auVar263._8_8_ +
                                    ABS((double)local_488[lVar58 + lVar102 + lVar78 * 7]);
                          dVar622 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar58 + lVar77 + lVar78 * 7]);
                          auVar597._0_8_ =
                               (ulong)local_a70._vptr_BaseFab[lVar82 + lVar58 + lVar77 + lVar78 * 4]
                               & 0x7fffffffffffffff;
                          auVar597._8_8_ =
                               (ulong)local_488[lVar80 + lVar102 + lVar78 * 3] & 0x7fffffffffffffff;
                          auVar419._0_8_ =
                               (ulong)local_a70._vptr_BaseFab[lVar82 + lVar80 + lVar77 + lVar78 * 2]
                               & 0x7fffffffffffffff;
                          auVar419._8_8_ =
                               (ulong)local_488[lVar58 + lVar77 + lVar78] & 0x7fffffffffffffff;
                          auVar454._8_4_ = SUB84(dVar622,0);
                          auVar454._0_8_ = dVar622;
                          auVar454._12_4_ = (int)((ulong)dVar622 >> 0x20);
                          auVar455._0_8_ =
                               dVar622 + dVar338 +
                               ABS((double)local_a70._vptr_BaseFab
                                           [lVar82 + lVar80 + lVar77 + lVar78 * 7]) + 1e-100;
                          auVar455._8_8_ =
                               auVar454._8_8_ + dVar472 +
                               ABS((double)local_488[lVar58 + lVar77 + lVar78 * 7]) + 1e-100;
                          auVar186 = divpd(auVar419,auVar455);
                          auVar204._0_8_ = dVar339 + dVar622 + 1e-100;
                          auVar204._8_8_ =
                               ABS((double)local_488[lVar58 + lVar102 + lVar78 * 7]) + dVar338 +
                               ABS((double)local_488[lVar80 + lVar102 + lVar78 * 7]) + 1e-100;
                          auVar354 = divpd(auVar597,auVar204);
                          auVar502._0_8_ =
                               (ulong)local_a70._vptr_BaseFab
                                      [lVar82 + lVar80 + lVar102 + lVar78 * 6] & 0x7fffffffffffffff;
                          auVar502._8_8_ =
                               (ulong)local_488[lVar58 + lVar102 + lVar78 * 5] & 0x7fffffffffffffff;
                          auVar264._0_8_ = dVar338 + 1e-100;
                          auVar264._8_8_ = dVar472 + 1e-100;
                          auVar230 = divpd(auVar502,auVar264);
                          *(double *)(local_250 + (long)local_cb8 * 8) =
                               ((double)local_488[lVar80 + lVar77 + lVar78 * 8] * dVar339 *
                                (auVar230._8_8_ +
                                 auVar354._8_8_ + auVar186._8_8_ + 1.0 + auVar186._0_8_ +
                                 auVar354._0_8_ + auVar230._0_8_) *
                                (dVar123 * (double)local_a70._vptr_BaseFab
                                                   [lVar83 + lVar70 + lVar77 + lVar78 * 3] +
                                dVar121 * (double)local_14b8[lVar78 * 5] +
                                dVar120 * (double)local_a70._vptr_BaseFab
                                                  [lVar92 + lVar70 + lVar77 + lVar78 * 6] +
                                dVar698 * (double)local_a70._vptr_BaseFab[lVar83 + lVar70 + lVar77]
                                + dVar332 * (double)local_14b8[lVar78] +
                                  dVar550 * (double)local_a70._vptr_BaseFab
                                                    [lVar92 + lVar93 + lVar77 + lVar78 * 4] +
                                  dVar122 * (double)local_a70._vptr_BaseFab
                                                    [lVar92 + lVar70 + lVar77 + lVar78 * 2] +
                                (double)local_a70._vptr_BaseFab
                                        [lVar92 + lVar93 + lVar77 + lVar78 * 7]) +
                               (dVar682 /
                               ((dVar433 + dVar585) * dVar696 +
                                (dVar561 + dVar557) * dVar666 + dVar682 +
                                (dVar433 + dVar557) * dVar686 + 1e-100)) *
                               ((double)local_a70._vptr_BaseFab
                                        [lVar83 + lVar58 + lVar77 + lVar78 * 5] * dVar123 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar83 + lVar58 + lVar77 + lVar78 * 3] * dVar121 +
                               dVar281 * (double)local_a70._vptr_BaseFab
                                                 [lVar83 + lVar59 + lVar77 + lVar78 * 5] +
                               (double)local_a70._vptr_BaseFab
                                       [lVar92 + lVar58 + lVar77 + lVar78 * 7] * dVar120 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar92 + lVar59 + lVar77 + lVar78 * 7] * dVar334 +
                               (double)local_a70._vptr_BaseFab[lVar83 + lVar58 + lVar77 + lVar78] *
                               dVar698 + (double)local_a70._vptr_BaseFab[lVar83 + lVar58 + lVar77] *
                                         dVar332 + dVar331 * (double)local_a70._vptr_BaseFab
                                                                     [lVar83 + lVar59 + lVar77 + 
                                                  lVar78] + (double)local_a70._vptr_BaseFab
                                                                    [lVar92 + lVar58 + lVar77 + 
                                                  lVar78 * 4] * dVar122 +
                                                  dVar513 * (double)local_a70._vptr_BaseFab
                                                                    [lVar92 + lVar59 + lVar77 + 
                                                  lVar78 * 4] +
                                                  (double)local_a70._vptr_BaseFab
                                                          [lVar92 + lVar58 + lVar77 + lVar78 * 2] *
                                                  dVar550 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar92 + lVar58 + lVar77 + lVar78 * 6]) +
                               (double)local_488[lVar59 + lVar77 + lVar78 * 8] * dVar427 *
                               (auVar285._8_8_ +
                                auVar341._8_8_ + auVar404._8_8_ + 1.0 + auVar404._0_8_ +
                                auVar341._0_8_ + auVar285._0_8_) *
                               ((double)local_a70._vptr_BaseFab
                                        [lVar83 + lVar71 + lVar77 + lVar78 * 5] * dVar121 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar83 + lVar71 + lVar77 + lVar78 * 3] * dVar281 +
                               dVar334 * (double)local_a70._vptr_BaseFab
                                                 [lVar92 + lVar71 + lVar77 + lVar78 * 6] +
                               (double)local_a70._vptr_BaseFab[lVar83 + lVar71 + lVar77 + lVar78] *
                               dVar332 + (double)local_a70._vptr_BaseFab[lVar83 + lVar71 + lVar77] *
                                         dVar331 + (double)local_a70._vptr_BaseFab
                                                           [lVar92 + lVar71 + lVar77 + lVar78 * 2] *
                                                   dVar513 + (double)local_a70._vptr_BaseFab
                                                                     [lVar92 + lVar71 + lVar77 + 
                                                  lVar78 * 4] * dVar550 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar92 + lVar71 + lVar77 + lVar78 * 7]) +
                               (dVar512 /
                               ((dVar560 + dVar386) * dVar644 +
                                (dVar471 + dVar388) * dVar615 + dVar512 +
                                (dVar560 + dVar388) * dVar621 + 1e-100)) *
                               ((double)local_a70._vptr_BaseFab
                                        [lVar82 + lVar70 + lVar77 + lVar78 * 6] * dVar123 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar82 + lVar93 + lVar77 + lVar78 * 7] * dVar121 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar82 + lVar70 + lVar77 + lVar78 * 3] * dVar120 +
                               dVar431 * (double)local_9f8[lVar70 + lVar77 + lVar78 * 6] +
                               (double)local_9f8[lVar93 + lVar77 + lVar78 * 7] * dVar469 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar82 + lVar70 + lVar77 + lVar78 * 2] * dVar698 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar82 + lVar93 + lVar77 + lVar78 * 4] * dVar332 +
                               (double)local_a70._vptr_BaseFab[lVar82 + lVar70 + lVar77] * dVar122 +
                               (double)local_a70._vptr_BaseFab[lVar82 + lVar93 + lVar77 + lVar78] *
                               dVar550 + dVar430 * (double)local_9f8[lVar93 + lVar77 + lVar78 * 4] +
                                         dVar473 * (double)local_9f8[lVar70 + lVar77 + lVar78 * 2] +
                               (double)local_a70._vptr_BaseFab
                                       [lVar82 + lVar93 + lVar77 + lVar78 * 5]) +
                               (double)((uVar118 & 0x3fe0000000000000 | ~uVar118 & (ulong)dVar470) &
                                        uVar117 | ~uVar117 & (ulong)dVar470) *
                               ((double)local_a70._vptr_BaseFab
                                        [lVar82 + lVar58 + lVar77 + lVar78 * 7] * dVar123 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar82 + lVar58 + lVar77 + lVar78 * 6] * dVar121 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar82 + lVar59 + lVar77 + lVar78 * 7] * dVar281 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar82 + lVar58 + lVar77 + lVar78 * 5] * dVar120 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar82 + lVar59 + lVar77 + lVar78 * 5] * dVar334 +
                               (double)local_9f8[lVar58 + lVar77 + lVar78 * 7] * dVar431 +
                               (double)local_9f8[lVar58 + lVar77 + lVar78 * 6] * dVar469 +
                               dVar335 * (double)local_9f8[lVar59 + lVar77 + lVar78 * 7] +
                               (double)local_a70._vptr_BaseFab
                                       [lVar82 + lVar58 + lVar77 + lVar78 * 4] * dVar698 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar82 + lVar58 + lVar77 + lVar78 * 2] * dVar332 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar82 + lVar59 + lVar77 + lVar78 * 4] * dVar331 +
                               (double)local_a70._vptr_BaseFab[lVar82 + lVar58 + lVar77 + lVar78] *
                               dVar122 + (double)local_a70._vptr_BaseFab[lVar82 + lVar58 + lVar77] *
                                         dVar550 + (double)local_a70._vptr_BaseFab
                                                           [lVar82 + lVar59 + lVar77 + lVar78] *
                                                   dVar513 + (double)local_9f8[lVar58 + lVar77 + 
                                                  lVar78 * 4] * dVar473 +
                                                  dVar578 * (double)local_9f8[lVar59 + lVar77 + 
                                                  lVar78 * 4] +
                                                  (double)local_9f8[lVar58 + lVar77 + lVar78 * 2] *
                                                  dVar430 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar82 + lVar58 + lVar77 + lVar78 * 3]) +
                               (dVar647 /
                               ((dVar665 + dVar613) * dVar643 +
                                (dVar559 + dVar613) * dVar661 + dVar647 +
                                (dVar665 + dVar588) * dVar620 + 1e-100)) *
                               ((double)local_a70._vptr_BaseFab
                                        [lVar82 + lVar71 + lVar77 + lVar78 * 7] * dVar121 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar82 + lVar71 + lVar77 + lVar78 * 6] * dVar281 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar82 + lVar71 + lVar77 + lVar78 * 3] * dVar334 +
                               (double)local_9f8[lVar71 + lVar77 + lVar78 * 7] * dVar469 +
                               (double)local_9f8[lVar71 + lVar77 + lVar78 * 6] * dVar335 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar82 + lVar71 + lVar77 + lVar78 * 4] * dVar332 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar82 + lVar71 + lVar77 + lVar78 * 2] * dVar331 +
                               (double)local_a70._vptr_BaseFab[lVar82 + lVar71 + lVar77 + lVar78] *
                               dVar550 + (double)local_a70._vptr_BaseFab[lVar82 + lVar71 + lVar77] *
                                         dVar513 + (double)local_9f8[lVar71 + lVar77 + lVar78 * 2] *
                                                   dVar578 + (double)local_9f8[lVar71 + lVar77 + 
                                                  lVar78 * 4] * dVar430 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar82 + lVar71 + lVar77 + lVar78 * 5]) +
                               (double)local_9f8[lVar80 + lVar77 + lVar78 * 8] * dVar619 *
                               (auVar287._8_8_ +
                                auVar290._8_8_ +
                                ABS((double)local_9f8[lVar80 + lVar77 + lVar78 * 2]) /
                                (dVar681 + dVar660 +
                                 ABS((double)local_9f8[lVar80 + lVar77 + lVar78 * 7]) + 1e-100) +
                                ABS((double)local_9f8[lVar58 + lVar77 + lVar78]) /
                                (dVar584 + ABS((double)local_480[lVar58 + lVar77 + lVar78 * 7]) +
                                 dVar681 + 1e-100) + 1.0 + auVar290._0_8_ + auVar287._0_8_) *
                               ((double)local_a70._vptr_BaseFab
                                        [lVar79 + lVar70 + lVar77 + lVar78 * 6] * dVar120 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar79 + lVar70 + lVar77 + lVar78 * 3] * dVar431 +
                               dVar469 * (double)local_a70._vptr_BaseFab
                                                 [lVar79 + lVar93 + lVar77 + lVar78 * 5] +
                               (double)local_a70._vptr_BaseFab
                                       [lVar79 + lVar70 + lVar77 + lVar78 * 2] * dVar122 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar79 + lVar93 + lVar77 + lVar78 * 4] * dVar550 +
                               (double)local_a70._vptr_BaseFab[lVar79 + lVar93 + lVar77 + lVar78] *
                               dVar430 + (double)local_a70._vptr_BaseFab[lVar79 + lVar70 + lVar77] *
                                         dVar473 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar79 + lVar93 + lVar77 + lVar78 * 7]) +
                               (dVar429 /
                               ((dVar579 + dVar645) * dVar685 +
                                (dVar645 + dVar385) * dVar558 + dVar429 +
                                (dVar579 + dVar617) * dVar684 + 1e-100)) *
                               ((double)local_a70._vptr_BaseFab
                                        [lVar79 + lVar58 + lVar77 + lVar78 * 7] * dVar120 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar79 + lVar59 + lVar77 + lVar78 * 7] * dVar334 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar79 + lVar58 + lVar77 + lVar78 * 5] * dVar431 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar79 + lVar58 + lVar77 + lVar78 * 3] * dVar469 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar79 + lVar59 + lVar77 + lVar78 * 5] * dVar335 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar79 + lVar58 + lVar77 + lVar78 * 4] * dVar122 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar79 + lVar58 + lVar77 + lVar78 * 2] * dVar550 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar79 + lVar59 + lVar77 + lVar78 * 4] * dVar513 +
                               (double)local_a70._vptr_BaseFab[lVar79 + lVar58 + lVar77 + lVar78] *
                               dVar473 + (double)local_a70._vptr_BaseFab
                                                 [lVar79 + lVar59 + lVar77 + lVar78] * dVar578 +
                                         (double)local_a70._vptr_BaseFab[lVar79 + lVar58 + lVar77] *
                                         dVar430 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar79 + lVar58 + lVar77 + lVar78 * 6]) +
                               (double)local_9f8[lVar59 + lVar77 + lVar78 * 8] * dVar556 *
                               (auVar343._8_8_ +
                                ABS((double)local_9f8[lVar59 + lVar77 + lVar78 * 4]) /
                                (dVar556 + dVar683 + 1e-100) +
                                ABS((double)local_9f8[lVar59 + lVar102 + lVar78 * 3]) /
                                (ABS((double)local_480[lVar59 + lVar102 + lVar78 * 7]) +
                                 ABS((double)local_278[lVar60 + lVar78 * 7]) +
                                 ABS((double)local_9f8[lVar60 + lVar102 + lVar78 * 7]) + dVar556 +
                                1e-100) + ABS((double)local_9f8[lVar59 + lVar77 + lVar78 * 2]) /
                                          (ABS((double)local_9f8[lVar60 + lVar77 + lVar78 * 7]) +
                                           dVar616 + dVar683 + 1e-100) +
                                          ABS((double)local_9f8[lVar59 + lVar77 + lVar78]) /
                                          (dVar642 + ABS((double)local_480[lVar59 + lVar77 + lVar78 
                                                  * 7]) + dVar683 + 1e-100) + 1.0 + auVar343._0_8_)
                               * ((double)local_a70._vptr_BaseFab
                                          [lVar79 + lVar71 + lVar77 + lVar78 * 6] * dVar334 +
                                  (double)local_a70._vptr_BaseFab
                                          [lVar79 + lVar71 + lVar77 + lVar78 * 5] * dVar469 +
                                  (double)local_a70._vptr_BaseFab
                                          [lVar79 + lVar71 + lVar77 + lVar78 * 3] * dVar335 +
                                  (double)local_a70._vptr_BaseFab
                                          [lVar79 + lVar71 + lVar77 + lVar78 * 4] * dVar550 +
                                  (double)local_a70._vptr_BaseFab
                                          [lVar79 + lVar71 + lVar77 + lVar78 * 2] * dVar513 +
                                  (double)local_a70._vptr_BaseFab[lVar79 + lVar71 + lVar77] *
                                  dVar578 + (double)local_a70._vptr_BaseFab
                                                    [lVar79 + lVar71 + lVar77 + lVar78] * dVar430 +
                                 (double)local_a70._vptr_BaseFab
                                         [lVar79 + lVar71 + lVar77 + lVar78 * 7]) +
                               (dVar384 /
                               ((dVar680 + dVar611) * dVar618 + dVar384 +
                                (dVar555 + dVar337) * dVar549 + (dVar611 + dVar337) * dVar587 +
                               1e-100)) *
                               ((double)local_a70._vptr_BaseFab
                                        [lVar83 + lVar70 + lVar102 + lVar78 * 3] * dVar698 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar83 + lVar93 + lVar102 + lVar78 * 5] * dVar332 +
                               (double)local_858[lVar78 * 7] * dVar550 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar92 + lVar70 + lVar102 + lVar78 * 6] * dVar122) +
                               (double)((uVar116 & 0x3fe0000000000000 | ~uVar116 & (ulong)dVar336) &
                                        uVar115 | ~uVar115 & (ulong)dVar336) *
                               ((double)local_a70._vptr_BaseFab
                                        [lVar83 + lVar58 + lVar102 + lVar78 * 5] * dVar698 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar83 + lVar58 + lVar102 + lVar78 * 3] * dVar332 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar83 + lVar59 + lVar102 + lVar78 * 5] * dVar331 +
                               (double)local_de8[lVar78 * 7] * dVar122 +
                               (double)local_d58[lVar78 * 7] * dVar513 + local_1f0) +
                               (dVar554 /
                               ((dVar515 + dVar553) * dVar548 + dVar554 +
                                (dVar515 + dVar387) * dVar583 + (dVar663 + dVar387) * dVar664 +
                               1e-100)) *
                               ((double)local_a70._vptr_BaseFab
                                        [lVar83 + lVar71 + lVar102 + lVar78 * 5] * dVar332 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar83 + lVar71 + lVar102 + lVar78 * 3] * dVar331 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar92 + lVar71 + lVar102 + lVar78 * 6] * dVar513 +
                               local_1f8) +
                               (double)((uVar113 & 0x3fe0000000000000 | ~uVar113 & (ulong)dVar467) &
                                        uVar114 | ~uVar114 & (ulong)dVar467) *
                               ((double)local_a70._vptr_BaseFab
                                        [lVar82 + lVar70 + lVar102 + lVar78 * 6] * dVar698 +
                               (double)local_9e8[lVar78 * 7] * dVar332 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar82 + lVar70 + lVar102 + lVar78 * 3] * dVar122 +
                               local_200 +
                               (double)local_9f8[lVar93 + lVar102 + lVar78 * 7] * dVar430 +
                               (double)local_9f8[lVar70 + lVar102 + lVar78 * 6] * dVar473) +
                               (double)((uVar111 & 0x3fe0000000000000 | ~uVar111 & (ulong)dVar641) &
                                        uVar112 | ~uVar112 & (ulong)dVar641) *
                               ((double)local_a70._vptr_BaseFab
                                        [lVar82 + lVar71 + lVar102 + lVar78 * 7] * dVar332 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar82 + lVar71 + lVar102 + lVar78 * 6] * dVar331 +
                               local_210 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar82 + lVar71 + lVar102 + lVar78 * 3] * dVar513 +
                               (double)local_9f8[lVar71 + lVar102 + lVar78 * 6] * dVar578 +
                               (double)local_9f8[lVar71 + lVar102 + lVar78 * 7] * dVar430) +
                               (dVar229 /
                               ((dVar646 + dVar582) * dVar586 + (dVar184 + dVar646) * dVar662 +
                                dVar229 + (dVar582 + dVar466) * dVar697 + 1e-100)) *
                               ((double)local_a70._vptr_BaseFab
                                        [lVar79 + lVar70 + lVar102 + lVar78 * 6] * dVar122 +
                               local_218 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar79 + lVar93 + lVar102 + lVar78 * 5] * dVar430 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar79 + lVar70 + lVar102 + lVar78 * 3] * dVar473) +
                               (double)((uVar107 & 0x3fe0000000000000 | ~uVar107 & (ulong)dVar581) &
                                        uVar333 | ~uVar333 & (ulong)dVar581) *
                               ((double)local_a70._vptr_BaseFab
                                        [lVar79 + lVar58 + lVar102 + lVar78 * 7] * dVar122 +
                               local_220 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar79 + lVar59 + lVar102 + lVar78 * 7] * dVar513 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar79 + lVar58 + lVar102 + lVar78 * 5] * dVar473 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar79 + lVar59 + lVar102 + lVar78 * 5] * dVar578 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar79 + lVar58 + lVar102 + lVar78 * 3] * dVar430) +
                               (dVar183 /
                               ((dVar514 + dVar432) * dVar552 +
                                (dVar612 + dVar124) * dVar695 + (dVar514 + dVar612) * dVar580 +
                                dVar183 + 1e-100)) *
                               ((double)local_228[lVar78 * 7] * dVar550 +
                               (double)local_228[lVar78 * 6] * dVar513 +
                               (double)local_228[lVar78 * 3] * dVar578 +
                               (double)local_228[lVar78 * 5] * dVar430) +
                               (double)local_a70._vptr_BaseFab
                                       [lVar82 + lVar58 + lVar102 + lVar78 * 7] * dVar698 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar82 + lVar58 + lVar102 + lVar78 * 6] * dVar332 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar82 + lVar59 + lVar102 + lVar78 * 7] * dVar331 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar82 + lVar58 + lVar102 + lVar78 * 5] * dVar122 +
                               local_208 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar82 + lVar59 + lVar102 + lVar78 * 5] * dVar513 +
                               (double)local_9f8[lVar58 + lVar102 + lVar78 * 7] * dVar473 +
                               (double)local_9f8[lVar59 + lVar102 + lVar78 * 7] * dVar578 +
                               (double)local_9f8[lVar58 + lVar102 + lVar78 * 6] * dVar430) * 0.125;
                          dVar550 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar83 + lVar70 + lVar53 + lVar78 * 7]);
                          dVar469 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar92 + lVar70 + lVar76 + lVar78 * 7]);
                          dVar334 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar83 + lVar70 + lVar76 + lVar78 * 7]);
                          p_Var54 = local_a70._vptr_BaseFab[lVar83 + lVar70 + lVar76 + lVar78 * 2];
                          uStack_c40 = 0;
                          dVar123 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar83 + lVar93 + lVar53 + lVar78 * 7]);
                          dVar124 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar83 + lVar93 + lVar76 + lVar78 * 7]);
                          local_338 = ABS((double)p_Var54) /
                                      (dVar550 + dVar123 + dVar124 + dVar334 + 1e-100);
                          uStack_330 = 0;
                          p_Var97 = local_a70._vptr_BaseFab[lVar83 + lVar70 + lVar76 + lVar78 * 3];
                          dVar384 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar92 + lVar93 + lVar76 + lVar78 * 7]);
                          dVar578 = ABS((double)p_Var97) /
                                    (dVar469 + dVar384 + dVar124 + dVar334 + 1e-100);
                          p_Var100 = local_a70._vptr_BaseFab[lVar83 + lVar70 + lVar76 + lVar78 * 6];
                          dVar385 = ABS((double)p_Var100) / (dVar334 + dVar124 + 1e-100);
                          dVar281 = dVar334 * (double)local_a70._vptr_BaseFab
                                                      [lVar83 + lVar70 + lVar76 + lVar78 * 8] *
                                    (ABS((double)local_a70._vptr_BaseFab
                                                 [lVar83 + lVar70 + lVar76 + lVar78 * 5]) /
                                     (dVar469 + dVar334 + 1e-100) +
                                     ABS((double)local_a70._vptr_BaseFab
                                                 [lVar83 + lVar70 + lVar76 + lVar78 * 4]) /
                                     (dVar550 + dVar334 + 1e-100) +
                                     ABS((double)local_a70._vptr_BaseFab
                                                 [lVar83 + lVar70 + lVar76 + lVar78]) /
                                     (ABS((double)local_a70._vptr_BaseFab
                                                  [lVar92 + lVar70 + lVar53 + lVar78 * 7]) + dVar550
                                      + dVar469 + dVar334 + 1e-100) + 1.0 + local_338 + dVar578 +
                                    dVar385);
                          dVar334 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar92 + lVar57 + lVar53 + lVar78 * 6]);
                          dVar120 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar92 + lVar57 + lVar76 + lVar78 * 6]);
                          dVar121 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar83 + lVar57 + lVar53 + lVar78 * 6]);
                          dVar184 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar83 + lVar57 + lVar76 + lVar78 * 6]);
                          dVar122 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar83 + lVar57 + lVar53 + lVar78 * 3]) /
                                    (dVar334 + dVar121 + 1e-100);
                          dVar183 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar83 + lVar57 + lVar76 + lVar78 * 3]) /
                                    (dVar120 + dVar184 + 1e-100);
                          dVar469 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar92 + lVar57 + lVar76 + lVar78 * 2]) /
                                    (dVar334 + dVar120 + 1e-100) + 1.0;
                          dVar550 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar83 + lVar57 + lVar76 + lVar78 * 2]) /
                                    (dVar121 + dVar184 + 1e-100) + 1.0;
                          dVar184 = (dVar550 + dVar183) * dVar184;
                          dVar184 = dVar184 / ((dVar469 + dVar183) * dVar120 +
                                               (dVar122 + dVar550) * dVar121 +
                                               (dVar469 + dVar122) * dVar334 + dVar184 + 1e-100);
                          dVar429 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar89 + lVar93 + lVar53 + lVar78 * 5]);
                          dVar121 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar89 + lVar93 + lVar76 + lVar78 * 5]);
                          dVar339 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar89 + lVar70 + lVar53 + lVar78 * 5]);
                          dVar120 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar89 + lVar70 + lVar76 + lVar78 * 5]);
                          dVar229 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar89 + lVar70 + lVar53 + lVar78 * 3]) /
                                    (dVar429 + dVar339 + 1e-100);
                          dVar469 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar89 + lVar70 + lVar76 + lVar78 * 3]) /
                                    (dVar121 + dVar120 + 1e-100);
                          dVar183 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar89 + lVar93 + lVar76 + lVar78]) /
                                    (dVar429 + dVar121 + 1e-100) + 1.0;
                          dVar334 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar89 + lVar70 + lVar76 + lVar78]) /
                                    (dVar339 + dVar120 + 1e-100) + 1.0;
                          dVar121 = (dVar183 + dVar469) * dVar121;
                          dVar120 = (dVar334 + dVar469) * dVar120;
                          local_a78 = local_a70._vptr_BaseFab + lVar89 + lVar57;
                          dVar469 = ABS((double)local_a78[lVar76 + lVar78 * 3]);
                          dVar469 = dVar469 / (ABS((double)local_a78[lVar53 + lVar78 * 3]) + dVar469
                                              );
                          uVar107 = -(ulong)((double)local_a78[lVar76 + lVar78 * 3] == 0.0);
                          uVar333 = -(ulong)((double)local_a78[lVar53 + lVar78 * 3] == 0.0);
                          dVar469 = (double)((uVar107 & 0x3fe0000000000000 |
                                             ~uVar107 & (ulong)dVar469) & uVar333 |
                                            ~uVar333 & (ulong)dVar469);
                          auVar532._0_8_ =
                               ABS((double)local_a70._vptr_BaseFab
                                           [lVar83 + lVar70 + lVar102 + lVar78]);
                          auVar532._8_8_ =
                               ABS((double)local_a70._vptr_BaseFab
                                           [lVar83 + lVar93 + lVar102 + lVar78]);
                          dVar473 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar92 + lVar70 + lVar102 + lVar78 * 4]);
                          dStack_770 = ABS((double)local_858[lVar78 * 4]);
                          dVar331 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar83 + lVar70 + lVar102 + lVar78 * 4]);
                          dVar122 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar83 + lVar93 + lVar102 + lVar78 * 4]);
                          auVar633._0_8_ = dVar473 + dVar331 + 1e-100;
                          auVar633._8_8_ = dStack_770 + dVar122 + 1e-100;
                          auVar343 = divpd(auVar532,auVar633);
                          dVar335 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar92 + lVar70 + lVar102 + lVar78 * 2]) /
                                    (dStack_770 + dVar473 + 1e-100);
                          dVar387 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar83 + lVar70 + lVar102 + lVar78 * 2]) /
                                    (dVar122 + dVar331 + 1e-100);
                          dVar332 = auVar343._0_8_ + 1.0;
                          dVar550 = auVar343._8_8_ + 1.0;
                          dStack_770 = (dVar335 + dVar550) * dStack_770;
                          dVar331 = (dVar387 + dVar332) * dVar331;
                          dVar122 = (dVar387 + dVar550) * dVar122;
                          dVar550 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar83 + lVar57 + lVar102 + lVar78 * 2]);
                          dVar550 = dVar550 / (ABS((double)local_a70._vptr_BaseFab
                                                           [lVar92 + lVar57 + lVar102 + lVar78 * 2])
                                              + dVar550);
                          uVar107 = -(ulong)((double)local_a70._vptr_BaseFab
                                                     [lVar83 + lVar57 + lVar102 + lVar78 * 2] == 0.0
                                            );
                          uVar333 = -(ulong)((double)local_a70._vptr_BaseFab
                                                     [lVar92 + lVar57 + lVar102 + lVar78 * 2] == 0.0
                                            );
                          dVar550 = (double)((uVar107 & 0x3fe0000000000000 |
                                             ~uVar107 & (ulong)dVar550) & uVar333 |
                                            ~uVar333 & (ulong)dVar550);
                          p_Var2 = local_a70._vptr_BaseFab[lVar89 + lVar70 + lVar102 + lVar78];
                          p_Var3 = local_a70._vptr_BaseFab[lVar89 + lVar93 + lVar102 + lVar78];
                          local_4e8 = (dVar229 + dVar334) * dVar339 + (dVar183 + dVar229) * dVar429
                                      + dVar121 + dVar120 + 1e-100;
                          uStack_4e0 = 0;
                          dVar120 = dVar120 / local_4e8;
                          local_778 = dStack_770 + (dVar335 + dVar332) * dVar473 + dVar122 + dVar331
                                      + 1e-100;
                          dVar331 = dVar331 / local_778;
                          uStack_990 = 0;
                          dVar334 = ABS((double)p_Var3) + ABS((double)p_Var2);
                          dVar183 = 0.5;
                          if ((double)p_Var2 != 0.0 || (double)p_Var3 != 0.0) {
                            dVar183 = ABS((double)p_Var2) / dVar334;
                          }
                          local_368 = (double)local_a70._vptr_BaseFab
                                              [lVar82 + lVar70 + lVar76 + lVar78 * 4] * dVar184;
                          local_388 = (double)local_a70._vptr_BaseFab
                                              [lVar82 + lVar70 + (long)local_868 + lVar78 * 7] *
                                      dVar184;
                          local_620 = (double)local_a70._vptr_BaseFab
                                              [lVar83 + lVar58 + (long)local_868 + lVar78 * 7] *
                                      dVar120;
                          local_758 = local_a70._vptr_BaseFab
                                      [lVar83 + lVar70 + (long)local_868 + lVar78 * 6];
                          local_a88 = local_a70._vptr_BaseFab[lVar83 + lVar70 + lVar102];
                          local_a90 = local_a70._vptr_BaseFab
                                      [lVar83 + lVar70 + lVar102 + lVar78 * 2];
                          local_628 = (double)local_a70._vptr_BaseFab
                                              [lVar82 + lVar70 + lVar52 + lVar78 * 7] * dVar550;
                          local_788 = local_a70._vptr_BaseFab[lVar83 + lVar70 + lVar52 + lVar78 * 5]
                          ;
                          uStack_780 = 0;
                          p_Var4 = local_a70._vptr_BaseFab[lVar83 + lVar70 + lVar52 + lVar78 * 3];
                          p_Var5 = local_a70._vptr_BaseFab[lVar83 + lVar70 + lVar52 + lVar78 * 6];
                          local_658 = (double)local_a70._vptr_BaseFab
                                              [lVar82 + lVar58 + lVar76 + lVar78 * 7] * dVar331;
                          local_640 = (double)local_a70._vptr_BaseFab
                                              [lVar83 + lVar58 + lVar76 + lVar78] * dVar281;
                          local_648 = (double)local_a70._vptr_BaseFab
                                              [lVar83 + lVar58 + lVar76 + lVar78 * 5] * dVar331;
                          local_650 = (double)local_a70._vptr_BaseFab
                                              [lVar82 + lVar58 + lVar102 + lVar78 * 4] * dVar331;
                          local_630 = (double)local_a70._vptr_BaseFab
                                              [lVar83 + lVar58 + (long)local_868 + lVar78 * 5] *
                                      dVar281;
                          local_638 = (double)local_a70._vptr_BaseFab
                                              [lVar83 + lVar58 + lVar102 + lVar78] * dVar331;
                          local_768 = (double)local_a90 * dVar183 +
                                      (double)local_a70._vptr_BaseFab
                                              [lVar83 + lVar70 + lVar102 + lVar78] * dVar550 +
                                      (double)local_a88 * dVar331 +
                                      (double)local_a70._vptr_BaseFab
                                              [lVar83 + lVar70 + (long)local_868 + lVar78 * 7] *
                                      dVar469 + dVar120 * (double)local_758 +
                                                (double)local_a70._vptr_BaseFab
                                                        [lVar83 + lVar70 + (long)local_868 +
                                                                           lVar78 * 3] * dVar281 +
                                                dVar184 * (double)local_a70._vptr_BaseFab
                                                                  [lVar83 + lVar70 + (long)local_868
                                                                                     + lVar78 * 5] +
                                      (double)local_a70._vptr_BaseFab
                                              [lVar83 + lVar70 + lVar102 + lVar78 * 4];
                          local_4f8 = (double)p_Var4 * dVar331 + dVar550 * (double)local_788 +
                                      (double)p_Var5 * dVar183 +
                                      (double)local_a70._vptr_BaseFab
                                              [lVar83 + lVar70 + lVar52 + lVar78 * 7];
                          uStack_4f0 = 0;
                          lVar60 = (long)(iVar63 - local_a70.domain.smallend.vect[2]);
                          dVar229 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar58 + (long)local_868 + lVar78 * 7]);
                          uStack_b00 = 0;
                          local_428 = local_a70._vptr_BaseFab[lVar82 + lVar58 + lVar67 + lVar78 * 3]
                          ;
                          uStack_420 = 0;
                          local_3b8 = local_a70._vptr_BaseFab[lVar82 + lVar58 + lVar67 + lVar78 * 6]
                          ;
                          uStack_3b0 = 0;
                          local_398 = local_470[lVar58 + lVar67 + lVar78 * 6];
                          uStack_390 = 0;
                          local_378 = local_470[lVar58 + lVar67 + lVar78 * 7];
                          uStack_370 = 0;
                          local_3f8 = local_a70._vptr_BaseFab[lVar82 + lVar60 + lVar67 + lVar78 * 5]
                          ;
                          uStack_3f0 = 0;
                          local_348 = local_a70._vptr_BaseFab[lVar82 + lVar60 + lVar67 + lVar78 * 7]
                          ;
                          uStack_340 = 0;
                          local_3d8 = local_a70._vptr_BaseFab
                                      [lVar82 + lVar58 + (long)local_868 + lVar78 * 6];
                          uStack_3d0 = 0;
                          local_3a8 = local_470[lVar58 + (long)local_868 + lVar78 * 2];
                          uStack_3a0 = 0;
                          local_3c8 = local_470[lVar58 + (long)local_868 + lVar78 * 6];
                          uStack_3c0 = 0;
                          local_3e8 = local_470[lVar58 + (long)local_868 + lVar78 * 3];
                          uStack_3e0 = 0;
                          local_358 = local_470[lVar58 + (long)local_868 + lVar78];
                          uStack_350 = 0;
                          uStack_520 = 0;
                          local_408 = local_a70._vptr_BaseFab
                                      [lVar82 + lVar60 + (long)local_868 + lVar78 * 5];
                          uStack_400 = 0;
                          local_418 = local_a70._vptr_BaseFab
                                      [lVar82 + lVar60 + (long)local_868 + lVar78 * 3];
                          uStack_410 = 0;
                          p_Var6 = local_a70._vptr_BaseFab[lVar83 + lVar70 + lVar77 + lVar78 * 2];
                          local_438 = local_a78[lVar52 + lVar78 * 3];
                          uStack_430 = 0;
                          p_Var7 = local_a70._vptr_BaseFab[lVar82 + lVar58 + lVar102 + lVar78];
                          local_998 = 0.5;
                          if ((double)p_Var2 != 0.0 || (double)p_Var3 != 0.0) {
                            local_998 = ABS((double)p_Var3) / dVar334;
                          }
                          auVar671._0_8_ =
                               (ulong)local_a70._vptr_BaseFab[lVar83 + lVar57 + lVar77 + lVar78 * 2]
                               & 0x7fffffffffffffff;
                          auVar671._8_8_ =
                               (ulong)local_a70._vptr_BaseFab[lVar92 + lVar57 + lVar77 + lVar78 * 2]
                               & 0x7fffffffffffffff;
                          local_798 = ABS((double)local_a70._vptr_BaseFab
                                                  [lVar83 + lVar57 + lVar52 + lVar78 * 6]);
                          dStack_790 = ABS((double)local_a70._vptr_BaseFab
                                                   [lVar92 + lVar57 + lVar52 + lVar78 * 6]);
                          dVar429 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar83 + lVar57 + lVar77 + lVar78 * 6]);
                          dVar332 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar92 + lVar57 + lVar77 + lVar78 * 6]);
                          auVar367._0_8_ = local_798 + dVar429 + 1e-100;
                          auVar367._8_8_ = dStack_790 + dVar332 + 1e-100;
                          auVar343 = divpd(auVar671,auVar367);
                          dVar334 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar83 + lVar57 + lVar52 + lVar78 * 3]) /
                                    (dStack_790 + local_798 + 1e-100);
                          dVar339 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar83 + lVar57 + lVar77 + lVar78 * 3]) /
                                    (dVar332 + dVar429 + 1e-100);
                          dVar473 = auVar343._0_8_ + 1.0;
                          dVar335 = auVar343._8_8_ + 1.0;
                          local_798 = (dVar334 + dVar473) * local_798;
                          dStack_790 = (dVar334 + dVar335) * dStack_790;
                          local_798 = local_798 /
                                      ((dVar339 + dVar335) * dVar332 + dStack_790 + local_798 +
                                       (dVar339 + dVar473) * dVar429 + 1e-100);
                          auVar456._0_8_ =
                               (ulong)local_a70._vptr_BaseFab[lVar89 + lVar70 + lVar77 + lVar78] &
                               0x7fffffffffffffff;
                          auVar456._8_8_ =
                               (ulong)local_a70._vptr_BaseFab[lVar89 + lVar93 + lVar77 + lVar78] &
                               0x7fffffffffffffff;
                          dVar515 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar89 + lVar70 + lVar52 + lVar78 * 5]);
                          dVar335 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar89 + lVar93 + lVar52 + lVar78 * 5]);
                          dVar387 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar89 + lVar70 + lVar77 + lVar78 * 5]);
                          dVar337 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar89 + lVar93 + lVar77 + lVar78 * 5]);
                          auVar368._0_8_ = dVar515 + dVar387 + 1e-100;
                          auVar368._8_8_ = dVar335 + dVar337 + 1e-100;
                          auVar343 = divpd(auVar456,auVar368);
                          dVar334 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar89 + lVar70 + lVar52 + lVar78 * 3]) /
                                    (dVar335 + dVar515 + 1e-100);
                          dVar471 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar89 + lVar70 + lVar77 + lVar78 * 3]) /
                                    (dVar337 + dVar387 + 1e-100);
                          dVar431 = auVar343._0_8_ + 1.0;
                          dVar466 = auVar343._8_8_ + 1.0;
                          dVar515 = (dVar334 + dVar431) * dVar515;
                          dVar335 = (dVar334 + dVar466) * dVar335;
                          dVar334 = ABS((double)local_438) /
                                    (ABS((double)local_a78[lVar77 + lVar78 * 3]) +
                                    ABS((double)local_438));
                          uVar107 = -(ulong)((double)local_a78[lVar77 + lVar78 * 3] == 0.0);
                          dVar336 = (double)((uVar107 & 0x3fe0000000000000 |
                                             ~uVar107 & (ulong)dVar334) &
                                             -(ulong)((double)local_438 == 0.0) |
                                            ~-(ulong)((double)local_438 == 0.0) & (ulong)dVar334);
                          local_a98 = (double)local_a70._vptr_BaseFab
                                              [lVar82 + lVar70 + lVar52 + lVar78 * 6] * dVar331 +
                                      local_628;
                          dVar388 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar58 + (long)local_868 + lVar78 * 3]);
                          dVar388 = dVar388 / (ABS((double)local_428) + dVar388);
                          uVar107 = -(ulong)((double)local_a70._vptr_BaseFab
                                                     [lVar82 + lVar58 + (long)local_868 + lVar78 * 3
                                                     ] == 0.0);
                          dVar427 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar58 + lVar67 + lVar78 * 5]);
                          dVar386 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar58 + (long)local_868 + lVar78 * 5]);
                          dVar512 = ABS((double)local_3f8);
                          dVar514 = ABS((double)local_408);
                          dVar467 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar60 + lVar67 + lVar78 * 3]) /
                                    (dVar427 + dVar512 + 1e-100);
                          dVar432 = ABS((double)local_418) / (dVar386 + dVar514 + 1e-100);
                          dVar554 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar58 + (long)local_868 + lVar78]) /
                                    (dVar427 + dVar386 + 1e-100) + 1.0;
                          dVar615 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar60 + (long)local_868 + lVar78]) /
                                    (dVar512 + dVar514 + 1e-100) + 1.0;
                          dVar555 = (dVar554 + dVar432) * dVar386;
                          dVar470 = ABS((double)local_3b8);
                          dVar339 = ABS((double)local_3d8);
                          dVar433 = ABS((double)local_398);
                          dVar513 = ABS((double)local_3c8);
                          dVar334 = ABS((double)local_470[lVar58 + lVar67 + lVar78 * 3]) /
                                    (dVar470 + dVar433 + 1e-100);
                          dVar552 = ABS((double)local_3e8) / (dVar339 + dVar513 + 1e-100);
                          dVar332 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar58 + (long)local_868 + lVar78 * 2]) /
                                    (dVar470 + dVar339 + 1e-100) + 1.0;
                          dVar472 = ABS((double)local_3a8) / (dVar433 + dVar513 + 1e-100) + 1.0;
                          dVar339 = (dVar332 + dVar552) * dVar339;
                          dVar338 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar58 + lVar67 + lVar78 * 7]);
                          dVar430 = ABS((double)local_470[lVar58 + (long)local_868 + lVar78 * 7]);
                          dVar553 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar60 + (long)local_868 + lVar78 * 7]) +
                                    dVar229;
                          iVar65 = (int)lVar104 + uVar64;
                          dVar473 = ABS((double)p_Var7);
                          local_1458 = dVar473 / (ABS((double)local_a70._vptr_BaseFab
                                                              [lVar82 + lVar60 + lVar102 + lVar78])
                                                 + dVar473);
                          local_538 = ABS((double)local_a70._vptr_BaseFab
                                                  [lVar83 + lVar70 + lVar77 + lVar78]);
                          dVar429 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar83 + lVar93 + lVar52 + lVar78 * 7]);
                          dVar387 = (dVar471 + dVar466) * dVar337 + dVar335 + dVar515 +
                                    (dVar471 + dVar431) * dVar387 + 1e-100;
                          dVar515 = dVar515 / dVar387;
                          uStack_530 = 0;
                          if (((double)p_Var7 == 0.0) && (!NAN((double)p_Var7))) {
                            uVar333 = -(ulong)((double)local_a70._vptr_BaseFab
                                                       [lVar82 + lVar60 + lVar102 + lVar78] == 0.0);
                            local_1458 = (double)(uVar333 & 0x3fe0000000000000 |
                                                 ~uVar333 & (ulong)local_1458);
                          }
                          dVar337 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar58 + lVar102 + lVar78 * 2]);
                          local_528 = local_470 + lVar58 + lVar102;
                          dVar337 = dVar337 / (ABS((double)local_528[lVar78 * 2]) + dVar337);
                          uVar333 = -(ulong)((double)local_528[lVar78 * 2] == 0.0);
                          uVar111 = -(ulong)((double)local_a70._vptr_BaseFab
                                                     [lVar82 + lVar58 + lVar102 + lVar78 * 2] == 0.0
                                            );
                          local_548 = (double)((uVar333 & 0x3fe0000000000000 |
                                               ~uVar333 & (ulong)dVar337) & uVar111 |
                                              ~uVar111 & (ulong)dVar337);
                          uStack_540 = 0;
                          auVar145._0_8_ =
                               (ulong)local_470[lVar60 + lVar102 + lVar78] & 0x7fffffffffffffff;
                          auVar145._8_8_ = (ulong)local_528[lVar78] & 0x7fffffffffffffff;
                          dVar466 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar60 + lVar102 + lVar78 * 4]);
                          dVar580 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar58 + lVar102 + lVar78 * 4]);
                          dVar431 = ABS((double)local_470[lVar60 + lVar102 + lVar78 * 4]);
                          dVar471 = ABS((double)local_528[lVar78 * 4]);
                          auVar309._0_8_ = dVar466 + dVar431 + 1e-100;
                          auVar309._8_8_ = dVar580 + dVar471 + 1e-100;
                          auVar343 = divpd(auVar145,auVar309);
                          local_7c8._8_4_ = SUB84(dVar580,0);
                          local_7c8._0_8_ = dVar580;
                          local_7c8._12_4_ = (int)((ulong)dVar580 >> 0x20);
                          dVar556 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar60 + lVar102 + lVar78 * 2]) /
                                    (dVar580 + dVar466 + 1e-100);
                          local_7b8._8_4_ = SUB84(dVar471,0);
                          local_7b8._0_8_ = dVar471;
                          local_7b8._12_4_ = (int)((ulong)dVar471 >> 0x20);
                          dVar579 = ABS((double)local_470[lVar60 + lVar102 + lVar78 * 2]) /
                                    (dVar471 + dVar431 + 1e-100);
                          dVar337 = auVar343._0_8_ + 1.0;
                          dStack_550 = auVar343._8_8_ + 1.0;
                          local_558 = (dStack_550 + dVar556) * dVar580;
                          local_558 = local_558 /
                                      ((dVar579 + dStack_550) * dVar471 +
                                       (dVar556 + dVar337) * dVar466 + local_558 +
                                       (dVar579 + dVar337) * dVar431 + 1e-100);
                          dVar337 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar58 + lVar102 + lVar78 * 3]);
                          dVar337 = dVar337 / (ABS((double)local_a70._vptr_BaseFab
                                                           [lVar82 + lVar58 + lVar77 + lVar78 * 3])
                                              + dVar337);
                          uVar333 = -(ulong)((double)local_a70._vptr_BaseFab
                                                     [lVar82 + lVar58 + lVar77 + lVar78 * 3] == 0.0)
                          ;
                          uVar111 = -(ulong)((double)local_a70._vptr_BaseFab
                                                     [lVar82 + lVar58 + lVar102 + lVar78 * 3] == 0.0
                                            );
                          local_568 = (double)((uVar333 & 0x3fe0000000000000 |
                                               ~uVar333 & (ulong)dVar337) & uVar111 |
                                              ~uVar111 & (ulong)dVar337);
                          uStack_560 = 0;
                          auVar310._0_8_ =
                               (ulong)local_a70._vptr_BaseFab[lVar82 + lVar60 + lVar77 + lVar78] &
                               0x7fffffffffffffff;
                          auVar310._8_8_ =
                               (ulong)local_a70._vptr_BaseFab[lVar82 + lVar58 + lVar77 + lVar78] &
                               0x7fffffffffffffff;
                          local_518 = ABS((double)local_a70._vptr_BaseFab
                                                  [lVar82 + lVar60 + lVar102 + lVar78 * 5]);
                          dStack_510 = ABS((double)local_a70._vptr_BaseFab
                                                   [lVar82 + lVar58 + lVar102 + lVar78 * 5]);
                          dVar556 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar60 + lVar77 + lVar78 * 5]);
                          dVar583 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar58 + lVar77 + lVar78 * 5]);
                          auVar146._0_8_ = local_518 + dVar556 + 1e-100;
                          auVar146._8_8_ = dStack_510 + dVar583 + 1e-100;
                          auVar343 = divpd(auVar310,auVar146);
                          dVar337 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar60 + lVar102 + lVar78 * 3]) /
                                    (dStack_510 + local_518 + 1e-100);
                          dVar431 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar60 + lVar77 + lVar78 * 3]) /
                                    (dVar583 + dVar556 + 1e-100);
                          dVar466 = auVar343._0_8_ + 1.0;
                          dVar582 = auVar343._8_8_ + 1.0;
                          dStack_570 = (dVar337 + dVar582) * dStack_510;
                          local_578 = dStack_570 /
                                      ((dVar431 + dVar582) * dVar583 +
                                       (dVar337 + dVar466) * local_518 + dStack_570 +
                                       (dVar431 + dVar466) * dVar556 + 1e-100);
                          auVar147._0_8_ =
                               (ulong)local_470[lVar58 + lVar77 + lVar78 * 2] & 0x7fffffffffffffff;
                          auVar147._8_8_ =
                               (ulong)local_a70._vptr_BaseFab[lVar82 + lVar58 + lVar77 + lVar78 * 2]
                               & 0x7fffffffffffffff;
                          dVar579 = ABS((double)local_528[lVar78 * 6]);
                          dStack_7a0 = ABS((double)local_a70._vptr_BaseFab
                                                   [lVar82 + lVar58 + lVar102 + lVar78 * 6]);
                          dVar466 = ABS((double)local_470[lVar58 + lVar77 + lVar78 * 6]);
                          dVar556 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar58 + lVar77 + lVar78 * 6]);
                          auVar311._0_8_ = dVar579 + dVar466 + 1e-100;
                          auVar311._8_8_ = dStack_7a0 + dVar556 + 1e-100;
                          auVar343 = divpd(auVar147,auVar311);
                          dVar581 = ABS((double)local_528[lVar78 * 3]) /
                                    (dStack_7a0 + dVar579 + 1e-100);
                          dVar641 = ABS((double)local_470[lVar58 + lVar77 + lVar78 * 3]) /
                                    (dVar556 + dVar466 + 1e-100);
                          dVar337 = auVar343._0_8_ + 1.0;
                          dVar431 = auVar343._8_8_ + 1.0;
                          dStack_7a0 = (dVar581 + dVar431) * dStack_7a0;
                          local_7a8 = dStack_7a0 /
                                      ((dVar641 + dVar431) * dVar556 +
                                       (dVar581 + dVar337) * dVar579 + dStack_7a0 +
                                       (dVar641 + dVar337) * dVar466 + 1e-100);
                          dVar466 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar92 + lVar58 + lVar53 + lVar78 * 6]);
                          dVar431 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar92 + lVar58 + lVar76 + lVar78 * 6]);
                          dVar556 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar83 + lVar58 + lVar53 + lVar78 * 6]);
                          dVar579 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar83 + lVar58 + lVar76 + lVar78 * 6]);
                          dVar641 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar83 + lVar58 + lVar53 + lVar78 * 3]) /
                                    (dVar466 + dVar556 + 1e-100);
                          dVar611 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar83 + lVar58 + lVar76 + lVar78 * 3]) /
                                    (dVar431 + dVar579 + 1e-100);
                          dVar337 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar92 + lVar58 + lVar76 + lVar78 * 2]) /
                                    (dVar466 + dVar431 + 1e-100) + 1.0;
                          dVar581 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar83 + lVar58 + lVar76 + lVar78 * 2]) /
                                    (dVar556 + dVar579 + 1e-100) + 1.0;
                          dVar579 = (dVar581 + dVar611) * dVar579;
                          dVar579 = dVar579 / ((dVar337 + dVar611) * dVar431 +
                                               (dVar641 + dVar581) * dVar556 +
                                               (dVar337 + dVar641) * dVar466 + dVar579 + 1e-100);
                          dVar337 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar89 + lVar58 + lVar76 + lVar78 * 3]);
                          dVar337 = dVar337 / (ABS((double)local_a70._vptr_BaseFab
                                                           [lVar89 + lVar58 + lVar53 + lVar78 * 3])
                                              + dVar337);
                          uVar333 = -(ulong)((double)local_a70._vptr_BaseFab
                                                     [lVar89 + lVar58 + lVar76 + lVar78 * 3] == 0.0)
                          ;
                          uVar111 = -(ulong)((double)local_a70._vptr_BaseFab
                                                     [lVar89 + lVar58 + lVar53 + lVar78 * 3] == 0.0)
                          ;
                          dVar337 = (double)((uVar333 & 0x3fe0000000000000 |
                                             ~uVar333 & (ulong)dVar337) & uVar111 |
                                            ~uVar111 & (ulong)dVar337);
                          dVar431 = (double)local_a70._vptr_BaseFab
                                            [lVar83 + lVar70 + lVar76 + lVar78 * 8] * dVar124 *
                                    (dVar385 +
                                    ABS((double)local_a70._vptr_BaseFab
                                                [lVar83 + lVar93 + lVar76 + lVar78 * 5]) /
                                    (dVar384 + dVar124 + 1e-100) +
                                    ABS((double)local_a70._vptr_BaseFab
                                                [lVar83 + lVar93 + lVar76 + lVar78 * 4]) /
                                    (dVar123 + dVar124 + 1e-100) +
                                    dVar578 + local_338 +
                                              ABS((double)local_a70._vptr_BaseFab
                                                          [lVar83 + lVar93 + lVar76 + lVar78]) /
                                              (ABS((double)local_a70._vptr_BaseFab
                                                           [lVar92 + lVar93 + lVar53 + lVar78 * 7])
                                               + dVar123 + dVar384 + dVar124 + 1e-100) + 1.0);
                          dVar121 = dVar121 / local_4e8;
                          dVar123 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar83 + lVar58 + lVar102 + lVar78 * 2]);
                          dVar123 = dVar123 / (ABS((double)local_de8[lVar78 * 2]) + dVar123);
                          uVar333 = -(ulong)((double)local_a70._vptr_BaseFab
                                                     [lVar83 + lVar58 + lVar102 + lVar78 * 2] == 0.0
                                            );
                          uVar111 = -(ulong)((double)local_de8[lVar78 * 2] == 0.0);
                          dVar123 = (double)((uVar333 & 0x3fe0000000000000 |
                                             ~uVar333 & (ulong)dVar123) & uVar111 |
                                            ~uVar111 & (ulong)dVar123);
                          dVar122 = dVar122 / local_778;
                          auVar148._0_8_ =
                               (ulong)local_a70._vptr_BaseFab[lVar83 + lVar58 + lVar77 + lVar78 * 2]
                               & 0x7fffffffffffffff;
                          auVar148._8_8_ =
                               (ulong)local_a70._vptr_BaseFab[lVar92 + lVar58 + lVar77 + lVar78 * 2]
                               & 0x7fffffffffffffff;
                          dVar556 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar83 + lVar58 + lVar52 + lVar78 * 6]);
                          dVar385 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar92 + lVar58 + lVar52 + lVar78 * 6]);
                          dVar466 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar83 + lVar58 + lVar77 + lVar78 * 6]);
                          dVar581 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar92 + lVar58 + lVar77 + lVar78 * 6]);
                          auVar457._0_8_ = dVar556 + dVar466 + 1e-100;
                          auVar457._8_8_ = dVar385 + dVar581 + 1e-100;
                          auVar343 = divpd(auVar148,auVar457);
                          dVar578 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar83 + lVar58 + lVar52 + lVar78 * 3]) /
                                    (dVar385 + dVar556 + 1e-100);
                          dVar641 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar83 + lVar58 + lVar77 + lVar78 * 3]) /
                                    (dVar581 + dVar466 + 1e-100);
                          dVar124 = auVar343._0_8_ + 1.0;
                          dVar384 = auVar343._8_8_ + 1.0;
                          dVar556 = (dVar578 + dVar124) * dVar556;
                          dVar556 = dVar556 / ((dVar641 + dVar384) * dVar581 +
                                               (dVar384 + dVar578) * dVar385 + dVar556 +
                                               (dVar641 + dVar124) * dVar466 + 1e-100);
                          dVar466 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar83 + lVar70 + lVar52 + lVar78 * 7]);
                          dVar578 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar83 + lVar70 + lVar77 + lVar78 * 7]);
                          auVar149._8_4_ = SUB84(dVar466,0);
                          auVar149._0_8_ = dVar466;
                          auVar149._12_4_ = (int)((ulong)dVar466 >> 0x20);
                          dVar384 = dVar466 + ABS((double)local_a70._vptr_BaseFab
                                                          [lVar92 + lVar70 + lVar52 + lVar78 * 7]);
                          auVar205._0_8_ = ABS((double)local_788);
                          auVar205._8_8_ =
                               ABS((double)local_a70._vptr_BaseFab
                                           [lVar83 + lVar70 + lVar77 + lVar78 * 4]);
                          auVar150._0_8_ = dVar384 + 1e-100;
                          auVar150._8_8_ = auVar149._8_8_ + dVar578 + 1e-100;
                          auVar343 = divpd(auVar205,auVar150);
                          auVar569._8_4_ = SUB84(dVar429,0);
                          auVar569._0_8_ = dVar429;
                          auVar569._12_4_ = (int)((ulong)dVar429 >> 0x20);
                          dVar124 = auVar569._8_8_ +
                                    ABS((double)local_a70._vptr_BaseFab
                                                [lVar92 + lVar93 + lVar52 + lVar78 * 7]);
                          auVar369._0_8_ = ABS((double)p_Var5);
                          auVar369._8_8_ =
                               ABS((double)local_a70._vptr_BaseFab
                                           [lVar83 + lVar93 + lVar52 + lVar78 * 5]);
                          auVar151._0_8_ = dVar429 + dVar466 + 1e-100;
                          auVar151._8_8_ = dVar124 + 1e-100;
                          auVar341 = divpd(auVar369,auVar151);
                          dVar385 = ABS((double)local_14b8[lVar78 * 7]);
                          auVar533._0_8_ = ABS((double)p_Var6);
                          auVar533._8_8_ = ABS((double)local_14b8[lVar78]);
                          auVar312._0_8_ = dVar578 + dVar429 + dVar466 + dVar385 + 1e-100;
                          auVar312._8_8_ =
                               dVar385 + dVar124 + ABS((double)local_a70._vptr_BaseFab
                                                               [lVar92 + lVar93 + lVar77 + lVar78 * 
                                                  7]) + 1e-100;
                          auVar186 = divpd(auVar533,auVar312);
                          dVar124 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar89 + lVar58 + lVar52 + lVar78 * 3]);
                          dVar124 = dVar124 / (ABS((double)local_a70._vptr_BaseFab
                                                           [lVar89 + lVar58 + lVar77 + lVar78 * 3])
                                              + dVar124);
                          uVar333 = -(ulong)((double)local_a70._vptr_BaseFab
                                                     [lVar89 + lVar58 + lVar77 + lVar78 * 3] == 0.0)
                          ;
                          uVar111 = -(ulong)((double)local_a70._vptr_BaseFab
                                                     [lVar89 + lVar58 + lVar52 + lVar78 * 3] == 0.0)
                          ;
                          dVar124 = (double)((uVar333 & 0x3fe0000000000000 |
                                             ~uVar333 & (ulong)dVar124) & uVar111 |
                                            ~uVar111 & (ulong)dVar124);
                          auVar672._0_8_ = ABS((double)local_14b8[lVar78 * 4]);
                          auVar672._8_8_ = ABS((double)p_Var4);
                          auVar152._0_8_ = dVar385 + dVar429 + 1e-100;
                          auVar152._8_8_ =
                               ABS((double)local_a70._vptr_BaseFab
                                           [lVar92 + lVar93 + lVar52 + lVar78 * 7]) +
                               ABS((double)local_a70._vptr_BaseFab
                                           [lVar92 + lVar70 + lVar52 + lVar78 * 7]) + dVar429 +
                               dVar466 + 1e-100;
                          auVar230 = divpd(auVar672,auVar152);
                          dVar611 = (local_538 /
                                     (dVar578 + ABS((double)local_a70._vptr_BaseFab
                                                            [lVar92 + lVar70 + lVar77 + lVar78 * 7])
                                                + dVar384 + 1e-100) + 1.0 + auVar186._0_8_ +
                                     auVar230._8_8_ + auVar343._8_8_ + auVar343._0_8_ +
                                    auVar341._0_8_) *
                                    dVar466 * (double)local_a70._vptr_BaseFab
                                                      [lVar83 + lVar70 + lVar77 + lVar78 * 8];
                          local_d08._8_8_ = auVar186._8_8_;
                          dStack_b50 = auVar341._8_8_;
                          dVar684 = dVar429 * (double)local_a70._vptr_BaseFab
                                                      [lVar83 + lVar70 + lVar77 + lVar78 * 8] *
                                    (dStack_b50 +
                                     (double)local_d08._8_8_ + 1.0 + auVar186._0_8_ + auVar230._8_8_
                                     + auVar230._0_8_ + auVar341._0_8_);
                          dVar335 = dVar335 / dVar387;
                          lVar104 = (long)iVar65;
                          dVar616 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar104 + lVar67 + lVar78 * 5]);
                          dVar385 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar104 + (long)local_868 + lVar78 * 5]);
                          dVar645 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar104 + lVar67 + lVar78 * 3]) /
                                    (dVar427 + dVar616 + 1e-100);
                          dVar663 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar104 + (long)local_868 + lVar78 * 3]) /
                                    (dVar386 + dVar385 + 1e-100);
                          dVar387 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar104 + (long)local_868 + lVar78]) /
                                    (dVar616 + dVar385 + 1e-100) + 1.0;
                          dVar385 = (dVar387 + dVar663) * dVar385;
                          dVar680 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar57 + (long)local_868 + lVar78 * 3]);
                          dVar680 = dVar680 / (ABS((double)local_a70._vptr_BaseFab
                                                           [lVar82 + lVar57 + lVar67 + lVar78 * 3])
                                              + dVar680);
                          uVar333 = -(ulong)((double)local_a70._vptr_BaseFab
                                                     [lVar82 + lVar57 + (long)local_868 + lVar78 * 3
                                                     ] == 0.0);
                          uVar111 = -(ulong)((double)local_a70._vptr_BaseFab
                                                     [lVar82 + lVar57 + lVar67 + lVar78 * 3] == 0.0)
                          ;
                          dVar466 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar104 + lVar67 + lVar78 * 7]);
                          dVar581 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar104 + (long)local_868 + lVar78 * 7]);
                          dVar617 = ABS((double)local_470[lVar104 + (long)local_868 + lVar78 * 7]);
                          dVar662 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar57 + lVar67 + lVar78 * 6]);
                          dVar429 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar57 + (long)local_868 + lVar78 * 6]);
                          dVar695 = ABS((double)local_470[lVar57 + lVar67 + lVar78 * 6]);
                          dVar685 = ABS((double)local_470[lVar57 + (long)local_868 + lVar78 * 6]);
                          dVar683 = ABS((double)local_470[lVar57 + lVar67 + lVar78 * 3]) /
                                    (dVar662 + dVar695 + 1e-100);
                          dVar697 = ABS((double)local_470[lVar57 + (long)local_868 + lVar78 * 3]) /
                                    (dVar429 + dVar685 + 1e-100);
                          dVar642 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar57 + (long)local_868 + lVar78 * 2]) /
                                    (dVar662 + dVar429 + 1e-100) + 1.0;
                          dVar641 = ABS((double)local_470[lVar57 + (long)local_868 + lVar78 * 2]) /
                                    (dVar695 + dVar685 + 1e-100) + 1.0;
                          dVar429 = (dVar642 + dVar697) * dVar429;
                          dVar578 = ABS((double)local_528[lVar78 * 7]);
                          dVar384 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar104 + lVar102 + lVar78]);
                          dVar384 = dVar384 / (dVar473 + dVar384);
                          auVar420._0_8_ =
                               (ulong)local_a70._vptr_BaseFab
                                      [lVar82 + lVar60 + lVar102 + lVar78 * 6] & 0x7fffffffffffffff;
                          auVar420._8_8_ = (ulong)local_528[lVar78 * 5] & 0x7fffffffffffffff;
                          if (((double)p_Var7 == 0.0) && (!NAN((double)p_Var7))) {
                            uVar112 = -(ulong)((double)local_a70._vptr_BaseFab
                                                       [lVar82 + lVar104 + lVar102 + lVar78] == 0.0)
                            ;
                            dVar384 = (double)(uVar112 & 0x3fe0000000000000 |
                                              ~uVar112 & (ulong)dVar384);
                          }
                          dVar612 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar104 + lVar102 + lVar78 * 4]);
                          dVar647 = ABS((double)local_470[lVar104 + lVar102 + lVar78 * 4]);
                          dVar585 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar104 + lVar102 + lVar78 * 2]) /
                                    (dVar580 + dVar612 + 1e-100);
                          dVar586 = ABS((double)local_470[lVar104 + lVar102 + lVar78 * 2]) /
                                    (dVar471 + dVar647 + 1e-100);
                          dVar681 = ABS((double)local_470[lVar104 + lVar102 + lVar78]) /
                                    (dVar612 + dVar647 + 1e-100) + 1.0;
                          dVar612 = (dVar585 + dVar681) * dVar612;
                          dVar560 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar57 + lVar102 + lVar78 * 2]);
                          dVar560 = dVar560 / (ABS((double)local_470[lVar57 + lVar102 + lVar78 * 2])
                                              + dVar560);
                          uVar112 = -(ulong)((double)local_470[lVar57 + lVar102 + lVar78 * 2] == 0.0
                                            );
                          uVar113 = -(ulong)((double)local_a70._vptr_BaseFab
                                                     [lVar82 + lVar57 + lVar102 + lVar78 * 2] == 0.0
                                            );
                          dVar682 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar104 + lVar77 + lVar78 * 5]);
                          dVar561 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar104 + lVar102 + lVar78 * 5]);
                          auVar598._0_8_ =
                               (ulong)local_a70._vptr_BaseFab
                                      [lVar82 + lVar104 + lVar77 + lVar78 * 3] & 0x7fffffffffffffff;
                          auVar598._8_8_ =
                               (ulong)local_a70._vptr_BaseFab
                                      [lVar82 + lVar104 + lVar102 + lVar78 * 3] & 0x7fffffffffffffff
                          ;
                          auVar503._0_8_ = dVar583 + dVar682 + 1e-100;
                          auVar503._8_8_ = dStack_510 + dVar561 + 1e-100;
                          auVar290 = divpd(auVar598,auVar503);
                          dVar660 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar104 + lVar77 + lVar78]) /
                                    (dVar561 + dVar682 + 1e-100) + 1.0;
                          dVar561 = (auVar290._8_8_ + dVar660) * dVar561;
                          dVar557 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar57 + lVar102 + lVar78 * 3]);
                          dVar557 = dVar557 / (ABS((double)local_a70._vptr_BaseFab
                                                           [lVar82 + lVar57 + lVar77 + lVar78 * 3])
                                              + dVar557);
                          uVar114 = -(ulong)((double)local_a70._vptr_BaseFab
                                                     [lVar82 + lVar57 + lVar77 + lVar78 * 3] == 0.0)
                          ;
                          uVar115 = -(ulong)((double)local_a70._vptr_BaseFab
                                                     [lVar82 + lVar57 + lVar102 + lVar78 * 3] == 0.0
                                            );
                          dVar473 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar58 + lVar102 + lVar78 * 7]);
                          auVar599._8_4_ = SUB84(dVar473,0);
                          auVar599._0_8_ = dVar473;
                          auVar599._12_4_ = (int)((ulong)dVar473 >> 0x20);
                          dVar549 = dVar473 + ABS((double)local_a70._vptr_BaseFab
                                                          [lVar82 + lVar60 + lVar102 + lVar78 * 7]);
                          dVar558 = auVar599._8_8_ + dVar578;
                          dVar548 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar58 + lVar77 + lVar78 * 7]);
                          auVar570._0_8_ =
                               (ulong)local_a70._vptr_BaseFab[lVar82 + lVar60 + lVar77 + lVar78 * 2]
                               & 0x7fffffffffffffff;
                          auVar570._8_8_ =
                               (ulong)local_470[lVar58 + lVar77 + lVar78] & 0x7fffffffffffffff;
                          auVar153._8_4_ = SUB84(dVar548,0);
                          auVar153._0_8_ = dVar548;
                          auVar153._12_4_ = (int)((ulong)dVar548 >> 0x20);
                          auVar154._0_8_ =
                               dVar548 + dVar549 +
                               ABS((double)local_a70._vptr_BaseFab
                                           [lVar82 + lVar60 + lVar77 + lVar78 * 7]) + 1e-100;
                          auVar154._8_8_ =
                               auVar153._8_8_ + dVar558 +
                               ABS((double)local_470[lVar58 + lVar77 + lVar78 * 7]) + 1e-100;
                          auVar285 = divpd(auVar570,auVar154);
                          auVar504._0_8_ =
                               (ulong)local_a70._vptr_BaseFab[lVar82 + lVar58 + lVar77 + lVar78 * 4]
                               & 0x7fffffffffffffff;
                          auVar504._8_8_ =
                               (ulong)local_470[lVar60 + lVar102 + lVar78 * 3] & 0x7fffffffffffffff;
                          auVar634._0_8_ = dVar473 + dVar548 + 1e-100;
                          auVar634._8_8_ =
                               dVar578 + dVar549 +
                               ABS((double)local_470[lVar60 + lVar102 + lVar78 * 7]) + 1e-100;
                          auVar186 = divpd(auVar504,auVar634);
                          auVar600._0_8_ = dVar549 + 1e-100;
                          auVar600._8_8_ = dVar558 + 1e-100;
                          auVar341 = divpd(auVar420,auVar600);
                          dVar587 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar104 + lVar102 + lVar78 * 7]);
                          auVar673._8_4_ = SUB84(dVar587,0);
                          auVar673._0_8_ = dVar587;
                          auVar673._12_4_ = (int)((ulong)dVar587 >> 0x20);
                          dVar558 = dVar587 + dVar473;
                          dVar584 = auVar673._8_8_ +
                                    ABS((double)local_470[lVar104 + lVar102 + lVar78 * 7]);
                          dVar549 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar104 + lVar77 + lVar78 * 7]);
                          auVar635._0_8_ =
                               (ulong)local_a70._vptr_BaseFab
                                      [lVar82 + lVar104 + lVar77 + lVar78 * 2] & 0x7fffffffffffffff;
                          auVar635._8_8_ =
                               (ulong)local_470[lVar104 + lVar77 + lVar78] & 0x7fffffffffffffff;
                          auVar458._0_8_ = dVar548 + dVar558 + dVar549 + 1e-100;
                          auVar458._8_8_ =
                               dVar549 + dVar584 +
                               ABS((double)local_470[lVar104 + lVar77 + lVar78 * 7]) + 1e-100;
                          auVar354 = divpd(auVar635,auVar458);
                          auVar534._0_8_ =
                               (ulong)local_a70._vptr_BaseFab
                                      [lVar82 + lVar104 + lVar77 + lVar78 * 4] & 0x7fffffffffffffff;
                          auVar534._8_8_ =
                               (ulong)local_470[lVar104 + lVar102 + lVar78 * 3] & 0x7fffffffffffffff
                          ;
                          auVar601._0_8_ = dVar549 + dVar587 + 1e-100;
                          auVar601._8_8_ =
                               dVar578 + dVar558 +
                               ABS((double)local_470[lVar104 + lVar102 + lVar78 * 7]) + 1e-100;
                          auVar230 = divpd(auVar534,auVar601);
                          auVar571._0_8_ =
                               (ulong)local_a70._vptr_BaseFab
                                      [lVar82 + lVar104 + lVar102 + lVar78 * 6] & 0x7fffffffffffffff
                          ;
                          auVar571._8_8_ =
                               (ulong)local_470[lVar104 + lVar102 + lVar78 * 5] & 0x7fffffffffffffff
                          ;
                          auVar674._0_8_ = dVar558 + 1e-100;
                          auVar674._8_8_ = dVar584 + 1e-100;
                          auVar287 = divpd(auVar571,auVar674);
                          auVar265._0_8_ =
                               (ulong)local_470[lVar57 + lVar77 + lVar78 * 2] & 0x7fffffffffffffff;
                          auVar265._8_8_ =
                               (ulong)local_a70._vptr_BaseFab[lVar82 + lVar57 + lVar77 + lVar78 * 2]
                               & 0x7fffffffffffffff;
                          dVar559 = ABS((double)local_470[lVar57 + lVar102 + lVar78 * 6]);
                          dVar584 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar57 + lVar102 + lVar78 * 6]);
                          dVar646 = ABS((double)local_470[lVar57 + lVar77 + lVar78 * 6]);
                          dVar664 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar57 + lVar77 + lVar78 * 6]);
                          auVar313._0_8_ = dVar559 + dVar646 + 1e-100;
                          auVar313._8_8_ = dVar584 + dVar664 + 1e-100;
                          auVar343 = divpd(auVar265,auVar313);
                          dVar558 = ABS((double)local_470[lVar57 + lVar102 + lVar78 * 3]) /
                                    (dVar584 + dVar559 + 1e-100);
                          dVar578 = ABS((double)local_470[lVar57 + lVar77 + lVar78 * 3]) /
                                    (dVar664 + dVar646 + 1e-100);
                          dVar548 = auVar343._0_8_ + 1.0;
                          dVar549 = auVar343._8_8_ + 1.0;
                          dVar584 = (dVar558 + dVar549) * dVar584;
                          *(double *)(local_258 + (long)local_cb8 * 8) =
                               (((dVar584 /
                                 ((dVar578 + dVar549) * dVar664 +
                                  (dVar558 + dVar548) * dVar559 + dVar584 +
                                  (dVar578 + dVar548) * dVar646 + 1e-100)) *
                                 (dVar335 * (double)local_a70._vptr_BaseFab
                                                    [lVar83 + lVar104 + lVar77 + lVar78 * 4] +
                                 dVar684 * (double)local_a70._vptr_BaseFab
                                                   [lVar83 + lVar104 + lVar77 + lVar78] +
                                 dVar122 * (double)local_a70._vptr_BaseFab
                                                   [lVar83 + lVar104 + lVar52 + lVar78 * 5] +
                                 local_998 *
                                 (double)local_a70._vptr_BaseFab
                                         [lVar83 + lVar104 + lVar52 + lVar78 * 7]) +
                                (double)local_470[lVar104 + lVar77 + lVar78 * 8] * dVar587 *
                                (auVar287._8_8_ +
                                 auVar230._8_8_ + auVar354._8_8_ + 1.0 + auVar354._0_8_ +
                                 auVar230._0_8_ + auVar287._0_8_) *
                                ((double)p_Var6 * dVar335 +
                                dVar124 * (double)local_14b8[lVar78 * 4] +
                                (double)local_a70._vptr_BaseFab[lVar83 + lVar70 + lVar77] * dVar684
                                + dVar556 * (double)local_14b8[lVar78] +
                                  (double)p_Var5 * local_998 +
                                  dVar123 * (double)local_a70._vptr_BaseFab
                                                    [lVar83 + lVar93 + lVar52 + lVar78 * 5] +
                                  (double)p_Var4 * dVar122 +
                                  (double)local_a70._vptr_BaseFab
                                          [lVar83 + lVar93 + lVar52 + lVar78 * 7]) +
                                (double)((uVar114 & 0x3fe0000000000000 | ~uVar114 & (ulong)dVar557)
                                         & uVar115 | ~uVar115 & (ulong)dVar557) *
                                ((double)local_a70._vptr_BaseFab
                                         [lVar82 + lVar104 + lVar52 + lVar78 * 7] * dVar122 +
                                (double)local_a70._vptr_BaseFab
                                        [lVar82 + lVar104 + lVar77 + lVar78 * 4] * dVar684) +
                                (dVar561 /
                                ((dVar582 + auVar290._8_8_) * dStack_510 + dVar561 +
                                 (dVar582 + auVar290._0_8_) * dVar583 +
                                 (dVar660 + auVar290._0_8_) * dVar682 + 1e-100)) *
                                ((double)local_a70._vptr_BaseFab
                                         [lVar82 + lVar70 + lVar77 + lVar78 * 2] * dVar684 +
                                (double)local_a70._vptr_BaseFab
                                        [lVar82 + lVar93 + lVar77 + lVar78 * 4] * dVar556 +
                                (double)local_a70._vptr_BaseFab
                                        [lVar82 + lVar93 + lVar52 + lVar78 * 7] * dVar123 +
                                (double)local_a70._vptr_BaseFab
                                        [lVar82 + lVar70 + lVar52 + lVar78 * 6] * dVar122) +
                                (double)((uVar112 & 0x3fe0000000000000 | ~uVar112 & (ulong)dVar560)
                                         & uVar113 | ~uVar113 & (ulong)dVar560) *
                                ((double)local_a70._vptr_BaseFab
                                         [lVar83 + lVar104 + lVar102 + lVar78 * 7] * dVar335 +
                                (double)local_a70._vptr_BaseFab
                                        [lVar83 + lVar104 + lVar102 + lVar78 * 5] * dVar684 +
                                (double)local_a70._vptr_BaseFab
                                        [lVar83 + lVar104 + lVar102 + lVar78 * 4] * local_998 +
                                (double)local_a70._vptr_BaseFab[lVar83 + lVar104 + lVar102 + lVar78]
                                * dVar122 +
                                dVar431 * (double)local_a70._vptr_BaseFab
                                                  [lVar83 + lVar104 + (long)local_868 + lVar78 * 5]
                                + dVar121 * (double)local_a70._vptr_BaseFab
                                                    [lVar83 + lVar104 + (long)local_868 + lVar78 * 7
                                                    ]) +
                                (dVar612 /
                                ((dStack_550 + dVar585) * dVar580 + dVar612 +
                                 (dStack_550 + dVar586) * dVar471 + (dVar681 + dVar586) * dVar647 +
                                1e-100)) *
                                ((double)local_a70._vptr_BaseFab
                                         [lVar83 + lVar70 + lVar102 + lVar78 * 6] * dVar335 +
                                (double)local_a70._vptr_BaseFab
                                        [lVar83 + lVar93 + lVar102 + lVar78 * 7] * dVar124 +
                                (double)local_a70._vptr_BaseFab
                                        [lVar83 + lVar70 + lVar102 + lVar78 * 3] * dVar684 +
                                (double)local_a70._vptr_BaseFab
                                        [lVar83 + lVar93 + lVar102 + lVar78 * 5] * dVar556 +
                                (double)local_a90 * local_998 +
                                (double)local_a88 * dVar122 +
                                (double)local_a70._vptr_BaseFab[lVar83 + lVar93 + lVar102 + lVar78]
                                * dVar123 +
                                (double)local_758 * dVar121 +
                                (double)local_a70._vptr_BaseFab
                                        [lVar83 + lVar93 + (long)local_868 + lVar78 * 7] * dVar337 +
                                dVar579 * (double)local_a70._vptr_BaseFab
                                                  [lVar83 + lVar93 + (long)local_868 + lVar78 * 5] +
                                (double)local_a70._vptr_BaseFab
                                        [lVar83 + lVar70 + (long)local_868 + lVar78 * 3] * dVar431 +
                                (double)local_a70._vptr_BaseFab
                                        [lVar83 + lVar93 + lVar102 + lVar78 * 4]) +
                                (double)local_a70._vptr_BaseFab
                                        [lVar82 + lVar104 + lVar102 + lVar78 * 7] * dVar684 +
                                (double)local_a70._vptr_BaseFab
                                        [lVar82 + lVar104 + (long)local_868 + lVar78 * 7] * dVar431
                                + (double)local_a70._vptr_BaseFab
                                          [lVar82 + lVar104 + lVar102 + lVar78 * 4] * dVar122 +
                                dVar384 * ((double)local_a70._vptr_BaseFab
                                                   [lVar82 + lVar70 + lVar102 + lVar78 * 6] *
                                           dVar684 +
                                          (double)local_9e8[lVar78 * 7] * dVar556 +
                                          (double)local_a70._vptr_BaseFab
                                                  [lVar82 + lVar70 + lVar102 + lVar78 * 2] * dVar122
                                          + (double)local_9e8[lVar78 * 4] * dVar123 +
                                            (double)local_a70._vptr_BaseFab
                                                    [lVar82 + lVar93 + (long)local_868 + lVar78 * 7]
                                            * dVar579 +
                                            (double)local_a70._vptr_BaseFab
                                                    [lVar82 + lVar70 + (long)local_868 + lVar78 * 6]
                                            * dVar431) +
                                (dVar429 /
                                ((dVar683 + dVar641) * dVar695 + (dVar642 + dVar683) * dVar662 +
                                 dVar429 + (dVar641 + dVar697) * dVar685 + 1e-100)) *
                                ((double)local_a70._vptr_BaseFab
                                         [lVar83 + lVar104 + lVar76 + lVar78 * 7] * local_998 +
                                (double)local_a70._vptr_BaseFab
                                        [lVar83 + lVar104 + lVar76 + lVar78 * 5] * dVar122 +
                                (double)local_a70._vptr_BaseFab[lVar83 + lVar104 + lVar76 + lVar78]
                                * dVar431 +
                                (double)local_a70._vptr_BaseFab
                                        [lVar83 + lVar104 + lVar76 + lVar78 * 4] * dVar121) +
                                (double)local_470[lVar104 + (long)local_868 + lVar78 * 8] * dVar581
                                * (ABS((double)local_a70._vptr_BaseFab
                                               [lVar82 + lVar104 + (long)local_868 + lVar78 * 6]) /
                                   (dVar229 + dVar581 + 1e-100) +
                                  ABS((double)local_470[lVar104 + (long)local_868 + lVar78 * 5]) /
                                  (dVar617 + dVar581 + 1e-100) +
                                  ABS((double)local_a70._vptr_BaseFab
                                              [lVar82 + lVar104 + (long)local_868 + lVar78 * 4]) /
                                  (dVar466 + dVar581 + 1e-100) +
                                  ABS((double)local_470[lVar104 + (long)local_868 + lVar78 * 3]) /
                                  (dVar430 + dVar229 + dVar581 + dVar617 + 1e-100) +
                                  ABS((double)local_a70._vptr_BaseFab
                                              [lVar82 + lVar104 + (long)local_868 + lVar78 * 2]) /
                                  (dVar338 + dVar466 + dVar229 + dVar581 + 1e-100) +
                                  ABS((double)local_470[lVar104 + (long)local_868 + lVar78]) /
                                  (ABS((double)local_470[lVar104 + lVar67 + lVar78 * 7]) + dVar466 +
                                   dVar581 + dVar617 + 1e-100) + 1.0) *
                                ((double)p_Var100 * local_998 +
                                (double)p_Var97 * dVar122 +
                                (double)local_a70._vptr_BaseFab
                                        [lVar83 + lVar93 + lVar76 + lVar78 * 5] * dVar123 +
                                (double)p_Var54 * dVar121 +
                                dVar337 * (double)local_a70._vptr_BaseFab
                                                  [lVar83 + lVar93 + lVar76 + lVar78 * 4] +
                                (double)local_a70._vptr_BaseFab[lVar83 + lVar93 + lVar76 + lVar78] *
                                dVar579 + (double)local_a70._vptr_BaseFab[lVar83 + lVar70 + lVar76]
                                          * dVar431 +
                                (double)local_a70._vptr_BaseFab
                                        [lVar83 + lVar93 + lVar76 + lVar78 * 7]) +
                                (double)((uVar333 & 0x3fe0000000000000 | ~uVar333 & (ulong)dVar680)
                                         & uVar111 | ~uVar111 & (ulong)dVar680) *
                                ((double)local_a70._vptr_BaseFab
                                         [lVar82 + lVar104 + lVar76 + lVar78 * 4] * dVar431 +
                                (double)local_a70._vptr_BaseFab
                                        [lVar82 + lVar104 + lVar76 + lVar78 * 7] * dVar122) +
                                (dVar385 /
                                ((dVar554 + dVar663) * dVar386 +
                                 (dVar645 + dVar387) * dVar616 + (dVar554 + dVar645) * dVar427 +
                                 dVar385 + 1e-100)) *
                                ((double)local_a70._vptr_BaseFab
                                         [lVar82 + lVar70 + lVar76 + lVar78 * 6] * dVar122 +
                                (double)local_a70._vptr_BaseFab
                                        [lVar82 + lVar93 + lVar76 + lVar78 * 7] * dVar123 +
                                (double)local_a70._vptr_BaseFab
                                        [lVar82 + lVar93 + lVar76 + lVar78 * 4] * dVar579 +
                                (double)local_a70._vptr_BaseFab
                                        [lVar82 + lVar70 + lVar76 + lVar78 * 2] * dVar431)) * 0.125
                               + ((double)local_470[lVar60 + lVar77 + lVar78 * 8] * dVar473 *
                                  (auVar341._8_8_ +
                                   auVar186._8_8_ + auVar285._8_8_ + 1.0 + auVar285._0_8_ +
                                   auVar186._0_8_ + auVar341._0_8_) *
                                  (dVar336 * (double)local_a70._vptr_BaseFab
                                                     [lVar83 + lVar70 + lVar77 + lVar78 * 4] +
                                  (double)local_a70._vptr_BaseFab[lVar83 + lVar70 + lVar77] *
                                  dVar611 + local_4f8 +
                                  (double)local_a70._vptr_BaseFab[lVar83 + lVar70 + lVar77 + lVar78]
                                  * local_798 + (double)p_Var6 * dVar515) +
                                 (dVar331 * (double)local_a70._vptr_BaseFab
                                                    [lVar82 + lVar58 + lVar52 + lVar78 * 7] +
                                 (double)local_a70._vptr_BaseFab
                                         [lVar82 + lVar58 + lVar77 + lVar78 * 4] * dVar611) *
                                 local_568 +
                                 ((double)local_a70._vptr_BaseFab
                                          [lVar83 + lVar58 + lVar102 + lVar78 * 7] * dVar515 +
                                 (double)local_a70._vptr_BaseFab
                                         [lVar83 + lVar58 + lVar102 + lVar78 * 5] * dVar611 +
                                 (double)local_a70._vptr_BaseFab
                                         [lVar83 + lVar58 + lVar102 + lVar78 * 4] * dVar183 +
                                 local_638 + local_630 + local_620) * local_548 +
                                 ((double)local_a70._vptr_BaseFab
                                          [lVar82 + lVar70 + lVar102 + lVar78 * 7] * local_798 +
                                 (double)local_a70._vptr_BaseFab
                                         [lVar82 + lVar70 + lVar102 + lVar78 * 6] * dVar611 +
                                 (double)local_a70._vptr_BaseFab
                                         [lVar82 + lVar70 + lVar102 + lVar78 * 4] * dVar550 +
                                 (double)local_a70._vptr_BaseFab
                                         [lVar82 + lVar70 + lVar102 + lVar78 * 2] * dVar331 +
                                 dVar281 * (double)local_a70._vptr_BaseFab
                                                   [lVar82 + lVar70 + (long)local_868 + lVar78 * 6]
                                 + local_388) * local_1458 +
                                 (double)local_a70._vptr_BaseFab
                                         [lVar82 + lVar58 + lVar102 + lVar78 * 7] * dVar611 +
                                 (double)local_a70._vptr_BaseFab
                                         [lVar82 + lVar58 + (long)local_868 + lVar78 * 7] * dVar281
                                 + local_650 +
                                 (double)local_470[lVar60 + (long)local_868 + lVar78 * 8] * dVar229
                                 * (ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar60 + (long)local_868 + lVar78 * 6]) /
                                    (dVar553 + 1e-100) +
                                   ABS((double)local_470[lVar58 + (long)local_868 + lVar78 * 5]) /
                                   (dVar229 + dVar430 + 1e-100) +
                                   ABS((double)local_a70._vptr_BaseFab
                                               [lVar82 + lVar58 + (long)local_868 + lVar78 * 4]) /
                                   (dVar338 + dVar229 + 1e-100) +
                                   ABS((double)local_470[lVar60 + (long)local_868 + lVar78 * 3]) /
                                   (ABS((double)local_470[lVar60 + (long)local_868 + lVar78 * 7]) +
                                    dVar430 + dVar553 + 1e-100) +
                                   ABS((double)local_a70._vptr_BaseFab
                                               [lVar82 + lVar60 + (long)local_868 + lVar78 * 2]) /
                                   (ABS((double)local_348) + dVar338 + dVar229 +
                                    ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar60 + (long)local_868 + lVar78 * 7]) +
                                   1e-100) + ABS((double)local_358) /
                                             (ABS((double)local_378) + dVar338 + dVar229 + dVar430 +
                                             1e-100) + 1.0) *
                                 ((double)p_Var100 * dVar183 +
                                  (double)local_a70._vptr_BaseFab
                                          [lVar83 + lVar70 + lVar76 + lVar78 * 5] * dVar550 +
                                  (double)p_Var97 * dVar331 +
                                  (double)local_a70._vptr_BaseFab
                                          [lVar83 + lVar70 + lVar76 + lVar78 * 4] * dVar469 +
                                  (double)p_Var54 * dVar120 +
                                  (double)local_a70._vptr_BaseFab[lVar83 + lVar70 + lVar76] *
                                  dVar281 + (double)local_a70._vptr_BaseFab
                                                    [lVar83 + lVar70 + lVar76 + lVar78] * dVar184 +
                                 (double)local_a70._vptr_BaseFab
                                         [lVar83 + lVar70 + lVar76 + lVar78 * 7]) +
                                 (dVar339 /
                                 ((dVar334 + dVar472) * dVar433 + (dVar332 + dVar334) * dVar470 +
                                  dVar339 + (dVar472 + dVar552) * dVar513 + 1e-100)) *
                                 ((double)local_a70._vptr_BaseFab
                                          [lVar83 + lVar58 + lVar76 + lVar78 * 7] * dVar183 +
                                 local_648 +
                                 local_640 +
                                 (double)local_a70._vptr_BaseFab
                                         [lVar83 + lVar58 + lVar76 + lVar78 * 4] * dVar120) +
                                 (double)((uVar107 & 0x3fe0000000000000 | ~uVar107 & (ulong)dVar388)
                                          & -(ulong)((double)local_428 == 0.0) |
                                         ~-(ulong)((double)local_428 == 0.0) & (ulong)dVar388) *
                                 ((double)local_a70._vptr_BaseFab
                                          [lVar82 + lVar58 + lVar76 + lVar78 * 4] * dVar281 +
                                 local_658) +
                                 (dVar555 /
                                 ((dVar467 + dVar615) * dVar512 + (dVar554 + dVar467) * dVar427 +
                                  dVar555 + (dVar615 + dVar432) * dVar514 + 1e-100)) *
                                 ((double)local_a70._vptr_BaseFab
                                          [lVar82 + lVar70 + lVar76 + lVar78 * 7] * dVar550 +
                                 (double)local_a70._vptr_BaseFab
                                         [lVar82 + lVar70 + lVar76 + lVar78 * 6] * dVar331 +
                                 (double)local_a70._vptr_BaseFab
                                         [lVar82 + lVar70 + lVar76 + lVar78 * 2] * dVar281 +
                                 local_368) +
                                 ((double)local_a70._vptr_BaseFab
                                          [lVar83 + lVar70 + lVar102 + lVar78 * 7] * dVar336 +
                                 (double)local_a70._vptr_BaseFab
                                         [lVar83 + lVar70 + lVar102 + lVar78 * 6] * dVar515 +
                                 (double)local_a70._vptr_BaseFab
                                         [lVar83 + lVar70 + lVar102 + lVar78 * 5] * local_798 +
                                 (double)local_a70._vptr_BaseFab
                                         [lVar83 + lVar70 + lVar102 + lVar78 * 3] * dVar611 +
                                 local_768) * local_558 +
                                 (local_798 *
                                  (double)local_a70._vptr_BaseFab
                                          [lVar82 + lVar70 + lVar77 + lVar78 * 4] +
                                 (double)local_a70._vptr_BaseFab
                                         [lVar82 + lVar70 + lVar77 + lVar78 * 2] * dVar611 +
                                 local_a98) * local_578 +
                                 (dVar515 * (double)local_a70._vptr_BaseFab
                                                    [lVar83 + lVar58 + lVar77 + lVar78 * 4] +
                                 dVar611 * (double)local_a70._vptr_BaseFab
                                                   [lVar83 + lVar58 + lVar77 + lVar78] +
                                 (double)local_a70._vptr_BaseFab
                                         [lVar83 + lVar58 + lVar52 + lVar78 * 5] * dVar331 +
                                 dVar183 * (double)local_a70._vptr_BaseFab
                                                   [lVar83 + lVar58 + lVar52 + lVar78 * 7]) *
                                 local_7a8) * 0.125) * 0.5;
                          dVar550 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar79 + lVar70 + lVar52 + lVar78 * 7]);
                          dVar469 = ABS((double)local_460[lVar70 + lVar77 + lVar78 * 7]);
                          dVar334 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar79 + lVar70 + lVar77 + lVar78 * 7]);
                          p_Var54 = local_a70._vptr_BaseFab[lVar79 + lVar70 + lVar77 + lVar78 * 2];
                          dVar473 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar79 + lVar93 + lVar52 + lVar78 * 7]);
                          dVar387 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar79 + lVar93 + lVar77 + lVar78 * 7]);
                          local_978 = ABS((double)p_Var54) /
                                      (dVar550 + dVar473 + dVar387 + dVar334 + 1e-100);
                          uStack_970 = 0;
                          p_Var97 = local_a70._vptr_BaseFab[lVar79 + lVar70 + lVar77 + lVar78 * 3];
                          dVar281 = ABS((double)local_460[lVar93 + lVar77 + lVar78 * 7]);
                          uStack_d80 = 0;
                          local_c98 = ABS((double)p_Var97) /
                                      (dVar469 + dVar281 + dVar387 + dVar334 + 1e-100);
                          uStack_c90 = 0;
                          p_Var100 = local_a70._vptr_BaseFab[lVar79 + lVar70 + lVar77 + lVar78 * 6];
                          dVar332 = ABS((double)p_Var100) / (dVar334 + dVar387 + 1e-100);
                          dVar427 = dVar334 * (double)local_a70._vptr_BaseFab
                                                      [lVar79 + lVar70 + lVar77 + lVar78 * 8] *
                                    (ABS((double)local_a70._vptr_BaseFab
                                                 [lVar79 + lVar70 + lVar77 + lVar78 * 5]) /
                                     (dVar469 + dVar334 + 1e-100) +
                                     ABS((double)local_a70._vptr_BaseFab
                                                 [lVar79 + lVar70 + lVar77 + lVar78 * 4]) /
                                     (dVar550 + dVar334 + 1e-100) +
                                     ABS((double)local_a70._vptr_BaseFab
                                                 [lVar79 + lVar70 + lVar77 + lVar78]) /
                                     (ABS((double)local_460[lVar70 + lVar52 + lVar78 * 7]) + dVar550
                                      + dVar469 + dVar334 + 1e-100) + 1.0 + local_978 + local_c98 +
                                    dVar332);
                          uStack_ce0 = 0;
                          dVar334 = ABS((double)local_460[lVar57 + lVar52 + lVar78 * 6]);
                          dVar550 = ABS((double)local_460[lVar57 + lVar77 + lVar78 * 6]);
                          dVar121 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar79 + lVar57 + lVar52 + lVar78 * 6]);
                          dVar331 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar79 + lVar57 + lVar77 + lVar78 * 6]);
                          dVar122 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar79 + lVar57 + lVar52 + lVar78 * 3]) /
                                    (dVar334 + dVar121 + 1e-100);
                          dVar123 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar79 + lVar57 + lVar77 + lVar78 * 3]) /
                                    (dVar550 + dVar331 + 1e-100);
                          dVar469 = ABS((double)local_460[lVar57 + lVar77 + lVar78 * 2]) /
                                    (dVar334 + dVar550 + 1e-100) + 1.0;
                          dVar120 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar79 + lVar57 + lVar77 + lVar78 * 2]) /
                                    (dVar121 + dVar331 + 1e-100) + 1.0;
                          dVar331 = (dVar120 + dVar123) * dVar331;
                          dVar331 = dVar331 / ((dVar469 + dVar123) * dVar550 +
                                               (dVar122 + dVar120) * dVar121 +
                                               (dVar469 + dVar122) * dVar334 + dVar331 + 1e-100);
                          auVar155._0_8_ =
                               ABS((double)local_a70._vptr_BaseFab
                                           [lVar82 + lVar70 + lVar77 + lVar78]);
                          auVar155._8_8_ =
                               ABS((double)local_a70._vptr_BaseFab
                                           [lVar82 + lVar93 + lVar77 + lVar78]);
                          dVar184 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar70 + lVar52 + lVar78 * 5]);
                          dVar385 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar93 + lVar52 + lVar78 * 5]);
                          dVar339 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar70 + lVar77 + lVar78 * 5]);
                          dVar122 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar93 + lVar77 + lVar78 * 5]);
                          auVar535._0_8_ = dVar184 + dVar339 + 1e-100;
                          auVar535._8_8_ = dVar385 + dVar122 + 1e-100;
                          auVar343 = divpd(auVar155,auVar535);
                          dVar336 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar70 + lVar52 + lVar78 * 3]) /
                                    (dVar385 + dVar184 + 1e-100);
                          dVar469 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar70 + lVar77 + lVar78 * 3]) /
                                    (dVar122 + dVar339 + 1e-100);
                          dVar334 = auVar343._0_8_ + 1.0;
                          dVar123 = auVar343._8_8_ + 1.0;
                          dVar339 = (dVar469 + dVar334) * dVar339;
                          dVar122 = (dVar469 + dVar123) * dVar122;
                          dVar469 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar57 + lVar77 + lVar78 * 3]);
                          dVar469 = dVar469 / (ABS((double)local_a70._vptr_BaseFab
                                                           [lVar82 + lVar57 + lVar52 + lVar78 * 3])
                                              + dVar469);
                          uVar107 = -(ulong)((double)local_a70._vptr_BaseFab
                                                     [lVar82 + lVar57 + lVar77 + lVar78 * 3] == 0.0)
                          ;
                          uVar333 = -(ulong)((double)local_a70._vptr_BaseFab
                                                     [lVar82 + lVar57 + lVar52 + lVar78 * 3] == 0.0)
                          ;
                          dVar469 = (double)((uVar107 & 0x3fe0000000000000 |
                                             ~uVar107 & (ulong)dVar469) & uVar333 |
                                            ~uVar333 & (ulong)dVar469);
                          auVar206._0_8_ =
                               (ulong)local_a70._vptr_BaseFab[lVar83 + lVar57 + lVar77 + lVar78 * 2]
                               & 0x7fffffffffffffff;
                          auVar206._8_8_ =
                               (ulong)local_a70._vptr_BaseFab[lVar92 + lVar57 + lVar77 + lVar78 * 2]
                               & 0x7fffffffffffffff;
                          dVar433 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar83 + lVar57 + lVar52 + lVar78 * 6]);
                          dVar338 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar92 + lVar57 + lVar52 + lVar78 * 6]);
                          dVar120 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar83 + lVar57 + lVar77 + lVar78 * 6]);
                          dVar124 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar92 + lVar57 + lVar77 + lVar78 * 6]);
                          auVar536._0_8_ = dVar433 + dVar120 + 1e-100;
                          auVar536._8_8_ = dVar338 + dVar124 + 1e-100;
                          auVar343 = divpd(auVar206,auVar536);
                          dVar388 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar83 + lVar57 + lVar52 + lVar78 * 3]) /
                                    (dVar338 + dVar433 + 1e-100);
                          dVar337 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar83 + lVar57 + lVar77 + lVar78 * 3]) /
                                    (dVar124 + dVar120 + 1e-100);
                          dVar229 = auVar343._0_8_ + 1.0;
                          dVar429 = auVar343._8_8_ + 1.0;
                          dVar124 = (dVar337 + dVar429) * dVar124;
                          auVar156._0_8_ =
                               (ulong)local_a70._vptr_BaseFab[lVar79 + lVar70 + lVar106 + lVar78] &
                               0x7fffffffffffffff;
                          auVar156._8_8_ =
                               (ulong)local_a70._vptr_BaseFab[lVar79 + lVar93 + lVar106 + lVar78] &
                               0x7fffffffffffffff;
                          dVar384 = ABS((double)local_460[lVar70 + lVar106 + lVar78 * 4]);
                          dVar578 = ABS((double)local_460[lVar93 + lVar106 + lVar78 * 4]);
                          dVar335 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar79 + lVar70 + lVar106 + lVar78 * 4]);
                          dStack_cc0 = ABS((double)local_a70._vptr_BaseFab
                                                   [lVar79 + lVar93 + lVar106 + lVar78 * 4]);
                          auVar602._0_8_ = dVar384 + dVar335 + 1e-100;
                          auVar602._8_8_ = dVar578 + dStack_cc0 + 1e-100;
                          auVar343 = divpd(auVar156,auVar602);
                          dVar386 = ABS((double)local_460[lVar70 + lVar106 + lVar78 * 2]) /
                                    (dVar578 + dVar384 + 1e-100);
                          dVar550 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar79 + lVar70 + lVar106 + lVar78 * 2]) /
                                    (dStack_cc0 + dVar335 + 1e-100);
                          dVar121 = auVar343._0_8_ + 1.0;
                          dVar183 = auVar343._8_8_ + 1.0;
                          dVar335 = (dVar550 + dVar121) * dVar335;
                          dStack_cc0 = (dVar550 + dVar183) * dStack_cc0;
                          dVar550 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar79 + lVar57 + lVar106 + lVar78 * 2]);
                          dVar550 = dVar550 / (ABS((double)local_460[lVar57 + lVar106 + lVar78 * 2])
                                              + dVar550);
                          uVar107 = -(ulong)((double)local_a70._vptr_BaseFab
                                                     [lVar79 + lVar57 + lVar106 + lVar78 * 2] == 0.0
                                            );
                          uVar333 = -(ulong)((double)local_460[lVar57 + lVar106 + lVar78 * 2] == 0.0
                                            );
                          dVar550 = (double)((uVar107 & 0x3fe0000000000000 |
                                             ~uVar107 & (ulong)dVar550) & uVar333 |
                                            ~uVar333 & (ulong)dVar550);
                          uStack_d10 = 0;
                          p_Var2 = local_a70._vptr_BaseFab[lVar82 + lVar70 + lVar106 + lVar78];
                          p_Var3 = local_a70._vptr_BaseFab[lVar82 + lVar93 + lVar106 + lVar78];
                          dVar184 = (dVar336 + dVar123) * dVar385 + (dVar336 + dVar334) * dVar184 +
                                    dVar122 + dVar339 + 1e-100;
                          dVar339 = dVar339 / dVar184;
                          dVar123 = (dVar386 + dVar121) * dVar384 + (dVar183 + dVar386) * dVar578 +
                                    dStack_cc0 + dVar335 + 1e-100;
                          dVar335 = dVar335 / dVar123;
                          dVar334 = 0.5;
                          dVar121 = ABS((double)p_Var3) + ABS((double)p_Var2);
                          uStack_a10 = 0;
                          p_Var4 = local_a70._vptr_BaseFab[lVar92 + lVar70 + lVar77 + lVar78 * 2];
                          p_Var5 = local_a70._vptr_BaseFab[lVar83 + lVar70 + lVar77 + lVar78 * 3];
                          p_Var6 = local_a70._vptr_BaseFab[lVar92 + lVar70 + lVar77 + lVar78 * 6];
                          if ((double)p_Var2 != 0.0 || (double)p_Var3 != 0.0) {
                            dVar334 = ABS((double)p_Var2) / dVar121;
                          }
                          lVar60 = (long)(iVar63 - local_a70.domain.smallend.vect[2]);
                          p_Var7 = local_a70._vptr_BaseFab[lVar82 + lVar58 + lVar102 + lVar78];
                          uStack_d70 = 0;
                          dVar183 = 0.5;
                          if ((double)p_Var2 != 0.0 || (double)p_Var3 != 0.0) {
                            dVar183 = ABS((double)p_Var3) / dVar121;
                          }
                          dVar124 = dVar124 / ((dVar388 + dVar229) * dVar433 +
                                               (dVar429 + dVar388) * dVar338 + dVar124 +
                                               (dVar337 + dVar229) * dVar120 + 1e-100);
                          auVar603._0_8_ =
                               (ulong)local_a70._vptr_BaseFab[lVar83 + lVar70 + lVar106 + lVar78] &
                               0x7fffffffffffffff;
                          auVar603._8_8_ =
                               (ulong)local_a70._vptr_BaseFab[lVar83 + lVar93 + lVar106 + lVar78] &
                               0x7fffffffffffffff;
                          dVar433 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar92 + lVar70 + lVar106 + lVar78 * 4]);
                          dStack_b40 = ABS((double)local_a70._vptr_BaseFab
                                                   [lVar92 + lVar93 + lVar106 + lVar78 * 4]);
                          dVar466 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar83 + lVar70 + lVar106 + lVar78 * 4]);
                          dStack_8a0 = ABS((double)local_a70._vptr_BaseFab
                                                   [lVar83 + lVar93 + lVar106 + lVar78 * 4]);
                          auVar572._0_8_ = dVar433 + dVar466 + 1e-100;
                          auVar572._8_8_ = dStack_b40 + dStack_8a0 + 1e-100;
                          auVar343 = divpd(auVar603,auVar572);
                          dVar120 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar92 + lVar70 + lVar106 + lVar78 * 2]) /
                                    (dStack_b40 + dVar433 + 1e-100);
                          dVar430 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar83 + lVar70 + lVar106 + lVar78 * 2]) /
                                    (dStack_8a0 + dVar466 + 1e-100);
                          dVar472 = auVar343._0_8_ + 1.0;
                          dVar121 = auVar343._8_8_ + 1.0;
                          dVar433 = (dVar120 + dVar472) * dVar433;
                          dStack_b40 = (dVar120 + dVar121) * dStack_b40;
                          dStack_8a0 = (dVar430 + dVar121) * dStack_8a0;
                          dVar120 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar92 + lVar57 + lVar106 + lVar78 * 2]);
                          dVar120 = dVar120 / (ABS((double)local_a70._vptr_BaseFab
                                                           [lVar83 + lVar57 + lVar106 + lVar78 * 2])
                                              + dVar120);
                          uVar107 = -(ulong)((double)local_a70._vptr_BaseFab
                                                     [lVar92 + lVar57 + lVar106 + lVar78 * 2] == 0.0
                                            );
                          uVar333 = -(ulong)((double)local_a70._vptr_BaseFab
                                                     [lVar83 + lVar57 + lVar106 + lVar78 * 2] == 0.0
                                            );
                          dVar120 = (double)((uVar333 & 0x3fe0000000000000 |
                                             ~uVar333 & (ulong)dVar120) & uVar107 |
                                            ~uVar107 & (ulong)dVar120);
                          dVar429 = ABS((double)local_9f8[lVar58 + lVar102 + lVar78 * 2]);
                          dVar429 = dVar429 / (ABS((double)local_610[lVar58 + lVar102 + lVar78 * 2])
                                              + dVar429);
                          uVar107 = -(ulong)((double)local_610[lVar58 + lVar102 + lVar78 * 2] == 0.0
                                            );
                          uVar333 = -(ulong)((double)local_9f8[lVar58 + lVar102 + lVar78 * 2] == 0.0
                                            );
                          dVar337 = ABS((double)local_610[lVar58 + lVar102 + lVar78 * 4]);
                          dVar336 = ABS((double)local_9f8[lVar58 + lVar102 + lVar78 * 4]);
                          dVar431 = ABS((double)local_288[lVar60 + lVar78 * 4]);
                          dVar384 = ABS((double)local_9f8[lVar60 + lVar102 + lVar78 * 4]);
                          dVar432 = ABS((double)local_288[lVar60 + lVar78 * 2]) /
                                    (dVar337 + dVar431 + 1e-100);
                          dVar388 = ABS((double)local_9f8[lVar60 + lVar102 + lVar78 * 2]) /
                                    (dVar336 + dVar384 + 1e-100);
                          dVar578 = ABS((double)local_9f8[lVar58 + lVar102 + lVar78]) /
                                    (dVar337 + dVar336 + 1e-100) + 1.0;
                          dVar338 = ABS((double)local_9f8[lVar60 + lVar102 + lVar78]) /
                                    (dVar431 + dVar384 + 1e-100) + 1.0;
                          dVar121 = (dVar578 + dVar388) * dVar336;
                          dVar385 = ABS((double)p_Var7);
                          local_1408 = dVar385 / (ABS((double)local_a70._vptr_BaseFab
                                                              [lVar82 + lVar60 + lVar102 + lVar78])
                                                 + dVar385);
                          dVar229 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar92 + lVar93 + lVar52 + lVar78 * 7]);
                          dVar386 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar92 + lVar93 + lVar77 + lVar78 * 7]);
                          dVar472 = dStack_8a0 + dStack_b40 + dVar433 +
                                    (dVar430 + dVar472) * dVar466 + 1e-100;
                          dVar433 = dVar433 / dVar472;
                          if (((double)p_Var7 == 0.0) && (!NAN((double)p_Var7))) {
                            uVar111 = -(ulong)((double)local_a70._vptr_BaseFab
                                                       [lVar82 + lVar60 + lVar102 + lVar78] == 0.0);
                            local_1408 = (double)(uVar111 & 0x3fe0000000000000 |
                                                 ~uVar111 & (ulong)local_1408);
                          }
                          dVar467 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar58 + lVar102 + lVar78 * 2]);
                          dVar467 = dVar467 / (ABS((double)local_478[lVar58 + lVar102 + lVar78 * 2])
                                              + dVar467);
                          uVar111 = -(ulong)((double)local_478[lVar58 + lVar102 + lVar78 * 2] == 0.0
                                            );
                          uVar112 = -(ulong)((double)local_a70._vptr_BaseFab
                                                     [lVar82 + lVar58 + lVar102 + lVar78 * 2] == 0.0
                                            );
                          dVar579 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar58 + lVar102 + lVar78 * 4]);
                          dVar581 = ABS((double)local_478[lVar58 + lVar102 + lVar78 * 4]);
                          dVar471 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar60 + lVar102 + lVar78 * 4]);
                          dVar470 = ABS((double)local_478[lVar60 + lVar102 + lVar78 * 4]);
                          dVar466 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar60 + lVar102 + lVar78 * 2]) /
                                    (dVar579 + dVar471 + 1e-100);
                          dVar512 = ABS((double)local_478[lVar60 + lVar102 + lVar78 * 2]) /
                                    (dVar581 + dVar470 + 1e-100);
                          dVar555 = ABS((double)local_478[lVar58 + lVar102 + lVar78]) /
                                    (dVar579 + dVar581 + 1e-100) + 1.0;
                          dVar430 = ABS((double)local_478[lVar60 + lVar102 + lVar78]) /
                                    (dVar471 + dVar470 + 1e-100) + 1.0;
                          local_cf8 = (dVar555 + dVar466) * dVar579;
                          local_cf8 = local_cf8 /
                                      ((dVar466 + dVar430) * dVar471 + local_cf8 +
                                       (dVar555 + dVar512) * dVar581 + (dVar430 + dVar512) * dVar470
                                      + 1e-100);
                          uStack_cf0 = 0;
                          auVar157._0_8_ =
                               (ulong)local_9f8[lVar58 + lVar77 + lVar78 * 2] & 0x7fffffffffffffff;
                          auVar157._8_8_ =
                               (ulong)local_610[lVar58 + lVar77 + lVar78 * 2] & 0x7fffffffffffffff;
                          dVar512 = ABS((double)local_9f8[lVar58 + lVar102 + lVar78 * 6]);
                          dVar513 = ABS((double)local_610[lVar58 + lVar102 + lVar78 * 6]);
                          dVar470 = ABS((double)local_9f8[lVar58 + lVar77 + lVar78 * 6]);
                          dVar471 = ABS((double)local_610[lVar58 + lVar77 + lVar78 * 6]);
                          auVar314._0_8_ = dVar512 + dVar470 + 1e-100;
                          auVar314._8_8_ = dVar513 + dVar471 + 1e-100;
                          auVar343 = divpd(auVar157,auVar314);
                          dVar515 = ABS((double)local_9f8[lVar58 + lVar102 + lVar78 * 3]) /
                                    (dVar513 + dVar512 + 1e-100);
                          dVar514 = ABS((double)local_9f8[lVar58 + lVar77 + lVar78 * 3]) /
                                    (dVar471 + dVar470 + 1e-100);
                          dVar430 = auVar343._0_8_ + 1.0;
                          dVar466 = auVar343._8_8_ + 1.0;
                          dVar512 = (dVar515 + dVar430) * dVar512;
                          local_d08._0_8_ =
                               (dVar512 /
                               ((dVar514 + dVar466) * dVar471 +
                                (dVar466 + dVar515) * dVar513 + dVar512 +
                                (dVar514 + dVar430) * dVar470 + 1e-100)) *
                               ((double)local_a70._vptr_BaseFab
                                        [lVar79 + lVar58 + lVar77 + lVar78 * 7] * dVar334 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar79 + lVar58 + lVar77 + lVar78 * 5] * dVar335 +
                               (double)local_a70._vptr_BaseFab[lVar79 + lVar58 + lVar77 + lVar78] *
                               dVar427 + (double)local_a70._vptr_BaseFab
                                                 [lVar79 + lVar58 + lVar77 + lVar78 * 4] * dVar339);
                          local_d08._8_8_ = 0;
                          dVar552 = ABS((double)local_9f8[lVar58 + lVar102 + lVar78 * 7]);
                          dVar553 = ABS((double)local_610[lVar58 + lVar102 + lVar78 * 7]);
                          dVar580 = ABS((double)local_9f8[lVar58 + lVar77 + lVar78 * 7]);
                          dVar430 = ABS((double)local_9f8[lVar60 + lVar102 + lVar78 * 7]) + dVar552;
                          auVar315._0_8_ =
                               (ulong)local_9f8[lVar58 + lVar77 + lVar78 * 4] & 0x7fffffffffffffff;
                          auVar315._8_8_ =
                               (ulong)local_9f8[lVar60 + lVar102 + lVar78 * 3] & 0x7fffffffffffffff;
                          auVar370._0_8_ = dVar552 + dVar580 + 1e-100;
                          auVar370._8_8_ =
                               ABS((double)local_288[lVar60 + lVar78 * 7]) + dVar553 + dVar552 +
                               ABS((double)local_9f8[lVar60 + lVar102 + lVar78 * 7]) + 1e-100;
                          auVar341 = divpd(auVar315,auVar370);
                          auVar266._0_8_ =
                               (ulong)local_9f8[lVar60 + lVar102 + lVar78 * 6] & 0x7fffffffffffffff;
                          auVar266._8_8_ =
                               (ulong)local_9f8[lVar58 + lVar102 + lVar78 * 5] & 0x7fffffffffffffff;
                          auVar158._0_8_ = dVar430 + 1e-100;
                          auVar158._8_8_ = dVar552 + dVar553 + 1e-100;
                          auVar343 = divpd(auVar266,auVar158);
                          local_b58 = (double)local_9f8[lVar60 + lVar77 + lVar78 * 8] * dVar552 *
                                      (auVar343._8_8_ +
                                       auVar341._8_8_ +
                                       ABS((double)local_9f8[lVar60 + lVar77 + lVar78 * 2]) /
                                       (dVar580 + dVar430 +
                                        ABS((double)local_9f8[lVar60 + lVar77 + lVar78 * 7]) +
                                       1e-100) + ABS((double)local_9f8[lVar58 + lVar77 + lVar78]) /
                                                 (dVar552 + dVar553 +
                                                  ABS((double)local_610[lVar58 + lVar77 + lVar78 * 7
                                                                       ]) + dVar580 + 1e-100) + 1.0
                                       + auVar341._0_8_ + auVar343._0_8_) *
                                      ((double)p_Var100 * dVar334 +
                                       (double)local_a70._vptr_BaseFab
                                               [lVar79 + lVar70 + lVar77 + lVar78 * 5] * dVar550 +
                                       (double)p_Var97 * dVar335 +
                                       (double)local_a70._vptr_BaseFab
                                               [lVar79 + lVar70 + lVar77 + lVar78 * 4] * dVar469 +
                                       (double)p_Var54 * dVar339 +
                                       (double)local_a70._vptr_BaseFab[lVar79 + lVar70 + lVar77] *
                                       dVar427 + (double)local_a70._vptr_BaseFab
                                                         [lVar79 + lVar70 + lVar77 + lVar78] *
                                                 dVar331 +
                                      (double)local_a70._vptr_BaseFab
                                              [lVar79 + lVar70 + lVar77 + lVar78 * 7]);
                          dVar430 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar58 + lVar102 + lVar78 * 3]);
                          dVar430 = dVar430 / (ABS((double)local_a70._vptr_BaseFab
                                                           [lVar82 + lVar58 + lVar77 + lVar78 * 3])
                                              + dVar430);
                          uVar113 = -(ulong)((double)local_a70._vptr_BaseFab
                                                     [lVar82 + lVar58 + lVar77 + lVar78 * 3] == 0.0)
                          ;
                          uVar114 = -(ulong)((double)local_a70._vptr_BaseFab
                                                     [lVar82 + lVar58 + lVar102 + lVar78 * 3] == 0.0
                                            );
                          local_988 = (double)((uVar113 & 0x3fe0000000000000 |
                                               ~uVar113 & (ulong)dVar430) & uVar114 |
                                              ~uVar114 & (ulong)dVar430);
                          uStack_980 = 0;
                          auVar316._0_8_ =
                               (ulong)local_a70._vptr_BaseFab[lVar82 + lVar60 + lVar77 + lVar78] &
                               0x7fffffffffffffff;
                          auVar316._8_8_ =
                               (ulong)local_a70._vptr_BaseFab[lVar82 + lVar58 + lVar77 + lVar78] &
                               0x7fffffffffffffff;
                          dVar512 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar60 + lVar102 + lVar78 * 5]);
                          dVar554 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar58 + lVar102 + lVar78 * 5]);
                          dVar471 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar60 + lVar77 + lVar78 * 5]);
                          dVar615 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar58 + lVar77 + lVar78 * 5]);
                          auVar159._0_8_ = dVar512 + dVar471 + 1e-100;
                          auVar159._8_8_ = dVar554 + dVar615 + 1e-100;
                          auVar343 = divpd(auVar316,auVar159);
                          dVar430 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar60 + lVar102 + lVar78 * 3]) /
                                    (dVar554 + dVar512 + 1e-100);
                          dVar466 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar60 + lVar77 + lVar78 * 3]) /
                                    (dVar615 + dVar471 + 1e-100);
                          dVar470 = auVar343._0_8_ + 1.0;
                          dVar514 = auVar343._8_8_ + 1.0;
                          dStack_730 = (dVar430 + dVar514) * dVar554;
                          local_738 = dStack_730 /
                                      ((dVar466 + dVar514) * dVar615 +
                                       (dVar430 + dVar470) * dVar512 + dStack_730 +
                                       (dVar466 + dVar470) * dVar471 + 1e-100);
                          auVar160._0_8_ =
                               (ulong)local_478[lVar58 + lVar77 + lVar78 * 2] & 0x7fffffffffffffff;
                          auVar160._8_8_ =
                               (ulong)local_a70._vptr_BaseFab[lVar82 + lVar58 + lVar77 + lVar78 * 2]
                               & 0x7fffffffffffffff;
                          dVar512 = ABS((double)local_478[lVar58 + lVar102 + lVar78 * 6]);
                          dStack_740 = ABS((double)local_a70._vptr_BaseFab
                                                   [lVar82 + lVar58 + lVar102 + lVar78 * 6]);
                          dVar470 = ABS((double)local_478[lVar58 + lVar77 + lVar78 * 6]);
                          dVar471 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar58 + lVar77 + lVar78 * 6]);
                          auVar317._0_8_ = dVar512 + dVar470 + 1e-100;
                          auVar317._8_8_ = dStack_740 + dVar471 + 1e-100;
                          auVar343 = divpd(auVar160,auVar317);
                          dVar513 = ABS((double)local_478[lVar58 + lVar102 + lVar78 * 3]) /
                                    (dStack_740 + dVar512 + 1e-100);
                          dVar515 = ABS((double)local_478[lVar58 + lVar77 + lVar78 * 3]) /
                                    (dVar471 + dVar470 + 1e-100);
                          dVar430 = auVar343._0_8_ + 1.0;
                          dVar466 = auVar343._8_8_ + 1.0;
                          dStack_740 = (dVar513 + dVar466) * dStack_740;
                          local_748 = dStack_740 /
                                      ((dVar515 + dVar466) * dVar471 +
                                       (dVar513 + dVar430) * dVar512 + dStack_740 +
                                       (dVar515 + dVar430) * dVar470 + 1e-100);
                          dVar470 = ABS((double)local_460[lVar58 + lVar52 + lVar78 * 6]);
                          dVar466 = ABS((double)local_460[lVar58 + lVar77 + lVar78 * 6]);
                          dVar512 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar79 + lVar58 + lVar52 + lVar78 * 6]);
                          dVar471 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar79 + lVar58 + lVar77 + lVar78 * 6]);
                          dVar513 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar79 + lVar58 + lVar52 + lVar78 * 3]) /
                                    (dVar470 + dVar512 + 1e-100);
                          dVar515 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar79 + lVar58 + lVar77 + lVar78 * 3]) /
                                    (dVar466 + dVar471 + 1e-100);
                          dVar430 = ABS((double)local_460[lVar58 + lVar77 + lVar78 * 2]) /
                                    (dVar470 + dVar466 + 1e-100) + 1.0;
                          dVar556 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar79 + lVar58 + lVar77 + lVar78 * 2]) /
                                    (dVar512 + dVar471 + 1e-100) + 1.0;
                          dVar471 = (dVar556 + dVar515) * dVar471;
                          dVar471 = dVar471 / ((dVar430 + dVar515) * dVar466 +
                                               (dVar513 + dVar556) * dVar512 +
                                               (dVar430 + dVar513) * dVar470 + dVar471 + 1e-100);
                          uStack_aa0 = 0;
                          dVar430 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar79 + lVar58 + lVar106 + lVar78 * 2]);
                          dVar430 = dVar430 / (ABS((double)local_460[lVar58 + lVar106 + lVar78 * 2])
                                              + dVar430);
                          uVar113 = -(ulong)((double)local_a70._vptr_BaseFab
                                                     [lVar79 + lVar58 + lVar106 + lVar78 * 2] == 0.0
                                            );
                          uVar114 = -(ulong)((double)local_460[lVar58 + lVar106 + lVar78 * 2] == 0.0
                                            );
                          dVar430 = (double)((uVar113 & 0x3fe0000000000000 |
                                             ~uVar113 & (ulong)dVar430) & uVar114 |
                                            ~uVar114 & (ulong)dVar430);
                          dVar281 = (double)local_a70._vptr_BaseFab
                                            [lVar79 + lVar70 + lVar77 + lVar78 * 8] * dVar387 *
                                    (dVar332 +
                                    ABS((double)local_a70._vptr_BaseFab
                                                [lVar79 + lVar93 + lVar77 + lVar78 * 5]) /
                                    (dVar281 + dVar387 + 1e-100) +
                                    ABS((double)local_a70._vptr_BaseFab
                                                [lVar79 + lVar93 + lVar77 + lVar78 * 4]) /
                                    (dVar473 + dVar387 + 1e-100) +
                                    local_c98 +
                                    local_978 +
                                    ABS((double)local_a70._vptr_BaseFab
                                                [lVar79 + lVar93 + lVar77 + lVar78]) /
                                    (ABS((double)local_460[lVar93 + lVar52 + lVar78 * 7]) + dVar473
                                     + dVar281 + dVar387 + 1e-100) + 1.0);
                          dVar332 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar58 + lVar77 + lVar78 * 3]);
                          dVar332 = dVar332 / (ABS((double)local_a70._vptr_BaseFab
                                                           [lVar82 + lVar58 + lVar52 + lVar78 * 3])
                                              + dVar332);
                          uVar113 = -(ulong)((double)local_a70._vptr_BaseFab
                                                     [lVar82 + lVar58 + lVar77 + lVar78 * 3] == 0.0)
                          ;
                          uVar114 = -(ulong)((double)local_a70._vptr_BaseFab
                                                     [lVar82 + lVar58 + lVar52 + lVar78 * 3] == 0.0)
                          ;
                          dVar332 = (double)((uVar113 & 0x3fe0000000000000 |
                                             ~uVar113 & (ulong)dVar332) & uVar114 |
                                            ~uVar114 & (ulong)dVar332);
                          dVar122 = dVar122 / dVar184;
                          dVar387 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar92 + lVar58 + lVar52 + lVar78 * 6]);
                          dVar473 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar92 + lVar58 + lVar77 + lVar78 * 6]);
                          dVar466 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar83 + lVar58 + lVar52 + lVar78 * 6]);
                          dVar470 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar83 + lVar58 + lVar77 + lVar78 * 6]);
                          dVar512 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar83 + lVar58 + lVar52 + lVar78 * 3]) /
                                    (dVar387 + dVar466 + 1e-100);
                          dVar513 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar83 + lVar58 + lVar77 + lVar78 * 3]) /
                                    (dVar473 + dVar470 + 1e-100);
                          dVar515 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar92 + lVar58 + lVar77 + lVar78 * 2]) /
                                    (dVar387 + dVar473 + 1e-100) + 1.0;
                          dVar184 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar83 + lVar58 + lVar77 + lVar78 * 2]) /
                                    (dVar466 + dVar470 + 1e-100) + 1.0;
                          dVar473 = (dVar515 + dVar513) * dVar473;
                          dVar473 = dVar473 / ((dVar512 + dVar184) * dVar466 +
                                               (dVar515 + dVar512) * dVar387 + dVar473 +
                                               (dVar184 + dVar513) * dVar470 + 1e-100);
                          dVar470 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar92 + lVar70 + lVar77 + lVar78 * 7]);
                          dVar512 = ABS((double)local_14b8[lVar78 * 7]);
                          dVar184 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar83 + lVar70 + lVar77 + lVar78 * 7]);
                          dVar387 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar92 + lVar70 + lVar52 + lVar78 * 7]);
                          dVar466 = ABS((double)p_Var4) /
                                    (dVar387 + dVar229 + dVar386 + dVar470 + 1e-100);
                          auVar267._8_4_ = SUB84(dVar386,0);
                          auVar267._0_8_ = dVar386;
                          auVar267._12_4_ = (int)((ulong)dVar386 >> 0x20);
                          auVar702._0_8_ =
                               ABS((double)local_a70._vptr_BaseFab
                                           [lVar92 + lVar93 + lVar77 + lVar78 * 4]);
                          auVar702._8_8_ = ABS((double)p_Var5);
                          auVar161._0_8_ = dVar386 + dVar229 + 1e-100;
                          auVar161._8_8_ = dVar386 + dVar470 + dVar512 + dVar184 + 1e-100;
                          auVar186 = divpd(auVar702,auVar161);
                          auVar162._8_4_ = SUB84(dVar470,0);
                          auVar162._0_8_ = dVar470;
                          auVar162._12_4_ = (int)((ulong)dVar470 >> 0x20);
                          auVar690._0_8_ =
                               ABS((double)local_a70._vptr_BaseFab
                                           [lVar83 + lVar70 + lVar77 + lVar78 * 5]);
                          auVar690._8_8_ =
                               ABS((double)local_a70._vptr_BaseFab
                                           [lVar92 + lVar70 + lVar77 + lVar78 * 4]);
                          auVar163._0_8_ = dVar470 + dVar184 + 1e-100;
                          auVar163._8_8_ = auVar162._8_8_ + dVar387 + 1e-100;
                          auVar343 = divpd(auVar690,auVar163);
                          uStack_cd0 = 0;
                          auVar691._0_8_ = ABS((double)p_Var6);
                          auVar691._8_8_ = ABS((double)local_14b8[lVar78 * 5]);
                          auVar268._0_8_ = dVar386 + dVar470 + 1e-100;
                          auVar268._8_8_ = auVar267._8_8_ + dVar512 + 1e-100;
                          auVar341 = divpd(auVar691,auVar268);
                          dVar515 = dVar470 * (double)local_a70._vptr_BaseFab
                                                      [lVar83 + lVar70 + lVar77 + lVar78 * 8] *
                                    (auVar343._8_8_ +
                                     ABS((double)local_a70._vptr_BaseFab
                                                 [lVar83 + lVar70 + lVar77 + lVar78]) /
                                     (ABS((double)local_a70._vptr_BaseFab
                                                  [lVar83 + lVar70 + lVar52 + lVar78 * 7]) + dVar387
                                      + dVar470 + dVar184 + 1e-100) + 1.0 + dVar466 + auVar186._8_8_
                                     + auVar343._0_8_ + auVar341._0_8_);
                          dVar556 = dVar386 * (double)local_a70._vptr_BaseFab
                                                      [lVar83 + lVar70 + lVar77 + lVar78 * 8] *
                                    (auVar341._8_8_ +
                                     ABS((double)local_14b8[lVar78]) /
                                     (ABS((double)local_a70._vptr_BaseFab
                                                  [lVar83 + lVar93 + lVar52 + lVar78 * 7]) + dVar229
                                      + dVar386 + dVar512 + 1e-100) + 1.0 + dVar466 + auVar186._8_8_
                                     + auVar186._0_8_ + auVar341._0_8_);
                          dVar123 = dStack_cc0 / dVar123;
                          dVar184 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar92 + lVar58 + lVar106 + lVar78 * 2]);
                          dVar184 = dVar184 / (ABS((double)local_a70._vptr_BaseFab
                                                           [lVar83 + lVar58 + lVar106 + lVar78 * 2])
                                              + dVar184);
                          uVar113 = -(ulong)((double)local_a70._vptr_BaseFab
                                                     [lVar83 + lVar58 + lVar106 + lVar78 * 2] == 0.0
                                            );
                          uVar114 = -(ulong)((double)local_a70._vptr_BaseFab
                                                     [lVar92 + lVar58 + lVar106 + lVar78 * 2] == 0.0
                                            );
                          dVar184 = (double)((uVar113 & 0x3fe0000000000000 |
                                             ~uVar113 & (ulong)dVar184) & uVar114 |
                                            ~uVar114 & (ulong)dVar184);
                          dVar472 = dStack_b40 / dVar472;
                          lVar80 = (long)iVar65;
                          local_c48 = local_a70._vptr_BaseFab + lVar92 + lVar80 + lVar77;
                          dVar466 = ABS((double)local_610[lVar80 + lVar102 + lVar78 * 4]);
                          dVar386 = ABS((double)local_9f8[lVar80 + lVar102 + lVar78 * 4]);
                          dVar470 = ABS((double)local_610[lVar80 + lVar102 + lVar78 * 2]) /
                                    (dVar337 + dVar466 + 1e-100);
                          dVar512 = ABS((double)local_9f8[lVar80 + lVar102 + lVar78 * 2]) /
                                    (dVar336 + dVar386 + 1e-100);
                          dVar387 = ABS((double)local_9f8[lVar80 + lVar102 + lVar78]) /
                                    (dVar466 + dVar386 + 1e-100) + 1.0;
                          dVar386 = (dVar387 + dVar512) * dVar386;
                          dVar513 = ABS((double)local_9f8[lVar57 + lVar102 + lVar78 * 2]);
                          dVar513 = dVar513 / (ABS((double)local_610[lVar57 + lVar102 + lVar78 * 2])
                                              + dVar513);
                          uVar113 = -(ulong)((double)local_9f8[lVar57 + lVar102 + lVar78 * 2] == 0.0
                                            );
                          uVar114 = -(ulong)((double)local_610[lVar57 + lVar102 + lVar78 * 2] == 0.0
                                            );
                          dVar229 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar104 + lVar102 + lVar78]);
                          dVar229 = dVar229 / (dVar385 + dVar229);
                          dVar385 = ABS((double)local_478[lVar58 + lVar102 + lVar78 * 7]);
                          auVar318._0_8_ =
                               (ulong)local_a70._vptr_BaseFab
                                      [lVar82 + lVar60 + lVar102 + lVar78 * 6] & 0x7fffffffffffffff;
                          auVar318._8_8_ =
                               (ulong)local_478[lVar58 + lVar102 + lVar78 * 5] & 0x7fffffffffffffff;
                          if (((double)p_Var7 == 0.0) && (!NAN((double)p_Var7))) {
                            uVar115 = -(ulong)((double)local_a70._vptr_BaseFab
                                                       [lVar82 + lVar104 + lVar102 + lVar78] == 0.0)
                            ;
                            dVar229 = (double)(uVar115 & 0x3fe0000000000000 |
                                              ~uVar115 & (ulong)dVar229);
                          }
                          dVar641 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar104 + lVar102 + lVar78 * 4]);
                          dVar685 = ABS((double)local_478[(long)iVar65 + lVar102 + lVar78 * 4]);
                          dVar582 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar104 + lVar102 + lVar78 * 2]) /
                                    (dVar579 + dVar641 + 1e-100);
                          dVar612 = ABS((double)local_478[(long)iVar65 + lVar102 + lVar78 * 2]) /
                                    (dVar581 + dVar685 + 1e-100);
                          dVar683 = ABS((double)local_478[(long)iVar65 + lVar102 + lVar78]) /
                                    (dVar641 + dVar685 + 1e-100) + 1.0;
                          dVar641 = (dVar582 + dVar683) * dVar641;
                          dVar557 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar57 + lVar102 + lVar78 * 2]);
                          dVar557 = dVar557 / (ABS((double)local_478[lVar57 + lVar102 + lVar78 * 2])
                                              + dVar557);
                          uVar115 = -(ulong)((double)local_478[lVar57 + lVar102 + lVar78 * 2] == 0.0
                                            );
                          uVar116 = -(ulong)((double)local_a70._vptr_BaseFab
                                                     [lVar82 + lVar57 + lVar102 + lVar78 * 2] == 0.0
                                            );
                          auVar537._0_8_ = ABS((double)local_9f8[lVar80 + lVar102 + lVar78 * 7]);
                          dVar681 = ABS((double)local_9f8[lVar80 + lVar77 + lVar78 * 7]);
                          auVar537._8_4_ = SUB84(auVar537._0_8_,0);
                          auVar537._12_4_ = (int)((ulong)auVar537._0_8_ >> 0x20);
                          dVar549 = ABS((double)local_610[lVar80 + lVar102 + lVar78 * 7]) +
                                    auVar537._8_8_;
                          auVar207._0_8_ =
                               (ulong)local_9f8[lVar80 + lVar102 + lVar78 * 6] & 0x7fffffffffffffff;
                          auVar207._8_8_ =
                               (ulong)local_9f8[lVar80 + lVar102 + lVar78 * 5] & 0x7fffffffffffffff;
                          auVar505._0_8_ = dVar552 + auVar537._0_8_ + 1e-100;
                          auVar505._8_8_ = dVar549 + 1e-100;
                          auVar343 = divpd(auVar207,auVar505);
                          auVar538._0_8_ =
                               (ulong)local_9f8[lVar57 + lVar77 + lVar78 * 2] & 0x7fffffffffffffff;
                          auVar538._8_8_ =
                               (ulong)local_610[lVar57 + lVar77 + lVar78 * 2] & 0x7fffffffffffffff;
                          dVar583 = ABS((double)local_9f8[lVar57 + lVar102 + lVar78 * 6]);
                          dVar616 = ABS((double)local_610[lVar57 + lVar102 + lVar78 * 6]);
                          dVar646 = ABS((double)local_9f8[lVar57 + lVar77 + lVar78 * 6]);
                          dVar664 = ABS((double)local_610[lVar57 + lVar77 + lVar78 * 6]);
                          auVar421._0_8_ = dVar583 + dVar646 + 1e-100;
                          auVar421._8_8_ = dVar616 + dVar664 + 1e-100;
                          auVar341 = divpd(auVar538,auVar421);
                          dVar684 = ABS((double)local_9f8[lVar57 + lVar102 + lVar78 * 3]) /
                                    (dVar616 + dVar583 + 1e-100);
                          dVar559 = ABS((double)local_9f8[lVar57 + lVar77 + lVar78 * 3]) /
                                    (dVar664 + dVar646 + 1e-100);
                          dVar558 = auVar341._0_8_ + 1.0;
                          dVar585 = auVar341._8_8_ + 1.0;
                          dVar583 = (dVar684 + dVar558) * dVar583;
                          dVar611 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar104 + lVar77 + lVar78 * 5]);
                          dVar617 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar104 + lVar102 + lVar78 * 5]);
                          auVar539._0_8_ =
                               (ulong)local_a70._vptr_BaseFab
                                      [lVar82 + lVar104 + lVar77 + lVar78 * 3] & 0x7fffffffffffffff;
                          auVar539._8_8_ =
                               (ulong)local_a70._vptr_BaseFab
                                      [lVar82 + lVar104 + lVar102 + lVar78 * 3] & 0x7fffffffffffffff
                          ;
                          auVar573._0_8_ = dVar615 + dVar611 + 1e-100;
                          auVar573._8_8_ = dVar554 + dVar617 + 1e-100;
                          auVar287 = divpd(auVar539,auVar573);
                          dVar695 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar104 + lVar77 + lVar78]) /
                                    (dVar617 + dVar611 + 1e-100) + 1.0;
                          dVar617 = (auVar287._8_8_ + dVar695) * dVar617;
                          dVar697 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar57 + lVar102 + lVar78 * 3]);
                          dVar697 = dVar697 / (ABS((double)local_a70._vptr_BaseFab
                                                           [lVar82 + lVar57 + lVar77 + lVar78 * 3])
                                              + dVar697);
                          uVar117 = -(ulong)((double)local_a70._vptr_BaseFab
                                                     [lVar82 + lVar57 + lVar77 + lVar78 * 3] == 0.0)
                          ;
                          uVar118 = -(ulong)((double)local_a70._vptr_BaseFab
                                                     [lVar82 + lVar57 + lVar102 + lVar78 * 3] == 0.0
                                            );
                          dVar642 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar58 + lVar102 + lVar78 * 7]);
                          auVar604._8_4_ = SUB84(dVar642,0);
                          auVar604._0_8_ = dVar642;
                          auVar604._12_4_ = (int)((ulong)dVar642 >> 0x20);
                          dVar662 = dVar642 + ABS((double)local_a70._vptr_BaseFab
                                                          [lVar82 + lVar60 + lVar102 + lVar78 * 7]);
                          dVar663 = auVar604._8_8_ + dVar385;
                          dVar645 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar58 + lVar77 + lVar78 * 7]);
                          auVar208._0_8_ =
                               (ulong)local_a70._vptr_BaseFab[lVar82 + lVar60 + lVar77 + lVar78 * 2]
                               & 0x7fffffffffffffff;
                          auVar208._8_8_ =
                               (ulong)local_478[lVar58 + lVar77 + lVar78] & 0x7fffffffffffffff;
                          auVar371._8_4_ = SUB84(dVar645,0);
                          auVar371._0_8_ = dVar645;
                          auVar371._12_4_ = (int)((ulong)dVar645 >> 0x20);
                          auVar372._0_8_ =
                               dVar645 + dVar662 +
                               ABS((double)local_a70._vptr_BaseFab
                                           [lVar82 + lVar60 + lVar77 + lVar78 * 7]) + 1e-100;
                          auVar372._8_8_ =
                               auVar371._8_8_ + dVar663 +
                               ABS((double)local_478[lVar58 + lVar77 + lVar78 * 7]) + 1e-100;
                          auVar341 = divpd(auVar208,auVar372);
                          auVar540._0_8_ =
                               (ulong)local_a70._vptr_BaseFab[lVar82 + lVar58 + lVar77 + lVar78 * 4]
                               & 0x7fffffffffffffff;
                          auVar540._8_8_ =
                               (ulong)local_478[lVar60 + lVar102 + lVar78 * 3] & 0x7fffffffffffffff;
                          auVar636._0_8_ = dVar642 + dVar645 + 1e-100;
                          auVar636._8_8_ =
                               dVar385 + dVar662 +
                               ABS((double)local_478[lVar60 + lVar102 + lVar78 * 7]) + 1e-100;
                          auVar290 = divpd(auVar540,auVar636);
                          auVar605._0_8_ = dVar662 + 1e-100;
                          auVar605._8_8_ = dVar663 + 1e-100;
                          auVar285 = divpd(auVar318,auVar605);
                          dVar647 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar104 + lVar102 + lVar78 * 7]);
                          auVar675._8_4_ = SUB84(dVar647,0);
                          auVar675._0_8_ = dVar647;
                          auVar675._12_4_ = (int)((ulong)dVar647 >> 0x20);
                          dVar663 = dVar647 + dVar642;
                          dVar680 = auVar675._8_8_ +
                                    ABS((double)local_478[(long)iVar65 + lVar102 + lVar78 * 7]);
                          dVar662 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar104 + lVar77 + lVar78 * 7]);
                          auVar637._0_8_ =
                               (ulong)local_a70._vptr_BaseFab
                                      [lVar82 + lVar104 + lVar77 + lVar78 * 2] & 0x7fffffffffffffff;
                          auVar637._8_8_ =
                               (ulong)local_478[(long)iVar65 + lVar77 + lVar78] & 0x7fffffffffffffff
                          ;
                          auVar506._0_8_ = dVar645 + dVar663 + dVar662 + 1e-100;
                          auVar506._8_8_ =
                               dVar662 + dVar680 +
                               ABS((double)local_478[(long)iVar65 + lVar77 + lVar78 * 7]) + 1e-100;
                          auVar404 = divpd(auVar637,auVar506);
                          auVar209._0_8_ =
                               (ulong)local_a70._vptr_BaseFab
                                      [lVar82 + lVar104 + lVar77 + lVar78 * 4] & 0x7fffffffffffffff;
                          auVar209._8_8_ =
                               (ulong)local_478[(long)iVar65 + lVar102 + lVar78 * 3] &
                               0x7fffffffffffffff;
                          auVar606._0_8_ = dVar662 + dVar647 + 1e-100;
                          auVar606._8_8_ =
                               dVar385 + dVar663 +
                               ABS((double)local_478[(long)iVar65 + lVar102 + lVar78 * 7]) + 1e-100;
                          auVar186 = divpd(auVar209,auVar606);
                          auVar574._0_8_ =
                               (ulong)local_a70._vptr_BaseFab
                                      [lVar82 + lVar104 + lVar102 + lVar78 * 6] & 0x7fffffffffffffff
                          ;
                          auVar574._8_8_ =
                               (ulong)local_478[(long)iVar65 + lVar102 + lVar78 * 5] &
                               0x7fffffffffffffff;
                          auVar676._0_8_ = dVar663 + 1e-100;
                          auVar676._8_8_ = dVar680 + 1e-100;
                          auVar354 = divpd(auVar574,auVar676);
                          auVar269._0_8_ =
                               (ulong)local_478[lVar57 + lVar77 + lVar78 * 2] & 0x7fffffffffffffff;
                          auVar269._8_8_ =
                               (ulong)local_a70._vptr_BaseFab[lVar82 + lVar57 + lVar77 + lVar78 * 2]
                               & 0x7fffffffffffffff;
                          dVar584 = ABS((double)local_478[lVar57 + lVar102 + lVar78 * 6]);
                          dVar680 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar57 + lVar102 + lVar78 * 6]);
                          dVar548 = ABS((double)local_478[lVar57 + lVar77 + lVar78 * 6]);
                          dVar660 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar57 + lVar77 + lVar78 * 6]);
                          auVar210._0_8_ = dVar584 + dVar548 + 1e-100;
                          auVar210._8_8_ = dVar680 + dVar660 + 1e-100;
                          auVar230 = divpd(auVar269,auVar210);
                          dVar663 = ABS((double)local_478[lVar57 + lVar102 + lVar78 * 3]) /
                                    (dVar680 + dVar584 + 1e-100);
                          dVar385 = ABS((double)local_478[lVar57 + lVar77 + lVar78 * 3]) /
                                    (dVar660 + dVar548 + 1e-100);
                          dVar645 = auVar230._0_8_ + 1.0;
                          dVar662 = auVar230._8_8_ + 1.0;
                          dVar680 = (dVar663 + dVar662) * dVar680;
                          *(double *)(local_260 + (long)local_cb8 * 8) =
                               (((dVar680 /
                                 ((dVar385 + dVar662) * dVar660 +
                                  (dVar663 + dVar645) * dVar584 + dVar680 +
                                  (dVar385 + dVar645) * dVar548 + 1e-100)) *
                                 (dVar472 * (double)local_a70._vptr_BaseFab
                                                    [lVar83 + lVar104 + lVar77 + lVar78 * 5] +
                                 dVar183 * (double)local_c48[lVar78 * 7] +
                                 dVar122 * (double)local_c48[lVar78 * 4] +
                                 dVar556 * (double)local_a70._vptr_BaseFab
                                                   [lVar83 + lVar104 + lVar77 + lVar78]) +
                                (double)local_478[(long)iVar65 + lVar77 + lVar78 * 8] * dVar647 *
                                (auVar354._8_8_ +
                                 auVar186._8_8_ + auVar404._8_8_ + 1.0 + auVar404._0_8_ +
                                 auVar186._0_8_ + auVar354._0_8_) *
                                ((double)p_Var5 * dVar472 +
                                dVar184 * (double)local_14b8[lVar78 * 5] +
                                (double)p_Var6 * dVar183 +
                                (double)local_a70._vptr_BaseFab[lVar83 + lVar70 + lVar77] * dVar556
                                + dVar473 * (double)local_14b8[lVar78] +
                                  dVar332 * (double)local_a70._vptr_BaseFab
                                                    [lVar92 + lVar93 + lVar77 + lVar78 * 4] +
                                  (double)p_Var4 * dVar122 +
                                (double)local_a70._vptr_BaseFab
                                        [lVar92 + lVar93 + lVar77 + lVar78 * 7]) +
                                (double)((uVar117 & 0x3fe0000000000000 | ~uVar117 & (ulong)dVar697)
                                         & uVar118 | ~uVar118 & (ulong)dVar697) *
                                ((double)local_a70._vptr_BaseFab
                                         [lVar82 + lVar104 + lVar77 + lVar78 * 7] * dVar472 +
                                (double)local_a70._vptr_BaseFab
                                        [lVar82 + lVar104 + lVar77 + lVar78 * 5] * dVar183 +
                                dVar123 * (double)local_9f8[lVar80 + lVar77 + lVar78 * 7] +
                                (double)local_a70._vptr_BaseFab
                                        [lVar82 + lVar104 + lVar77 + lVar78 * 4] * dVar556 +
                                dVar281 * (double)local_9f8[lVar80 + lVar77 + lVar78 * 4] +
                                (double)local_a70._vptr_BaseFab[lVar82 + lVar104 + lVar77 + lVar78]
                                * dVar122) +
                                (dVar617 /
                                ((dVar514 + auVar287._8_8_) * dVar554 + dVar617 +
                                 (dVar514 + auVar287._0_8_) * dVar615 +
                                 (dVar695 + auVar287._0_8_) * dVar611 + 1e-100)) *
                                ((double)local_a70._vptr_BaseFab
                                         [lVar82 + lVar70 + lVar77 + lVar78 * 6] * dVar472 +
                                (double)local_a70._vptr_BaseFab
                                        [lVar82 + lVar93 + lVar77 + lVar78 * 7] * dVar184 +
                                (double)local_a70._vptr_BaseFab
                                        [lVar82 + lVar70 + lVar77 + lVar78 * 3] * dVar183 +
                                (double)local_9f8[lVar70 + lVar77 + lVar78 * 6] * dVar123 +
                                (double)local_9f8[lVar93 + lVar77 + lVar78 * 7] * dVar430 +
                                (double)local_a70._vptr_BaseFab
                                        [lVar82 + lVar70 + lVar77 + lVar78 * 2] * dVar556 +
                                (double)local_a70._vptr_BaseFab
                                        [lVar82 + lVar93 + lVar77 + lVar78 * 4] * dVar473 +
                                (double)local_a70._vptr_BaseFab[lVar82 + lVar70 + lVar77] * dVar122
                                + (double)local_a70._vptr_BaseFab[lVar82 + lVar93 + lVar77 + lVar78]
                                  * dVar332 +
                                  dVar471 * (double)local_9f8[lVar93 + lVar77 + lVar78 * 4] +
                                  (double)local_9f8[lVar70 + lVar77 + lVar78 * 2] * dVar281 +
                                (double)local_a70._vptr_BaseFab
                                        [lVar82 + lVar93 + lVar77 + lVar78 * 5]) +
                                (dVar583 /
                                ((dVar559 + dVar585) * dVar664 +
                                 (dVar585 + dVar684) * dVar616 + dVar583 +
                                 (dVar559 + dVar558) * dVar646 + 1e-100)) *
                                ((double)local_a70._vptr_BaseFab
                                         [lVar79 + lVar80 + lVar77 + lVar78 * 7] * dVar183 +
                                (double)local_a70._vptr_BaseFab
                                        [lVar79 + lVar80 + lVar77 + lVar78 * 5] * dVar123 +
                                (double)local_a70._vptr_BaseFab[lVar79 + lVar80 + lVar77 + lVar78] *
                                dVar281 + (double)local_a70._vptr_BaseFab
                                                  [lVar79 + lVar80 + lVar77 + lVar78 * 4] * dVar122)
                                + (double)local_9f8[lVar80 + lVar77 + lVar78 * 8] * auVar537._0_8_ *
                                  (auVar343._8_8_ +
                                   ABS((double)local_9f8[lVar80 + lVar77 + lVar78 * 2]) /
                                   (dVar580 + dVar552 + auVar537._0_8_ + dVar681 + 1e-100) +
                                   ABS((double)local_9f8[lVar80 + lVar77 + lVar78]) /
                                   (dVar549 + ABS((double)local_610[lVar80 + lVar77 + lVar78 * 7]) +
                                    dVar681 + 1e-100) + 1.0 +
                                   ABS((double)local_9f8[lVar80 + lVar102 + lVar78 * 3]) /
                                   (dVar553 + ABS((double)local_610[lVar80 + lVar102 + lVar78 * 7])
                                    + dVar552 + auVar537._0_8_ + 1e-100) +
                                   ABS((double)local_9f8[lVar80 + lVar77 + lVar78 * 4]) /
                                   (auVar537._0_8_ + dVar681 + 1e-100) + auVar343._0_8_) *
                                  ((double)p_Var100 * dVar183 +
                                  (double)p_Var97 * dVar123 +
                                  dVar430 * (double)local_a70._vptr_BaseFab
                                                    [lVar79 + lVar93 + lVar77 + lVar78 * 5] +
                                  (double)p_Var54 * dVar122 +
                                  (double)local_a70._vptr_BaseFab
                                          [lVar79 + lVar93 + lVar77 + lVar78 * 4] * dVar332 +
                                  (double)local_a70._vptr_BaseFab[lVar79 + lVar93 + lVar77 + lVar78]
                                  * dVar471 +
                                  (double)local_a70._vptr_BaseFab[lVar79 + lVar70 + lVar77] *
                                  dVar281 + (double)local_a70._vptr_BaseFab
                                                    [lVar79 + lVar93 + lVar77 + lVar78 * 7]) +
                                  (double)((uVar115 & 0x3fe0000000000000 | ~uVar115 & (ulong)dVar557
                                           ) & uVar116 | ~uVar116 & (ulong)dVar557) *
                                  ((double)local_a70._vptr_BaseFab
                                           [lVar92 + lVar80 + lVar102 + lVar78 * 7] * dVar122 +
                                  (double)local_a70._vptr_BaseFab
                                          [lVar83 + lVar104 + lVar102 + lVar78 * 5] * dVar556) +
                                  (dVar641 /
                                  ((dVar555 + dVar582) * dVar579 + dVar641 +
                                   (dVar555 + dVar612) * dVar581 + (dVar683 + dVar612) * dVar685 +
                                  1e-100)) *
                                  ((double)local_a70._vptr_BaseFab
                                           [lVar83 + lVar70 + lVar102 + lVar78 * 3] * dVar556 +
                                  (double)local_a70._vptr_BaseFab
                                          [lVar83 + lVar93 + lVar102 + lVar78 * 5] * dVar473 +
                                  (double)local_858[lVar78 * 7] * dVar332 +
                                  (double)local_a70._vptr_BaseFab
                                          [lVar92 + lVar70 + lVar102 + lVar78 * 6] * dVar122) +
                                  (double)local_a70._vptr_BaseFab
                                          [lVar82 + lVar104 + lVar102 + lVar78 * 7] * dVar556 +
                                  (double)local_9f8[lVar80 + lVar102 + lVar78 * 7] * dVar281 +
                                  (double)local_a70._vptr_BaseFab
                                          [lVar82 + lVar104 + lVar102 + lVar78 * 5] * dVar122 +
                                  dVar229 * ((double)local_a70._vptr_BaseFab
                                                     [lVar82 + lVar70 + lVar102 + lVar78 * 6] *
                                             dVar556 +
                                            (double)local_9e8[lVar78 * 7] * dVar473 +
                                            (double)local_a70._vptr_BaseFab
                                                    [lVar82 + lVar70 + lVar102 + lVar78 * 3] *
                                            dVar122 + (double)local_9e8[lVar78 * 5] * dVar332 +
                                                      (double)local_9f8[lVar93 + lVar102 + lVar78 * 
                                                  7] * dVar471 +
                                                  (double)local_9f8[lVar70 + lVar102 + lVar78 * 6] *
                                                  dVar281) +
                                  (double)((uVar113 & 0x3fe0000000000000 | ~uVar113 & (ulong)dVar513
                                           ) & uVar114 | ~uVar114 & (ulong)dVar513) *
                                  ((double)local_a70._vptr_BaseFab
                                           [lVar79 + lVar80 + lVar102 + lVar78 * 5] * dVar281 +
                                  (double)local_a70._vptr_BaseFab
                                          [lVar79 + lVar80 + lVar102 + lVar78 * 7] * dVar122) +
                                  (dVar386 /
                                  ((dVar578 + dVar512) * dVar336 +
                                   (dVar470 + dVar387) * dVar466 + (dVar578 + dVar470) * dVar337 +
                                   dVar386 + 1e-100)) *
                                  ((double)local_a70._vptr_BaseFab
                                           [lVar79 + lVar70 + lVar102 + lVar78 * 6] * dVar122 +
                                  (double)local_a70._vptr_BaseFab
                                          [lVar79 + lVar93 + lVar102 + lVar78 * 7] * dVar332 +
                                  (double)local_a70._vptr_BaseFab
                                          [lVar79 + lVar93 + lVar102 + lVar78 * 5] * dVar471 +
                                  (double)local_a70._vptr_BaseFab
                                          [lVar79 + lVar70 + lVar102 + lVar78 * 3] * dVar281)) *
                                0.125 + ((double)local_478[lVar60 + lVar77 + lVar78 * 8] * dVar642 *
                                         (auVar285._8_8_ +
                                          auVar290._8_8_ + auVar341._8_8_ + 1.0 + auVar341._0_8_ +
                                          auVar290._0_8_ + auVar285._0_8_) *
                                         (dVar120 * (double)local_a70._vptr_BaseFab
                                                            [lVar83 + lVar70 + lVar77 + lVar78 * 5]
                                         + (double)local_a70._vptr_BaseFab
                                                   [lVar83 + lVar70 + lVar77 + lVar78] * dVar124 +
                                           (double)local_a70._vptr_BaseFab[lVar83 + lVar70 + lVar77]
                                           * dVar515 +
                                           (double)p_Var4 * dVar339 +
                                           dVar469 * (double)local_a70._vptr_BaseFab
                                                             [lVar92 + lVar70 + lVar77 + lVar78 * 4]
                                           + (double)p_Var6 * dVar334 +
                                           (double)local_a70._vptr_BaseFab
                                                   [lVar92 + lVar70 + lVar77 + lVar78 * 7] +
                                           (double)p_Var5 * dVar433) +
                                        ((double)local_a70._vptr_BaseFab
                                                 [lVar82 + lVar58 + lVar77 + lVar78 * 7] * dVar433 +
                                        (double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar58 + lVar77 + lVar78 * 5] * dVar334 +
                                        dVar335 * (double)local_9f8[lVar58 + lVar77 + lVar78 * 7] +
                                        (double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar58 + lVar77 + lVar78 * 4] * dVar515 +
                                        (double)local_9f8[lVar58 + lVar77 + lVar78 * 4] * dVar427 +
                                        (double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar58 + lVar77 + lVar78] * dVar339) *
                                        local_988 +
                                        ((double)local_de8[lVar78 * 7] * dVar339 +
                                        (double)local_a70._vptr_BaseFab
                                                [lVar83 + lVar58 + lVar102 + lVar78 * 5] * dVar515)
                                        * (double)((uVar111 & 0x3fe0000000000000 |
                                                   ~uVar111 & (ulong)dVar467) & uVar112 |
                                                  ~uVar112 & (ulong)dVar467) +
                                        ((double)local_a70._vptr_BaseFab
                                                 [lVar82 + lVar70 + lVar102 + lVar78 * 7] * dVar124
                                        + (double)local_a70._vptr_BaseFab
                                                  [lVar82 + lVar70 + lVar102 + lVar78 * 6] * dVar515
                                          + (double)local_a70._vptr_BaseFab
                                                    [lVar82 + lVar70 + lVar102 + lVar78 * 5] *
                                            dVar469 + (double)local_a70._vptr_BaseFab
                                                              [lVar82 + lVar70 + lVar102 + lVar78 * 
                                                  3] * dVar339 +
                                                  (double)local_9f8[lVar70 + lVar102 + lVar78 * 6] *
                                                  dVar427 + (double)local_9f8[lVar70 + lVar102 + 
                                                  lVar78 * 7] * dVar331) * local_1408 +
                                        (double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar58 + lVar102 + lVar78 * 7] * dVar515 +
                                        (double)local_9f8[lVar58 + lVar102 + lVar78 * 7] * dVar427 +
                                        (double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar58 + lVar102 + lVar78 * 5] * dVar339 +
                                        (double)((uVar333 & 0x3fe0000000000000 |
                                                 ~uVar333 & (ulong)dVar429) & uVar107 |
                                                ~uVar107 & (ulong)dVar429) *
                                        ((double)local_a70._vptr_BaseFab
                                                 [lVar79 + lVar58 + lVar102 + lVar78 * 5] * dVar427
                                        + (double)local_a70._vptr_BaseFab
                                                  [lVar79 + lVar58 + lVar102 + lVar78 * 7] * dVar339
                                        ) + (dVar121 /
                                            ((dVar432 + dVar338) * dVar431 +
                                             (dVar578 + dVar432) * dVar337 + dVar121 +
                                             (dVar338 + dVar388) * dVar384 + 1e-100)) *
                                            ((double)local_a70._vptr_BaseFab
                                                     [lVar79 + lVar70 + lVar102 + lVar78 * 7] *
                                             dVar469 +
                                            (double)local_a70._vptr_BaseFab
                                                    [lVar79 + lVar70 + lVar102 + lVar78 * 6] *
                                            dVar339 + (double)local_a70._vptr_BaseFab
                                                              [lVar79 + lVar70 + lVar102 + lVar78 * 
                                                  3] * dVar427 +
                                                  (double)local_a70._vptr_BaseFab
                                                          [lVar79 + lVar70 + lVar102 + lVar78 * 5] *
                                                  dVar331) +
                                        ((double)local_a70._vptr_BaseFab
                                                 [lVar83 + lVar70 + lVar102 + lVar78 * 5] * dVar124
                                        + (double)local_a70._vptr_BaseFab
                                                  [lVar83 + lVar70 + lVar102 + lVar78 * 3] * dVar515
                                          + (double)local_a70._vptr_BaseFab
                                                    [lVar92 + lVar70 + lVar102 + lVar78 * 6] *
                                            dVar339 + (double)local_a70._vptr_BaseFab
                                                              [lVar92 + lVar70 + lVar102 + lVar78 * 
                                                  7] * dVar469) * local_cf8 +
                                        (double)local_d08._0_8_ + local_b58 +
                                        ((double)local_a70._vptr_BaseFab
                                                 [lVar82 + lVar70 + lVar77 + lVar78 * 7] * dVar120 +
                                        (double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar70 + lVar77 + lVar78 * 6] * dVar433 +
                                        (double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar70 + lVar77 + lVar78 * 3] * dVar334 +
                                        dVar550 * (double)local_9f8[lVar70 + lVar77 + lVar78 * 7] +
                                        (double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar70 + lVar77 + lVar78 * 4] * dVar124 +
                                        (double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar70 + lVar77 + lVar78 * 2] * dVar515 +
                                        (double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar70 + lVar77 + lVar78] * dVar469 +
                                        (double)local_a70._vptr_BaseFab[lVar82 + lVar70 + lVar77] *
                                        dVar339 + dVar427 * (double)local_9f8[lVar70 + lVar77 + 
                                                  lVar78 * 2] +
                                                  dVar331 * (double)local_9f8[lVar70 + lVar77 + 
                                                  lVar78 * 4] +
                                        (double)local_9f8[lVar70 + lVar77 + lVar78 * 6] * dVar335 +
                                        (double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar70 + lVar77 + lVar78 * 5]) * local_738
                                        + (dVar433 * (double)local_a70._vptr_BaseFab
                                                             [lVar83 + lVar58 + lVar77 + lVar78 * 5]
                                          + dVar334 * (double)local_a70._vptr_BaseFab
                                                              [lVar92 + lVar58 + lVar77 + lVar78 * 7
                                                              ] +
                                            dVar339 * (double)local_a70._vptr_BaseFab
                                                              [lVar92 + lVar58 + lVar77 + lVar78 * 4
                                                              ] +
                                            dVar515 * (double)local_a70._vptr_BaseFab
                                                              [lVar83 + lVar58 + lVar77 + lVar78]) *
                                          local_748) * 0.125) * 0.5;
                          auVar541._0_8_ =
                               (ulong)local_a70._vptr_BaseFab[lVar83 + lVar58 + lVar77 + lVar78 * 2]
                               & 0x7fffffffffffffff;
                          auVar541._8_8_ =
                               (ulong)local_a70._vptr_BaseFab[lVar92 + lVar58 + lVar77 + lVar78 * 2]
                               & 0x7fffffffffffffff;
                          dVar427 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar83 + lVar58 + lVar52 + lVar78 * 6]);
                          dVar433 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar92 + lVar58 + lVar52 + lVar78 * 6]);
                          dVar338 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar83 + lVar58 + lVar77 + lVar78 * 6]);
                          dStack_710 = ABS((double)local_a70._vptr_BaseFab
                                                   [lVar92 + lVar58 + lVar77 + lVar78 * 6]);
                          auVar638._0_8_ = dVar427 + dVar338 + 1e-100;
                          auVar638._8_8_ = dVar433 + dStack_710 + 1e-100;
                          auVar343 = divpd(auVar541,auVar638);
                          dVar122 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar83 + lVar58 + lVar52 + lVar78 * 3]) /
                                    (dVar433 + dVar427 + 1e-100);
                          dVar469 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar83 + lVar58 + lVar77 + lVar78 * 3]) /
                                    (dStack_710 + dVar338 + 1e-100);
                          dVar336 = auVar343._0_8_ + 1.0;
                          dVar388 = auVar343._8_8_ + 1.0;
                          dVar338 = (dVar469 + dVar336) * dVar338;
                          dStack_710 = (dVar469 + dVar388) * dStack_710;
                          dVar120 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar89 + lVar99 + lVar52 + lVar78 * 5]);
                          dVar334 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar89 + lVar99 + lVar77 + lVar78 * 5]);
                          dVar183 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar89 + lVar71 + lVar52 + lVar78 * 5]);
                          dVar229 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar89 + lVar71 + lVar77 + lVar78 * 5]);
                          dVar332 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar89 + lVar71 + lVar52 + lVar78 * 3]) /
                                    (dVar120 + dVar183 + 1e-100);
                          dVar473 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar89 + lVar71 + lVar77 + lVar78 * 3]) /
                                    (dVar334 + dVar229 + 1e-100);
                          dVar469 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar89 + lVar99 + lVar77 + lVar78]) /
                                    (dVar120 + dVar334 + 1e-100) + 1.0;
                          dVar430 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar89 + lVar71 + lVar77 + lVar78]) /
                                    (dVar183 + dVar229 + 1e-100) + 1.0;
                          dVar229 = (dVar430 + dVar473) * dVar229;
                          dVar384 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar89 + lVar58 + lVar77 + lVar78 * 3]);
                          dVar384 = dVar384 / (ABS((double)local_a70._vptr_BaseFab
                                                           [lVar89 + lVar58 + lVar52 + lVar78 * 3])
                                              + dVar384);
                          uVar107 = -(ulong)((double)local_a70._vptr_BaseFab
                                                     [lVar89 + lVar58 + lVar52 + lVar78 * 3] == 0.0)
                          ;
                          uVar333 = -(ulong)((double)local_a70._vptr_BaseFab
                                                     [lVar89 + lVar58 + lVar77 + lVar78 * 3] == 0.0)
                          ;
                          auVar459._0_8_ =
                               (ulong)local_a70._vptr_BaseFab[lVar89 + lVar70 + lVar77 + lVar78] &
                               0x7fffffffffffffff;
                          auVar459._8_8_ =
                               (ulong)local_a70._vptr_BaseFab[lVar89 + lVar93 + lVar77 + lVar78] &
                               0x7fffffffffffffff;
                          dVar121 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar89 + lVar70 + lVar52 + lVar78 * 5]);
                          dVar123 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar89 + lVar93 + lVar52 + lVar78 * 5]);
                          dVar387 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar89 + lVar70 + lVar77 + lVar78 * 5]);
                          dVar339 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar89 + lVar93 + lVar77 + lVar78 * 5]);
                          auVar373._0_8_ = dVar121 + dVar387 + 1e-100;
                          auVar373._8_8_ = dVar123 + dVar339 + 1e-100;
                          auVar343 = divpd(auVar459,auVar373);
                          dVar184 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar89 + lVar70 + lVar52 + lVar78 * 3]) /
                                    (dVar123 + dVar121 + 1e-100);
                          dVar281 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar89 + lVar70 + lVar77 + lVar78 * 3]) /
                                    (dVar339 + dVar387 + 1e-100);
                          dVar331 = auVar343._0_8_ + 1.0;
                          dVar335 = auVar343._8_8_ + 1.0;
                          dVar431 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar92 + lVar71 + lVar52 + lVar78 * 7]);
                          dVar339 = (dVar281 + dVar335) * dVar339;
                          auVar270._0_8_ =
                               (ulong)local_a70._vptr_BaseFab[lVar83 + lVar71 + lVar106 + lVar78] &
                               0x7fffffffffffffff;
                          auVar270._8_8_ =
                               (ulong)local_a70._vptr_BaseFab[lVar83 + lVar99 + lVar106 + lVar78] &
                               0x7fffffffffffffff;
                          dVar429 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar92 + lVar71 + lVar106 + lVar78 * 4]);
                          dVar386 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar92 + lVar99 + lVar106 + lVar78 * 4]);
                          dVar385 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar83 + lVar71 + lVar106 + lVar78 * 4]);
                          dVar578 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar83 + lVar99 + lVar106 + lVar78 * 4]);
                          auVar422._0_8_ = dVar429 + dVar385 + 1e-100;
                          auVar422._8_8_ = dVar386 + dVar578 + 1e-100;
                          auVar343 = divpd(auVar270,auVar422);
                          dVar472 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar92 + lVar71 + lVar106 + lVar78 * 2]) /
                                    (dVar386 + dVar429 + 1e-100);
                          dVar337 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar83 + lVar71 + lVar106 + lVar78 * 2]) /
                                    (dVar578 + dVar385 + 1e-100);
                          dVar550 = auVar343._0_8_ + 1.0;
                          dVar124 = auVar343._8_8_ + 1.0;
                          dVar429 = (dVar472 + dVar550) * dVar429;
                          dVar385 = (dVar337 + dVar550) * dVar385;
                          uStack_b10 = 0;
                          p_Var54 = local_a70._vptr_BaseFab[lVar92 + lVar58 + lVar106 + lVar78 * 2];
                          p_Var97 = local_a70._vptr_BaseFab[lVar83 + lVar58 + lVar106 + lVar78 * 2];
                          local_958 = ABS((double)local_a70._vptr_BaseFab
                                                  [lVar83 + lVar71 + lVar52 + lVar78 * 7]);
                          dVar550 = (dVar122 + dVar388) * dVar433 + (dVar122 + dVar336) * dVar427 +
                                    dStack_710 + dVar338 + 1e-100;
                          dVar338 = dVar338 / dVar550;
                          dVar336 = ABS((double)p_Var54) + ABS((double)p_Var97);
                          p_Var100 = local_a70._vptr_BaseFab[lVar83 + lVar71 + lVar77 + lVar78];
                          p_Var2 = local_a70._vptr_BaseFab[lVar83 + lVar71 + lVar77 + lVar78 * 3];
                          p_Var3 = local_a70._vptr_BaseFab[lVar83 + lVar71 + lVar77 + lVar78 * 5];
                          p_Var4 = local_14b8[lVar78];
                          uStack_bf0 = 0;
                          p_Var5 = local_a70._vptr_BaseFab[lVar83 + lVar70 + lVar77 + lVar78 * 3];
                          uStack_c10 = 0;
                          p_Var6 = local_14b8[lVar78 * 5];
                          dVar122 = 0.5;
                          if ((double)p_Var97 != 0.0 || (double)p_Var54 != 0.0) {
                            dVar122 = ABS((double)p_Var97) / dVar336;
                          }
                          dVar388 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar92 + lVar71 + lVar77 + lVar78 * 7]);
                          uStack_950 = 0;
                          dVar433 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar83 + lVar99 + lVar77 + lVar78 * 7]);
                          uStack_d40 = 0;
                          dVar427 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar83 + lVar93 + lVar52 + lVar78 * 7]);
                          dVar384 = (double)(~uVar107 & (ulong)dVar384 |
                                            (uVar333 & 0x3fe0000000000000 |
                                            ~uVar333 & (ulong)dVar384) & uVar107);
                          dVar124 = (dVar337 + dVar124) * dVar578 +
                                    (dVar124 + dVar472) * dVar386 + dVar429 + dVar385 + 1e-100;
                          local_b48 = (double)local_a70._vptr_BaseFab
                                              [lVar82 + lVar58 + lVar102 + lVar78 * 6] * dVar338;
                          lVar81 = (long)(iVar74 - local_a70.domain.smallend.vect[2]);
                          local_4b8 = local_a70._vptr_BaseFab + lVar82 + lVar81 + lVar102;
                          lVar60 = (long)(iVar63 - local_a70.domain.smallend.vect[2]);
                          local_8a8 = local_a70._vptr_BaseFab + lVar82 + lVar60 + lVar102;
                          local_8e8 = local_618 + lVar58 + lVar102;
                          p_Var7 = local_a70._vptr_BaseFab[lVar82 + lVar58 + lVar102 + lVar78 * 2];
                          dVar578 = 0.5;
                          if ((double)p_Var97 != 0.0 || (double)p_Var54 != 0.0) {
                            dVar578 = ABS((double)p_Var54) / dVar336;
                          }
                          dVar229 = dVar229 / ((dVar469 + dVar473) * dVar334 +
                                               (dVar332 + dVar430) * dVar183 +
                                               (dVar469 + dVar332) * dVar120 + dVar229 + 1e-100);
                          local_728 = ABS((double)local_a70._vptr_BaseFab
                                                  [lVar83 + lVar71 + lVar77 + lVar78 * 2]);
                          uStack_720 = 0;
                          dVar339 = dVar339 / ((dVar184 + dVar331) * dVar121 +
                                               (dVar335 + dVar184) * dVar123 + dVar339 +
                                               (dVar281 + dVar331) * dVar387 + 1e-100);
                          auVar703._0_8_ =
                               (ulong)local_a70._vptr_BaseFab[lVar83 + lVar70 + lVar106 + lVar78] &
                               0x7fffffffffffffff;
                          auVar703._8_8_ =
                               (ulong)local_a70._vptr_BaseFab[lVar83 + lVar93 + lVar106 + lVar78] &
                               0x7fffffffffffffff;
                          dVar123 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar92 + lVar70 + lVar106 + lVar78 * 4]);
                          dVar120 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar92 + lVar93 + lVar106 + lVar78 * 4]);
                          dVar386 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar83 + lVar70 + lVar106 + lVar78 * 4]);
                          dVar472 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar83 + lVar93 + lVar106 + lVar78 * 4]);
                          auVar319._0_8_ = dVar123 + dVar386 + 1e-100;
                          auVar319._8_8_ = dVar120 + dVar472 + 1e-100;
                          auVar343 = divpd(auVar703,auVar319);
                          dVar334 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar92 + lVar70 + lVar106 + lVar78 * 2]) /
                                    (dVar120 + dVar123 + 1e-100);
                          dVar430 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar83 + lVar70 + lVar106 + lVar78 * 2]) /
                                    (dVar472 + dVar386 + 1e-100);
                          dVar432 = auVar343._0_8_ + 1.0;
                          dVar469 = auVar343._8_8_ + 1.0;
                          dVar120 = (dVar334 + dVar469) * dVar120;
                          dVar472 = (dVar430 + dVar469) * dVar472;
                          dVar469 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar89 + lVar71 + lVar106 + lVar78]);
                          dVar469 = dVar469 / (ABS((double)local_a70._vptr_BaseFab
                                                           [lVar89 + lVar99 + lVar106 + lVar78]) +
                                              dVar469);
                          uVar107 = -(ulong)((double)local_a70._vptr_BaseFab
                                                     [lVar89 + lVar99 + lVar106 + lVar78] == 0.0);
                          uVar333 = -(ulong)((double)local_a70._vptr_BaseFab
                                                     [lVar89 + lVar71 + lVar106 + lVar78] == 0.0);
                          dVar466 = (double)((uVar333 & 0x3fe0000000000000 |
                                             ~uVar333 & (ulong)dVar469) & uVar107 |
                                            ~uVar107 & (ulong)dVar469);
                          dVar469 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar89 + lVar93 + lVar106 + lVar78]);
                          dVar469 = dVar469 / (ABS((double)local_a70._vptr_BaseFab
                                                           [lVar89 + lVar70 + lVar106 + lVar78]) +
                                              dVar469);
                          uVar107 = -(ulong)((double)local_a70._vptr_BaseFab
                                                     [lVar89 + lVar93 + lVar106 + lVar78] == 0.0);
                          uVar333 = -(ulong)((double)local_a70._vptr_BaseFab
                                                     [lVar89 + lVar70 + lVar106 + lVar78] == 0.0);
                          local_6e8 = ABS((double)local_a70._vptr_BaseFab
                                                  [lVar83 + lVar71 + lVar77 + lVar78 * 4]);
                          uStack_6e0 = 0;
                          dVar469 = (double)((uVar333 & 0x3fe0000000000000 |
                                             ~uVar333 & (ulong)dVar469) & uVar107 |
                                            ~uVar107 & (ulong)dVar469);
                          dVar332 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar59 + lVar102 + lVar78]);
                          dVar332 = dVar332 / (ABS((double)local_4b8[lVar78]) + dVar332);
                          uVar107 = -(ulong)((double)local_4b8[lVar78] == 0.0);
                          uVar333 = -(ulong)((double)local_a70._vptr_BaseFab
                                                     [lVar82 + lVar59 + lVar102 + lVar78] == 0.0);
                          local_908 = ABS((double)local_a70._vptr_BaseFab
                                                  [lVar83 + lVar71 + lVar77 + lVar78 * 6]);
                          uStack_900 = 0;
                          dVar183 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar58 + lVar102 + lVar78]);
                          dVar183 = dVar183 / (ABS((double)local_8a8[lVar78]) + dVar183);
                          uVar111 = -(ulong)((double)local_a70._vptr_BaseFab
                                                     [lVar82 + lVar58 + lVar102 + lVar78] == 0.0);
                          uVar112 = -(ulong)((double)local_8a8[lVar78] == 0.0);
                          dVar184 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar92 + lVar93 + lVar77 + lVar78 * 7]);
                          local_8c8._0_8_ =
                               ABS((double)local_a70._vptr_BaseFab
                                           [lVar83 + lVar70 + lVar77 + lVar78 * 2]);
                          local_8c8._8_8_ = 0;
                          local_8b8 = ABS((double)local_14b8[lVar78 * 4]);
                          uStack_8b0 = 0;
                          dVar387 = ABS((double)local_4b8[lVar78 * 4]);
                          dVar121 = ABS((double)local_290[lVar81 + lVar78 * 4]);
                          dVar331 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar59 + lVar102 + lVar78 * 4]);
                          dVar281 = ABS((double)local_618[lVar59 + lVar102 + lVar78 * 4]);
                          dVar473 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar59 + lVar102 + lVar78 * 2]) /
                                    (dVar387 + dVar331 + 1e-100);
                          dVar337 = ABS((double)local_618[lVar59 + lVar102 + lVar78 * 2]) /
                                    (dVar121 + dVar281 + 1e-100);
                          dVar336 = ABS((double)local_290[lVar81 + lVar78]) /
                                    (dVar387 + dVar121 + 1e-100) + 1.0;
                          dVar335 = ABS((double)local_618[lVar59 + lVar102 + lVar78]) /
                                    (dVar331 + dVar281 + 1e-100) + 1.0;
                          local_8d8 = ABS((double)local_a70._vptr_BaseFab
                                                  [lVar83 + lVar70 + lVar77 + lVar78 * 6]);
                          uStack_8d0 = 0;
                          dVar385 = dVar385 / dVar124;
                          dVar334 = (dVar334 + dVar432) * dVar123 + dVar120 + dVar472 +
                                    (dVar430 + dVar432) * dVar386 + 1e-100;
                          dVar472 = dVar472 / dVar334;
                          local_718 = dVar338 * (double)local_a70._vptr_BaseFab
                                                        [lVar83 + lVar71 + lVar102 + lVar78 * 5];
                          dVar386 = (dVar473 + dVar335) * dVar331;
                          local_708 = dVar338 * (double)local_a70._vptr_BaseFab
                                                        [lVar83 + lVar58 + lVar102 + lVar78 * 3];
                          dVar123 = ABS((double)p_Var7);
                          local_8f8 = dVar123 / (ABS((double)local_8e8[lVar78 * 2]) + dVar123);
                          local_938 = (double)p_Var100 * dVar338;
                          local_6f8 = dVar338 * (double)local_a70._vptr_BaseFab
                                                        [lVar83 + lVar58 + lVar77];
                          uStack_930 = 0;
                          if (((double)p_Var7 == 0.0) && (!NAN((double)p_Var7))) {
                            uVar113 = -(ulong)((double)local_8e8[lVar78 * 2] == 0.0);
                            local_8f8 = (double)(uVar113 & 0x3fe0000000000000 |
                                                ~uVar113 & (ulong)local_8f8);
                          }
                          uStack_8f0 = 0;
                          dVar467 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar58 + lVar102 + lVar78 * 4]);
                          dVar470 = ABS((double)local_8e8[lVar78 * 4]);
                          dVar582 = ABS((double)local_8a8[lVar78 * 4]);
                          dVar471 = ABS((double)local_618[lVar60 + lVar102 + lVar78 * 4]);
                          dVar580 = ABS((double)local_8a8[lVar78 * 2]) /
                                    (dVar467 + dVar582 + 1e-100);
                          dVar512 = ABS((double)local_618[lVar60 + lVar102 + lVar78 * 2]) /
                                    (dVar470 + dVar471 + 1e-100);
                          dVar430 = ABS((double)local_8e8[lVar78]) / (dVar467 + dVar470 + 1e-100) +
                                    1.0;
                          dVar432 = ABS((double)local_618[lVar60 + lVar102 + lVar78]) /
                                    (dVar582 + dVar471 + 1e-100) + 1.0;
                          local_918._0_8_ = (dVar430 + dVar580) * dVar467;
                          local_918._0_8_ =
                               (double)local_918._0_8_ /
                               ((dVar580 + dVar432) * dVar582 + (double)local_918._0_8_ +
                                (dVar430 + dVar512) * dVar470 + (dVar432 + dVar512) * dVar471 +
                               1e-100);
                          local_918._8_8_ = 0;
                          auVar211._0_8_ =
                               (ulong)local_a70._vptr_BaseFab[lVar82 + lVar59 + lVar77 + lVar78] &
                               0x7fffffffffffffff;
                          auVar211._8_8_ =
                               (ulong)local_a70._vptr_BaseFab[lVar82 + lVar81 + lVar77 + lVar78] &
                               0x7fffffffffffffff;
                          local_968 = ABS((double)local_a70._vptr_BaseFab
                                                  [lVar82 + lVar59 + lVar102 + lVar78 * 5]);
                          dVar513 = ABS((double)local_4b8[lVar78 * 5]);
                          dVar471 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar59 + lVar77 + lVar78 * 5]);
                          dVar512 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar81 + lVar77 + lVar78 * 5]);
                          auVar374._0_8_ = local_968 + dVar471 + 1e-100;
                          auVar374._8_8_ = dVar513 + dVar512 + 1e-100;
                          auVar343 = divpd(auVar211,auVar374);
                          dVar430 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar59 + lVar102 + lVar78 * 3]) /
                                    (dVar513 + local_968 + 1e-100);
                          dVar514 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar59 + lVar77 + lVar78 * 3]) /
                                    (dVar512 + dVar471 + 1e-100);
                          dVar432 = auVar343._0_8_ + 1.0;
                          dVar470 = auVar343._8_8_ + 1.0;
                          local_968 = (dVar430 + dVar432) * local_968;
                          local_968 = local_968 /
                                      ((dVar514 + dVar470) * dVar512 +
                                       (dVar470 + dVar430) * dVar513 + local_968 +
                                       (dVar514 + dVar432) * dVar471 + 1e-100);
                          uStack_960 = 0;
                          dVar430 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar58 + lVar102 + lVar78 * 3]);
                          dVar430 = dVar430 / (ABS((double)local_a70._vptr_BaseFab
                                                           [lVar82 + lVar58 + lVar77 + lVar78 * 3])
                                              + dVar430);
                          uVar113 = -(ulong)((double)local_a70._vptr_BaseFab
                                                     [lVar82 + lVar58 + lVar77 + lVar78 * 3] == 0.0)
                          ;
                          uVar114 = -(ulong)((double)local_a70._vptr_BaseFab
                                                     [lVar82 + lVar58 + lVar102 + lVar78 * 3] == 0.0
                                            );
                          local_928 = (double)((uVar113 & 0x3fe0000000000000 |
                                               ~uVar113 & (ulong)dVar430) & uVar114 |
                                              ~uVar114 & (ulong)dVar430);
                          uStack_920 = 0;
                          auVar212._0_8_ =
                               (ulong)local_a70._vptr_BaseFab[lVar82 + lVar60 + lVar77 + lVar78] &
                               0x7fffffffffffffff;
                          auVar212._8_8_ =
                               (ulong)local_a70._vptr_BaseFab[lVar82 + lVar58 + lVar77 + lVar78] &
                               0x7fffffffffffffff;
                          dVar512 = ABS((double)local_8a8[lVar78 * 5]);
                          dStack_940 = ABS((double)local_a70._vptr_BaseFab
                                                   [lVar82 + lVar58 + lVar102 + lVar78 * 5]);
                          dVar470 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar60 + lVar77 + lVar78 * 5]);
                          dVar471 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar58 + lVar77 + lVar78 * 5]);
                          auVar375._0_8_ = dVar512 + dVar470 + 1e-100;
                          auVar375._8_8_ = dStack_940 + dVar471 + 1e-100;
                          auVar343 = divpd(auVar212,auVar375);
                          dVar513 = ABS((double)local_8a8[lVar78 * 3]) /
                                    (dStack_940 + dVar512 + 1e-100);
                          dVar514 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar60 + lVar77 + lVar78 * 3]) /
                                    (dVar471 + dVar470 + 1e-100);
                          dVar430 = auVar343._0_8_ + 1.0;
                          dVar432 = auVar343._8_8_ + 1.0;
                          dStack_940 = (dVar513 + dVar432) * dStack_940;
                          local_948 = dStack_940 /
                                      ((dVar514 + dVar432) * dVar471 +
                                       (dVar513 + dVar430) * dVar512 + dStack_940 +
                                       (dVar514 + dVar430) * dVar470 + 1e-100);
                          auVar164._0_8_ =
                               (ulong)local_618[lVar58 + lVar77 + lVar78 * 2] & 0x7fffffffffffffff;
                          auVar164._8_8_ =
                               (ulong)local_a70._vptr_BaseFab[lVar82 + lVar58 + lVar77 + lVar78 * 2]
                               & 0x7fffffffffffffff;
                          dVar556 = ABS((double)local_8e8[lVar78 * 6]);
                          dVar579 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar58 + lVar102 + lVar78 * 6]);
                          dVar554 = ABS((double)local_618[lVar58 + lVar77 + lVar78 * 6]);
                          dVar555 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar58 + lVar77 + lVar78 * 6]);
                          auVar213._0_8_ = dVar556 + dVar554 + 1e-100;
                          auVar213._8_8_ = dVar579 + dVar555 + 1e-100;
                          auVar343 = divpd(auVar164,auVar213);
                          dVar513 = ABS((double)local_8e8[lVar78 * 3]) /
                                    (dVar579 + dVar556 + 1e-100);
                          dVar515 = ABS((double)local_618[lVar58 + lVar77 + lVar78 * 3]) /
                                    (dVar555 + dVar554 + 1e-100);
                          dVar470 = auVar343._0_8_ + 1.0;
                          dVar512 = auVar343._8_8_ + 1.0;
                          dStack_e00 = (dVar513 + dVar512) * dVar579;
                          dVar615 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar99 + lVar52 + lVar78 * 5]);
                          dVar514 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar99 + lVar77 + lVar78 * 5]);
                          dVar552 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar71 + lVar52 + lVar78 * 5]);
                          dVar471 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar71 + lVar77 + lVar78 * 5]);
                          dVar553 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar71 + lVar52 + lVar78 * 3]) /
                                    (dVar615 + dVar552 + 1e-100);
                          dVar581 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar71 + lVar77 + lVar78 * 3]) /
                                    (dVar514 + dVar471 + 1e-100);
                          dVar432 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar99 + lVar77 + lVar78]) /
                                    (dVar615 + dVar514 + 1e-100) + 1.0;
                          dVar430 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar71 + lVar77 + lVar78]) /
                                    (dVar552 + dVar471 + 1e-100) + 1.0;
                          dVar471 = (dVar430 + dVar581) * dVar471;
                          dVar471 = dVar471 / ((dVar432 + dVar581) * dVar514 +
                                               (dVar553 + dVar430) * dVar552 +
                                               (dVar432 + dVar553) * dVar615 + dVar471 + 1e-100);
                          dVar430 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar58 + lVar77 + lVar78 * 3]);
                          dVar430 = dVar430 / (ABS((double)local_a70._vptr_BaseFab
                                                           [lVar82 + lVar58 + lVar52 + lVar78 * 3])
                                              + dVar430);
                          uVar113 = -(ulong)((double)local_a70._vptr_BaseFab
                                                     [lVar82 + lVar58 + lVar77 + lVar78 * 3] == 0.0)
                          ;
                          uVar114 = -(ulong)((double)local_a70._vptr_BaseFab
                                                     [lVar82 + lVar58 + lVar52 + lVar78 * 3] == 0.0)
                          ;
                          dVar430 = (double)((uVar113 & 0x3fe0000000000000 |
                                             ~uVar113 & (ulong)dVar430) & uVar114 |
                                            ~uVar114 & (ulong)dVar430);
                          dVar615 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar93 + lVar52 + lVar78 * 5]);
                          local_6c8 = ABS((double)local_a70._vptr_BaseFab
                                                  [lVar82 + lVar93 + lVar77 + lVar78 * 5]);
                          dVar581 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar70 + lVar52 + lVar78 * 5]);
                          dVar552 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar70 + lVar77 + lVar78 * 5]);
                          dVar553 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar70 + lVar52 + lVar78 * 3]) /
                                    (dVar615 + dVar581 + 1e-100);
                          dVar641 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar70 + lVar77 + lVar78 * 3]) /
                                    (local_6c8 + dVar552 + 1e-100);
                          dVar432 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar93 + lVar77 + lVar78]) /
                                    (dVar615 + local_6c8 + 1e-100) + 1.0;
                          dVar514 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar70 + lVar77 + lVar78]) /
                                    (dVar581 + dVar552 + 1e-100) + 1.0;
                          local_6c8 = (dVar432 + dVar641) * local_6c8;
                          local_6c8 = local_6c8 /
                                      ((dVar553 + dVar514) * dVar581 + (dVar432 + dVar553) * dVar615
                                       + local_6c8 + (dVar514 + dVar641) * dVar552 + 1e-100);
                          uStack_6c0 = 0;
                          local_6d8 = ABS((double)local_a70._vptr_BaseFab
                                                  [lVar92 + lVar99 + lVar52 + lVar78 * 7]) + dVar431
                          ;
                          uStack_6d0 = 0;
                          uStack_c00 = 0;
                          dVar553 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar83 + lVar71 + lVar77 + lVar78 * 7]);
                          auVar542._8_4_ = SUB84(dVar388,0);
                          auVar542._0_8_ = dVar388;
                          auVar542._12_4_ = (int)((ulong)dVar388 >> 0x20);
                          dVar552 = dVar388 + ABS((double)local_a80[lVar78 * 7]);
                          dVar514 = ABS((double)p_Var2) / (dVar433 + dVar552 + dVar553 + 1e-100);
                          dVar615 = ABS((double)p_Var100) /
                                    (dVar431 + local_958 + dVar388 + dVar553 + 1e-100) + 1.0;
                          dVar432 = ABS((double)local_4d8[lVar78]);
                          dVar432 = dVar432 / (ABS((double)local_4c8[lVar78]) + dVar432);
                          uVar113 = -(ulong)((double)local_4d8[lVar78] == 0.0);
                          uVar114 = -(ulong)((double)local_4c8[lVar78] == 0.0);
                          dVar432 = (double)((uVar113 & 0x3fe0000000000000 |
                                             ~uVar113 & (ulong)dVar432) & uVar114 |
                                            ~uVar114 & (ulong)dVar432);
                          auVar214._0_8_ =
                               ABS((double)local_a70._vptr_BaseFab
                                           [lVar92 + lVar71 + lVar77 + lVar78 * 6]);
                          auVar214._8_8_ = ABS((double)p_Var3);
                          auVar543._0_8_ = dVar552 + 1e-100;
                          auVar543._8_8_ = auVar542._8_8_ + dVar553 + 1e-100;
                          auVar343 = divpd(auVar214,auVar543);
                          dVar552 = dVar553 * (double)local_a70._vptr_BaseFab
                                                      [lVar83 + lVar71 + lVar77 + lVar78 * 8] *
                                    (local_908 / (dVar433 + dVar553 + 1e-100) +
                                    local_6e8 / (local_958 + dVar553 + 1e-100) +
                                    local_728 /
                                    (ABS((double)local_a70._vptr_BaseFab
                                                 [lVar83 + lVar99 + lVar52 + lVar78 * 7]) +
                                     local_958 + dVar433 + dVar553 + 1e-100) + dVar615 + dVar514 +
                                    auVar343._8_8_);
                          local_6b8 = (double)local_a70._vptr_BaseFab
                                              [lVar82 + lVar59 + lVar102 + lVar78 * 7] * dVar552 +
                                      local_b48;
                          local_698 = (double)local_a70._vptr_BaseFab
                                              [lVar82 + lVar59 + lVar77 + lVar78 * 4] * dVar552 +
                                      (double)local_a70._vptr_BaseFab
                                              [lVar82 + lVar58 + lVar77 + lVar78 * 2] * dVar338;
                          dVar553 = dVar388 * (double)local_a70._vptr_BaseFab
                                                      [lVar83 + lVar71 + lVar77 + lVar78 * 8] *
                                    (ABS((double)local_a70._vptr_BaseFab
                                                 [lVar92 + lVar71 + lVar77 + lVar78 * 2]) /
                                     (ABS((double)local_a80[lVar78 * 7]) + local_6d8 + dVar388 +
                                     1e-100) + dVar615 + dVar514 +
                                     ABS((double)local_a70._vptr_BaseFab
                                                 [lVar92 + lVar71 + lVar77 + lVar78 * 4]) /
                                     (dVar431 + dVar388 + 1e-100) + auVar343._8_8_ + auVar343._0_8_)
                          ;
                          dVar550 = dStack_710 / dVar550;
                          dVar431 = ABS((double)local_14b8[lVar78 * 7]);
                          dVar514 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar92 + lVar93 + lVar52 + lVar78 * 7]);
                          dVar615 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar83 + lVar70 + lVar77 + lVar78 * 7]);
                          auVar165._8_4_ = SUB84(dVar184,0);
                          auVar165._0_8_ = dVar184;
                          auVar165._12_4_ = (int)((ulong)dVar184 >> 0x20);
                          dVar433 = dVar184 + ABS((double)local_a70._vptr_BaseFab
                                                          [lVar92 + lVar70 + lVar77 + lVar78 * 7]);
                          auVar376._0_8_ =
                               ABS((double)local_a70._vptr_BaseFab
                                           [lVar92 + lVar93 + lVar77 + lVar78 * 4]);
                          auVar376._8_8_ = ABS((double)p_Var5);
                          auVar215._0_8_ = dVar184 + dVar514 + 1e-100;
                          auVar215._8_8_ = dVar431 + dVar433 + dVar615 + 1e-100;
                          auVar343 = divpd(auVar376,auVar215);
                          dVar581 = ABS((double)p_Var4) /
                                    (dVar514 + dVar427 + dVar184 + dVar431 + 1e-100) + 1.0;
                          dStack_c20 = auVar343._8_8_;
                          dVar388 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar93 + lVar106 + lVar78]);
                          dVar388 = dVar388 / (ABS((double)local_a70._vptr_BaseFab
                                                           [lVar82 + lVar70 + lVar106 + lVar78]) +
                                              dVar388);
                          uVar113 = -(ulong)((double)local_a70._vptr_BaseFab
                                                     [lVar82 + lVar70 + lVar106 + lVar78] == 0.0);
                          uVar114 = -(ulong)((double)local_a70._vptr_BaseFab
                                                     [lVar82 + lVar93 + lVar106 + lVar78] == 0.0);
                          dVar388 = (double)((uVar113 & 0x3fe0000000000000 |
                                             ~uVar113 & (ulong)dVar388) & uVar114 |
                                            ~uVar114 & (ulong)dVar388);
                          auVar654._0_8_ =
                               ABS((double)local_a70._vptr_BaseFab
                                           [lVar92 + lVar70 + lVar77 + lVar78 * 6]);
                          auVar654._8_8_ = ABS((double)p_Var6);
                          auVar166._0_8_ = dVar433 + 1e-100;
                          auVar166._8_8_ = auVar165._8_8_ + dVar431 + 1e-100;
                          auVar341 = divpd(auVar654,auVar166);
                          dVar431 = dVar431 * (double)local_a70._vptr_BaseFab
                                                      [lVar83 + lVar70 + lVar77 + lVar78 * 8] *
                                    (local_8d8 / (dVar615 + dVar431 + 1e-100) +
                                    local_8b8 / (dVar427 + dVar431 + 1e-100) +
                                    (double)local_8c8._0_8_ /
                                    (ABS((double)local_a70._vptr_BaseFab
                                                 [lVar83 + lVar70 + lVar52 + lVar78 * 7]) + dVar427
                                     + dVar431 + dVar615 + 1e-100) + dVar581 + dStack_c20 +
                                    auVar341._8_8_);
                          local_6a8 = (double)local_a70._vptr_BaseFab
                                              [lVar82 + lVar58 + lVar102 + lVar78 * 7] * dVar431 +
                                      local_6b8;
                          local_ed8._0_8_ = auVar343._0_8_;
                          dVar615 = dVar184 * (double)local_a70._vptr_BaseFab
                                                      [lVar83 + lVar70 + lVar77 + lVar78 * 8] *
                                    (ABS((double)local_a70._vptr_BaseFab
                                                 [lVar92 + lVar70 + lVar77 + lVar78 * 2]) /
                                     (ABS((double)local_a70._vptr_BaseFab
                                                  [lVar92 + lVar70 + lVar52 + lVar78 * 7]) + dVar514
                                      + dVar184 +
                                      ABS((double)local_a70._vptr_BaseFab
                                                  [lVar92 + lVar70 + lVar77 + lVar78 * 7]) + 1e-100)
                                     + dVar581 + dStack_c20 + (double)local_ed8._0_8_ +
                                     auVar341._8_8_ + auVar341._0_8_);
                          dVar429 = dVar429 / dVar124;
                          dVar120 = dVar120 / dVar334;
                          local_d18 = local_a70._vptr_BaseFab + lVar88 + lVar93 + lVar102;
                          local_cc8 = local_a70._vptr_BaseFab + lVar88 + lVar93 + lVar77;
                          dVar124 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar88 + lVar81 + lVar102 + lVar78 * 4]);
                          dVar427 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar88 + lVar59 + lVar102 + lVar78 * 4]);
                          dVar184 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar88 + lVar59 + lVar102 + lVar78 * 2]) /
                                    (dVar124 + dVar427 + 1e-100);
                          dVar433 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar88 + lVar81 + lVar102 + lVar78]) /
                                    (dVar387 + dVar124 + 1e-100) + 1.0;
                          dVar514 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar88 + lVar59 + lVar102 + lVar78]) /
                                    (dVar331 + dVar427 + 1e-100) + 1.0;
                          dVar427 = (dVar514 + dVar184) * dVar427;
                          dVar334 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar88 + lVar58 + lVar102 + lVar78 * 2]);
                          dVar334 = dVar334 / (dVar123 + dVar334);
                          auVar607._0_8_ =
                               (ulong)local_a70._vptr_BaseFab[lVar82 + lVar59 + lVar77 + lVar78 * 4]
                               & 0x7fffffffffffffff;
                          auVar607._8_8_ =
                               (ulong)local_618[lVar59 + lVar102 + lVar78 * 3] & 0x7fffffffffffffff;
                          auVar575._0_8_ =
                               (ulong)local_a70._vptr_BaseFab
                                      [lVar82 + lVar59 + lVar102 + lVar78 * 6] & 0x7fffffffffffffff;
                          auVar575._8_8_ =
                               (ulong)local_618[lVar59 + lVar102 + lVar78 * 5] & 0x7fffffffffffffff;
                          dVar123 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar58 + lVar77 + lVar78 * 7]);
                          if (((double)p_Var7 == 0.0) && (!NAN((double)p_Var7))) {
                            uVar113 = -(ulong)((double)local_a70._vptr_BaseFab
                                                       [lVar88 + lVar58 + lVar102 + lVar78 * 2] ==
                                              0.0);
                            dVar334 = (double)(uVar113 & 0x3fe0000000000000 |
                                              ~uVar113 & (ulong)dVar334);
                          }
                          dVar561 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar88 + lVar58 + lVar102 + lVar78 * 4]);
                          dVar581 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar88 + lVar60 + lVar102 + lVar78 * 4]);
                          dVar660 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar88 + lVar60 + lVar102 + lVar78 * 2]) /
                                    (dVar561 + dVar581 + 1e-100);
                          dVar560 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar88 + lVar58 + lVar102 + lVar78]) /
                                    (dVar467 + dVar561 + 1e-100) + 1.0;
                          dVar662 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar88 + lVar60 + lVar102 + lVar78]) /
                                    (dVar582 + dVar581 + 1e-100) + 1.0;
                          dVar561 = (dVar560 + dVar660) * dVar561;
                          dVar558 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar89 + lVar59 + lVar102 + lVar78]);
                          dVar558 = dVar558 / (ABS((double)local_a70._vptr_BaseFab
                                                           [lVar89 + lVar81 + lVar102 + lVar78]) +
                                              dVar558);
                          uVar113 = -(ulong)((double)local_a70._vptr_BaseFab
                                                     [lVar89 + lVar59 + lVar102 + lVar78] == 0.0);
                          uVar114 = -(ulong)((double)local_a70._vptr_BaseFab
                                                     [lVar89 + lVar81 + lVar102 + lVar78] == 0.0);
                          dVar617 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar89 + lVar58 + lVar102 + lVar78]);
                          dVar617 = dVar617 / (ABS((double)local_a70._vptr_BaseFab
                                                           [lVar89 + lVar60 + lVar102 + lVar78]) +
                                              dVar617);
                          uVar115 = -(ulong)((double)local_a70._vptr_BaseFab
                                                     [lVar89 + lVar60 + lVar102 + lVar78] == 0.0);
                          uVar116 = -(ulong)((double)local_a70._vptr_BaseFab
                                                     [lVar89 + lVar58 + lVar102 + lVar78] == 0.0);
                          dVar612 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar59 + lVar77 + lVar78 * 7]);
                          dVar697 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar88 + lVar59 + lVar102 + lVar78 * 7]);
                          dVar549 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar59 + lVar102 + lVar78 * 7]);
                          auVar271._8_4_ = SUB84(dVar549,0);
                          auVar271._0_8_ = dVar549;
                          auVar271._12_4_ = (int)((ulong)dVar549 >> 0x20);
                          dVar611 = dVar549 + ABS((double)local_4b8[lVar78 * 7]);
                          dVar641 = auVar271._8_8_ +
                                    ABS((double)local_618[lVar59 + lVar102 + lVar78 * 7]);
                          auVar320._0_8_ =
                               (ulong)local_a70._vptr_BaseFab[lVar82 + lVar59 + lVar77 + lVar78 * 2]
                               & 0x7fffffffffffffff;
                          auVar320._8_8_ =
                               (ulong)local_618[lVar59 + lVar77 + lVar78] & 0x7fffffffffffffff;
                          auVar167._0_8_ =
                               dVar612 + dVar611 + ABS((double)local_a70._vptr_BaseFab
                                                               [lVar82 + lVar81 + lVar77 + lVar78 * 
                                                  7]) + 1e-100;
                          auVar167._8_8_ =
                               ABS((double)local_618[lVar59 + lVar77 + lVar78 * 7]) +
                               dVar641 + dVar612 + 1e-100;
                          auVar230 = divpd(auVar320,auVar167);
                          auVar321._0_8_ = dVar612 + dVar549 + 1e-100;
                          auVar321._8_8_ =
                               ABS((double)local_290[lVar81 + lVar78 * 7]) + dVar611 +
                               ABS((double)local_618[lVar59 + lVar102 + lVar78 * 7]) + 1e-100;
                          auVar354 = divpd(auVar607,auVar321);
                          auVar168._0_8_ = dVar611 + 1e-100;
                          auVar168._8_8_ = dVar641 + 1e-100;
                          auVar290 = divpd(auVar575,auVar168);
                          dVar642 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar88 + lVar59 + lVar77 + lVar78 * 7]);
                          dVar695 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar88 + lVar81 + lVar102 + lVar78 * 7]) + dVar697;
                          auVar272._0_8_ =
                               (ulong)local_a70._vptr_BaseFab
                                      [lVar88 + lVar59 + lVar102 + lVar78 * 6] & 0x7fffffffffffffff;
                          auVar272._8_8_ =
                               (ulong)local_a70._vptr_BaseFab
                                      [lVar88 + lVar59 + lVar102 + lVar78 * 5] & 0x7fffffffffffffff;
                          auVar423._0_8_ = dVar695 + 1e-100;
                          auVar423._8_8_ = dVar697 + dVar549 + 1e-100;
                          auVar341 = divpd(auVar272,auVar423);
                          dVar663 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar88 + lVar58 + lVar77 + lVar78 * 6]);
                          dVar680 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar88 + lVar58 + lVar102 + lVar78 * 6]);
                          auVar424._0_8_ =
                               (ulong)local_a70._vptr_BaseFab[lVar88 + lVar58 + lVar77 + lVar78 * 3]
                               & 0x7fffffffffffffff;
                          auVar424._8_8_ =
                               (ulong)local_a70._vptr_BaseFab
                                      [lVar88 + lVar58 + lVar102 + lVar78 * 3] & 0x7fffffffffffffff;
                          auVar460._0_8_ = dVar555 + dVar663 + 1e-100;
                          auVar460._8_8_ = dVar579 + dVar680 + 1e-100;
                          auVar285 = divpd(auVar424,auVar460);
                          dVar645 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar88 + lVar58 + lVar77 + lVar78 * 2]) /
                                    (dVar680 + dVar663 + 1e-100) + 1.0;
                          dVar680 = (auVar285._8_8_ + dVar645) * dVar680;
                          dVar584 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar88 + lVar58 + lVar102 + lVar78 * 7]);
                          dVar646 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar58 + lVar102 + lVar78 * 7]);
                          auVar425._8_4_ = SUB84(dVar646,0);
                          auVar425._0_8_ = dVar646;
                          auVar425._12_4_ = (int)((ulong)dVar646 >> 0x20);
                          dVar641 = dVar646 + ABS((double)local_8a8[lVar78 * 7]);
                          dVar583 = auVar425._8_8_ + ABS((double)local_8e8[lVar78 * 7]);
                          auVar169._8_4_ = SUB84(dVar123,0);
                          auVar169._0_8_ = dVar123;
                          auVar169._12_4_ = (int)((ulong)dVar123 >> 0x20);
                          auVar273._0_8_ =
                               (ulong)local_a70._vptr_BaseFab[lVar82 + lVar60 + lVar77 + lVar78 * 2]
                               & 0x7fffffffffffffff;
                          auVar273._8_8_ =
                               (ulong)local_618[lVar58 + lVar77 + lVar78] & 0x7fffffffffffffff;
                          auVar170._0_8_ =
                               dVar123 + dVar641 +
                               ABS((double)local_a70._vptr_BaseFab
                                           [lVar82 + lVar60 + lVar77 + lVar78 * 7]) + 1e-100;
                          auVar170._8_8_ =
                               auVar169._8_8_ + dVar583 +
                               ABS((double)local_618[lVar58 + lVar77 + lVar78 * 7]) + 1e-100;
                          auVar186 = divpd(auVar273,auVar170);
                          auVar274._0_8_ = dVar646 + dVar123 + 1e-100;
                          auVar274._8_8_ =
                               ABS((double)local_8e8[lVar78 * 7]) + dVar641 +
                               ABS((double)local_618[lVar60 + lVar102 + lVar78 * 7]) + 1e-100;
                          auVar36._8_8_ =
                               (ulong)local_618[lVar60 + lVar102 + lVar78 * 3] & 0x7fffffffffffffff;
                          auVar36._0_8_ =
                               (ulong)local_a70._vptr_BaseFab[lVar82 + lVar58 + lVar77 + lVar78 * 4]
                               & 0x7fffffffffffffff;
                          auVar404 = divpd(auVar36,auVar274);
                          auVar171._0_8_ = dVar641 + 1e-100;
                          auVar171._8_8_ = dVar583 + 1e-100;
                          auVar34._8_8_ = (ulong)local_8e8[lVar78 * 5] & 0x7fffffffffffffff;
                          auVar34._0_8_ = (ulong)local_8a8[lVar78 * 6] & 0x7fffffffffffffff;
                          auVar487 = divpd(auVar34,auVar171);
                          dVar683 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar88 + lVar58 + lVar77 + lVar78 * 7]);
                          dVar586 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar88 + lVar60 + lVar102 + lVar78 * 7]) + dVar584;
                          auVar639._0_8_ =
                               (ulong)local_a70._vptr_BaseFab[lVar88 + lVar58 + lVar77 + lVar78 * 4]
                               & 0x7fffffffffffffff;
                          auVar639._8_8_ =
                               (ulong)local_a70._vptr_BaseFab
                                      [lVar88 + lVar60 + lVar102 + lVar78 * 3] & 0x7fffffffffffffff;
                          auVar322._0_8_ = dVar584 + dVar683 + 1e-100;
                          auVar322._8_8_ =
                               dVar641 + dVar584 +
                               ABS((double)local_a70._vptr_BaseFab
                                           [lVar88 + lVar60 + lVar102 + lVar78 * 7]) + 1e-100;
                          auVar522 = divpd(auVar639,auVar322);
                          auVar216._0_8_ =
                               (ulong)local_a70._vptr_BaseFab
                                      [lVar88 + lVar60 + lVar102 + lVar78 * 6] & 0x7fffffffffffffff;
                          auVar216._8_8_ =
                               (ulong)local_a70._vptr_BaseFab
                                      [lVar88 + lVar58 + lVar102 + lVar78 * 5] & 0x7fffffffffffffff;
                          auVar655._0_8_ = dVar586 + 1e-100;
                          auVar655._8_8_ = dVar584 + dVar646 + 1e-100;
                          auVar343 = divpd(auVar216,auVar655);
                          auVar544._0_8_ =
                               (ulong)local_a70._vptr_BaseFab[lVar89 + lVar59 + lVar77 + lVar78] &
                               0x7fffffffffffffff;
                          auVar544._8_8_ =
                               (ulong)local_a70._vptr_BaseFab[lVar89 + lVar81 + lVar77 + lVar78] &
                               0x7fffffffffffffff;
                          dVar685 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar89 + lVar59 + lVar102 + lVar78 * 5]);
                          dVar557 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar89 + lVar81 + lVar102 + lVar78 * 5]);
                          dVar681 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar89 + lVar59 + lVar77 + lVar78 * 5]);
                          dVar559 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar89 + lVar81 + lVar77 + lVar78 * 5]);
                          auVar323._0_8_ = dVar685 + dVar681 + 1e-100;
                          auVar323._8_8_ = dVar557 + dVar559 + 1e-100;
                          auVar287 = divpd(auVar544,auVar323);
                          dVar684 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar89 + lVar59 + lVar102 + lVar78 * 3]) /
                                    (dVar557 + dVar685 + 1e-100);
                          dVar647 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar89 + lVar59 + lVar77 + lVar78 * 3]) /
                                    (dVar559 + dVar681 + 1e-100);
                          dVar585 = auVar287._0_8_ + 1.0;
                          dVar664 = auVar287._8_8_ + 1.0;
                          dVar685 = (dVar684 + dVar585) * dVar685;
                          dVar548 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar89 + lVar58 + lVar102 + lVar78 * 3]);
                          dVar548 = dVar548 / (ABS((double)local_a70._vptr_BaseFab
                                                           [lVar89 + lVar58 + lVar77 + lVar78 * 3])
                                              + dVar548);
                          uVar117 = -(ulong)((double)local_a70._vptr_BaseFab
                                                     [lVar89 + lVar58 + lVar102 + lVar78 * 3] == 0.0
                                            );
                          uVar118 = -(ulong)((double)local_a70._vptr_BaseFab
                                                     [lVar89 + lVar58 + lVar77 + lVar78 * 3] == 0.0)
                          ;
                          auVar656._0_8_ =
                               (ulong)local_a70._vptr_BaseFab[lVar89 + lVar60 + lVar77 + lVar78] &
                               0x7fffffffffffffff;
                          auVar656._8_8_ =
                               (ulong)local_a70._vptr_BaseFab[lVar89 + lVar58 + lVar77 + lVar78] &
                               0x7fffffffffffffff;
                          dVar682 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar89 + lVar60 + lVar102 + lVar78 * 5]);
                          dVar583 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar89 + lVar58 + lVar102 + lVar78 * 5]);
                          dVar613 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar89 + lVar60 + lVar77 + lVar78 * 5]);
                          dVar618 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar89 + lVar58 + lVar77 + lVar78 * 5]);
                          auVar324._0_8_ = dVar682 + dVar613 + 1e-100;
                          auVar324._8_8_ = dVar583 + dVar618 + 1e-100;
                          auVar287 = divpd(auVar656,auVar324);
                          dVar641 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar89 + lVar60 + lVar102 + lVar78 * 3]) /
                                    (dVar583 + dVar682 + 1e-100);
                          dVar616 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar89 + lVar60 + lVar77 + lVar78 * 3]) /
                                    (dVar618 + dVar613 + 1e-100);
                          dVar587 = auVar287._0_8_ + 1.0;
                          dVar588 = auVar287._8_8_ + 1.0;
                          dVar583 = (dVar641 + dVar588) * dVar583;
                          *(double *)(local_268 + (long)local_cb8 * 8) =
                               (((dVar583 /
                                 ((dVar616 + dVar588) * dVar618 +
                                  (dVar641 + dVar587) * dVar682 + dVar583 +
                                  (dVar616 + dVar587) * dVar613 + 1e-100)) *
                                 (dVar120 * (double)local_a70._vptr_BaseFab
                                                    [lVar88 + lVar70 + lVar77 + lVar78 * 6] +
                                 dVar578 * (double)local_cc8[lVar78 * 7] +
                                 dVar550 * (double)local_cc8[lVar78 * 4] +
                                 dVar615 * (double)local_a70._vptr_BaseFab
                                                   [lVar88 + lVar70 + lVar77 + lVar78 * 2]) +
                                (double)((uVar118 & 0x3fe0000000000000 | ~uVar118 & (ulong)dVar548)
                                         & uVar117 | ~uVar117 & (ulong)dVar548) *
                                ((double)local_a70._vptr_BaseFab
                                         [lVar88 + lVar58 + lVar77 + lVar78 * 7] * dVar120 +
                                (double)local_a70._vptr_BaseFab
                                        [lVar88 + lVar58 + lVar77 + lVar78 * 6] * dVar578 +
                                dVar429 * (double)local_a70._vptr_BaseFab
                                                  [lVar88 + lVar59 + lVar77 + lVar78 * 7] +
                                (double)local_a70._vptr_BaseFab
                                        [lVar88 + lVar58 + lVar77 + lVar78 * 4] * dVar615 +
                                dVar553 * (double)local_a70._vptr_BaseFab
                                                  [lVar88 + lVar59 + lVar77 + lVar78 * 4] +
                                (double)local_a70._vptr_BaseFab
                                        [lVar88 + lVar58 + lVar77 + lVar78 * 2] * dVar550) +
                                (dVar685 /
                                ((dVar647 + dVar664) * dVar559 +
                                 (dVar684 + dVar664) * dVar557 + dVar685 +
                                 (dVar647 + dVar585) * dVar681 + 1e-100)) *
                                ((double)local_a70._vptr_BaseFab
                                         [lVar88 + lVar71 + lVar77 + lVar78 * 7] * dVar578 +
                                (double)local_a70._vptr_BaseFab
                                        [lVar88 + lVar71 + lVar77 + lVar78 * 6] * dVar429 +
                                (double)local_a70._vptr_BaseFab
                                        [lVar88 + lVar71 + lVar77 + lVar78 * 2] * dVar553 +
                                (double)local_a70._vptr_BaseFab
                                        [lVar88 + lVar71 + lVar77 + lVar78 * 4] * dVar550) +
                                (double)local_a70._vptr_BaseFab
                                        [lVar88 + lVar60 + lVar77 + lVar78 * 8] * dVar584 *
                                (auVar343._8_8_ +
                                 auVar522._8_8_ +
                                 ABS((double)local_a70._vptr_BaseFab
                                             [lVar88 + lVar60 + lVar77 + lVar78 * 2]) /
                                 (dVar683 + dVar586 +
                                  ABS((double)local_a70._vptr_BaseFab
                                              [lVar88 + lVar60 + lVar77 + lVar78 * 7]) + 1e-100) +
                                 ABS((double)local_a70._vptr_BaseFab
                                             [lVar88 + lVar58 + lVar77 + lVar78]) /
                                 (dVar584 + dVar646 + dVar123 + dVar683 + 1e-100) + 1.0 +
                                 auVar522._0_8_ + auVar343._0_8_) *
                                ((double)p_Var5 * dVar120 +
                                (double)p_Var6 * dVar578 +
                                dVar388 * (double)local_a70._vptr_BaseFab
                                                  [lVar92 + lVar70 + lVar77 + lVar78 * 6] +
                                (double)local_a70._vptr_BaseFab[lVar83 + lVar70 + lVar77] * dVar615
                                + (double)p_Var4 * dVar550 +
                                  dVar430 * (double)local_a70._vptr_BaseFab
                                                    [lVar92 + lVar93 + lVar77 + lVar78 * 4] +
                                  local_6c8 *
                                  (double)local_a70._vptr_BaseFab
                                          [lVar92 + lVar70 + lVar77 + lVar78 * 2] +
                                (double)local_a70._vptr_BaseFab
                                        [lVar92 + lVar93 + lVar77 + lVar78 * 7]) +
                                (dVar680 /
                                ((dVar512 + auVar285._8_8_) * dVar579 + dVar680 +
                                 (dVar512 + auVar285._0_8_) * dVar555 +
                                 (dVar645 + auVar285._0_8_) * dVar663 + 1e-100)) *
                                ((double)local_a70._vptr_BaseFab
                                         [lVar83 + lVar58 + lVar77 + lVar78 * 5] * dVar120 +
                                (double)local_a70._vptr_BaseFab
                                        [lVar83 + lVar58 + lVar77 + lVar78 * 3] * dVar578 +
                                (double)local_a70._vptr_BaseFab
                                        [lVar83 + lVar59 + lVar77 + lVar78 * 5] * dVar429 +
                                (double)local_a70._vptr_BaseFab
                                        [lVar92 + lVar58 + lVar77 + lVar78 * 7] * dVar388 +
                                (double)local_a70._vptr_BaseFab
                                        [lVar92 + lVar59 + lVar77 + lVar78 * 7] * dVar432 +
                                (double)local_a70._vptr_BaseFab[lVar83 + lVar58 + lVar77 + lVar78] *
                                dVar615 + (double)local_a70._vptr_BaseFab[lVar83 + lVar58 + lVar77]
                                          * dVar550 +
                                          (double)local_a70._vptr_BaseFab
                                                  [lVar83 + lVar59 + lVar77 + lVar78] * dVar553 +
                                          (double)local_a70._vptr_BaseFab
                                                  [lVar92 + lVar58 + lVar77 + lVar78 * 4] *
                                          local_6c8 +
                                          dVar471 * (double)local_a70._vptr_BaseFab
                                                            [lVar92 + lVar59 + lVar77 + lVar78 * 4]
                                          + (double)local_a70._vptr_BaseFab
                                                    [lVar92 + lVar58 + lVar77 + lVar78 * 2] *
                                            dVar430 +
                                (double)local_a70._vptr_BaseFab
                                        [lVar92 + lVar58 + lVar77 + lVar78 * 6]) +
                                (double)local_a70._vptr_BaseFab
                                        [lVar88 + lVar59 + lVar77 + lVar78 * 8] * dVar697 *
                                (auVar341._8_8_ +
                                 ABS((double)local_a70._vptr_BaseFab
                                             [lVar88 + lVar59 + lVar77 + lVar78 * 4]) /
                                 (dVar697 + dVar642 + 1e-100) +
                                 ABS((double)local_a70._vptr_BaseFab
                                             [lVar88 + lVar59 + lVar102 + lVar78 * 3]) /
                                 (dVar611 + ABS((double)local_a70._vptr_BaseFab
                                                        [lVar88 + lVar81 + lVar102 + lVar78 * 7]) +
                                  dVar697 + 1e-100) +
                                 ABS((double)local_a70._vptr_BaseFab
                                             [lVar88 + lVar59 + lVar77 + lVar78 * 2]) /
                                 (ABS((double)local_a70._vptr_BaseFab
                                              [lVar88 + lVar81 + lVar77 + lVar78 * 7]) + dVar695 +
                                  dVar642 + 1e-100) +
                                 ABS((double)local_a70._vptr_BaseFab
                                             [lVar88 + lVar59 + lVar77 + lVar78]) /
                                 (dVar612 + dVar697 + dVar549 + dVar642 + 1e-100) + 1.0 +
                                auVar341._0_8_) *
                                ((double)p_Var3 * dVar578 +
                                (double)p_Var2 * dVar429 +
                                dVar432 * (double)local_a70._vptr_BaseFab
                                                  [lVar92 + lVar71 + lVar77 + lVar78 * 6] +
                                (double)p_Var100 * dVar550 +
                                (double)local_a70._vptr_BaseFab[lVar83 + lVar71 + lVar77] * dVar553
                                + (double)local_a70._vptr_BaseFab
                                          [lVar92 + lVar71 + lVar77 + lVar78 * 2] * dVar471 +
                                  (double)local_a70._vptr_BaseFab
                                          [lVar92 + lVar71 + lVar77 + lVar78 * 4] * dVar430 +
                                (double)local_a70._vptr_BaseFab
                                        [lVar92 + lVar71 + lVar77 + lVar78 * 7]) +
                                (double)((uVar115 & 0x3fe0000000000000 | ~uVar115 & (ulong)dVar617)
                                         & uVar116 | ~uVar116 & (ulong)dVar617) *
                                ((double)local_d18[lVar78 * 7] * dVar550 +
                                (double)local_a70._vptr_BaseFab
                                        [lVar88 + lVar70 + lVar102 + lVar78 * 6] * dVar615) +
                                (double)local_a70._vptr_BaseFab
                                        [lVar88 + lVar58 + lVar102 + lVar78 * 7] * dVar615 +
                                (double)local_a70._vptr_BaseFab
                                        [lVar88 + lVar59 + lVar102 + lVar78 * 7] * dVar553 +
                                (double)local_a70._vptr_BaseFab
                                        [lVar88 + lVar58 + lVar102 + lVar78 * 6] * dVar550 +
                                (double)((uVar113 & 0x3fe0000000000000 | ~uVar113 & (ulong)dVar558)
                                         & uVar114 | ~uVar114 & (ulong)dVar558) *
                                ((double)local_a70._vptr_BaseFab
                                         [lVar88 + lVar71 + lVar102 + lVar78 * 6] * dVar553 +
                                (double)local_a70._vptr_BaseFab
                                        [lVar88 + lVar71 + lVar102 + lVar78 * 7] * dVar550) +
                                (dVar561 /
                                ((dVar580 + dVar662) * dVar582 + (dVar580 + dVar560) * dVar467 +
                                 dVar561 + (dVar662 + dVar660) * dVar581 + 1e-100)) *
                                ((double)local_a70._vptr_BaseFab
                                         [lVar83 + lVar70 + lVar102 + lVar78 * 3] * dVar615 +
                                (double)local_a70._vptr_BaseFab
                                        [lVar83 + lVar93 + lVar102 + lVar78 * 5] * dVar550 +
                                (double)local_858[lVar78 * 7] * dVar430 +
                                (double)local_a70._vptr_BaseFab
                                        [lVar92 + lVar70 + lVar102 + lVar78 * 6] * local_6c8) +
                                (dVar427 /
                                ((dVar433 + dVar184) * dVar124 +
                                 (dVar473 + dVar514) * dVar331 + (dVar473 + dVar433) * dVar387 +
                                 dVar427 + 1e-100)) *
                                ((double)local_a70._vptr_BaseFab
                                         [lVar83 + lVar71 + lVar102 + lVar78 * 5] * dVar550 +
                                (double)local_a70._vptr_BaseFab
                                        [lVar83 + lVar71 + lVar102 + lVar78 * 3] * dVar553 +
                                (double)local_a70._vptr_BaseFab
                                        [lVar92 + lVar71 + lVar102 + lVar78 * 6] * dVar471 +
                                (double)local_a70._vptr_BaseFab
                                        [lVar92 + lVar71 + lVar102 + lVar78 * 7] * dVar430) +
                                ((double)local_a70._vptr_BaseFab
                                         [lVar83 + lVar58 + lVar102 + lVar78 * 5] * dVar615 +
                                (double)local_a70._vptr_BaseFab
                                        [lVar83 + lVar58 + lVar102 + lVar78 * 3] * dVar550 +
                                (double)local_a70._vptr_BaseFab
                                        [lVar83 + lVar59 + lVar102 + lVar78 * 5] * dVar553 +
                                (double)local_de8[lVar78 * 7] * local_6c8 +
                                (double)local_d58[lVar78 * 7] * dVar471 +
                                (double)local_de8[lVar78 * 6] * dVar430) * dVar334) * 0.125 +
                               (dVar646 * (double)local_618[lVar60 + lVar77 + lVar78 * 8] *
                                (auVar487._8_8_ +
                                 auVar404._8_8_ + auVar186._8_8_ + 1.0 + auVar186._0_8_ +
                                 auVar404._0_8_ + auVar487._0_8_) *
                                ((double)local_a70._vptr_BaseFab
                                         [lVar83 + lVar70 + lVar77 + lVar78 * 6] * dVar469 +
                                dVar472 * (double)p_Var5 +
                                dVar122 * (double)p_Var6 +
                                (double)local_a70._vptr_BaseFab
                                        [lVar83 + lVar70 + lVar77 + lVar78 * 2] * dVar339 +
                                (double)local_14b8[lVar78 * 4] * dVar384 +
                                dVar338 * (double)p_Var4 +
                                dVar431 * (double)local_a70._vptr_BaseFab[lVar83 + lVar70 + lVar77]
                                + (double)local_14b8[lVar78 * 7]) +
                               (dStack_e00 /
                               ((dVar515 + dVar512) * dVar555 +
                                (dVar513 + dVar470) * dVar556 + dStack_e00 +
                                (dVar515 + dVar470) * dVar554 + 1e-100)) *
                               ((double)local_a70._vptr_BaseFab
                                        [lVar83 + lVar58 + lVar77 + lVar78 * 7] * dVar469 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar83 + lVar59 + lVar77 + lVar78 * 7] * dVar466 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar83 + lVar58 + lVar77 + lVar78 * 5] * dVar472 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar83 + lVar58 + lVar77 + lVar78 * 3] * dVar122 +
                               dVar385 * (double)local_a70._vptr_BaseFab
                                                 [lVar83 + lVar59 + lVar77 + lVar78 * 5] +
                               (double)local_a70._vptr_BaseFab
                                       [lVar83 + lVar58 + lVar77 + lVar78 * 4] * dVar339 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar83 + lVar58 + lVar77 + lVar78 * 2] * dVar384 +
                               dVar229 * (double)local_a70._vptr_BaseFab
                                                 [lVar83 + lVar59 + lVar77 + lVar78 * 4] +
                               (double)local_a70._vptr_BaseFab[lVar83 + lVar58 + lVar77 + lVar78] *
                               dVar431 + dVar552 * (double)local_a70._vptr_BaseFab
                                                           [lVar83 + lVar59 + lVar77 + lVar78] +
                                         local_6f8 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar83 + lVar58 + lVar77 + lVar78 * 6]) +
                               dVar549 * (double)local_618[lVar59 + lVar77 + lVar78 * 8] *
                               (auVar290._8_8_ +
                                auVar354._8_8_ + auVar230._8_8_ + 1.0 + auVar230._0_8_ +
                                auVar354._0_8_ + auVar290._0_8_) *
                               ((double)local_a70._vptr_BaseFab
                                        [lVar83 + lVar71 + lVar77 + lVar78 * 6] * dVar466 +
                                (double)p_Var3 * dVar122 +
                                (double)p_Var2 * dVar385 +
                                (double)local_a70._vptr_BaseFab
                                        [lVar83 + lVar71 + lVar77 + lVar78 * 4] * dVar384 +
                                (double)local_a70._vptr_BaseFab
                                        [lVar83 + lVar71 + lVar77 + lVar78 * 2] * dVar229 +
                                (double)local_a70._vptr_BaseFab[lVar83 + lVar71 + lVar77] * dVar552
                                + local_938 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar83 + lVar71 + lVar77 + lVar78 * 7]) +
                               ((double)local_a70._vptr_BaseFab
                                        [lVar82 + lVar58 + lVar77 + lVar78 * 7] * dVar472 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar82 + lVar58 + lVar77 + lVar78 * 6] * dVar122 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar82 + lVar59 + lVar77 + lVar78 * 7] * dVar385 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar82 + lVar58 + lVar77 + lVar78 * 4] * dVar431 + local_698
                               ) * local_928 +
                               (double)((uVar112 & 0x3fe0000000000000 | ~uVar112 & (ulong)dVar183) &
                                        uVar111 | ~uVar111 & (ulong)dVar183) *
                               ((double)local_9e8[lVar78 * 7] * dVar338 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar82 + lVar70 + lVar102 + lVar78 * 6] * dVar431) +
                               (double)((uVar333 & 0x3fe0000000000000 | ~uVar333 & (ulong)dVar332) &
                                        uVar107 | ~uVar107 & (ulong)dVar332) *
                               ((double)local_a70._vptr_BaseFab
                                        [lVar82 + lVar71 + lVar102 + lVar78 * 6] * dVar552 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar82 + lVar71 + lVar102 + lVar78 * 7] * dVar338) +
                               local_6a8 +
                               (dVar386 /
                               ((dVar336 + dVar473) * dVar387 + dVar386 +
                                (dVar336 + dVar337) * dVar121 + (dVar335 + dVar337) * dVar281 +
                               1e-100)) *
                               ((double)local_a70._vptr_BaseFab
                                        [lVar83 + lVar71 + lVar102 + lVar78 * 7] * dVar384 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar83 + lVar71 + lVar102 + lVar78 * 6] * dVar229 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar83 + lVar71 + lVar102 + lVar78 * 3] * dVar552 +
                               local_718) +
                               ((double)local_a70._vptr_BaseFab
                                        [lVar83 + lVar58 + lVar102 + lVar78 * 7] * dVar339 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar83 + lVar58 + lVar102 + lVar78 * 6] * dVar384 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar83 + lVar59 + lVar102 + lVar78 * 7] * dVar229 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar83 + lVar58 + lVar102 + lVar78 * 5] * dVar431 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar83 + lVar59 + lVar102 + lVar78 * 5] * dVar552 +
                               local_708) * local_8f8 +
                               ((double)local_a70._vptr_BaseFab
                                        [lVar83 + lVar70 + lVar102 + lVar78 * 6] * dVar339 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar83 + lVar93 + lVar102 + lVar78 * 7] * dVar384 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar83 + lVar93 + lVar102 + lVar78 * 5] * dVar338 +
                               dVar431 * (double)local_a70._vptr_BaseFab
                                                 [lVar83 + lVar70 + lVar102 + lVar78 * 3]) *
                               (double)local_918._0_8_ +
                               ((double)local_a70._vptr_BaseFab
                                        [lVar82 + lVar71 + lVar77 + lVar78 * 7] * dVar122 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar82 + lVar71 + lVar77 + lVar78 * 6] * dVar385 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar82 + lVar71 + lVar77 + lVar78 * 2] * dVar552 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar82 + lVar71 + lVar77 + lVar78 * 4] * dVar338) *
                               local_968 +
                               ((double)local_a70._vptr_BaseFab
                                        [lVar82 + lVar70 + lVar77 + lVar78 * 6] * dVar472 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar82 + lVar93 + lVar77 + lVar78 * 7] * dVar122 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar82 + lVar93 + lVar77 + lVar78 * 4] * dVar338 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar82 + lVar70 + lVar77 + lVar78 * 2] * dVar431) *
                               local_948) * 0.125) * 0.5;
                          auVar343 = _DAT_00698470;
                          p_Var54 = local_a70._vptr_BaseFab[lVar89 + lVar93 + lVar106 + lVar78];
                          p_Var97 = local_a70._vptr_BaseFab[lVar89 + lVar70 + lVar106 + lVar78];
                          dVar469 = ABS((double)p_Var54) + ABS((double)p_Var97);
                          p_Var100 = local_a70._vptr_BaseFab[lVar92 + lVar57 + lVar106 + lVar78 * 2]
                          ;
                          p_Var2 = local_a70._vptr_BaseFab[lVar83 + lVar57 + lVar106 + lVar78 * 2];
                          p_Var3 = local_a70._vptr_BaseFab[lVar83 + lVar70 + lVar77 + lVar78];
                          local_be8 = local_a70._vptr_BaseFab[lVar83 + lVar70 + lVar77 + lVar78 * 2]
                          ;
                          uStack_be0 = 0;
                          p_Var4 = local_a70._vptr_BaseFab[lVar83 + lVar70 + lVar77 + lVar78 * 3];
                          p_Var5 = local_a70._vptr_BaseFab[lVar83 + lVar70 + lVar77 + lVar78 * 5];
                          p_Var6 = local_a70._vptr_BaseFab[lVar83 + lVar70 + lVar77 + lVar78 * 6];
                          p_Var7 = local_a70._vptr_BaseFab[lVar83 + lVar70 + lVar77 + lVar78 * 8];
                          local_aa8 = 0.5;
                          if ((double)p_Var97 != 0.0 || (double)p_Var54 != 0.0) {
                            local_aa8 = ABS((double)p_Var97) / dVar469;
                          }
                          p_Var8 = local_a70._vptr_BaseFab[lVar82 + lVar58 + lVar102 + lVar78];
                          lVar99 = (long)(iVar63 - local_a70.domain.smallend.vect[2]);
                          dVar550 = 0.5;
                          if ((double)p_Var97 != 0.0 || (double)p_Var54 != 0.0) {
                            dVar550 = ABS((double)p_Var54) / dVar469;
                          }
                          dVar469 = ABS((double)p_Var8);
                          local_d28 = dVar469 / (ABS((double)local_a70._vptr_BaseFab
                                                             [lVar82 + lVar99 + lVar102 + lVar78]) +
                                                dVar469);
                          if (((double)p_Var8 == 0.0) && (!NAN((double)p_Var8))) {
                            uVar107 = -(ulong)((double)local_a70._vptr_BaseFab
                                                       [lVar82 + lVar99 + lVar102 + lVar78] == 0.0);
                            local_d28 = (double)(uVar107 & 0x3fe0000000000000 |
                                                ~uVar107 & (ulong)local_d28);
                          }
                          uStack_d20 = 0;
                          local_12d8 = ABS((double)local_a70._vptr_BaseFab
                                                   [lVar82 + lVar104 + lVar102 + lVar78]);
                          local_12d8 = local_12d8 / (dVar469 + local_12d8);
                          if (((double)p_Var8 == 0.0) && (!NAN((double)p_Var8))) {
                            uVar107 = -(ulong)((double)local_a70._vptr_BaseFab
                                                       [lVar82 + lVar104 + lVar102 + lVar78] == 0.0)
                            ;
                            local_12d8 = (double)(uVar107 & 0x3fe0000000000000 |
                                                 ~uVar107 & (ulong)local_12d8);
                          }
                          auVar640._0_8_ =
                               (ulong)local_a70._vptr_BaseFab[lVar83 + lVar57 + lVar77 + lVar78 * 2]
                               & 0x7fffffffffffffff;
                          auVar640._8_8_ =
                               (ulong)local_a70._vptr_BaseFab[lVar92 + lVar57 + lVar77 + lVar78 * 2]
                               & 0x7fffffffffffffff;
                          dVar385 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar83 + lVar57 + lVar52 + lVar78 * 6]);
                          dVar578 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar92 + lVar57 + lVar52 + lVar78 * 6]);
                          dVar123 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar83 + lVar57 + lVar77 + lVar78 * 6]);
                          dStack_f20 = ABS((double)local_a70._vptr_BaseFab
                                                   [lVar92 + lVar57 + lVar77 + lVar78 * 6]);
                          auVar325._0_8_ = dVar385 + dVar123 + 1e-100;
                          auVar325._8_8_ = dVar578 + dStack_f20 + 1e-100;
                          auVar341 = divpd(auVar640,auVar325);
                          dVar121 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar83 + lVar57 + lVar52 + lVar78 * 3]) /
                                    (dVar578 + dVar385 + 1e-100);
                          dVar469 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar83 + lVar57 + lVar77 + lVar78 * 3]) /
                                    (dStack_f20 + dVar123 + 1e-100);
                          dVar122 = auVar341._0_8_ + 1.0;
                          dVar229 = auVar341._8_8_ + 1.0;
                          dVar123 = (dVar469 + dVar122) * dVar123;
                          dStack_f20 = (dVar469 + dVar229) * dStack_f20;
                          dVar334 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar89 + lVar93 + lVar52 + lVar78 * 5]);
                          dVar184 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar89 + lVar93 + lVar77 + lVar78 * 5]);
                          dVar469 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar89 + lVar70 + lVar52 + lVar78 * 5]);
                          dVar183 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar89 + lVar70 + lVar77 + lVar78 * 5]);
                          dVar429 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar89 + lVar70 + lVar52 + lVar78 * 3]) /
                                    (dVar334 + dVar469 + 1e-100);
                          dVar120 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar89 + lVar70 + lVar77 + lVar78 * 3]) /
                                    (dVar184 + dVar183 + 1e-100);
                          dVar124 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar89 + lVar93 + lVar77 + lVar78]) /
                                    (dVar334 + dVar184 + 1e-100) + 1.0;
                          dVar384 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar89 + lVar70 + lVar77 + lVar78]) /
                                    (dVar469 + dVar183 + 1e-100) + 1.0;
                          dVar184 = (dVar124 + dVar120) * dVar184;
                          local_f28 = (dVar121 + dVar122) * dVar385 + (dVar229 + dVar121) * dVar578
                                      + dStack_f20 + dVar123 + 1e-100;
                          dVar123 = dVar123 / local_f28;
                          dVar183 = (dVar384 + dVar120) * dVar183;
                          dVar229 = (dVar429 + dVar384) * dVar469 + (dVar124 + dVar429) * dVar334 +
                                    dVar184 + dVar183 + 1e-100;
                          dVar183 = dVar183 / dVar229;
                          auVar172._0_8_ =
                               (ulong)local_a70._vptr_BaseFab[lVar83 + lVar70 + lVar106 + lVar78] &
                               0x7fffffffffffffff;
                          auVar172._8_8_ =
                               (ulong)local_a70._vptr_BaseFab[lVar83 + lVar93 + lVar106 + lVar78] &
                               0x7fffffffffffffff;
                          dVar120 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar92 + lVar70 + lVar106 + lVar78 * 4]);
                          dStack_eb0 = ABS((double)local_a70._vptr_BaseFab
                                                   [lVar92 + lVar93 + lVar106 + lVar78 * 4]);
                          dVar122 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar83 + lVar70 + lVar106 + lVar78 * 4]);
                          dVar121 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar83 + lVar93 + lVar106 + lVar78 * 4]);
                          auVar326._0_8_ = dVar120 + dVar122 + 1e-100;
                          auVar326._8_8_ = dStack_eb0 + dVar121 + 1e-100;
                          auVar341 = divpd(auVar172,auVar326);
                          dVar124 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar92 + lVar70 + lVar106 + lVar78 * 2]) /
                                    (dStack_eb0 + dVar120 + 1e-100);
                          dVar384 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar83 + lVar70 + lVar106 + lVar78 * 2]) /
                                    (dVar121 + dVar122 + 1e-100);
                          dVar469 = auVar341._0_8_ + 1.0;
                          dVar334 = auVar341._8_8_ + 1.0;
                          dVar120 = (dVar124 + dVar469) * dVar120;
                          dStack_eb0 = (dVar124 + dVar334) * dStack_eb0;
                          dVar122 = (dVar384 + dVar469) * dVar122;
                          dVar121 = (dVar384 + dVar334) * dVar121;
                          local_eb8 = dStack_eb0 + dVar120 + dVar121 + dVar122 + 1e-100;
                          dVar122 = dVar122 / local_eb8;
                          dVar469 = ABS((double)p_Var100) + ABS((double)p_Var2);
                          local_878 = 0.5;
                          if ((double)p_Var2 != 0.0 || (double)p_Var100 != 0.0) {
                            local_878 = ABS((double)p_Var2) / dVar469;
                          }
                          local_c28 = (double)local_a70._vptr_BaseFab
                                              [lVar82 + lVar70 + lVar102 + lVar78 * 7] * dVar123;
                          local_a18 = (double)local_a70._vptr_BaseFab
                                              [lVar83 + lVar58 + lVar102 + lVar78 * 7] * dVar183;
                          p_Var54 = local_a70._vptr_BaseFab[lVar83 + lVar70 + lVar102 + lVar78 * 3];
                          local_ab8 = local_a70._vptr_BaseFab
                                      [lVar83 + lVar70 + lVar102 + lVar78 * 6];
                          local_ae8 = (double)local_a70._vptr_BaseFab
                                              [lVar82 + lVar58 + lVar77 + lVar78 * 7] * dVar122;
                          local_ef0 = (double)local_a70._vptr_BaseFab
                                              [lVar82 + lVar70 + lVar77 + lVar78 * 4] * dVar123;
                          local_c08 = local_a70._vptr_BaseFab[lVar82 + lVar70 + lVar77 + lVar78 * 6]
                          ;
                          local_ad8 = (double)local_a70._vptr_BaseFab
                                              [lVar83 + lVar58 + lVar77 + lVar78 * 4] * dVar183;
                          p_Var97 = local_a70._vptr_BaseFab[lVar83 + lVar70 + lVar77];
                          p_Var8 = local_a70._vptr_BaseFab[lVar82 + lVar58 + lVar102 + lVar78 * 2];
                          dVar334 = 0.5;
                          if ((double)p_Var2 != 0.0 || (double)p_Var100 != 0.0) {
                            dVar334 = ABS((double)p_Var100) / dVar469;
                          }
                          dVar469 = ABS((double)p_Var8);
                          local_c38 = dVar469 / (ABS((double)local_ca0[lVar58 + lVar102 + lVar78 * 2
                                                                      ]) + dVar469);
                          if (((double)p_Var8 == 0.0) && (!NAN((double)p_Var8))) {
                            uVar107 = -(ulong)((double)local_ca0[lVar58 + lVar102 + lVar78 * 2] ==
                                              0.0);
                            local_c38 = (double)(uVar107 & 0x3fe0000000000000 |
                                                ~uVar107 & (ulong)local_c38);
                          }
                          uStack_c30 = 0;
                          dVar124 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar88 + lVar58 + lVar102 + lVar78 * 2]);
                          local_1248 = (FabArray<amrex::FArrayBox> *)(dVar124 / (dVar469 + dVar124))
                          ;
                          p_Var100 = local_a70._vptr_BaseFab[lVar92 + lVar58 + lVar106 + lVar78 * 2]
                          ;
                          p_Var2 = local_a70._vptr_BaseFab[lVar83 + lVar58 + lVar106 + lVar78 * 2];
                          p_Var9 = local_a70._vptr_BaseFab[lVar82 + lVar93 + lVar106 + lVar78];
                          p_Var10 = local_a70._vptr_BaseFab[lVar82 + lVar70 + lVar106 + lVar78];
                          p_Var11 = local_14b8[lVar78];
                          local_bd8 = local_14b8[lVar78 * 4];
                          uStack_bd0 = 0;
                          p_Var12 = local_14b8[lVar78 * 5];
                          if (((double)p_Var8 == 0.0) && (!NAN((double)p_Var8))) {
                            uVar107 = -(ulong)((double)local_a70._vptr_BaseFab
                                                       [lVar88 + lVar58 + lVar102 + lVar78 * 2] ==
                                              0.0);
                            local_1248 = (FabArray<amrex::FArrayBox> *)
                                         (uVar107 & 0x3fe0000000000000 |
                                         ~uVar107 & (ulong)local_1248);
                          }
                          dVar469 = ABS((double)p_Var9) + ABS((double)p_Var10);
                          local_c18 = (Geometry *)0x3fe0000000000000;
                          if ((double)p_Var10 != 0.0 || (double)p_Var9 != 0.0) {
                            local_c18 = (Geometry *)(ABS((double)p_Var10) / dVar469);
                          }
                          dVar124 = ABS((double)local_a78[lVar77 + lVar78 * 3]);
                          dVar124 = dVar124 / (ABS((double)local_a78[lVar52 + lVar78 * 3]) + dVar124
                                              );
                          uVar107 = -(ulong)((double)local_a78[lVar77 + lVar78 * 3] == 0.0);
                          local_bf8 = 0.5;
                          if ((double)p_Var10 != 0.0 || (double)p_Var9 != 0.0) {
                            local_bf8 = ABS((double)p_Var9) / dVar469;
                          }
                          local_1478._0_8_ =
                               ABS((double)local_a70._vptr_BaseFab
                                           [lVar82 + lVar58 + lVar102 + lVar78 * 4]);
                          dVar430 = ABS((double)local_ca0[lVar58 + lVar102 + lVar78 * 4]);
                          stack0xffffffffffffeb90 = 0.0;
                          dVar331 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar99 + lVar102 + lVar78 * 4]);
                          dVar433 = ABS((double)local_ca0[lVar99 + lVar102 + lVar78 * 4]);
                          dVar339 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar99 + lVar102 + lVar78 * 2]) /
                                    ((double)local_1478._0_8_ + dVar331 + 1e-100);
                          dVar466 = ABS((double)local_ca0[lVar99 + lVar102 + lVar78 * 2]) /
                                    (dVar430 + dVar433 + 1e-100);
                          dVar552 = ABS((double)local_ca0[lVar58 + lVar102 + lVar78]) /
                                    ((double)local_1478._0_8_ + dVar430 + 1e-100) + 1.0;
                          dVar469 = ABS((double)local_ca0[lVar99 + lVar102 + lVar78]) /
                                    (dVar331 + dVar433 + 1e-100) + 1.0;
                          dVar338 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar58 + lVar102 + lVar78 * 3]);
                          dVar338 = dVar338 / (ABS((double)local_a70._vptr_BaseFab
                                                           [lVar82 + lVar58 + lVar77 + lVar78 * 3])
                                              + dVar338);
                          auVar275._0_8_ =
                               (ulong)local_a70._vptr_BaseFab[lVar82 + lVar99 + lVar77 + lVar78] &
                               0x7fffffffffffffff;
                          auVar275._8_8_ =
                               (ulong)local_a70._vptr_BaseFab[lVar82 + lVar58 + lVar77 + lVar78] &
                               0x7fffffffffffffff;
                          dVar336 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar99 + lVar102 + lVar78 * 5]);
                          dVar427 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar58 + lVar102 + lVar78 * 5]);
                          dVar471 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar99 + lVar77 + lVar78 * 5]);
                          dVar513 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar58 + lVar77 + lVar78 * 5]);
                          auVar217._0_8_ = dVar336 + dVar471 + 1e-100;
                          auVar217._8_8_ = dVar427 + dVar513 + 1e-100;
                          auVar341 = divpd(auVar275,auVar217);
                          dVar332 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar99 + lVar102 + lVar78 * 3]) /
                                    (dVar427 + dVar336 + 1e-100);
                          dVar281 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar99 + lVar77 + lVar78 * 3]) /
                                    (dVar513 + dVar471 + 1e-100);
                          dVar578 = auVar341._0_8_ + 1.0;
                          dStack_e20 = auVar341._8_8_ + 1.0;
                          auVar692._0_8_ =
                               (ulong)local_ca0[lVar58 + lVar77 + lVar78 * 2] & 0x7fffffffffffffff;
                          auVar692._8_8_ =
                               (ulong)local_a70._vptr_BaseFab[lVar82 + lVar58 + lVar77 + lVar78 * 2]
                               & 0x7fffffffffffffff;
                          dVar467 = ABS((double)local_ca0[lVar58 + lVar102 + lVar78 * 6]);
                          dVar470 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar58 + lVar102 + lVar78 * 6]);
                          dVar512 = ABS((double)local_ca0[lVar58 + lVar77 + lVar78 * 6]);
                          dVar514 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar58 + lVar77 + lVar78 * 6]);
                          auVar218._0_8_ = dVar467 + dVar512 + 1e-100;
                          auVar218._8_8_ = dVar470 + dVar514 + 1e-100;
                          auVar186 = divpd(auVar692,auVar218);
                          dVar431 = ABS((double)local_ca0[lVar58 + lVar102 + lVar78 * 3]) /
                                    (dVar470 + dVar467 + 1e-100);
                          dVar473 = ABS((double)local_ca0[lVar58 + lVar77 + lVar78 * 3]) /
                                    (dVar514 + dVar512 + 1e-100);
                          auVar507._0_8_ =
                               (ulong)local_a70._vptr_BaseFab[lVar83 + lVar58 + lVar77 + lVar78 * 2]
                               & 0x7fffffffffffffff;
                          auVar507._8_8_ =
                               (ulong)local_a70._vptr_BaseFab[lVar92 + lVar58 + lVar77 + lVar78 * 2]
                               & 0x7fffffffffffffff;
                          dVar386 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar83 + lVar58 + lVar52 + lVar78 * 6]);
                          dVar472 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar92 + lVar58 + lVar52 + lVar78 * 6]);
                          dVar384 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar83 + lVar58 + lVar77 + lVar78 * 6]);
                          dVar385 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar92 + lVar58 + lVar77 + lVar78 * 6]);
                          auVar219._0_8_ = dVar386 + dVar384 + 1e-100;
                          auVar219._8_8_ = dVar472 + dVar385 + 1e-100;
                          auVar341 = divpd(auVar507,auVar219);
                          dVar337 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar83 + lVar58 + lVar52 + lVar78 * 3]) /
                                    (dVar472 + dVar386 + 1e-100);
                          dVar388 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar83 + lVar58 + lVar77 + lVar78 * 3]) /
                                    (dVar385 + dVar384 + 1e-100);
                          dVar335 = auVar341._0_8_ + 1.0;
                          dVar387 = auVar341._8_8_ + 1.0;
                          local_14f8._0_8_ = (dVar552 + dVar339) * (double)local_1478._0_8_;
                          uVar333 = -(ulong)((double)local_a70._vptr_BaseFab
                                                     [lVar82 + lVar58 + lVar77 + lVar78 * 3] == 0.0)
                          ;
                          dVar429 = (dStack_e20 + dVar332) * dVar427;
                          dVar515 = auVar186._0_8_ + 1.0;
                          dVar615 = auVar186._8_8_ + 1.0;
                          dVar432 = (dVar431 + dVar615) * dVar470;
                          dVar384 = (dVar388 + dVar335) * dVar384;
                          dVar385 = (dVar388 + dVar387) * dVar385;
                          dVar388 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar89 + lVar58 + lVar77 + lVar78 * 3]);
                          dVar388 = dVar388 / (ABS((double)local_a70._vptr_BaseFab
                                                           [lVar89 + lVar58 + lVar52 + lVar78 * 3])
                                              + dVar388);
                          dVar184 = dVar184 / dVar229;
                          uVar111 = -(ulong)((double)local_a70._vptr_BaseFab
                                                     [lVar89 + lVar58 + lVar77 + lVar78 * 3] == 0.0)
                          ;
                          local_b08 = 0.5;
                          dVar229 = ABS((double)p_Var100) + ABS((double)p_Var2);
                          if ((double)p_Var2 != 0.0 || (double)p_Var100 != 0.0) {
                            local_b08 = ABS((double)p_Var2) / dVar229;
                          }
                          uVar112 = -(ulong)((double)local_a78[lVar52 + lVar78 * 3] == 0.0);
                          uVar114 = ~uVar333 & (ulong)dVar338;
                          local_d48 = 0.5;
                          uVar113 = -(ulong)((double)local_a70._vptr_BaseFab
                                                     [lVar89 + lVar58 + lVar52 + lVar78 * 3] == 0.0)
                          ;
                          dVar121 = dVar121 / local_eb8;
                          local_ce8 = (double)local_a70._vptr_BaseFab
                                              [lVar83 + lVar104 + lVar102 + lVar78 * 7] * dVar184;
                          local_cd8 = (double)local_a70._vptr_BaseFab
                                              [lVar82 + lVar104 + lVar77 + lVar78 * 7] * dVar121;
                          local_b18 = (double)local_a70._vptr_BaseFab
                                              [lVar83 + lVar104 + lVar77 + lVar78 * 4] * dVar184;
                          local_ac8 = local_ca0 + iVar65 + lVar102;
                          p_Var8 = local_a70._vptr_BaseFab[lVar82 + lVar57 + lVar102 + lVar78 * 2];
                          if ((double)p_Var2 != 0.0 || (double)p_Var100 != 0.0) {
                            local_d48 = ABS((double)p_Var100) / dVar229;
                          }
                          local_11a8._4_4_ =
                               (uint)(uVar114 >> 0x20) | (uint)(uVar333 >> 0x20) & 0x3fe00000;
                          local_df8 = ABS((double)local_a70._vptr_BaseFab
                                                  [lVar82 + lVar104 + lVar102 + lVar78 * 4]);
                          dVar555 = ABS((double)local_ac8[lVar78 * 4]);
                          local_d38 = ABS((double)local_a70._vptr_BaseFab
                                                  [lVar82 + lVar104 + lVar102 + lVar78 * 2]) /
                                      ((double)local_1478._0_8_ + local_df8 + 1e-100);
                          dVar579 = ABS((double)local_ac8[lVar78 * 2]) /
                                    (dVar430 + dVar555 + 1e-100);
                          dVar229 = ABS((double)local_ac8[lVar78]) / (local_df8 + dVar555 + 1e-100)
                                    + 1.0;
                          uStack_d30 = 0;
                          local_e68 = (local_d38 + dVar229) * local_df8;
                          dVar554 = ABS((double)p_Var8);
                          local_1188 = dVar554 / (ABS((double)local_ca0[lVar57 + lVar102 + lVar78 * 
                                                  2]) + dVar554);
                          lVar59 = -(ulong)((double)local_a70._vptr_BaseFab
                                                    [lVar82 + lVar58 + lVar102 + lVar78 * 3] == 0.0)
                          ;
                          dVar553 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar92 + lVar70 + lVar52 + lVar78 * 7]);
                          uStack_e70 = 0;
                          dVar556 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar83 + lVar70 + lVar52 + lVar78 * 7]);
                          dVar580 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar83 + lVar93 + lVar52 + lVar78 * 7]);
                          uStack_df0 = 0;
                          if (((double)p_Var8 == 0.0) && (!NAN((double)p_Var8))) {
                            uVar333 = -(ulong)((double)local_ca0[lVar57 + lVar102 + lVar78 * 2] ==
                                              0.0);
                            local_1188 = (double)(uVar333 & 0x3fe0000000000000 |
                                                 ~uVar333 & (ulong)local_1188);
                          }
                          local_688 = local_a70._vptr_BaseFab[lVar82 + lVar99 + lVar77 + lVar78 * 7]
                          ;
                          dVar581 = (double)(~uVar112 & (ulong)dVar124 |
                                            (~uVar107 & (ulong)dVar124 |
                                            uVar107 & 0x3fe0000000000000) & uVar112);
                          local_14c8._0_4_ = (uint)lVar59;
                          local_14c8._4_4_ = (uint)((ulong)lVar59 >> 0x20);
                          local_10c8._0_4_ = SUB84(dVar338,0);
                          local_10c8._4_4_ = (uint)((ulong)dVar338 >> 0x20);
                          local_1508 = CONCAT44(~local_14c8._4_4_ & local_10c8._4_4_,
                                                ~(uint)local_14c8 & (uint)local_10c8);
                          local_11a8._0_4_ = (uint)uVar114;
                          local_11a8 = CONCAT44(local_11a8._4_4_ & local_14c8._4_4_,
                                                (uint)local_11a8 & (uint)local_14c8);
                          dVar387 = (dVar337 + dVar335) * dVar386 + (dVar387 + dVar337) * dVar472 +
                                    dVar385 + dVar384 + 1e-100;
                          local_ec8 = ABS((double)local_a70._vptr_BaseFab
                                                  [lVar92 + lVar93 + lVar52 + lVar78 * 7]);
                          uStack_ec0 = 0;
                          dVar335 = (double)(~uVar113 & (ulong)dVar388 |
                                            (~uVar111 & (ulong)dVar388 |
                                            uVar111 & 0x3fe0000000000000) & uVar113);
                          p_Stack_680 = local_ca0[lVar58 + lVar77 + lVar78 * 7];
                          dVar124 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar57 + lVar77 + lVar78 * 3]);
                          dVar124 = dVar124 / (ABS((double)local_a70._vptr_BaseFab
                                                           [lVar82 + lVar57 + lVar52 + lVar78 * 3])
                                              + dVar124);
                          uVar107 = -(ulong)((double)local_a70._vptr_BaseFab
                                                     [lVar82 + lVar57 + lVar77 + lVar78 * 3] == 0.0)
                          ;
                          uVar333 = -(ulong)((double)local_a70._vptr_BaseFab
                                                     [lVar82 + lVar57 + lVar52 + lVar78 * 3] == 0.0)
                          ;
                          dVar124 = (double)((uVar107 & 0x3fe0000000000000 |
                                             ~uVar107 & (ulong)dVar124) & uVar333 |
                                            ~uVar333 & (ulong)dVar124);
                          local_f28 = dStack_f20 / local_f28;
                          local_888 = local_a70._vptr_BaseFab + lVar88 + lVar57;
                          local_d50 = local_888 + lVar102;
                          local_1458 = ABS((double)local_d50[lVar78 * 2]);
                          local_1458 = local_1458 / (dVar554 + local_1458);
                          local_a28 = local_a70._vptr_BaseFab[lVar82 + lVar70 + lVar52 + lVar78 * 5]
                          ;
                          p_Stack_a20 = local_a70._vptr_BaseFab
                                        [lVar82 + lVar93 + lVar52 + lVar78 * 5];
                          dVar337 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar58 + lVar102 + lVar78 * 7]);
                          local_b38 = local_a70._vptr_BaseFab[lVar82 + lVar70 + lVar77 + lVar78 * 5]
                          ;
                          p_Stack_b30 = local_a70._vptr_BaseFab
                                        [lVar82 + lVar93 + lVar77 + lVar78 * 5];
                          dVar120 = dVar120 / local_eb8;
                          local_c68._8_8_ = 0;
                          local_c68._0_8_ =
                               (double)local_a70._vptr_BaseFab
                                       [lVar88 + lVar70 + lVar102 + lVar78 * 7] * local_f28;
                          local_c58 = (double)local_a70._vptr_BaseFab
                                              [lVar88 + lVar58 + lVar77 + lVar78 * 7] * dVar120;
                          local_e18._8_8_ = 0;
                          local_e18._0_8_ =
                               (double)local_a70._vptr_BaseFab
                                       [lVar88 + lVar70 + lVar77 + lVar78 * 4] * local_f28;
                          local_d78 = local_a70._vptr_BaseFab + lVar88 + lVar99;
                          local_e08 = local_a70._vptr_BaseFab
                                      [lVar88 + lVar70 + lVar102 + lVar78 * 6];
                          local_13c8._4_4_ =
                               (undefined4)
                               ((ulong)ABS((double)local_a70._vptr_BaseFab
                                                   [lVar82 + lVar99 + lVar102 + lVar78 * 7]) >> 0x20
                               );
                          uStack_13c0 = SUB84(ABS((double)local_ca0[lVar58 + lVar102 + lVar78 * 7]),
                                              0);
                          local_14a8 = (double)CONCAT44(local_13c8._4_4_,uStack_13c0);
                          local_898._8_8_ = 0;
                          local_898._0_8_ =
                               local_a70._vptr_BaseFab[lVar82 + lVar104 + lVar77 + lVar78 * 7];
                          local_af8 = local_a70._vptr_BaseFab
                                      [lVar82 + lVar104 + lVar77 + lVar78 * 2];
                          uStack_af0 = 0;
                          p_Var100 = local_a70._vptr_BaseFab[lVar92 + lVar70 + lVar77 + lVar78 * 2];
                          p_Var2 = local_a70._vptr_BaseFab[lVar92 + lVar70 + lVar77 + lVar78 * 4];
                          p_Var9 = local_a70._vptr_BaseFab[lVar92 + lVar70 + lVar77 + lVar78 * 6];
                          local_d88 = local_a70._vptr_BaseFab[lVar88 + lVar70 + lVar77 + lVar78 * 2]
                          ;
                          p_Var10 = local_a70._vptr_BaseFab[lVar89 + lVar58 + lVar102 + lVar78];
                          if (((double)p_Var8 == 0.0) && (!NAN((double)p_Var8))) {
                            uVar107 = -(ulong)((double)local_d50[lVar78 * 2] == 0.0);
                            local_1458 = (double)(uVar107 & 0x3fe0000000000000 |
                                                 ~uVar107 & (ulong)local_1458);
                          }
                          local_14f8._0_8_ =
                               (double)local_14f8._0_8_ /
                               (dVar433 * (dVar469 + dVar466) +
                                (dVar552 + dVar466) * dVar430 +
                                (dVar339 + dVar469) * dVar331 + (double)local_14f8._0_8_ + 1e-100);
                          local_14f8._8_8_ = 0;
                          local_e68 = local_e68 /
                                      ((dVar552 + local_d38) * (double)local_1478._0_8_ + local_e68
                                       + (dVar552 + dVar579) * dVar430 +
                                       (dVar229 + dVar579) * dVar555 + 1e-100);
                          uStack_e60 = 0;
                          dVar582 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar104 + lVar102 + lVar78 * 5]);
                          dVar579 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar104 + lVar77 + lVar78 * 5]);
                          dVar680 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar104 + lVar102 + lVar78 * 3]) /
                                    (dVar427 + dVar582 + 1e-100);
                          dVar338 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar104 + lVar77 + lVar78 * 3]) /
                                    (dVar513 + dVar579 + 1e-100);
                          dVar662 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar104 + lVar77 + lVar78]) /
                                    (dVar582 + dVar579 + 1e-100) + 1.0;
                          dVar582 = (dVar680 + dVar662) * dVar582;
                          dVar229 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar57 + lVar102 + lVar78 * 3]);
                          dVar229 = dVar229 / (ABS((double)local_a70._vptr_BaseFab
                                                           [lVar82 + lVar57 + lVar77 + lVar78 * 3])
                                              + dVar229);
                          uVar107 = -(ulong)((double)local_a70._vptr_BaseFab
                                                     [lVar82 + lVar57 + lVar102 + lVar78 * 3] == 0.0
                                            );
                          uVar333 = -(ulong)((double)local_a70._vptr_BaseFab
                                                     [lVar82 + lVar57 + lVar77 + lVar78 * 3] == 0.0)
                          ;
                          uVar383 = (undefined4)((ulong)dVar337 >> 0x20);
                          auVar657._8_4_ = SUB84(dVar337,0);
                          auVar657._0_8_ = dVar337;
                          auVar657._12_4_ = uVar383;
                          local_e88 = dVar337 + ABS((double)local_a70._vptr_BaseFab
                                                            [lVar82 + lVar99 + lVar102 + lVar78 * 7]
                                                   );
                          dStack_e80 = auVar657._8_8_ +
                                       ABS((double)local_ca0[lVar58 + lVar102 + lVar78 * 7]);
                          dVar641 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar58 + lVar77 + lVar78 * 7]);
                          auVar173._8_4_ = SUB84(dVar641,0);
                          auVar173._0_8_ = dVar641;
                          auVar173._12_4_ = (int)((ulong)dVar641 >> 0x20);
                          auVar220._0_8_ =
                               (ulong)local_a70._vptr_BaseFab[lVar82 + lVar99 + lVar77 + lVar78 * 2]
                               & 0x7fffffffffffffff;
                          auVar220._8_8_ =
                               (ulong)local_ca0[lVar58 + lVar77 + lVar78] & 0x7fffffffffffffff;
                          auVar174._0_8_ = dVar641 + local_e88 + ABS((double)local_688) + 1e-100;
                          auVar174._8_8_ =
                               auVar173._8_8_ + dStack_e80 + ABS((double)p_Stack_680) + 1e-100;
                          auVar341 = divpd(auVar220,auVar174);
                          auVar327._0_8_ =
                               (ulong)local_a70._vptr_BaseFab[lVar82 + lVar58 + lVar77 + lVar78 * 4]
                               & 0x7fffffffffffffff;
                          auVar327._8_8_ =
                               (ulong)local_ca0[lVar99 + lVar102 + lVar78 * 3] & 0x7fffffffffffffff;
                          auVar377._0_8_ = dVar337 + dVar641 + 1e-100;
                          auVar377._8_8_ =
                               local_14a8 + local_e88 +
                               ABS((double)local_ca0[lVar99 + lVar102 + lVar78 * 7]) + 1e-100;
                          auVar186 = divpd(auVar327,auVar377);
                          auVar175._0_8_ = local_e88 + 1e-100;
                          auVar175._8_8_ = dStack_e80 + 1e-100;
                          auVar35._8_8_ =
                               (ulong)local_ca0[lVar58 + lVar102 + lVar78 * 5] & 0x7fffffffffffffff;
                          auVar35._0_8_ =
                               (ulong)local_a70._vptr_BaseFab
                                      [lVar82 + lVar99 + lVar102 + lVar78 * 6] & 0x7fffffffffffffff;
                          auVar285 = divpd(auVar35,auVar175);
                          auVar328._0_8_ =
                               (ulong)local_ca0[lVar57 + lVar77 + lVar78 * 2] & 0x7fffffffffffffff;
                          auVar328._8_8_ =
                               (ulong)local_a70._vptr_BaseFab[lVar82 + lVar57 + lVar77 + lVar78 * 2]
                               & 0x7fffffffffffffff;
                          dVar386 = ABS((double)local_ca0[lVar57 + lVar102 + lVar78 * 6]);
                          dVar472 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar57 + lVar102 + lVar78 * 6]);
                          dVar554 = ABS((double)local_ca0[lVar57 + lVar77 + lVar78 * 6]);
                          dVar555 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar57 + lVar77 + lVar78 * 6]);
                          auVar176._0_8_ = dVar386 + dVar554 + 1e-100;
                          auVar176._8_8_ = dVar472 + dVar555 + 1e-100;
                          auVar230 = divpd(auVar328,auVar176);
                          dVar583 = ABS((double)local_ca0[lVar57 + lVar102 + lVar78 * 3]) /
                                    (dVar472 + dVar386 + 1e-100);
                          dVar642 = ABS((double)local_ca0[lVar57 + lVar77 + lVar78 * 3]) /
                                    (dVar555 + dVar554 + 1e-100);
                          dVar466 = auVar230._0_8_ + 1.0;
                          dVar552 = auVar230._8_8_ + 1.0;
                          dVar616 = (dVar583 + dVar552) * dVar472;
                          auVar545._0_8_ =
                               (ulong)local_a70._vptr_BaseFab[lVar82 + lVar70 + lVar77 + lVar78] &
                               0x7fffffffffffffff;
                          auVar545._8_8_ =
                               (ulong)local_a70._vptr_BaseFab[lVar82 + lVar93 + lVar77 + lVar78] &
                               0x7fffffffffffffff;
                          dVar611 = ABS((double)local_a28);
                          dVar617 = ABS((double)p_Stack_a20);
                          dVar388 = ABS((double)local_b38);
                          dVar433 = ABS((double)p_Stack_b30);
                          auVar221._0_8_ = dVar611 + dVar388 + 1e-100;
                          auVar221._8_8_ = dVar617 + dVar433 + 1e-100;
                          auVar230 = divpd(auVar545,auVar221);
                          dVar663 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar70 + lVar52 + lVar78 * 3]) /
                                    (dVar617 + dVar611 + 1e-100);
                          dVar645 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar70 + lVar77 + lVar78 * 3]) /
                                    (dVar433 + dVar388 + 1e-100);
                          dVar469 = auVar230._0_8_ + 1.0;
                          dVar430 = auVar230._8_8_ + 1.0;
                          dVar388 = (dVar645 + dVar469) * dVar388;
                          dVar433 = (dVar645 + dVar430) * dVar433;
                          dVar611 = (dVar663 + dVar469) * dVar611 + (dVar430 + dVar663) * dVar617 +
                                    dVar433 + dVar388 + 1e-100;
                          dVar388 = dVar388 / dVar611;
                          dVar469 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar92 + lVar70 + lVar77 + lVar78 * 7]);
                          dStack_e90 = ABS((double)local_14b8[lVar78 * 7]);
                          auVar177._8_4_ = SUB84(dStack_e90,0);
                          auVar177._0_8_ = dStack_e90;
                          auVar177._12_4_ = (int)((ulong)dStack_e90 >> 0x20);
                          local_e28 = (double)local_a70._vptr_BaseFab
                                              [lVar92 + lVar70 + lVar102 + lVar78 * 6] * dVar388 +
                                      (double)local_a70._vptr_BaseFab
                                              [lVar92 + lVar70 + lVar102 + lVar78 * 7] * dVar124;
                          local_ed8._0_8_ = (double)p_Var100 * dVar388 + dVar124 * (double)p_Var2;
                          local_ed8._8_8_ = 0;
                          local_f48 = ABS((double)local_a70._vptr_BaseFab
                                                  [lVar88 + lVar58 + lVar102 + lVar78 * 4]);
                          dVar617 = ABS((double)local_d78[lVar102 + lVar78 * 4]);
                          dVar124 = ABS((double)local_d78[lVar102 + lVar78 * 2]) /
                                    (local_f48 + dVar617 + 1e-100);
                          dVar645 = ABS((double)local_d78[lVar102 + lVar78]) /
                                    (dVar331 + dVar617 + 1e-100) + 1.0;
                          local_c88 = ABS((double)local_a70._vptr_BaseFab
                                                  [lVar83 + lVar70 + lVar77 + lVar78 * 4]);
                          uStack_c80 = 0;
                          local_f38 = ABS((double)local_a70._vptr_BaseFab
                                                  [lVar88 + lVar58 + lVar102 + lVar78]) /
                                      ((double)local_1478._0_8_ + local_f48 + 1e-100) + 1.0;
                          local_b28 = (double)p_Var3 * dVar123;
                          uStack_b20 = 0;
                          dVar384 = dVar384 / dVar387;
                          dVar430 = (local_f38 + dVar124) * local_f48;
                          local_ea8 = ABS((double)p_Var10);
                          local_1388 = local_ea8 /
                                       (ABS((double)local_a70._vptr_BaseFab
                                                    [lVar89 + lVar99 + lVar102 + lVar78]) +
                                       local_ea8);
                          local_ee8 = ABS((double)p_Var100);
                          local_e78 = dVar553 + dVar556 + dVar469;
                          uStack_10d0 = auVar177._8_8_;
                          local_14d8._8_8_ = ABS((double)p_Var12);
                          local_14d8._0_8_ = ABS((double)p_Var9);
                          local_c78 = dStack_e90 * (double)p_Var7;
                          local_e98._0_4_ = SUB84(dVar469,0);
                          local_e98._4_4_ = (undefined4)((ulong)dVar469 >> 0x20);
                          uStack_ea0 = 0;
                          uStack_f30 = 0;
                          uStack_f40 = 0;
                          uStack_ee0 = 0;
                          uStack_c70 = uStack_10d0;
                          if (((double)p_Var10 == 0.0) && (!NAN((double)p_Var10))) {
                            uVar111 = -(ulong)((double)local_a70._vptr_BaseFab
                                                       [lVar89 + lVar99 + lVar102 + lVar78] == 0.0);
                            local_1388 = (double)(uVar111 & 0x3fe0000000000000 |
                                                 ~uVar111 & (ulong)local_1388);
                          }
                          p_Var8 = local_a70._vptr_BaseFab[lVar88 + lVar58 + lVar102 + lVar78 * 6];
                          auVar222._0_8_ =
                               ABS((double)local_a70._vptr_BaseFab
                                           [lVar88 + lVar58 + lVar77 + lVar78 * 6]);
                          auVar222._8_4_ = SUB84(p_Var8,0);
                          auVar222._12_4_ = (uint)((ulong)p_Var8 >> 0x20) & 0x7fffffff;
                          auVar508._0_8_ =
                               (ulong)local_a70._vptr_BaseFab[lVar88 + lVar58 + lVar77 + lVar78 * 3]
                               & 0x7fffffffffffffff;
                          auVar508._8_4_ =
                               SUB84(local_a70._vptr_BaseFab[lVar88 + lVar58 + lVar102 + lVar78 * 3]
                                     ,0);
                          auVar508._12_4_ =
                               (uint)((ulong)local_a70._vptr_BaseFab
                                             [lVar88 + lVar58 + lVar102 + lVar78 * 3] >> 0x20) &
                               0x7fffffff;
                          auVar276._0_8_ = dVar514 + auVar222._0_8_ + 1e-100;
                          auVar276._8_8_ = dVar470 + auVar222._8_8_ + 1e-100;
                          auVar287 = divpd(auVar508,auVar276);
                          dVar663 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar88 + lVar58 + lVar77 + lVar78 * 2]) /
                                    (ABS((double)p_Var8) + auVar222._0_8_ + 1e-100) + 1.0;
                          dVar697 = (auVar287._8_8_ + dVar663) * ABS((double)p_Var8);
                          dVar683 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar89 + lVar58 + lVar102 + lVar78 * 3]);
                          dVar683 = dVar683 / (ABS((double)local_a70._vptr_BaseFab
                                                           [lVar89 + lVar58 + lVar77 + lVar78 * 3])
                                              + dVar683);
                          p_Var8 = local_a70._vptr_BaseFab[lVar89 + lVar58 + lVar102 + lVar78 * 5];
                          uVar111 = -(ulong)((double)local_a70._vptr_BaseFab
                                                     [lVar89 + lVar58 + lVar77 + lVar78 * 3] == 0.0)
                          ;
                          uVar112 = -(ulong)((double)local_a70._vptr_BaseFab
                                                     [lVar89 + lVar58 + lVar102 + lVar78 * 3] == 0.0
                                            );
                          p_Var13 = local_a70._vptr_BaseFab[lVar89 + lVar58 + lVar77 + lVar78 * 5];
                          auVar223._0_8_ =
                               (ulong)local_a70._vptr_BaseFab[lVar89 + lVar99 + lVar77 + lVar78] &
                               0x7fffffffffffffff;
                          auVar223._8_4_ =
                               SUB84(local_a70._vptr_BaseFab[lVar89 + lVar58 + lVar77 + lVar78],0);
                          auVar223._12_4_ =
                               (uint)((ulong)local_a70._vptr_BaseFab
                                             [lVar89 + lVar58 + lVar77 + lVar78] >> 0x20) &
                               0x7fffffff;
                          auVar546._0_8_ =
                               ABS((double)local_a70._vptr_BaseFab
                                           [lVar89 + lVar99 + lVar102 + lVar78 * 5]);
                          auVar546._8_4_ = SUB84(p_Var8,0);
                          auVar546._12_4_ = (uint)((ulong)p_Var8 >> 0x20) & 0x7fffffff;
                          local_1168._0_8_ =
                               ABS((double)local_a70._vptr_BaseFab
                                           [lVar89 + lVar99 + lVar77 + lVar78 * 5]);
                          local_1168._8_4_ = SUB84(p_Var13,0);
                          local_1168._12_4_ = (uint)((ulong)p_Var13 >> 0x20) & 0x7fffffff;
                          auVar178._8_4_ = auVar546._8_4_;
                          auVar178._0_8_ = auVar546._0_8_;
                          auVar178._12_4_ = auVar546._12_4_;
                          dVar548 = local_1168._8_8_;
                          auVar179._0_8_ = auVar546._0_8_ + (double)local_1168._0_8_ + 1e-100;
                          auVar179._8_8_ = auVar178._8_8_ + dVar548 + 1e-100;
                          auVar230 = divpd(auVar223,auVar179);
                          dVar684 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar89 + lVar99 + lVar102 + lVar78 * 3]) /
                                    (ABS((double)p_Var8) + auVar546._0_8_ + 1e-100);
                          dVar549 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar89 + lVar99 + lVar77 + lVar78 * 3]) /
                                    (ABS((double)p_Var13) + (double)local_1168._0_8_ + 1e-100);
                          dVar685 = auVar230._0_8_ + 1.0;
                          dVar695 = auVar230._8_8_ + 1.0;
                          dVar660 = auVar546._8_8_;
                          uStack_f10 = (dVar684 + dVar695) * dVar660;
                          local_f18 = uStack_f10 /
                                      ((dVar549 + dVar695) * dVar548 +
                                       (dVar684 + dVar685) * auVar546._0_8_ + uStack_f10 +
                                       (dVar549 + dVar685) * (double)local_1168._0_8_ + 1e-100);
                          dVar684 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar58 + lVar77 + lVar78 * 3]);
                          dVar684 = dVar684 / (ABS((double)local_a70._vptr_BaseFab
                                                           [lVar82 + lVar58 + lVar52 + lVar78 * 3])
                                              + dVar684);
                          uVar113 = -(ulong)((double)local_a70._vptr_BaseFab
                                                     [lVar82 + lVar58 + lVar77 + lVar78 * 3] == 0.0)
                          ;
                          uVar114 = -(ulong)((double)local_a70._vptr_BaseFab
                                                     [lVar82 + lVar58 + lVar52 + lVar78 * 3] == 0.0)
                          ;
                          local_f08 = (double)((uVar113 & 0x3fe0000000000000 |
                                               ~uVar113 & (ulong)dVar684) & uVar114 |
                                              ~uVar114 & (ulong)dVar684);
                          uStack_f00 = 0;
                          dVar433 = dVar433 / dVar611;
                          dVar385 = dVar385 / dVar387;
                          p_Var8 = local_a70._vptr_BaseFab[lVar92 + lVar93 + lVar77 + lVar78 * 7];
                          auVar509._0_8_ =
                               ABS((double)local_a70._vptr_BaseFab
                                           [lVar83 + lVar70 + lVar77 + lVar78 * 7]);
                          auVar509._8_4_ = SUB84(p_Var8,0);
                          auVar509._12_4_ = (uint)((ulong)p_Var8 >> 0x20) & 0x7fffffff;
                          dVar685 = ABS((double)local_be8) /
                                    (dVar556 + dVar580 + dStack_e90 + auVar509._0_8_ + 1e-100);
                          auVar277._0_8_ = ABS((double)p_Var8);
                          auVar277._8_4_ = auVar509._8_4_;
                          auVar277._12_4_ = auVar509._12_4_;
                          p_Var8 = local_a70._vptr_BaseFab[lVar92 + lVar93 + lVar77 + lVar78 * 4];
                          auVar658._0_8_ = ABS((double)p_Var4);
                          auVar658._8_4_ = SUB84(p_Var8,0);
                          auVar658._12_4_ = (uint)((ulong)p_Var8 >> 0x20) & 0x7fffffff;
                          auVar378._0_8_ =
                               dStack_e90 + dVar469 + auVar277._0_8_ + auVar509._0_8_ + 1e-100;
                          auVar378._8_8_ = local_ec8 + auVar509._8_8_ + 1e-100;
                          auVar290 = divpd(auVar658,auVar378);
                          dVar611 = ABS((double)p_Var3) / (local_e78 + auVar509._0_8_ + 1e-100) +
                                    1.0;
                          dVar549 = auVar290._0_8_;
                          auVar693._8_4_ = (int)local_e98;
                          auVar693._0_8_ = dVar469;
                          auVar693._12_4_ = local_e98._4_4_;
                          auVar180._0_8_ = ABS((double)p_Var5);
                          auVar180._8_4_ = SUB84(p_Var2,0);
                          auVar180._12_4_ = (uint)((ulong)p_Var2 >> 0x20) & 0x7fffffff;
                          auVar694._0_8_ = dVar469 + auVar509._0_8_ + 1e-100;
                          auVar694._8_8_ = auVar693._8_8_ + dVar553 + 1e-100;
                          auVar230 = divpd(auVar180,auVar694);
                          dVar387 = ABS((double)p_Var6) / (auVar509._0_8_ + dStack_e90 + 1e-100);
                          dVar684 = (dVar611 + dVar685 + dVar549 +
                                     local_c88 / (dVar556 + auVar509._0_8_ + 1e-100) +
                                     auVar230._0_8_ + dVar387) * auVar509._0_8_ * (double)p_Var7;
                          dVar556 = ABS((double)p_Var11) /
                                    (dVar580 + local_ec8 + auVar277._0_8_ + dStack_e90 + 1e-100) +
                                    1.0;
                          auVar278._0_8_ = dVar469 + auVar277._0_8_ + 1e-100;
                          auVar278._8_8_ = dStack_e90 + auVar277._8_8_ + 1e-100;
                          local_14d8 = divpd(local_14d8,auVar278);
                          dVar580 = local_c78 *
                                    (ABS((double)local_bd8) / (dVar580 + dStack_e90 + 1e-100) +
                                     dVar685 + dVar556 + dVar549 + local_14d8._8_8_ + dVar387);
                          local_d68 = (double)((uVar333 & 0x3fe0000000000000 |
                                               ~uVar333 & (ulong)dVar229) & uVar107 |
                                              ~uVar107 & (ulong)dVar229) *
                                      ((double)local_a70._vptr_BaseFab
                                               [lVar82 + lVar104 + lVar77 + lVar78 * 4] * dVar580 +
                                      local_cd8) +
                                      (dVar582 /
                                      ((dStack_e20 + dVar680) * dVar427 + dVar582 +
                                       (dStack_e20 + dVar338) * dVar513 +
                                       (dVar662 + dVar338) * dVar579 + 1e-100)) *
                                      ((double)local_c08 * dVar121 +
                                      (double)local_a70._vptr_BaseFab
                                              [lVar82 + lVar93 + lVar77 + lVar78 * 7] * local_b08 +
                                      dVar384 * (double)local_a70._vptr_BaseFab
                                                        [lVar82 + lVar93 + lVar77 + lVar78 * 4] +
                                      (double)local_a70._vptr_BaseFab
                                              [lVar82 + lVar70 + lVar77 + lVar78 * 2] * dVar580) +
                                      local_1188 *
                                      ((double)local_a70._vptr_BaseFab
                                               [lVar83 + lVar104 + lVar102 + lVar78 * 5] * dVar580 +
                                      local_ce8) +
                                      local_e68 *
                                      ((double)local_ab8 * dVar184 +
                                      (double)local_a70._vptr_BaseFab
                                              [lVar83 + lVar93 + lVar102 + lVar78 * 7] * dVar335 +
                                      (double)local_a70._vptr_BaseFab
                                              [lVar83 + lVar93 + lVar102 + lVar78 * 5] * dVar384 +
                                      (double)p_Var54 * dVar580) +
                                      (double)local_a70._vptr_BaseFab
                                              [lVar82 + lVar104 + lVar102 + lVar78 * 7] * dVar580 +
                                      local_12d8 *
                                      ((double)local_9e8[lVar78 * 7] * dVar384 +
                                      (double)local_a70._vptr_BaseFab
                                              [lVar82 + lVar70 + lVar102 + lVar78 * 6] * dVar580);
                          uStack_d60 = 0;
                          dVar229 = local_ee8 /
                                    (dVar553 + local_ec8 + auVar277._0_8_ + dVar469 + 1e-100);
                          dStack_10f0 = auVar230._8_8_;
                          dVar582 = dVar469 * (double)p_Var7 *
                                    (dStack_10f0 + dVar611 + dVar229 + dVar549 + auVar230._0_8_ +
                                    (double)local_14d8._0_8_);
                          dVar579 = auVar277._0_8_ * (double)p_Var7 *
                                    (auVar290._8_8_ + dVar229 + dVar556 + dVar549 + local_14d8._8_8_
                                    + (double)local_14d8._0_8_);
                          dVar387 = dStack_eb0 / local_eb8;
                          lVar57 = (long)iVar65;
                          local_15c8 = dVar579 * (double)local_a70._vptr_BaseFab
                                                         [lVar88 + lVar57 + lVar77 + lVar78 * 4] +
                                       dVar387 * (double)local_a70._vptr_BaseFab
                                                         [lVar88 + lVar57 + lVar77 + lVar78 * 7];
                          dStack_15c0 = auVar277._8_8_;
                          dVar553 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar88 + lVar57 + lVar102 + lVar78 * 4]);
                          dVar556 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar88 + lVar57 + lVar102 + lVar78 * 2]) /
                                    (local_f48 + dVar553 + 1e-100);
                          dVar338 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar88 + lVar57 + lVar102 + lVar78]) /
                                    (local_df8 + dVar553 + 1e-100) + 1.0;
                          dVar427 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar82 + lVar104 + lVar77 + lVar78 * 7]);
                          dVar553 = (dVar338 + dVar556) * dVar553;
                          dVar229 = ABS((double)local_a70._vptr_BaseFab
                                                [lVar89 + lVar57 + lVar102 + lVar78]);
                          dVar229 = dVar229 / (local_ea8 + dVar229);
                          auVar461._0_8_ =
                               (ulong)local_d78[lVar102 + lVar78 * 6] & 0x7fffffffffffffff;
                          auVar461._8_8_ =
                               (ulong)local_a70._vptr_BaseFab
                                      [lVar88 + lVar58 + lVar102 + lVar78 * 5] & 0x7fffffffffffffff;
                          if (((double)p_Var10 == 0.0) && (!NAN((double)p_Var10))) {
                            uVar107 = -(ulong)((double)local_a70._vptr_BaseFab
                                                       [lVar89 + lVar57 + lVar102 + lVar78] == 0.0);
                            dVar229 = (double)(uVar107 & 0x3fe0000000000000 |
                                              ~uVar107 & (ulong)dVar229);
                          }
                          uVar182 = (uint)DAT_00698470;
                          uVar225 = DAT_00698470._4_4_;
                          uVar228 = DAT_00698470._8_4_;
                          uVar280 = DAT_00698470._12_4_;
                          uVar119 = (uint)local_a70._vptr_BaseFab
                                          [lVar88 + lVar58 + lVar102 + lVar78 * 7] & uVar182;
                          uVar181 = (uint)((ulong)local_a70._vptr_BaseFab
                                                  [lVar88 + lVar58 + lVar102 + lVar78 * 7] >> 0x20)
                                    & uVar225;
                          auVar329._0_8_ = (double)CONCAT44(uVar181,uVar119);
                          auVar329._8_4_ =
                               (uint)local_a70._vptr_BaseFab
                                     [lVar82 + lVar104 + lVar102 + lVar78 * 7] & uVar228;
                          auVar329._12_4_ =
                               (uint)((ulong)local_a70._vptr_BaseFab
                                             [lVar82 + lVar104 + lVar102 + lVar78 * 7] >> 0x20) &
                               uVar280;
                          auVar547._0_8_ = (double)CONCAT44(auVar329._12_4_,auVar329._8_4_);
                          auVar547._8_4_ = auVar329._8_4_;
                          auVar547._12_4_ = auVar329._12_4_;
                          dVar584 = auVar547._0_8_ + dVar337;
                          dVar585 = auVar547._8_8_ + ABS((double)local_ac8[lVar78 * 7]);
                          auVar38._4_4_ = auVar329._8_4_;
                          auVar38._0_4_ = uVar181;
                          auVar38._8_4_ = auVar329._12_4_;
                          auVar608._0_4_ =
                               (uint)local_a70._vptr_BaseFab[lVar82 + lVar104 + lVar77 + lVar78 * 4]
                               & uVar182;
                          auVar608._4_4_ =
                               (uint)((ulong)local_a70._vptr_BaseFab
                                             [lVar82 + lVar104 + lVar77 + lVar78 * 4] >> 0x20) &
                               uVar225;
                          auVar608._8_4_ = (uint)local_ac8[lVar78 * 3] & uVar228;
                          auVar608._12_4_ = (uint)((ulong)local_ac8[lVar78 * 3] >> 0x20) & uVar280;
                          auVar576._0_8_ = dVar427 + auVar38._4_8_ + 1e-100;
                          auVar576._8_8_ =
                               local_14a8 + dVar584 + ABS((double)local_ac8[lVar78 * 7]) + 1e-100;
                          auVar522 = divpd(auVar608,auVar576);
                          auVar609._0_8_ = dVar584 + 1e-100;
                          auVar609._8_8_ = dVar585 + 1e-100;
                          auVar37._8_8_ = (ulong)local_ac8[lVar78 * 5] & 0x7fffffffffffffff;
                          auVar37._0_8_ =
                               (ulong)local_a70._vptr_BaseFab
                                      [lVar82 + lVar104 + lVar102 + lVar78 * 6] & 0x7fffffffffffffff
                          ;
                          auVar625 = divpd(auVar37,auVar609);
                          auVar610._0_8_ =
                               (double)CONCAT44((uint)((ulong)local_a70._vptr_BaseFab
                                                              [lVar88 + lVar58 + lVar77 + lVar78 * 7
                                                              ] >> 0x20) & uVar225,
                                                (uint)local_a70._vptr_BaseFab
                                                      [lVar88 + lVar58 + lVar77 + lVar78 * 7] &
                                                uVar182);
                          auVar610._8_4_ = (uint)local_d78[lVar102 + lVar78 * 7] & uVar228;
                          auVar610._12_4_ =
                               (uint)((ulong)local_d78[lVar102 + lVar78 * 7] >> 0x20) & uVar280;
                          auVar577._0_8_ = (double)CONCAT44(auVar610._12_4_,auVar610._8_4_);
                          auVar577._8_4_ = SUB84(dVar337,0);
                          auVar577._12_4_ = uVar383;
                          auVar659._0_4_ =
                               (uint)local_a70._vptr_BaseFab[lVar88 + lVar58 + lVar77 + lVar78 * 4]
                               & uVar182;
                          auVar659._4_4_ =
                               (uint)((ulong)local_a70._vptr_BaseFab
                                             [lVar88 + lVar58 + lVar77 + lVar78 * 4] >> 0x20) &
                               uVar225;
                          auVar659._8_4_ = (uint)local_d78[lVar102 + lVar78 * 3] & uVar228;
                          auVar659._12_4_ =
                               (uint)((ulong)local_d78[lVar102 + lVar78 * 3] >> 0x20) & uVar280;
                          auVar677._0_8_ = auVar329._0_8_ + auVar610._0_8_ + 1e-100;
                          auVar677._8_8_ = local_e88 + auVar329._0_8_ + auVar610._8_8_ + 1e-100;
                          auVar628 = divpd(auVar659,auVar677);
                          auVar678._0_8_ = (double)CONCAT44(uVar181,uVar119);
                          auVar678._8_4_ = uVar119;
                          auVar678._12_4_ = uVar181;
                          dVar612 = auVar678._8_8_ + auVar577._8_8_;
                          auVar679._0_8_ = auVar678._0_8_ + auVar577._0_8_ + 1e-100;
                          auVar679._8_8_ = dVar612 + 1e-100;
                          auVar354 = divpd(auVar461,auVar679);
                          uVar119 = (uint)local_a70._vptr_BaseFab
                                          [lVar88 + lVar57 + lVar102 + lVar78 * 7] & uVar182;
                          uVar181 = (uint)((ulong)local_a70._vptr_BaseFab
                                                  [lVar88 + lVar57 + lVar102 + lVar78 * 7] >> 0x20)
                                    & uVar225;
                          auVar379._0_8_ = (double)CONCAT44(uVar181,uVar119);
                          auVar379._8_4_ = uVar119;
                          auVar379._12_4_ = uVar181;
                          dVar557 = auVar329._8_8_ + auVar379._8_8_;
                          dVar558 = (double)CONCAT44((uint)((ulong)local_a70._vptr_BaseFab
                                                                   [lVar88 + lVar57 + lVar77 + 
                                                  lVar78 * 7] >> 0x20) & uVar225,
                                                  (uint)local_a70._vptr_BaseFab
                                                        [lVar88 + lVar57 + lVar77 + lVar78 * 7] &
                                                  uVar182);
                          auVar380._0_4_ =
                               (uint)local_a70._vptr_BaseFab[lVar88 + lVar57 + lVar77 + lVar78 * 4]
                               & uVar182;
                          auVar380._4_4_ =
                               (uint)((ulong)local_a70._vptr_BaseFab
                                             [lVar88 + lVar57 + lVar77 + lVar78 * 4] >> 0x20) &
                               uVar225;
                          auVar380._8_4_ =
                               (uint)local_a70._vptr_BaseFab[lVar88 + lVar57 + lVar102 + lVar78 * 3]
                               & uVar228;
                          auVar380._12_4_ =
                               (uint)((ulong)local_a70._vptr_BaseFab
                                             [lVar88 + lVar57 + lVar102 + lVar78 * 3] >> 0x20) &
                               uVar280;
                          auVar510._0_8_ = dVar558 + auVar379._0_8_ + 1e-100;
                          auVar510._8_8_ = dVar584 + auVar329._0_8_ + auVar379._8_8_ + 1e-100;
                          auVar230 = divpd(auVar380,auVar510);
                          auVar426._0_4_ =
                               (uint)local_a70._vptr_BaseFab[lVar88 + lVar57 + lVar102 + lVar78 * 6]
                               & uVar182;
                          auVar426._4_4_ =
                               (uint)((ulong)local_a70._vptr_BaseFab
                                             [lVar88 + lVar57 + lVar102 + lVar78 * 6] >> 0x20) &
                               uVar225;
                          auVar426._8_4_ =
                               (uint)local_a70._vptr_BaseFab[lVar88 + lVar57 + lVar102 + lVar78 * 5]
                               & uVar228;
                          auVar426._12_4_ =
                               (uint)((ulong)local_a70._vptr_BaseFab
                                             [lVar88 + lVar57 + lVar102 + lVar78 * 5] >> 0x20) &
                               uVar280;
                          auVar330._0_8_ = auVar329._0_8_ + auVar379._0_8_ + 1e-100;
                          auVar330._8_8_ = dVar557 + 1e-100;
                          auVar290 = divpd(auVar426,auVar330);
                          auVar381._0_8_ =
                               (double)CONCAT44((uint)((ulong)local_888[lVar77 + lVar78 * 6] >> 0x20
                                                      ) & uVar225,
                                                (uint)local_888[lVar77 + lVar78 * 6] & uVar182);
                          auVar381._8_4_ = (uint)local_d50[lVar78 * 6] & uVar228;
                          auVar381._12_4_ = (uint)((ulong)local_d50[lVar78 * 6] >> 0x20) & uVar280;
                          dVar611 = (double)CONCAT44(auVar381._12_4_,auVar381._8_4_);
                          auVar462._0_4_ = (uint)local_888[lVar77 + lVar78 * 3] & uVar182;
                          auVar462._4_4_ =
                               (uint)((ulong)local_888[lVar77 + lVar78 * 3] >> 0x20) & uVar225;
                          auVar462._8_4_ = (uint)local_d50[lVar78 * 3] & uVar228;
                          auVar462._12_4_ = (uint)((ulong)local_d50[lVar78 * 3] >> 0x20) & uVar280;
                          auVar224._0_8_ = dVar555 + auVar381._0_8_ + 1e-100;
                          auVar224._8_8_ = dVar472 + auVar381._8_8_ + 1e-100;
                          auVar404 = divpd(auVar462,auVar224);
                          dVar680 = (double)CONCAT44((uint)((ulong)local_888[lVar77 + lVar78 * 2] >>
                                                           0x20) & uVar225,
                                                     (uint)local_888[lVar77 + lVar78 * 2] & uVar182)
                                    / (dVar611 + auVar381._0_8_ + 1e-100) + 1.0;
                          dVar611 = (auVar404._8_8_ + dVar680) * dVar611;
                          auVar382._0_8_ =
                               (double)CONCAT44((uint)((ulong)local_a70._vptr_BaseFab
                                                              [lVar89 + lVar57 + lVar77 + lVar78 * 5
                                                              ] >> 0x20) & uVar225,
                                                (uint)local_a70._vptr_BaseFab
                                                      [lVar89 + lVar57 + lVar77 + lVar78 * 5] &
                                                uVar182);
                          auVar382._8_4_ =
                               (uint)local_a70._vptr_BaseFab[lVar89 + lVar57 + lVar102 + lVar78 * 5]
                               & uVar228;
                          auVar382._12_4_ =
                               (uint)((ulong)local_a70._vptr_BaseFab
                                             [lVar89 + lVar57 + lVar102 + lVar78 * 5] >> 0x20) &
                               uVar280;
                          dVar685 = (double)CONCAT44(auVar382._12_4_,auVar382._8_4_);
                          auVar463._0_4_ =
                               (uint)local_a70._vptr_BaseFab[lVar89 + lVar57 + lVar77 + lVar78 * 3]
                               & uVar182;
                          auVar463._4_4_ =
                               (uint)((ulong)local_a70._vptr_BaseFab
                                             [lVar89 + lVar57 + lVar77 + lVar78 * 3] >> 0x20) &
                               uVar225;
                          auVar463._8_4_ =
                               (uint)local_a70._vptr_BaseFab[lVar89 + lVar57 + lVar102 + lVar78 * 3]
                               & uVar228;
                          auVar463._12_4_ =
                               (uint)((ulong)local_a70._vptr_BaseFab
                                             [lVar89 + lVar57 + lVar102 + lVar78 * 3] >> 0x20) &
                               uVar280;
                          auVar279._0_8_ = dVar548 + auVar382._0_8_ + 1e-100;
                          auVar279._8_8_ = dVar660 + auVar382._8_8_ + 1e-100;
                          auVar487 = divpd(auVar463,auVar279);
                          dVar549 = (double)CONCAT44((uint)((ulong)local_a70._vptr_BaseFab
                                                                   [lVar89 + lVar57 + lVar77 + 
                                                  lVar78] >> 0x20) & uVar225,
                                                  (uint)local_a70._vptr_BaseFab
                                                        [lVar89 + lVar57 + lVar77 + lVar78] &
                                                  uVar182) / (dVar685 + auVar382._0_8_ + 1e-100) +
                                    1.0;
                          dVar685 = (auVar487._8_8_ + dVar549) * dVar685;
                          p_Var2 = local_a78[lVar102 + lVar78 * 3];
                          p_Var7 = local_a78[lVar77 + lVar78 * 3];
                          dVar662 = (double)CONCAT44((uint)((ulong)p_Var2 >> 0x20) & uVar225,
                                                     (uint)p_Var2 & uVar182);
                          dVar662 = dVar662 / ((double)CONCAT44((uint)((ulong)p_Var7 >> 0x20) &
                                                                uVar225,(uint)p_Var7 & uVar182) +
                                              dVar662);
                          *(double *)(local_270 + (long)local_cb8 * 8) =
                               (((double)((-(ulong)((double)p_Var7 == 0.0) & 0x3fe0000000000000 |
                                          ~-(ulong)((double)p_Var7 == 0.0) & (ulong)dVar662) &
                                          -(ulong)((double)p_Var2 == 0.0) |
                                         ~-(ulong)((double)p_Var2 == 0.0) & (ulong)dVar662) *
                                 local_15c8 +
                                (dVar685 /
                                ((dVar695 + auVar487._8_8_) * dVar660 + dVar685 +
                                 (dVar695 + auVar487._0_8_) * dVar548 +
                                 (dVar549 + auVar487._0_8_) * auVar382._0_8_ + 1e-100)) *
                                ((double)local_a70._vptr_BaseFab
                                         [lVar88 + lVar70 + lVar77 + lVar78 * 6] * dVar387 +
                                local_d48 * (double)local_cc8[lVar78 * 7] +
                                dVar385 * (double)local_cc8[lVar78 * 4] +
                                (double)local_d88 * dVar579) +
                                (dVar611 /
                                ((dVar552 + auVar404._8_8_) * dVar472 + dVar611 +
                                 (dVar552 + auVar404._0_8_) * dVar555 +
                                 (dVar680 + auVar404._0_8_) * auVar381._0_8_ + 1e-100)) *
                                ((double)local_a70._vptr_BaseFab
                                         [lVar83 + lVar104 + lVar77 + lVar78 * 5] * dVar387 +
                                local_bf8 * (double)local_c48[lVar78 * 7] +
                                dVar433 * (double)local_c48[lVar78 * 4] +
                                (double)local_a70._vptr_BaseFab[lVar83 + lVar104 + lVar77 + lVar78]
                                * dVar579) +
                                (double)local_a70._vptr_BaseFab
                                        [lVar88 + lVar57 + lVar77 + lVar78 * 8] *
                                (double)CONCAT44(uVar181,uVar119) *
                                (auVar290._8_8_ +
                                 auVar230._8_8_ +
                                 (double)CONCAT44((uint)((ulong)local_a70._vptr_BaseFab
                                                                [lVar88 + lVar57 + lVar77 + lVar78 *
                                                                                            2] >>
                                                        0x20) & uVar225,
                                                  (uint)local_a70._vptr_BaseFab
                                                        [lVar88 + lVar57 + lVar77 + lVar78 * 2] &
                                                  uVar182) /
                                 (auVar610._0_8_ + auVar329._0_8_ + auVar379._0_8_ + dVar558 +
                                 1e-100) + (double)CONCAT44((uint)((ulong)local_a70._vptr_BaseFab
                                                                          [lVar88 + lVar57 + lVar77 
                                                  + lVar78] >> 0x20) & uVar225,
                                                  (uint)local_a70._vptr_BaseFab
                                                        [lVar88 + lVar57 + lVar77 + lVar78] &
                                                  uVar182) / (dVar557 + dVar427 + dVar558 + 1e-100)
                                           + 1.0 + auVar230._0_8_ + auVar290._0_8_) *
                                ((double)p_Var4 * dVar387 +
                                (double)p_Var12 * local_d48 +
                                (double)p_Var9 * local_bf8 +
                                (double)p_Var97 * dVar579 +
                                (double)p_Var11 * dVar385 +
                                local_f08 * (double)p_Var8 + (double)p_Var100 * dVar433 +
                                (double)local_a70._vptr_BaseFab
                                        [lVar92 + lVar93 + lVar77 + lVar78 * 7]) +
                                (double)local_a70._vptr_BaseFab
                                        [lVar88 + lVar57 + lVar102 + lVar78 * 7] * dVar579 +
                                dVar229 * ((double)local_d18[lVar78 * 7] * dVar385 +
                                          (double)local_e08 * dVar579) +
                                (dVar553 /
                                ((local_f38 + dVar556) * local_f48 +
                                 (local_d38 + dVar338) * local_df8 +
                                 (double)local_1478._0_8_ * (local_d38 + local_f38) + dVar553 +
                                1e-100)) *
                                ((double)p_Var54 * dVar579 +
                                (double)local_a70._vptr_BaseFab
                                        [lVar83 + lVar93 + lVar102 + lVar78 * 5] * dVar385 +
                                (double)local_858[lVar78 * 7] * local_f08 +
                                (double)local_a70._vptr_BaseFab
                                        [lVar92 + lVar70 + lVar102 + lVar78 * 6] * dVar433) +
                                ((double)local_a70._vptr_BaseFab
                                         [lVar92 + lVar80 + lVar102 + lVar78 * 7] * dVar433 +
                                (double)local_a70._vptr_BaseFab
                                        [lVar83 + lVar104 + lVar102 + lVar78 * 5] * dVar579) *
                                local_1458) * 0.125 +
                               (local_f18 *
                                (dVar334 * (double)local_a70._vptr_BaseFab
                                                   [lVar88 + lVar70 + lVar77 + lVar78 * 7] +
                                dVar120 * (double)local_a70._vptr_BaseFab
                                                  [lVar88 + lVar70 + lVar77 + lVar78 * 6] +
                                (double)local_d88 * dVar582 +
                                (double)local_a70._vptr_BaseFab
                                        [lVar88 + lVar70 + lVar77 + lVar78 * 4] * local_f28) +
                               (double)((uVar111 & 0x3fe0000000000000 | ~uVar111 & (ulong)dVar683) &
                                        uVar112 | ~uVar112 & (ulong)dVar683) *
                               (dVar582 * (double)local_a70._vptr_BaseFab
                                                  [lVar88 + lVar58 + lVar77 + lVar78 * 4] +
                               local_c58) +
                               (double)local_d78[lVar77 + lVar78 * 8] * auVar329._0_8_ *
                               (auVar354._8_8_ +
                                auVar628._8_8_ +
                                ABS((double)local_d78[lVar77 + lVar78 * 2]) /
                                (ABS((double)local_d78[lVar77 + lVar78 * 7]) +
                                 auVar610._0_8_ + auVar678._0_8_ + auVar577._0_8_ + 1e-100) +
                                ABS((double)local_a70._vptr_BaseFab
                                            [lVar88 + lVar58 + lVar77 + lVar78]) /
                                (dVar612 + dVar641 + auVar610._0_8_ + 1e-100) + 1.0 + auVar628._0_8_
                               + auVar354._0_8_) *
                               ((double)p_Var5 * dVar334 +
                               (double)p_Var4 * dVar120 +
                               (double)p_Var3 * local_f28 +
                               (double)p_Var97 * dVar582 + (double)local_ed8._0_8_ +
                               (double)p_Var9 * (double)local_c18 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar92 + lVar70 + lVar77 + lVar78 * 7]) +
                               ((double)local_a70._vptr_BaseFab
                                        [lVar83 + lVar58 + lVar77 + lVar78 * 5] * dVar120 +
                               (double)local_c18 *
                               (double)local_a70._vptr_BaseFab
                                       [lVar92 + lVar58 + lVar77 + lVar78 * 7] +
                               dVar388 * (double)local_a70._vptr_BaseFab
                                                 [lVar92 + lVar58 + lVar77 + lVar78 * 4] +
                               (double)local_a70._vptr_BaseFab[lVar83 + lVar58 + lVar77 + lVar78] *
                               dVar582) *
                               (dVar697 /
                               ((dVar615 + auVar287._8_8_) * dVar470 + dVar697 +
                                (dVar615 + auVar287._0_8_) * dVar514 +
                                (dVar663 + auVar287._0_8_) * auVar222._0_8_ + 1e-100)) +
                               ((double)local_e08 * dVar582 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar88 + lVar70 + lVar102 + lVar78 * 7] * local_f28) *
                               local_1388 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar88 + lVar58 + lVar102 + lVar78 * 7] * dVar582 +
                               ((double)local_a70._vptr_BaseFab
                                        [lVar83 + lVar70 + lVar102 + lVar78 * 5] * local_f28 +
                               (double)p_Var54 * dVar582 + local_e28) *
                               (dVar430 /
                               ((dVar339 + dVar645) * dVar331 +
                                (dVar339 + local_f38) * (double)local_1478._0_8_ + dVar430 +
                                (dVar645 + dVar124) * dVar617 + 1e-100)) +
                               (double)local_1248 *
                               ((double)local_de8[lVar78 * 7] * dVar388 +
                               (double)local_a70._vptr_BaseFab
                                       [lVar83 + lVar58 + lVar102 + lVar78 * 5] * dVar582)) * 0.125
                               + ((double)(local_1508 | local_11a8) *
                                  ((double)local_a70._vptr_BaseFab
                                           [lVar82 + lVar58 + lVar77 + lVar78 * 4] * dVar684 +
                                  local_ae8) +
                                  (double)local_14f8._0_8_ *
                                  ((double)local_a70._vptr_BaseFab
                                           [lVar83 + lVar70 + lVar102 + lVar78 * 7] * dVar581 +
                                  (double)local_ab8 * dVar183 +
                                  (double)p_Var54 * dVar684 +
                                  dVar123 * (double)local_a70._vptr_BaseFab
                                                    [lVar83 + lVar70 + lVar102 + lVar78 * 5]) +
                                  local_c38 *
                                  ((double)local_a70._vptr_BaseFab
                                           [lVar83 + lVar58 + lVar102 + lVar78 * 5] * dVar684 +
                                  local_a18) +
                                  ((double)local_a70._vptr_BaseFab
                                           [lVar82 + lVar70 + lVar102 + lVar78 * 6] * dVar684 +
                                  local_c28) * local_d28 +
                                  (double)local_a70._vptr_BaseFab
                                          [lVar82 + lVar58 + lVar102 + lVar78 * 7] * dVar684 +
                                  (dVar429 /
                                  ((dVar281 + dVar578) * dVar471 +
                                   (dVar281 + dStack_e20) * dVar513 +
                                   (dVar332 + dVar578) * dVar336 + dVar429 + 1e-100)) *
                                  ((double)local_a70._vptr_BaseFab
                                           [lVar82 + lVar70 + lVar77 + lVar78 * 7] * local_878 +
                                  (double)local_c08 * dVar122 +
                                  (double)local_a70._vptr_BaseFab
                                          [lVar82 + lVar70 + lVar77 + lVar78 * 2] * dVar684 +
                                  local_ef0) +
                                  (dVar432 /
                                  ((dVar473 + dVar515) * dVar512 +
                                   (dVar473 + dVar615) * dVar514 +
                                   (dVar431 + dVar515) * dVar467 + dVar432 + 1e-100)) *
                                  ((double)local_a70._vptr_BaseFab
                                           [lVar83 + lVar58 + lVar77 + lVar78 * 7] * local_aa8 +
                                  (double)local_a70._vptr_BaseFab
                                          [lVar83 + lVar58 + lVar77 + lVar78 * 5] * dVar122 +
                                  (double)local_a70._vptr_BaseFab[lVar83 + lVar58 + lVar77 + lVar78]
                                  * dVar684 + local_ad8) +
                                 (double)local_ca0[lVar99 + lVar77 + lVar78 * 8] * dVar337 *
                                 (auVar285._8_8_ +
                                  auVar186._8_8_ + auVar341._8_8_ + 1.0 + auVar341._0_8_ +
                                  auVar186._0_8_ + auVar285._0_8_) *
                                 (local_aa8 * (double)p_Var6 +
                                  local_878 * (double)p_Var5 +
                                  dVar122 * (double)p_Var4 +
                                  (double)local_a70._vptr_BaseFab
                                          [lVar83 + lVar70 + lVar77 + lVar78 * 4] * dVar581 +
                                  dVar183 * (double)local_be8 +
                                  dVar684 * (double)p_Var97 + local_b28 +
                                 (double)local_a70._vptr_BaseFab
                                         [lVar83 + lVar70 + lVar77 + lVar78 * 7])) * 0.125 +
                                 ((dVar616 /
                                  ((dVar642 + dVar552) * dVar555 +
                                   (dVar583 + dVar466) * dVar386 + dVar616 +
                                   (dVar642 + dVar466) * dVar554 + 1e-100)) *
                                  (dVar550 * (double)local_a70._vptr_BaseFab
                                                     [lVar83 + lVar104 + lVar77 + lVar78 * 7] +
                                  dVar121 * (double)local_a70._vptr_BaseFab
                                                    [lVar83 + lVar104 + lVar77 + lVar78 * 5] +
                                  dVar580 * (double)local_a70._vptr_BaseFab
                                                    [lVar83 + lVar104 + lVar77 + lVar78] + local_b18
                                  ) + (double)local_ca0[(long)iVar65 + lVar77 + lVar78 * 8] *
                                      auVar547._0_8_ *
                                      (auVar625._8_8_ +
                                       auVar522._8_8_ +
                                       ABS((double)local_af8) /
                                       (dVar641 + dVar584 + dVar427 + 1e-100) +
                                       ABS((double)local_ca0[(long)iVar65 + lVar77 + lVar78]) /
                                       (dVar585 + dVar427 +
                                        ABS((double)local_ca0[(long)iVar65 + lVar77 + lVar78 * 7]) +
                                       1e-100) + 1.0 + auVar522._0_8_ + auVar625._0_8_) *
                                      ((double)p_Var6 * dVar550 +
                                      (double)p_Var4 * dVar121 +
                                      local_b08 * (double)p_Var12 +
                                      (double)local_be8 * dVar184 +
                                      (double)local_bd8 * dVar335 +
                                      (double)p_Var97 * dVar580 + (double)p_Var11 * dVar384 +
                                      (double)local_14b8[lVar78 * 7]) + local_d68) * 0.125) * 0.25;
                          lVar103 = lVar103 + 1;
                          dStack_c50 = dStack_cc0;
                          local_a08 = dStack_eb0;
                          dStack_a00 = dStack_eb0;
                          dStack_700 = dStack_710;
                          dStack_6f0 = dStack_710;
                          local_508 = dStack_550;
                          dStack_500 = dStack_550;
                        } while (local_5fc != (int)lVar103);
                      }
                      local_660 = local_660 + 1;
                      local_e98 = dVar469;
                    } while (local_600 != (int)local_660);
                  }
                  local_668 = (ulong)(iVar48 + 1);
                } while (iVar48 != iStack_834);
              }
              MFIter::operator++((MFIter *)&local_bc8);
            }
            MFIter::~MFIter((MFIter *)&local_bc8);
            MFIter::MFIter((MFIter *)&local_bc8,&local_670->super_FabArrayBase,true);
            while (local_ba8[0] < local_ba8[2]) {
              MFIter::tilebox((Box *)&local_a70,(MFIter *)&local_bc8);
              FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                        ((Array4<double> *)local_dd8,local_670,(MFIter *)&local_bc8);
              uVar107 = (ulong)DAT_00697990;
              uVar333 = (ulong)DAT_00698470;
              if ((int)local_a70.super_DataAllocator.m_arena <= local_a70.dptr._4_4_) {
                lVar75 = (long)local_a70._vptr_BaseFab._4_4_;
                local_14b8._0_4_ = (int)local_a70.dptr + 1;
                iVar48 = (int)local_a70.super_DataAllocator.m_arena + -1;
                local_1478._0_8_ = lVar75 + -1;
                iVar63 = (int)local_a70.super_DataAllocator.m_arena;
                do {
                  if (local_a70._vptr_BaseFab._4_4_ <= (int)local_a70.dptr) {
                    lVar51 = CONCAT44(iStack_dbc,iStack_dc0);
                    lVar53 = CONCAT44(local_dd8._12_4_,local_dd8._8_4_) * 8;
                    lVar92 = (lVar75 - iStack_db4) * lVar53;
                    lVar76 = ((long)iVar48 - (long)local_db0) * local_dd8._16_8_ * 8;
                    lVar106 = lVar92 + lVar76;
                    lVar102 = lVar51 * 0x38;
                    lVar78 = ((long)iVar63 - (long)local_db0) * local_dd8._16_8_ * 8;
                    lVar92 = lVar92 + lVar78;
                    lVar77 = ((lVar75 + -1) - (long)iStack_db4) * lVar53;
                    lVar76 = lVar76 + lVar77;
                    lVar77 = lVar77 + lVar78;
                    lVar78 = lVar51 * 0x30;
                    lVar67 = (long)local_db8;
                    local_1690 = lVar76 + lVar102 + lVar67 * -8;
                    local_1618 = lVar102 + lVar77 + lVar67 * -8;
                    lVar52 = lVar51 * 0x20 + lVar77 + lVar67 * -8;
                    lVar104 = lVar76 + lVar78 + lVar67 * -8;
                    local_1668 = lVar78 + lVar77 + lVar67 * -8;
                    local_15e8 = lVar51 * 0x10 + lVar77 + lVar67 * -8;
                    lVar76 = CONCAT71(local_dd8._1_7_,local_dd8[0]) +
                             (long)(int)local_a70._vptr_BaseFab * 8;
                    lVar88 = lVar106 + lVar102 + lVar67 * -8 + lVar76;
                    lVar103 = lVar106 + lVar51 * 0x28 + lVar67 * -8 + lVar76;
                    lVar77 = lVar92 + lVar102 + lVar67 * -8 + lVar76;
                    lVar82 = lVar51 * 0x28 + lVar92 + lVar67 * -8 + lVar76;
                    lVar102 = lVar92 + lVar51 * 0x20 + lVar67 * -8 + lVar76;
                    lVar83 = lVar92 + lVar51 * 8 + lVar67 * -8 + lVar76;
                    local_1518 = lVar76 + local_1690;
                    local_1690 = local_1690 + lVar76;
                    local_1620 = (double)(lVar76 + local_1618);
                    local_1618 = local_1618 + lVar76;
                    local_15f8 = lVar76 + lVar52;
                    lVar52 = lVar52 + lVar76;
                    local_1698 = lVar106 + lVar78 + lVar67 * -8 + lVar76;
                    lVar79 = lVar106 + lVar51 * 0x18 + lVar67 * -8 + lVar76;
                    local_1598 = lVar92 + lVar67 * -8 + lVar76;
                    local_1688 = lVar92 + lVar78 + lVar67 * -8 + lVar76;
                    local_1678 = lVar51 * 0x18 + lVar92 + lVar67 * -8 + lVar76;
                    local_1680 = lVar92 + lVar51 * 0x10 + lVar67 * -8 + lVar76;
                    local_1670 = lVar92 + lVar51 * 0x40 + lVar67 * -8 + lVar76;
                    local_1660 = lVar76 + lVar104;
                    lVar104 = lVar104 + lVar76;
                    local_1650 = lVar76 + local_1668;
                    local_1668 = local_1668 + lVar76;
                    local_1640 = lVar76 + local_15e8;
                    local_15e8 = local_15e8 + lVar76;
                    local_15c8 = (double)local_1678;
                    lVar106 = lVar77;
                    lVar78 = lVar88;
                    lVar51 = lVar83;
                    lVar67 = lVar103;
                    lVar76 = lVar102;
                    local_1658 = (double)local_1680;
                    local_1648 = lVar79;
                    local_15f0 = lVar75;
                    local_1588 = local_1688;
                    local_1578 = lVar82;
                    local_1568 = local_1698;
                    do {
                      if ((int)local_a70._vptr_BaseFab <=
                          local_a70.super_DataAllocator.m_arena._4_4_) {
                        lVar92 = 0;
                        do {
                          *(ulong *)(local_1598 + lVar92 * 8) =
                               (ulong)(*(double *)(lVar51 + -8 + lVar92 * 8) +
                                       *(double *)(lVar51 + lVar92 * 8) +
                                       *(double *)(local_1640 + lVar92 * 8) +
                                       *(double *)((long)local_1658 + lVar92 * 8) +
                                       *(double *)(local_1648 + lVar92 * 8) +
                                       *(double *)((long)local_15c8 + lVar92 * 8) +
                                       *(double *)(lVar52 + -8 + lVar92 * 8) +
                                       *(double *)(lVar52 + lVar92 * 8) +
                                       *(double *)(lVar76 + -8 + lVar92 * 8) +
                                       *(double *)(lVar76 + lVar92 * 8) +
                                       *(double *)(lVar67 + -8 + lVar92 * 8) +
                                       *(double *)(lVar67 + lVar92 * 8) +
                                       *(double *)(lVar82 + -8 + lVar92 * 8) +
                                       *(double *)(lVar82 + lVar92 * 8) +
                                       *(double *)(local_1660 + lVar92 * 8) +
                                       *(double *)(local_1568 + lVar92 * 8) +
                                       *(double *)(local_1650 + lVar92 * 8) +
                                       *(double *)(local_1588 + lVar92 * 8) +
                                       *(double *)(local_1690 + -8 + lVar92 * 8) +
                                       *(double *)(local_1690 + lVar92 * 8) +
                                       *(double *)(lVar88 + -8 + lVar92 * 8) +
                                       *(double *)(lVar88 + lVar92 * 8) +
                                       *(double *)(local_1618 + -8 + lVar92 * 8) +
                                       *(double *)(local_1618 + lVar92 * 8) +
                                       *(double *)(lVar77 + -8 + lVar92 * 8) +
                                      *(double *)(lVar77 + lVar92 * 8)) ^ uVar107;
                          *(double *)(local_1670 + lVar92 * 8) =
                               1.0 / ((double)(*(ulong *)(lVar106 + lVar92 * 8) & uVar333) +
                                      (double)(*(ulong *)(lVar106 + -8 + lVar92 * 8) & uVar333) +
                                      (double)(*(ulong *)((long)local_1620 + lVar92 * 8) & uVar333)
                                      + (double)(*(ulong *)((long)local_1620 + -8 + lVar92 * 8) &
                                                uVar333) +
                                        (double)(*(ulong *)(lVar78 + lVar92 * 8) & uVar333) +
                                        (double)(*(ulong *)(lVar78 + -8 + lVar92 * 8) & uVar333) +
                                        (double)(*(ulong *)(local_1518 + lVar92 * 8) & uVar333) +
                                        (double)(*(ulong *)(local_1518 + -8 + lVar92 * 8) & uVar333)
                                        + (double)(*(ulong *)(local_1688 + lVar92 * 8) & uVar333) +
                                          (double)(*(ulong *)(local_1668 + lVar92 * 8) & uVar333) +
                                          (double)(*(ulong *)(local_1698 + lVar92 * 8) & uVar333) +
                                          (double)(*(ulong *)(lVar104 + lVar92 * 8) & uVar333) +
                                          (double)(*(ulong *)(local_1578 + lVar92 * 8) & uVar333) +
                                          (double)(*(ulong *)(local_1578 + -8 + lVar92 * 8) &
                                                  uVar333) +
                                          (double)(*(ulong *)(lVar103 + lVar92 * 8) & uVar333) +
                                          (double)(*(ulong *)(lVar103 + -8 + lVar92 * 8) & uVar333)
                                          + (double)(*(ulong *)(lVar102 + lVar92 * 8) & uVar333) +
                                            (double)(*(ulong *)(lVar102 + -8 + lVar92 * 8) & uVar333
                                                    ) +
                                            (double)(*(ulong *)(local_15f8 + lVar92 * 8) & uVar333)
                                            + (double)(*(ulong *)(local_15f8 + -8 + lVar92 * 8) &
                                                      uVar333) +
                                              (double)(*(ulong *)(local_1678 + lVar92 * 8) & uVar333
                                                      ) +
                                              (double)(*(ulong *)(lVar79 + lVar92 * 8) & uVar333) +
                                              (double)(*(ulong *)(local_1680 + lVar92 * 8) & uVar333
                                                      ) +
                                              (double)(*(ulong *)(local_15e8 + lVar92 * 8) & uVar333
                                                      ) +
                                              (double)(*(ulong *)(lVar83 + lVar92 * 8) & uVar333) +
                                              (double)(*(ulong *)(lVar83 + -8 + lVar92 * 8) &
                                                      uVar333) + 1e-100);
                          lVar92 = lVar92 + 1;
                        } while ((local_a70.super_DataAllocator.m_arena._4_4_ -
                                 (int)local_a70._vptr_BaseFab) + 1 != (int)lVar92);
                      }
                      local_15f0 = local_15f0 + 1;
                      lVar78 = lVar78 + lVar53;
                      lVar103 = lVar103 + lVar53;
                      lVar106 = lVar106 + lVar53;
                      local_1578 = local_1578 + lVar53;
                      lVar102 = lVar102 + lVar53;
                      lVar83 = lVar83 + lVar53;
                      local_1518 = local_1518 + lVar53;
                      local_1620 = (double)((long)local_1620 + lVar53);
                      local_15f8 = local_15f8 + lVar53;
                      lVar88 = lVar88 + lVar53;
                      lVar67 = lVar67 + lVar53;
                      lVar77 = lVar77 + lVar53;
                      lVar82 = lVar82 + lVar53;
                      lVar76 = lVar76 + lVar53;
                      lVar51 = lVar51 + lVar53;
                      local_1690 = local_1690 + lVar53;
                      local_1618 = local_1618 + lVar53;
                      lVar52 = lVar52 + lVar53;
                      local_1568 = local_1568 + lVar53;
                      local_1648 = local_1648 + lVar53;
                      local_1598 = local_1598 + lVar53;
                      local_1588 = local_1588 + lVar53;
                      local_15c8 = (double)((long)local_15c8 + lVar53);
                      local_1658 = (double)((long)local_1658 + lVar53);
                      local_1660 = local_1660 + lVar53;
                      local_1650 = local_1650 + lVar53;
                      local_1640 = local_1640 + lVar53;
                      local_1698 = local_1698 + lVar53;
                      lVar79 = lVar79 + lVar53;
                      local_1670 = local_1670 + lVar53;
                      local_1688 = local_1688 + lVar53;
                      local_1678 = local_1678 + lVar53;
                      local_1680 = local_1680 + lVar53;
                      lVar104 = lVar104 + lVar53;
                      local_1668 = local_1668 + lVar53;
                      local_15e8 = local_15e8 + lVar53;
                    } while ((int)local_a70.dptr + 1 != (int)local_15f0);
                  }
                  iVar48 = iVar48 + 1;
                  bVar110 = iVar63 != local_a70.dptr._4_4_;
                  iVar63 = iVar63 + 1;
                } while (bVar110);
              }
              MFIter::operator++((MFIter *)&local_bc8);
            }
            MFIter::~MFIter((MFIter *)&local_bc8);
            if (bVar109 || !bVar108) {
              period = Periodicity::NonPeriodic();
              FabArray<amrex::FArrayBox>::ParallelCopy
                        (local_320,(FabArray<amrex::FArrayBox> *)local_1e8,period,COPY);
            }
            lVar75 = local_318;
            pFVar25 = *(FabArray<amrex::FArrayBox> **)
                       (*(long *)((long)&(((this->m_stencil).
                                           super_vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                                           .
                                           super__Vector_base<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->
                                         super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                                         ).
                                         super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                                 + local_328) + local_318 * 8);
            PVar704 = Geometry::periodicity
                                ((Geometry *)
                                 (local_318 * 200 +
                                 *(long *)((long)&(((this->super_MLNodeLinOp).super_MLLinOp.m_geom.
                                                                                                        
                                                  super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                                                  .
                                                  super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                                                  ).
                                                  super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                                          + local_328)));
            local_bc8 = PVar704.period.vect[0]._0_1_;
            bStack_bc7 = PVar704.period.vect[0]._1_1_;
            bStack_bc6 = PVar704.period.vect[0]._2_1_;
            uStack_bc5 = PVar704.period.vect[0]._3_1_;
            auStack_bc4._0_4_ = PVar704.period.vect[1];
            auStack_bc4._4_4_ = PVar704.period.vect[2];
            FabArray<amrex::FArrayBox>::FillBoundary<double>
                      (pFVar25,(Periodicity *)&local_bc8,false);
            MultiFab::~MultiFab((MultiFab *)local_1e8);
            lVar75 = lVar75 + 1;
          } while (lVar75 < (this->super_MLNodeLinOp).super_MLLinOp.m_num_mg_levels.
                            super_vector<int,_std::allocator<int>_>.
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar72]);
        }
        uVar72 = uVar72 + 1;
        uVar107 = (ulong)(this->super_MLNodeLinOp).super_MLLinOp.m_num_amr_levels;
      } while ((long)uVar72 < (long)uVar107);
    }
    if (0 < (this->super_MLNodeLinOp).super_MLLinOp.m_num_amr_levels) {
      lVar75 = 0;
      do {
        if (0 < (this->super_MLNodeLinOp).super_MLLinOp.m_num_mg_levels.
                super_vector<int,_std::allocator<int>_>.
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start[lVar75]) {
          lVar106 = 0;
          do {
            MFIter::MFIter((MFIter *)local_1e8,
                           *(FabArrayBase **)
                            (*(long *)&(local_e50->
                                       super_vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                                       ).
                                       super__Vector_base<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[lVar75].
                                       super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                                       .
                                       super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                            + lVar106 * 8),true);
            if ((int)local_1e8._32_4_ < (int)local_1e8._40_4_) {
              do {
                MFIter::tilebox((Box *)&local_a70,(MFIter *)local_1e8);
                FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                          ((Array4<const_double> *)&local_bc8,
                           *(FabArray<amrex::FArrayBox> **)
                            (*(long *)&(this->m_stencil).
                                       super_vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                                       .
                                       super__Vector_base<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[lVar75].
                                       super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                                       .
                                       super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                            + lVar106 * 8),(MFIter *)local_1e8);
                FabArray<amrex::IArrayBox>::array<amrex::IArrayBox,_0>
                          ((Array4<int> *)local_dd8,
                           *(FabArray<amrex::IArrayBox> **)
                            (*(long *)&(this->super_MLNodeLinOp).m_dirichlet_mask.
                                       super_vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                                       .
                                       super__Vector_base<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[lVar75].
                                       super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                                       .
                                       super__Vector_base<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                            + lVar106 * 8),(MFIter *)local_1e8);
                if ((int)local_a70.super_DataAllocator.m_arena <= local_a70.dptr._4_4_) {
                  iVar48 = (int)local_a70.super_DataAllocator.m_arena;
                  do {
                    if (local_a70._vptr_BaseFab._4_4_ <= (int)local_a70.dptr) {
                      iVar63 = local_a70._vptr_BaseFab._4_4_;
                      do {
                        if ((int)local_a70._vptr_BaseFab <=
                            local_a70.super_DataAllocator.m_arena._4_4_) {
                          iVar74 = (int)local_a70._vptr_BaseFab;
                          do {
                            dVar469 = *(double *)
                                       (CONCAT44(auStack_bc4._0_4_,
                                                 CONCAT13(uStack_bc5,
                                                          CONCAT12(bStack_bc6,
                                                                   CONCAT11(bStack_bc7,local_bc8))))
                                        + ((long)iVar63 - (long)local_ba8[1]) *
                                          CONCAT44(auStack_bc4._8_4_,auStack_bc4._4_4_) * 8 +
                                        (long)(iVar74 - local_ba8[0]) * 8 +
                                       ((long)iVar48 - (long)local_ba8[2]) *
                                       CONCAT44(auStack_bc4._16_4_,auStack_bc4._12_4_) * 8);
                            if ((dVar469 == 0.0) && (!NAN(dVar469))) {
                              *(undefined4 *)
                               (((long)iVar63 - (long)iStack_db4) *
                                CONCAT44(local_dd8._12_4_,local_dd8._8_4_) * 4 +
                                CONCAT71(local_dd8._1_7_,local_dd8[0]) +
                                (long)(iVar74 - local_db8) * 4 +
                               ((long)iVar48 - (long)local_db0) * local_dd8._16_8_ * 4) = 1;
                            }
                            iVar74 = iVar74 + 1;
                          } while (local_a70.super_DataAllocator.m_arena._4_4_ + 1 != iVar74);
                        }
                        bVar108 = iVar63 != (int)local_a70.dptr;
                        iVar63 = iVar63 + 1;
                      } while (bVar108);
                    }
                    bVar108 = iVar48 != local_a70.dptr._4_4_;
                    iVar48 = iVar48 + 1;
                  } while (bVar108);
                }
                MFIter::operator++((MFIter *)local_1e8);
              } while ((int)local_1e8._32_4_ < (int)local_1e8._40_4_);
            }
            MFIter::~MFIter((MFIter *)local_1e8);
            lVar106 = lVar106 + 1;
          } while (lVar106 < (this->super_MLNodeLinOp).super_MLLinOp.m_num_mg_levels.
                             super_vector<int,_std::allocator<int>_>.
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[lVar75]);
        }
        lVar75 = lVar75 + 1;
      } while (lVar75 < (this->super_MLNodeLinOp).super_MLLinOp.m_num_amr_levels);
    }
    iVar48 = *(this->super_MLNodeLinOp).super_MLLinOp.m_num_mg_levels.
              super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
              _M_impl.super__Vector_impl_data._M_start;
    uVar107 = (ulong)(iVar48 - 1);
    uVar72 = 0;
    do {
      iVar63 = (int)uVar72;
      if (iVar48 < 2) break;
      iVar74 = iMultiFab::min(*(iMultiFab **)
                               (*(long *)&(((this->super_MLNodeLinOp).m_dirichlet_mask.
                                            super_vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                                            .
                                            super__Vector_base<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->
                                          super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                                          ).
                                          super__Vector_base<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                               + uVar107 * 8),0,0,false);
      iVar48 = iVar48 + -1;
      if (iVar74 == 0) {
        uVar72 = uVar107 & 0xffffffff;
      }
      iVar63 = (int)uVar72;
      uVar107 = uVar107 - 1;
    } while (iVar74 != 0);
    if (iVar63 + 1 <
        *(this->super_MLNodeLinOp).super_MLLinOp.m_num_mg_levels.
         super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
         _M_impl.super__Vector_impl_data._M_start) {
      resizeMultiGrid(this,iVar63 + 1);
    }
    iVar48 = *(this->super_MLNodeLinOp).super_MLLinOp.m_num_mg_levels.
              super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pMVar49 = &(this->super_MLNodeLinOp).m_bottom_dot_mask;
    FabArray<amrex::FArrayBox>::build_arrays<amrex::FArrayBox,_0>
              (&pMVar49->super_FabArray<amrex::FArrayBox>);
    pAVar30 = (this->super_MLNodeLinOp).m_bottom_dot_mask.super_FabArray<amrex::FArrayBox>.m_arrays.
              hp;
    pFVar31 = *(FabArray<amrex::IArrayBox> **)
               (*(long *)&(((this->super_MLNodeLinOp).m_dirichlet_mask.
                            super_vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                            .
                            super__Vector_base<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                          ).
                          super__Vector_base<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                + -8 + (long)iVar48 * 8);
    FabArray<amrex::IArrayBox>::build_arrays<amrex::IArrayBox,_0>(pFVar31);
    pAVar32 = (pFVar31->m_const_arrays).hp;
    local_dd8[0] = false;
    local_dd8._1_7_ = 0;
    local_dd8._8_4_ = 0;
    bStack_bc6 = true;
    auStack_bc4._0_4_ = Gpu::Device::max_gpu_streams.itype;
    local_bc8 = true;
    bStack_bc7 = false;
    auStack_bc4._4_4_ = (undefined4)FabArrayBase::mfiter_tile_size;
    auStack_bc4._8_4_ = SUB84(FabArrayBase::mfiter_tile_size,4);
    auStack_bc4._12_4_ = DAT_00753ec0;
    MFIter::MFIter((MFIter *)local_1e8,(FabArrayBase *)pMVar49,(MFItInfo *)&local_bc8);
    if ((int)local_1e8._32_4_ < (int)local_1e8._40_4_) {
      do {
        MFIter::growntilebox((Box *)&local_bc8,(MFIter *)local_1e8,(IntVect *)local_dd8);
        piVar66 = (int *)(local_1e8 + 0x20);
        if ((long *)local_1e8._64_8_ != (long *)0x0) {
          piVar66 = (int *)((long)(int)local_1e8._32_4_ * 4 + *(long *)local_1e8._64_8_);
        }
        if ((int)auStack_bc4._4_4_ <= (int)auStack_bc4._16_4_) {
          iVar48 = CONCAT13(uStack_bc5,CONCAT12(bStack_bc6,CONCAT11(bStack_bc7,local_bc8)));
          pAVar1 = pAVar32 + *piVar66;
          pAVar94 = pAVar30 + *piVar66;
          IVar39.itype = auStack_bc4._4_4_;
          do {
            if ((int)auStack_bc4._0_4_ <= (int)auStack_bc4._12_4_) {
              IVar101.itype = auStack_bc4._0_4_;
              do {
                if (iVar48 <= (int)auStack_bc4._8_4_) {
                  iVar63 = (pAVar1->begin).x;
                  iVar74 = (pAVar1->begin).y;
                  iVar65 = (pAVar1->begin).z;
                  piVar66 = pAVar1->p;
                  lVar75 = pAVar1->kstride;
                  lVar106 = pAVar1->jstride;
                  lVar78 = 0;
                  do {
                    if (piVar66[(long)iVar48 +
                                ((((long)(int)IVar39.itype - (long)iVar65) * lVar75 +
                                 ((long)(int)IVar101.itype - (long)iVar74) * lVar106 + lVar78) -
                                (long)iVar63)] != 0) {
                      pAVar94->p
                      [(((long)(int)IVar101.itype - (long)(pAVar94->begin).y) * pAVar94->jstride +
                       ((long)(int)IVar39.itype - (long)(pAVar94->begin).z) * pAVar94->kstride +
                       iVar48 + lVar78) - (long)(pAVar94->begin).x] = 0.0;
                    }
                    lVar78 = lVar78 + 1;
                  } while ((auStack_bc4._8_4_ - iVar48) + 1 != (int)lVar78);
                }
                bVar108 = IVar101.itype != auStack_bc4._12_4_;
                IVar101.itype = IVar101.itype + 1;
              } while (bVar108);
            }
            bVar108 = IVar39.itype != auStack_bc4._16_4_;
            IVar39.itype = IVar39.itype + 1;
          } while (bVar108);
        }
        MFIter::operator++((MFIter *)local_1e8);
      } while ((int)local_1e8._32_4_ < (int)local_1e8._40_4_);
    }
    MFIter::~MFIter((MFIter *)local_1e8);
    if ((this->super_MLNodeLinOp).m_is_bottom_singular == true) {
      pMVar49 = &(this->super_MLNodeLinOp).m_coarse_dot_mask;
      FabArray<amrex::FArrayBox>::build_arrays<amrex::FArrayBox,_0>
                (&pMVar49->super_FabArray<amrex::FArrayBox>);
      pAVar30 = (this->super_MLNodeLinOp).m_coarse_dot_mask.super_FabArray<amrex::FArrayBox>.
                m_arrays.hp;
      pFVar31 = (FabArray<amrex::IArrayBox> *)
                **(undefined8 **)
                  &(((this->super_MLNodeLinOp).m_dirichlet_mask.
                     super_vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                     .
                     super__Vector_base<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->
                   super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                   ).
                   super__Vector_base<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
      ;
      FabArray<amrex::IArrayBox>::build_arrays<amrex::IArrayBox,_0>(pFVar31);
      pAVar32 = (pFVar31->m_const_arrays).hp;
      local_dd8[0] = false;
      local_dd8._1_7_ = 0;
      local_dd8._8_4_ = 0;
      bStack_bc6 = true;
      auStack_bc4._0_4_ = Gpu::Device::max_gpu_streams.itype;
      local_bc8 = true;
      bStack_bc7 = false;
      auStack_bc4._4_4_ = (undefined4)FabArrayBase::mfiter_tile_size;
      auStack_bc4._8_4_ = SUB84(FabArrayBase::mfiter_tile_size,4);
      auStack_bc4._12_4_ = DAT_00753ec0;
      MFIter::MFIter((MFIter *)local_1e8,(FabArrayBase *)pMVar49,(MFItInfo *)&local_bc8);
      if ((int)local_1e8._32_4_ < (int)local_1e8._40_4_) {
        do {
          MFIter::growntilebox((Box *)&local_bc8,(MFIter *)local_1e8,(IntVect *)local_dd8);
          piVar66 = (int *)(local_1e8 + 0x20);
          if ((long *)local_1e8._64_8_ != (long *)0x0) {
            piVar66 = (int *)((long)(int)local_1e8._32_4_ * 4 + *(long *)local_1e8._64_8_);
          }
          if ((int)auStack_bc4._4_4_ <= (int)auStack_bc4._16_4_) {
            iVar48 = CONCAT13(uStack_bc5,CONCAT12(bStack_bc6,CONCAT11(bStack_bc7,local_bc8)));
            pAVar1 = pAVar32 + *piVar66;
            pAVar94 = pAVar30 + *piVar66;
            IVar39.itype = auStack_bc4._4_4_;
            do {
              if ((int)auStack_bc4._0_4_ <= (int)auStack_bc4._12_4_) {
                IVar101.itype = auStack_bc4._0_4_;
                do {
                  if (iVar48 <= (int)auStack_bc4._8_4_) {
                    iVar63 = (pAVar1->begin).x;
                    iVar74 = (pAVar1->begin).y;
                    iVar65 = (pAVar1->begin).z;
                    piVar66 = pAVar1->p;
                    lVar75 = pAVar1->kstride;
                    lVar106 = pAVar1->jstride;
                    lVar78 = 0;
                    do {
                      if (piVar66[(long)iVar48 +
                                  ((((long)(int)IVar39.itype - (long)iVar65) * lVar75 +
                                   ((long)(int)IVar101.itype - (long)iVar74) * lVar106 + lVar78) -
                                  (long)iVar63)] != 0) {
                        pAVar94->p
                        [(((long)(int)IVar101.itype - (long)(pAVar94->begin).y) * pAVar94->jstride +
                         ((long)(int)IVar39.itype - (long)(pAVar94->begin).z) * pAVar94->kstride +
                         iVar48 + lVar78) - (long)(pAVar94->begin).x] = 0.0;
                      }
                      lVar78 = lVar78 + 1;
                    } while ((auStack_bc4._8_4_ - iVar48) + 1 != (int)lVar78);
                  }
                  bVar108 = IVar101.itype != auStack_bc4._12_4_;
                  IVar101.itype = IVar101.itype + 1;
                } while (bVar108);
              }
              bVar108 = IVar39.itype != auStack_bc4._16_4_;
              IVar39.itype = IVar39.itype + 1;
            } while (bVar108);
          }
          MFIter::operator++((MFIter *)local_1e8);
        } while ((int)local_1e8._32_4_ < (int)local_1e8._40_4_);
      }
      MFIter::~MFIter((MFIter *)local_1e8);
    }
    Gpu::Device::streamSynchronize();
    RVar127 = MultiFab::norm0((MultiFab *)
                              (*(pointer *)
                                ((long)&(((this->m_stencil).
                                          super_vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                                          .
                                          super__Vector_base<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->
                                        super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                                        ).
                                        super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                                + 8))[-1]._M_t.
                              super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
                              ,0,0,false,false);
    (*(pointer *)
      ((long)&(((this->m_s0_norm0).
                super_vector<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>
                .
                super__Vector_base<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->
              super_vector<double,_std::allocator<double>_>).
              super__Vector_base<double,_std::allocator<double>_> + 8))[-1] =
         RVar127 * this->m_normalization_threshold;
  }
  return;
}

Assistant:

void
MLNodeLaplacian::buildStencil ()
{
    m_stencil.resize(m_num_amr_levels);
    m_nosigma_stencil.resize(m_num_amr_levels);
    m_s0_norm0.resize(m_num_amr_levels);
    for (int amrlev = 0; amrlev < m_num_amr_levels; ++amrlev)
    {
        m_stencil[amrlev].resize(m_num_mg_levels[amrlev]);
        m_s0_norm0[amrlev].resize(m_num_mg_levels[amrlev],0.0);
    }

    if (m_coarsening_strategy != CoarseningStrategy::RAP) return;

    const int ncomp_s = (AMREX_SPACEDIM == 2) ? 5 : 9;
    AMREX_ALWAYS_ASSERT_WITH_MESSAGE(AMREX_SPACEDIM != 1,
                                     "MLNodeLaplacian::buildStencil: 1d not supported");
    AMREX_ALWAYS_ASSERT_WITH_MESSAGE(!m_geom[0][0].IsRZ(),
                                     "MLNodeLaplacian::buildStencil: cylindrical not supported for RAP");

    for (int amrlev = 0; amrlev < m_num_amr_levels; ++amrlev)
    {
        AMREX_ALWAYS_ASSERT(amrlev == m_num_amr_levels-1 || AMRRefRatio(amrlev) == 2);
        for (int mglev = 0; mglev < m_num_mg_levels[amrlev]; ++mglev)
        {
            const int nghost = (0 == amrlev && mglev+1 == m_num_mg_levels[amrlev]) ? 1 : 4;
            m_stencil[amrlev][mglev] = std::make_unique<MultiFab>
                (amrex::convert(m_grids[amrlev][mglev], IntVect::TheNodeVector()),
                 m_dmap[amrlev][mglev], ncomp_s, nghost);
            m_stencil[amrlev][mglev]->setVal(0.0);
        }

        if (amrlev > 0) {
            m_nosigma_stencil[amrlev] = std::make_unique<MultiFab>
                (amrex::convert(m_grids[amrlev][0], IntVect::TheNodeVector()),
                 m_dmap[amrlev][0], ncomp_s, 4);
            m_nosigma_stencil[amrlev]->setVal(0.0);
        }

        {
            const Geometry& geom = m_geom[amrlev][0];
            const auto dxinvarr = geom.InvCellSizeArray();

#ifdef AMREX_USE_EB
            auto factory = dynamic_cast<EBFArrayBoxFactory const*>(m_factory[amrlev][0].get());
            const FabArray<EBCellFlagFab>* flags = (factory) ? &(factory->getMultiEBCellFlagFab()) : nullptr;
            const MultiFab* intg = m_integral[amrlev].get();
            const MultiFab* vfrac = (factory) ? &(factory->getVolFrac()) : nullptr;
#endif

            MFItInfo mfi_info;
            if (Gpu::notInLaunchRegion()) mfi_info.EnableTiling().SetDynamic(true);
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
            {
                FArrayBox sgfab;
                FArrayBox cnfab;

                for (MFIter mfi(*m_stencil[amrlev][0],mfi_info); mfi.isValid(); ++mfi)
                {
                    Box vbx = mfi.validbox();
                    AMREX_D_TERM(vbx.growLo(0,1);, vbx.growLo(1,1);, vbx.growLo(2,1));
                    Box bx = mfi.growntilebox(1);
                    bx &= vbx;
                    const Box& ccbx = amrex::enclosedCells(bx);
                    const Box& ccbxg1 = amrex::grow(ccbx,1);
                    const FArrayBox& sgfab_orig = (*m_sigma[amrlev][0][0])[mfi];
                    Array4<Real const> const& sgarr_orig = sgfab_orig.const_array();

                    Array4<Real> const& starr = m_stencil[amrlev][0]->array(mfi);
                    Array4<Real> const ns_starr = m_nosigma_stencil[amrlev] ?
                        m_nosigma_stencil[amrlev]->array(mfi) : Array4<Real>{};
#ifdef AMREX_USE_EB
                    Array4<Real const> const& intgarr = intg->const_array(mfi);

                    const int ncomp_c = (AMREX_SPACEDIM == 2) ? 6 : 27;
                    bool regular = !factory;
                    if (factory)
                    {
                        Array4<EBCellFlag const> const& flagarr = flags->const_array(mfi);
                        Array4<Real const> const& vfracarr = vfrac->const_array(mfi);
                        const auto& flag = (*flags)[mfi];
                        const auto& typ = flag.getType(ccbxg1);
                        if (typ == FabType::covered)
                        {
                            AMREX_HOST_DEVICE_PARALLEL_FOR_4D(bx,ncomp_s,i,j,k,n,
                            {
                                starr(i,j,k,n) = 0.0;
                            });

                            if (ns_starr) {
                                AMREX_HOST_DEVICE_PARALLEL_FOR_4D(bx,ncomp_s,i,j,k,n,
                                {
                                    ns_starr(i,j,k,n) = 0.0;
                                });
                            }
                        }
                        else if (typ == FabType::singlevalued)
                        {
                            const Box& btmp = ccbxg1 & sgfab_orig.box();

                            cnfab.resize(ccbxg1, ncomp_c);
                            Elixir cneli = cnfab.elixir();
                            Array4<Real> const& cnarr = cnfab.array();

                            sgfab.resize(ccbxg1);
                            Elixir sgeli = sgfab.elixir();
                            Array4<Real> const& sgarr = sgfab.array();

                            AMREX_HOST_DEVICE_FOR_3D(ccbxg1, i, j, k,
                            {
                                if (btmp.contains(IntVect(AMREX_D_DECL(i,j,k)))) {
                                    mlndlap_set_connection(i,j,k,cnarr,intgarr,vfracarr,flagarr);
                                    sgarr(i,j,k) = sgarr_orig(i,j,k);
                                } else {
                                    for (int n = 0; n < ncomp_c; ++n) {
                                        cnarr(i,j,k,n) = 0.0;
                                    }
                                    sgarr(i,j,k) = 0.0;
                                }
                            });

                            AMREX_HOST_DEVICE_FOR_3D(bx, i, j, k,
                            {
                                mlndlap_set_stencil_eb(i, j, k, starr, sgarr, cnarr, dxinvarr);
                            });

                            if (ns_starr) {
                                AMREX_HOST_DEVICE_FOR_3D(btmp, i, j, k,
                                {
                                    sgarr(i,j,k) = Real(1.0);
                                });
                                AMREX_HOST_DEVICE_FOR_3D(bx, i, j, k,
                                {
                                    mlndlap_set_stencil_eb(i,j,k, ns_starr, sgarr, cnarr, dxinvarr);
                                });
                            }
                        }
                        else
                        {
                            regular = true;
                        }
                    }
                    if (regular)
#endif
                    {
                        const Box& btmp = ccbxg1 & sgfab_orig.box();

                        sgfab.resize(ccbxg1);
                        Elixir sgeli = sgfab.elixir();
                        Array4<Real> const& sgarr = sgfab.array();

                        AMREX_HOST_DEVICE_FOR_3D(ccbxg1, i, j, k,
                        {
                            if (btmp.contains(IntVect(AMREX_D_DECL(i,j,k)))) {
                                sgarr(i,j,k) = sgarr_orig(i,j,k);
                            } else {
                                sgarr(i,j,k) = 0.0;
                            }
                        });

                        AMREX_LAUNCH_HOST_DEVICE_LAMBDA ( bx, tbx,
                        {
                            mlndlap_set_stencil(tbx,starr,sgarr,dxinvarr);
                        });

                        if (ns_starr) {
                            AMREX_HOST_DEVICE_FOR_3D(btmp, i, j, k,
                            {
                                sgarr(i,j,k) = Real(1.0);
                            });

                            AMREX_LAUNCH_HOST_DEVICE_LAMBDA ( bx, tbx,
                            {
                                mlndlap_set_stencil(tbx, ns_starr, sgarr, dxinvarr);
                            });
                        }
                    }
                }
            }

            // set_stencil_s0 has to be in a separate MFIter from set_stencil
            // because it uses other cells' data.
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
            for (MFIter mfi(*m_stencil[amrlev][0],TilingIfNotGPU()); mfi.isValid(); ++mfi)
            {
                const Box& bx = mfi.tilebox();
                Array4<Real> const& starr = m_stencil[amrlev][0]->array(mfi);
                AMREX_HOST_DEVICE_PARALLEL_FOR_3D(bx, i, j, k,
                {
                    mlndlap_set_stencil_s0(i,j,k,starr);
                });

                if (m_nosigma_stencil[amrlev]) {
                    Array4<Real> const& ns_starr = m_nosigma_stencil[amrlev]->array(mfi);
                    AMREX_HOST_DEVICE_PARALLEL_FOR_3D(bx, i, j, k,
                    {
                        mlndlap_set_stencil_s0(i,j,k,ns_starr);
                    });
                }
            }

            m_stencil[amrlev][0]->FillBoundary(geom.periodicity());

            if (m_nosigma_stencil[amrlev]) {
                m_nosigma_stencil[amrlev]->FillBoundary(geom.periodicity());
            }
        }

        for (int mglev = 1; mglev < m_num_mg_levels[amrlev]; ++mglev)
        {
            const MultiFab& fine = *m_stencil[amrlev][mglev-1];
            MultiFab& crse = *m_stencil[amrlev][mglev];
            bool need_parallel_copy = !amrex::isMFIterSafe(crse, fine);
            MultiFab cfine;
            if (need_parallel_copy) {
                const BoxArray& ba = amrex::coarsen(fine.boxArray(), 2);
                cfine.define(ba, fine.DistributionMap(), fine.nComp(), 1);
                cfine.setVal(0.0);
            }

            MultiFab* pcrse = (need_parallel_copy) ? &cfine : &crse;

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
            for (MFIter mfi(*pcrse, TilingIfNotGPU()); mfi.isValid(); ++mfi)
            {
                Box vbx = mfi.validbox();
                AMREX_D_TERM(vbx.growLo(0,1);, vbx.growLo(1,1);, vbx.growLo(2,1));
                Box bx = mfi.growntilebox(1);
                bx &= vbx;
                Array4<Real> const& csten = pcrse->array(mfi);
                Array4<Real const> const& fsten = fine.const_array(mfi);

                AMREX_HOST_DEVICE_FOR_3D(bx, i, j, k,
                {
                    mlndlap_stencil_rap(i,j,k,csten,fsten);
                });
            }

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
            for (MFIter mfi(*pcrse,TilingIfNotGPU()); mfi.isValid(); ++mfi)
            {
                const Box& bx = mfi.tilebox();
                Array4<Real> const& starr = pcrse->array(mfi);
                AMREX_HOST_DEVICE_PARALLEL_FOR_3D(bx, i, j, k,
                {
                    mlndlap_set_stencil_s0(i,j,k,starr);
                });
            }

            if (need_parallel_copy) {
                crse.ParallelCopy(cfine);
            }

            m_stencil[amrlev][mglev]->FillBoundary(m_geom[amrlev][mglev].periodicity());
        }
    }

#ifdef AMREX_USE_EB
    for (int amrlev = 0; amrlev < m_num_amr_levels; ++amrlev) {
        for (int mglev = 0; mglev < m_num_mg_levels[amrlev]; ++mglev) {
#ifdef AMREX_USE_GPU
            if (Gpu::inLaunchRegion() && m_stencil[amrlev][mglev]->isFusingCandidate()) {
                auto const& stma = m_stencil[amrlev][mglev]->const_arrays();
                auto const& dmskma = m_dirichlet_mask[amrlev][mglev]->arrays();
                ParallelFor(*m_stencil[amrlev][mglev],
                [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k) noexcept
                {
                    if (stma[box_no](i,j,k,0) == Real(0.0)) {
                        dmskma[box_no](i,j,k) = 1;
                    }
                });
                // We only need to sync once at the end of this function.
            } else
#endif
            {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
                for (MFIter mfi(*m_stencil[amrlev][mglev],TilingIfNotGPU()); mfi.isValid(); ++mfi) {
                    Box const& bx = mfi.tilebox();
                    Array4<Real const> const& starr = m_stencil[amrlev][mglev]->const_array(mfi);
                    Array4<int> const& dmskarr = m_dirichlet_mask[amrlev][mglev]->array(mfi);
                    AMREX_HOST_DEVICE_PARALLEL_FOR_3D(bx, i, j, k,
                    {
                        if (starr(i,j,k,0) == Real(0.0)) {
                            dmskarr(i,j,k) = 1;
                        }
                    });
                }
            }
        }
    }
#endif

#ifdef AMREX_USE_EB
    int max_eb_level = 0;
    for (int mglev = m_num_mg_levels[0]-1; mglev > 0; --mglev) {
        int mlo = m_dirichlet_mask[0][mglev]->min(0);
        if (!mlo) {
            // This level is good because not every nodes are Dirichlet.
            max_eb_level = mglev;
            break;
        }
    }
    if (max_eb_level+1 < m_num_mg_levels[0]) {
        resizeMultiGrid(max_eb_level+1);
    }
#endif

    {
        int amrlev = 0;
        int mglev = m_num_mg_levels[amrlev]-1;
        auto const& dotmasks = m_bottom_dot_mask.arrays();
        auto const& dirmasks = m_dirichlet_mask[amrlev][mglev]->const_arrays();
        amrex::ParallelFor(m_bottom_dot_mask,
        [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k) noexcept
        {
            if (dirmasks[box_no](i,j,k)) {
                dotmasks[box_no](i,j,k) = Real(0.);
            }
        });
    }

    if (m_is_bottom_singular)
    {
        int amrlev = 0;
        int mglev = 0;
        auto const& dotmasks = m_coarse_dot_mask.arrays();
        auto const& dirmasks = m_dirichlet_mask[amrlev][mglev]->const_arrays();
        amrex::ParallelFor(m_coarse_dot_mask,
        [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k) noexcept
        {
            if (dirmasks[box_no](i,j,k)) {
                dotmasks[box_no](i,j,k) = Real(0.);
            }
        });
    }

    Gpu::streamSynchronize();

    // This is only needed at the bottom.
    m_s0_norm0[0].back() = m_stencil[0].back()->norm0(0,0) * m_normalization_threshold;
}